

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256_avx2.cpp
# Opt level: O2

void __thiscall sha256d64_avx2::Transform_8way(sha256d64_avx2 *this,uchar *out,uchar *in)

{
  long lVar1;
  int offset;
  int offset_00;
  int offset_01;
  int offset_02;
  int offset_03;
  int offset_04;
  int offset_05;
  int offset_06;
  int offset_07;
  int offset_08;
  int offset_09;
  int offset_10;
  int offset_11;
  int offset_12;
  int offset_13;
  long in_FS_OFFSET;
  undefined1 in_ZMM0 [64];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 in_stack_00000008 [32];
  __m256i v;
  undefined1 local_738 [32];
  
  auVar42 = in_ZMM0._0_32_;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  anon_unknown_0::Read8((__m256i *)out,(uchar *)0x0,(int)in);
  auVar146._8_4_ = 0x98c7e2a2;
  auVar146._0_8_ = 0x98c7e2a298c7e2a2;
  auVar146._12_4_ = 0x98c7e2a2;
  auVar146._16_4_ = 0x98c7e2a2;
  auVar146._20_4_ = 0x98c7e2a2;
  auVar146._24_4_ = 0x98c7e2a2;
  auVar146._28_4_ = 0x98c7e2a2;
  auVar94 = vpaddd_avx2(auVar42,auVar146);
  auVar2._8_4_ = 0xfc08884d;
  auVar2._0_8_ = 0xfc08884dfc08884d;
  auVar2._12_4_ = 0xfc08884d;
  auVar2._16_4_ = 0xfc08884d;
  auVar2._20_4_ = 0xfc08884d;
  auVar2._24_4_ = 0xfc08884d;
  auVar2._28_4_ = 0xfc08884d;
  auVar8 = vpaddd_avx2(auVar42,auVar2);
  auVar70 = auVar8;
  anon_unknown_0::Read8((__m256i *)out,(uchar *)0x4,offset);
  auVar11 = vpsrld_avx2(auVar94,6);
  auVar3 = vpslld_avx2(auVar94,0x1a);
  auVar11 = vpor_avx2(auVar3,auVar11);
  auVar3 = vpsrld_avx2(auVar94,0xb);
  auVar12 = vpslld_avx2(auVar94,0x15);
  auVar12 = vpor_avx2(auVar12,auVar3);
  auVar3 = vpsrld_avx2(auVar94,0x19);
  auVar13 = vpslld_avx2(auVar94,7);
  auVar13 = vpor_avx2(auVar13,auVar3);
  auVar4._8_4_ = 0xca0b3af3;
  auVar4._0_8_ = 0xca0b3af3ca0b3af3;
  auVar4._12_4_ = 0xca0b3af3;
  auVar4._16_4_ = 0xca0b3af3;
  auVar4._20_4_ = 0xca0b3af3;
  auVar4._24_4_ = 0xca0b3af3;
  auVar4._28_4_ = 0xca0b3af3;
  auVar3 = vpand_avx2(auVar94,auVar4);
  auVar14._8_4_ = 0x9b05688c;
  auVar14._0_8_ = 0x9b05688c9b05688c;
  auVar14._12_4_ = 0x9b05688c;
  auVar14._16_4_ = 0x9b05688c;
  auVar14._20_4_ = 0x9b05688c;
  auVar14._24_4_ = 0x9b05688c;
  auVar14._28_4_ = 0x9b05688c;
  auVar3 = vpaddd_avx2(auVar8,auVar3 ^ auVar14);
  auVar3 = vpaddd_avx2(auVar3,auVar12 ^ auVar11 ^ auVar13);
  local_738._8_4_ = 0x90bb1e3c;
  local_738._0_8_ = 0x90bb1e3c90bb1e3c;
  local_738._12_4_ = 0x90bb1e3c;
  local_738._16_4_ = 0x90bb1e3c;
  local_738._20_4_ = 0x90bb1e3c;
  local_738._24_4_ = 0x90bb1e3c;
  local_738._28_4_ = 0x90bb1e3c;
  auVar11 = vpsrld_avx2(auVar70,2);
  auVar12 = vpslld_avx2(auVar70,0x1e);
  auVar12 = vpor_avx2(auVar12,auVar11);
  auVar11 = vpsrld_avx2(auVar70,0xd);
  auVar13 = vpslld_avx2(auVar70,0x13);
  auVar13 = vpor_avx2(auVar13,auVar11);
  auVar11 = vpsrld_avx2(auVar70,0x16);
  auVar34 = vpslld_avx2(auVar70,10);
  auVar34 = vpor_avx2(auVar34,auVar11);
  auVar35._8_4_ = 0xd16e48e2;
  auVar35._0_8_ = 0xd16e48e2d16e48e2;
  auVar35._12_4_ = 0xd16e48e2;
  auVar35._16_4_ = 0xd16e48e2;
  auVar35._20_4_ = 0xd16e48e2;
  auVar35._24_4_ = 0xd16e48e2;
  auVar35._28_4_ = 0xd16e48e2;
  auVar11 = vpand_avx2(auVar70,auVar35);
  auVar11 = vpaddd_avx2(auVar13 ^ auVar12 ^ auVar34,auVar11);
  auVar11 = vpaddd_avx2(auVar3,auVar11);
  auVar36._8_4_ = 0xcd2a11ae;
  auVar36._0_8_ = 0xcd2a11aecd2a11ae;
  auVar36._12_4_ = 0xcd2a11ae;
  auVar36._16_4_ = 0xcd2a11ae;
  auVar36._20_4_ = 0xcd2a11ae;
  auVar36._24_4_ = 0xcd2a11ae;
  auVar36._28_4_ = 0xcd2a11ae;
  auVar3 = vpaddd_avx2(auVar3,auVar36);
  auVar151._8_4_ = 0xbabcc441;
  auVar151._0_8_ = 0xbabcc441babcc441;
  auVar151._12_4_ = 0xbabcc441;
  auVar151._16_4_ = 0xbabcc441;
  auVar151._20_4_ = 0xbabcc441;
  auVar151._24_4_ = 0xbabcc441;
  auVar151._28_4_ = 0xbabcc441;
  auVar11 = vpaddd_avx2(auVar11,auVar151);
  auVar141 = auVar11;
  anon_unknown_0::Read8((__m256i *)out,(uchar *)0x8,offset_00);
  auVar13 = vpsrld_avx2(auVar3,6);
  auVar12 = vpslld_avx2(auVar3,0x1a);
  auVar13 = vpor_avx2(auVar12,auVar13);
  auVar12 = vpsrld_avx2(auVar3,0xb);
  auVar34 = vpslld_avx2(auVar3,0x15);
  auVar34 = vpor_avx2(auVar34,auVar12);
  auVar12 = vpsrld_avx2(auVar3,0x19);
  auVar15 = vpslld_avx2(auVar3,7);
  auVar15 = vpor_avx2(auVar15,auVar12);
  auVar5._8_8_ = 0x510e527f510e527f;
  auVar5._0_8_ = 0x510e527f510e527f;
  auVar5._16_8_ = 0x510e527f510e527f;
  auVar5._24_8_ = 0x510e527f510e527f;
  auVar12 = vpand_avx2(auVar5 ^ auVar94,auVar3);
  auVar16._8_4_ = 0x510e527f;
  auVar16._0_8_ = 0x510e527f510e527f;
  auVar16._12_4_ = 0x510e527f;
  auVar16._16_4_ = 0x510e527f;
  auVar16._20_4_ = 0x510e527f;
  auVar16._24_4_ = 0x510e527f;
  auVar16._28_4_ = 0x510e527f;
  auVar68._8_4_ = 0x50c6645b;
  auVar68._0_8_ = 0x50c6645b50c6645b;
  auVar68._12_4_ = 0x50c6645b;
  auVar68._16_4_ = 0x50c6645b;
  auVar68._20_4_ = 0x50c6645b;
  auVar68._24_4_ = 0x50c6645b;
  auVar68._28_4_ = 0x50c6645b;
  auVar12 = vpaddd_avx2(auVar141,auVar12 ^ auVar16);
  auVar12 = vpaddd_avx2(auVar12,auVar34 ^ auVar13 ^ auVar15);
  auVar13 = vpsrld_avx2(auVar11,2);
  auVar34 = vpslld_avx2(auVar11,0x1e);
  auVar15 = vpor_avx2(auVar34,auVar13);
  auVar13 = vpsrld_avx2(auVar11,0xd);
  auVar34 = vpslld_avx2(auVar11,0x13);
  auVar18 = vpor_avx2(auVar34,auVar13);
  auVar13 = vpsrld_avx2(auVar11,0x16);
  auVar34 = vpslld_avx2(auVar11,10);
  auVar19 = vpor_avx2(auVar34,auVar13);
  auVar13 = vpand_avx2(auVar11,auVar70);
  auVar34 = vpor_avx2(auVar11,auVar70);
  auVar87._8_8_ = 0x6a09e6676a09e667;
  auVar87._0_8_ = 0x6a09e6676a09e667;
  auVar87._16_8_ = 0x6a09e6676a09e667;
  auVar87._24_8_ = 0x6a09e6676a09e667;
  auVar34 = vpand_avx2(auVar34,auVar87);
  auVar13 = vpor_avx2(auVar13,auVar34);
  auVar13 = vpaddd_avx2(auVar18 ^ auVar15 ^ auVar19,auVar13);
  auVar17._8_4_ = 0xc2e12e0;
  auVar17._0_8_ = 0xc2e12e00c2e12e0;
  auVar17._12_4_ = 0xc2e12e0;
  auVar17._16_4_ = 0xc2e12e0;
  auVar17._20_4_ = 0xc2e12e0;
  auVar17._24_4_ = 0xc2e12e0;
  auVar17._28_4_ = 0xc2e12e0;
  auVar34 = vpaddd_avx2(auVar12,auVar17);
  auVar12 = vpaddd_avx2(auVar12,auVar68);
  auVar12 = vpaddd_avx2(auVar12,auVar13);
  auVar142 = auVar12;
  anon_unknown_0::Read8((__m256i *)out,(uchar *)0xc,offset_01);
  auVar15 = vpsrld_avx2(auVar34,6);
  auVar13 = vpslld_avx2(auVar34,0x1a);
  auVar15 = vpor_avx2(auVar13,auVar15);
  auVar13 = vpsrld_avx2(auVar34,0xb);
  auVar18 = vpslld_avx2(auVar34,0x15);
  auVar18 = vpor_avx2(auVar18,auVar13);
  auVar13 = vpsrld_avx2(auVar34,0x19);
  auVar19 = vpslld_avx2(auVar34,7);
  auVar19 = vpor_avx2(auVar19,auVar13);
  auVar13 = vpandn_avx2(auVar34,auVar94);
  auVar94 = vpand_avx2(auVar34,auVar3);
  auVar94 = vpor_avx2(auVar94,auVar13);
  auVar69._8_4_ = 0x3ac42e24;
  auVar69._0_8_ = 0x3ac42e243ac42e24;
  auVar69._12_4_ = 0x3ac42e24;
  auVar69._16_4_ = 0x3ac42e24;
  auVar69._20_4_ = 0x3ac42e24;
  auVar69._24_4_ = 0x3ac42e24;
  auVar69._28_4_ = 0x3ac42e24;
  auVar94 = vpaddd_avx2(auVar142,auVar94);
  auVar94 = vpaddd_avx2(auVar94,auVar18 ^ auVar15 ^ auVar19);
  auVar13 = vpsrld_avx2(auVar12,2);
  auVar15 = vpslld_avx2(auVar12,0x1e);
  auVar13 = vpor_avx2(auVar15,auVar13);
  auVar15 = vpsrld_avx2(auVar12,0xd);
  auVar18 = vpslld_avx2(auVar12,0x13);
  auVar15 = vpor_avx2(auVar18,auVar15);
  auVar18 = vpsrld_avx2(auVar12,0x16);
  auVar19 = vpslld_avx2(auVar12,10);
  auVar18 = vpor_avx2(auVar19,auVar18);
  auVar13 = vpaddd_avx2(auVar94,auVar15 ^ auVar13 ^ auVar18);
  auVar15 = vpand_avx2(auVar12,auVar11);
  auVar18 = vpor_avx2(auVar12,auVar11);
  auVar18 = vpand_avx2(auVar18,auVar70);
  auVar15 = vpor_avx2(auVar18,auVar15);
  auVar37._8_4_ = 0xa4ce148b;
  auVar37._0_8_ = 0xa4ce148ba4ce148b;
  auVar37._12_4_ = 0xa4ce148b;
  auVar37._16_4_ = 0xa4ce148b;
  auVar37._20_4_ = 0xa4ce148b;
  auVar37._24_4_ = 0xa4ce148b;
  auVar37._28_4_ = 0xa4ce148b;
  auVar94 = vpaddd_avx2(auVar94,auVar37);
  auVar15 = vpaddd_avx2(auVar15,auVar69);
  auVar13 = vpaddd_avx2(auVar13,auVar15);
  auVar143 = auVar13;
  anon_unknown_0::Read8((__m256i *)out,(uchar *)0x10,offset_02);
  auVar18 = vpsrld_avx2(auVar94,6);
  auVar15 = vpslld_avx2(auVar94,0x1a);
  auVar19 = vpor_avx2(auVar15,auVar18);
  auVar15 = vpsrld_avx2(auVar94,0xb);
  auVar18 = vpslld_avx2(auVar94,0x15);
  auVar20 = vpor_avx2(auVar18,auVar15);
  auVar15 = vpsrld_avx2(auVar94,0x19);
  auVar18 = vpslld_avx2(auVar94,7);
  auVar38 = vpor_avx2(auVar18,auVar15);
  auVar18 = vpandn_avx2(auVar94,auVar3);
  auVar15 = vpand_avx2(auVar94,auVar34);
  auVar18 = vpor_avx2(auVar15,auVar18);
  auVar15 = vpaddd_avx2(auVar143,auVar42);
  auVar15 = vpaddd_avx2(auVar15,auVar18);
  auVar18._8_4_ = 0xd21ea4fd;
  auVar18._0_8_ = 0xd21ea4fdd21ea4fd;
  auVar18._12_4_ = 0xd21ea4fd;
  auVar18._16_4_ = 0xd21ea4fd;
  auVar18._20_4_ = 0xd21ea4fd;
  auVar18._24_4_ = 0xd21ea4fd;
  auVar18._28_4_ = 0xd21ea4fd;
  auVar15 = vpaddd_avx2(auVar15,auVar18);
  auVar15 = vpaddd_avx2(auVar15,auVar20 ^ auVar19 ^ auVar38);
  auVar18 = vpsrld_avx2(auVar13,2);
  auVar19 = vpslld_avx2(auVar13,0x1e);
  auVar20 = vpor_avx2(auVar19,auVar18);
  auVar18 = vpsrld_avx2(auVar13,0xd);
  auVar19 = vpslld_avx2(auVar13,0x13);
  auVar38 = vpor_avx2(auVar19,auVar18);
  auVar18 = vpsrld_avx2(auVar13,0x16);
  auVar19 = vpslld_avx2(auVar13,10);
  auVar39 = vpor_avx2(auVar19,auVar18);
  auVar18 = vpand_avx2(auVar13,auVar12);
  auVar19 = vpor_avx2(auVar13,auVar12);
  auVar19 = vpand_avx2(auVar19,auVar11);
  auVar19 = vpor_avx2(auVar19,auVar18);
  auVar18 = vpaddd_avx2(auVar15,auVar70);
  auVar15 = vpaddd_avx2(auVar15,auVar38 ^ auVar20 ^ auVar39);
  auVar15 = vpaddd_avx2(auVar15,auVar19);
  auVar95 = auVar15;
  anon_unknown_0::Read8((__m256i *)out,(uchar *)0x14,offset_03);
  auVar20 = vpsrld_avx2(auVar18,6);
  auVar19 = vpslld_avx2(auVar18,0x1a);
  auVar38 = vpor_avx2(auVar19,auVar20);
  auVar19 = vpsrld_avx2(auVar18,0xb);
  auVar20 = vpslld_avx2(auVar18,0x15);
  auVar39 = vpor_avx2(auVar20,auVar19);
  auVar19 = vpsrld_avx2(auVar18,0x19);
  auVar20 = vpslld_avx2(auVar18,7);
  auVar70 = vpor_avx2(auVar20,auVar19);
  auVar20 = vpandn_avx2(auVar18,auVar34);
  auVar19 = vpand_avx2(auVar18,auVar94);
  auVar19 = vpor_avx2(auVar19,auVar20);
  auVar3 = vpaddd_avx2(auVar95,auVar3);
  auVar3 = vpaddd_avx2(auVar3,auVar19);
  auVar21._8_4_ = 0x59f111f1;
  auVar21._0_8_ = 0x59f111f159f111f1;
  auVar21._12_4_ = 0x59f111f1;
  auVar21._16_4_ = 0x59f111f1;
  auVar21._20_4_ = 0x59f111f1;
  auVar21._24_4_ = 0x59f111f1;
  auVar21._28_4_ = 0x59f111f1;
  auVar3 = vpaddd_avx2(auVar3,auVar21);
  auVar3 = vpaddd_avx2(auVar3,auVar39 ^ auVar38 ^ auVar70);
  auVar19 = vpsrld_avx2(auVar15,2);
  auVar20 = vpslld_avx2(auVar15,0x1e);
  auVar38 = vpor_avx2(auVar20,auVar19);
  auVar19 = vpsrld_avx2(auVar15,0xd);
  auVar20 = vpslld_avx2(auVar15,0x13);
  auVar39 = vpor_avx2(auVar20,auVar19);
  auVar19 = vpsrld_avx2(auVar15,0x16);
  auVar20 = vpslld_avx2(auVar15,10);
  auVar70 = vpor_avx2(auVar20,auVar19);
  auVar19 = vpand_avx2(auVar15,auVar13);
  auVar20 = vpor_avx2(auVar15,auVar13);
  auVar20 = vpand_avx2(auVar20,auVar12);
  auVar19 = vpor_avx2(auVar20,auVar19);
  auVar11 = vpaddd_avx2(auVar3,auVar11);
  auVar3 = vpaddd_avx2(auVar39 ^ auVar38 ^ auVar70,auVar3);
  auVar3 = vpaddd_avx2(auVar3,auVar19);
  auVar72 = auVar3;
  anon_unknown_0::Read8((__m256i *)out,(uchar *)0x18,offset_04);
  auVar20 = vpsrld_avx2(auVar11,6);
  auVar19 = vpslld_avx2(auVar11,0x1a);
  auVar38 = vpor_avx2(auVar19,auVar20);
  auVar19 = vpsrld_avx2(auVar11,0xb);
  auVar20 = vpslld_avx2(auVar11,0x15);
  auVar39 = vpor_avx2(auVar20,auVar19);
  auVar19 = vpsrld_avx2(auVar11,0x19);
  auVar20 = vpslld_avx2(auVar11,7);
  auVar70 = vpor_avx2(auVar20,auVar19);
  auVar20 = vpandn_avx2(auVar11,auVar94);
  auVar19 = vpand_avx2(auVar11,auVar18);
  auVar19 = vpor_avx2(auVar19,auVar20);
  auVar34 = vpaddd_avx2(auVar72,auVar34);
  auVar34 = vpaddd_avx2(auVar34,auVar19);
  auVar22._8_4_ = 0x923f82a4;
  auVar22._0_8_ = 0x923f82a4923f82a4;
  auVar22._12_4_ = 0x923f82a4;
  auVar22._16_4_ = 0x923f82a4;
  auVar22._20_4_ = 0x923f82a4;
  auVar22._24_4_ = 0x923f82a4;
  auVar22._28_4_ = 0x923f82a4;
  auVar34 = vpaddd_avx2(auVar34,auVar22);
  auVar34 = vpaddd_avx2(auVar34,auVar39 ^ auVar38 ^ auVar70);
  auVar19 = vpsrld_avx2(auVar3,2);
  auVar20 = vpslld_avx2(auVar3,0x1e);
  auVar38 = vpor_avx2(auVar20,auVar19);
  auVar19 = vpsrld_avx2(auVar3,0xd);
  auVar20 = vpslld_avx2(auVar3,0x13);
  auVar39 = vpor_avx2(auVar20,auVar19);
  auVar19 = vpsrld_avx2(auVar3,0x16);
  auVar20 = vpslld_avx2(auVar3,10);
  auVar70 = vpor_avx2(auVar20,auVar19);
  auVar19 = vpand_avx2(auVar3,auVar15);
  auVar20 = vpor_avx2(auVar3,auVar15);
  auVar20 = vpand_avx2(auVar20,auVar13);
  auVar19 = vpor_avx2(auVar20,auVar19);
  auVar12 = vpaddd_avx2(auVar34,auVar12);
  auVar34 = vpaddd_avx2(auVar39 ^ auVar38 ^ auVar70,auVar34);
  auVar34 = vpaddd_avx2(auVar34,auVar19);
  auVar74 = auVar34;
  anon_unknown_0::Read8((__m256i *)out,(uchar *)0x1c,offset_05);
  auVar20 = vpsrld_avx2(auVar12,6);
  auVar19 = vpslld_avx2(auVar12,0x1a);
  auVar38 = vpor_avx2(auVar19,auVar20);
  auVar19 = vpsrld_avx2(auVar12,0xb);
  auVar20 = vpslld_avx2(auVar12,0x15);
  auVar39 = vpor_avx2(auVar20,auVar19);
  auVar19 = vpsrld_avx2(auVar12,0x19);
  auVar20 = vpslld_avx2(auVar12,7);
  auVar70 = vpor_avx2(auVar20,auVar19);
  auVar20 = vpandn_avx2(auVar12,auVar18);
  auVar19 = vpand_avx2(auVar12,auVar11);
  auVar19 = vpor_avx2(auVar19,auVar20);
  auVar94 = vpaddd_avx2(auVar74,auVar94);
  auVar94 = vpaddd_avx2(auVar94,auVar19);
  auVar23._8_4_ = 0xab1c5ed5;
  auVar23._0_8_ = 0xab1c5ed5ab1c5ed5;
  auVar23._12_4_ = 0xab1c5ed5;
  auVar23._16_4_ = 0xab1c5ed5;
  auVar23._20_4_ = 0xab1c5ed5;
  auVar23._24_4_ = 0xab1c5ed5;
  auVar23._28_4_ = 0xab1c5ed5;
  auVar94 = vpaddd_avx2(auVar94,auVar23);
  auVar94 = vpaddd_avx2(auVar94,auVar39 ^ auVar38 ^ auVar70);
  auVar19 = vpsrld_avx2(auVar34,2);
  auVar20 = vpslld_avx2(auVar34,0x1e);
  auVar38 = vpor_avx2(auVar20,auVar19);
  auVar19 = vpsrld_avx2(auVar34,0xd);
  auVar20 = vpslld_avx2(auVar34,0x13);
  auVar39 = vpor_avx2(auVar20,auVar19);
  auVar19 = vpsrld_avx2(auVar34,0x16);
  auVar20 = vpslld_avx2(auVar34,10);
  auVar70 = vpor_avx2(auVar20,auVar19);
  auVar19 = vpand_avx2(auVar34,auVar3);
  auVar20 = vpor_avx2(auVar34,auVar3);
  auVar20 = vpand_avx2(auVar20,auVar15);
  auVar19 = vpor_avx2(auVar20,auVar19);
  auVar13 = vpaddd_avx2(auVar94,auVar13);
  auVar94 = vpaddd_avx2(auVar39 ^ auVar38 ^ auVar70,auVar94);
  auVar94 = vpaddd_avx2(auVar94,auVar19);
  auVar6 = auVar94;
  anon_unknown_0::Read8((__m256i *)out,(uchar *)0x20,offset_06);
  auVar20 = vpsrld_avx2(auVar13,6);
  auVar19 = vpslld_avx2(auVar13,0x1a);
  auVar38 = vpor_avx2(auVar19,auVar20);
  auVar19 = vpsrld_avx2(auVar13,0xb);
  auVar20 = vpslld_avx2(auVar13,0x15);
  auVar39 = vpor_avx2(auVar20,auVar19);
  auVar19 = vpsrld_avx2(auVar13,0x19);
  auVar20 = vpslld_avx2(auVar13,7);
  auVar70 = vpor_avx2(auVar20,auVar19);
  auVar20 = vpandn_avx2(auVar13,auVar11);
  auVar19 = vpand_avx2(auVar13,auVar12);
  auVar19 = vpor_avx2(auVar19,auVar20);
  auVar18 = vpaddd_avx2(auVar6,auVar18);
  auVar18 = vpaddd_avx2(auVar18,auVar19);
  auVar24._8_4_ = 0xd807aa98;
  auVar24._0_8_ = 0xd807aa98d807aa98;
  auVar24._12_4_ = 0xd807aa98;
  auVar24._16_4_ = 0xd807aa98;
  auVar24._20_4_ = 0xd807aa98;
  auVar24._24_4_ = 0xd807aa98;
  auVar24._28_4_ = 0xd807aa98;
  auVar18 = vpaddd_avx2(auVar18,auVar24);
  auVar18 = vpaddd_avx2(auVar18,auVar39 ^ auVar38 ^ auVar70);
  auVar19 = vpsrld_avx2(auVar94,2);
  auVar20 = vpslld_avx2(auVar94,0x1e);
  auVar38 = vpor_avx2(auVar20,auVar19);
  auVar19 = vpsrld_avx2(auVar94,0xd);
  auVar20 = vpslld_avx2(auVar94,0x13);
  auVar39 = vpor_avx2(auVar20,auVar19);
  auVar19 = vpsrld_avx2(auVar94,0x16);
  auVar20 = vpslld_avx2(auVar94,10);
  auVar70 = vpor_avx2(auVar20,auVar19);
  auVar19 = vpand_avx2(auVar94,auVar34);
  auVar20 = vpor_avx2(auVar94,auVar34);
  auVar20 = vpand_avx2(auVar20,auVar3);
  auVar19 = vpor_avx2(auVar20,auVar19);
  auVar15 = vpaddd_avx2(auVar18,auVar15);
  auVar18 = vpaddd_avx2(auVar39 ^ auVar38 ^ auVar70,auVar18);
  auVar18 = vpaddd_avx2(auVar18,auVar19);
  auVar7 = auVar18;
  anon_unknown_0::Read8((__m256i *)out,(uchar *)0x24,offset_07);
  auVar20 = vpsrld_avx2(auVar15,6);
  auVar19 = vpslld_avx2(auVar15,0x1a);
  auVar38 = vpor_avx2(auVar19,auVar20);
  auVar19 = vpsrld_avx2(auVar15,0xb);
  auVar20 = vpslld_avx2(auVar15,0x15);
  auVar39 = vpor_avx2(auVar20,auVar19);
  auVar19 = vpsrld_avx2(auVar15,0x19);
  auVar20 = vpslld_avx2(auVar15,7);
  auVar70 = vpor_avx2(auVar20,auVar19);
  auVar20 = vpandn_avx2(auVar15,auVar12);
  auVar19 = vpand_avx2(auVar15,auVar13);
  auVar19 = vpor_avx2(auVar19,auVar20);
  auVar11 = vpaddd_avx2(auVar7,auVar11);
  auVar11 = vpaddd_avx2(auVar11,auVar19);
  auVar25._8_4_ = 0x12835b01;
  auVar25._0_8_ = 0x12835b0112835b01;
  auVar25._12_4_ = 0x12835b01;
  auVar25._16_4_ = 0x12835b01;
  auVar25._20_4_ = 0x12835b01;
  auVar25._24_4_ = 0x12835b01;
  auVar25._28_4_ = 0x12835b01;
  auVar11 = vpaddd_avx2(auVar11,auVar25);
  auVar11 = vpaddd_avx2(auVar11,auVar39 ^ auVar38 ^ auVar70);
  auVar19 = vpsrld_avx2(auVar18,2);
  auVar20 = vpslld_avx2(auVar18,0x1e);
  auVar38 = vpor_avx2(auVar20,auVar19);
  auVar19 = vpsrld_avx2(auVar18,0xd);
  auVar20 = vpslld_avx2(auVar18,0x13);
  auVar39 = vpor_avx2(auVar20,auVar19);
  auVar19 = vpsrld_avx2(auVar18,0x16);
  auVar20 = vpslld_avx2(auVar18,10);
  auVar70 = vpor_avx2(auVar20,auVar19);
  auVar19 = vpand_avx2(auVar18,auVar94);
  auVar20 = vpor_avx2(auVar18,auVar94);
  auVar20 = vpand_avx2(auVar20,auVar34);
  auVar19 = vpor_avx2(auVar20,auVar19);
  auVar3 = vpaddd_avx2(auVar11,auVar3);
  auVar11 = vpaddd_avx2(auVar39 ^ auVar38 ^ auVar70,auVar11);
  auVar11 = vpaddd_avx2(auVar11,auVar19);
  auVar33 = auVar11;
  anon_unknown_0::Read8((__m256i *)out,&DAT_00000028,offset_08);
  auVar20 = vpsrld_avx2(auVar3,6);
  auVar19 = vpslld_avx2(auVar3,0x1a);
  auVar38 = vpor_avx2(auVar19,auVar20);
  auVar19 = vpsrld_avx2(auVar3,0xb);
  auVar20 = vpslld_avx2(auVar3,0x15);
  auVar39 = vpor_avx2(auVar20,auVar19);
  auVar19 = vpsrld_avx2(auVar3,0x19);
  auVar20 = vpslld_avx2(auVar3,7);
  auVar70 = vpor_avx2(auVar20,auVar19);
  auVar20 = vpandn_avx2(auVar3,auVar13);
  auVar19 = vpand_avx2(auVar3,auVar15);
  auVar19 = vpor_avx2(auVar19,auVar20);
  auVar12 = vpaddd_avx2(auVar33,auVar12);
  auVar12 = vpaddd_avx2(auVar12,auVar19);
  auVar26._8_4_ = 0x243185be;
  auVar26._0_8_ = 0x243185be243185be;
  auVar26._12_4_ = 0x243185be;
  auVar26._16_4_ = 0x243185be;
  auVar26._20_4_ = 0x243185be;
  auVar26._24_4_ = 0x243185be;
  auVar26._28_4_ = 0x243185be;
  auVar12 = vpaddd_avx2(auVar12,auVar26);
  auVar12 = vpaddd_avx2(auVar12,auVar39 ^ auVar38 ^ auVar70);
  auVar19 = vpsrld_avx2(auVar11,2);
  auVar20 = vpslld_avx2(auVar11,0x1e);
  auVar38 = vpor_avx2(auVar20,auVar19);
  auVar19 = vpsrld_avx2(auVar11,0xd);
  auVar20 = vpslld_avx2(auVar11,0x13);
  auVar39 = vpor_avx2(auVar20,auVar19);
  auVar19 = vpsrld_avx2(auVar11,0x16);
  auVar20 = vpslld_avx2(auVar11,10);
  auVar70 = vpor_avx2(auVar20,auVar19);
  auVar19 = vpand_avx2(auVar11,auVar18);
  auVar20 = vpor_avx2(auVar11,auVar18);
  auVar20 = vpand_avx2(auVar20,auVar94);
  auVar19 = vpor_avx2(auVar20,auVar19);
  auVar34 = vpaddd_avx2(auVar12,auVar34);
  auVar12 = vpaddd_avx2(auVar39 ^ auVar38 ^ auVar70,auVar12);
  auVar12 = vpaddd_avx2(auVar12,auVar19);
  auVar44 = auVar12;
  anon_unknown_0::Read8((__m256i *)out,(uchar *)0x2c,offset_09);
  auVar20 = vpsrld_avx2(auVar34,6);
  auVar19 = vpslld_avx2(auVar34,0x1a);
  auVar38 = vpor_avx2(auVar19,auVar20);
  auVar19 = vpsrld_avx2(auVar34,0xb);
  auVar20 = vpslld_avx2(auVar34,0x15);
  auVar39 = vpor_avx2(auVar20,auVar19);
  auVar19 = vpsrld_avx2(auVar34,0x19);
  auVar20 = vpslld_avx2(auVar34,7);
  auVar70 = vpor_avx2(auVar20,auVar19);
  auVar20 = vpandn_avx2(auVar34,auVar15);
  auVar19 = vpand_avx2(auVar34,auVar3);
  auVar19 = vpor_avx2(auVar19,auVar20);
  auVar13 = vpaddd_avx2(auVar44,auVar13);
  auVar13 = vpaddd_avx2(auVar13,auVar19);
  auVar27._8_4_ = 0x550c7dc3;
  auVar27._0_8_ = 0x550c7dc3550c7dc3;
  auVar27._12_4_ = 0x550c7dc3;
  auVar27._16_4_ = 0x550c7dc3;
  auVar27._20_4_ = 0x550c7dc3;
  auVar27._24_4_ = 0x550c7dc3;
  auVar27._28_4_ = 0x550c7dc3;
  auVar13 = vpaddd_avx2(auVar13,auVar27);
  auVar13 = vpaddd_avx2(auVar13,auVar39 ^ auVar38 ^ auVar70);
  auVar19 = vpsrld_avx2(auVar12,2);
  auVar20 = vpslld_avx2(auVar12,0x1e);
  auVar38 = vpor_avx2(auVar20,auVar19);
  auVar19 = vpsrld_avx2(auVar12,0xd);
  auVar20 = vpslld_avx2(auVar12,0x13);
  auVar39 = vpor_avx2(auVar20,auVar19);
  auVar19 = vpsrld_avx2(auVar12,0x16);
  auVar20 = vpslld_avx2(auVar12,10);
  auVar70 = vpor_avx2(auVar20,auVar19);
  auVar19 = vpand_avx2(auVar12,auVar11);
  auVar20 = vpor_avx2(auVar12,auVar11);
  auVar20 = vpand_avx2(auVar20,auVar18);
  auVar19 = vpor_avx2(auVar20,auVar19);
  auVar94 = vpaddd_avx2(auVar13,auVar94);
  auVar13 = vpaddd_avx2(auVar39 ^ auVar38 ^ auVar70,auVar13);
  auVar13 = vpaddd_avx2(auVar13,auVar19);
  auVar100 = auVar13;
  anon_unknown_0::Read8((__m256i *)out,(uchar *)0x30,offset_10);
  auVar20 = vpsrld_avx2(auVar94,6);
  auVar19 = vpslld_avx2(auVar94,0x1a);
  auVar38 = vpor_avx2(auVar19,auVar20);
  auVar19 = vpsrld_avx2(auVar94,0xb);
  auVar20 = vpslld_avx2(auVar94,0x15);
  auVar39 = vpor_avx2(auVar20,auVar19);
  auVar19 = vpsrld_avx2(auVar94,0x19);
  auVar20 = vpslld_avx2(auVar94,7);
  auVar70 = vpor_avx2(auVar20,auVar19);
  auVar20 = vpandn_avx2(auVar94,auVar3);
  auVar19 = vpand_avx2(auVar94,auVar34);
  auVar19 = vpor_avx2(auVar19,auVar20);
  auVar15 = vpaddd_avx2(auVar100,auVar15);
  auVar15 = vpaddd_avx2(auVar15,auVar19);
  auVar28._8_4_ = 0x72be5d74;
  auVar28._0_8_ = 0x72be5d7472be5d74;
  auVar28._12_4_ = 0x72be5d74;
  auVar28._16_4_ = 0x72be5d74;
  auVar28._20_4_ = 0x72be5d74;
  auVar28._24_4_ = 0x72be5d74;
  auVar28._28_4_ = 0x72be5d74;
  auVar15 = vpaddd_avx2(auVar15,auVar28);
  auVar15 = vpaddd_avx2(auVar15,auVar39 ^ auVar38 ^ auVar70);
  auVar19 = vpsrld_avx2(auVar13,2);
  auVar20 = vpslld_avx2(auVar13,0x1e);
  auVar38 = vpor_avx2(auVar20,auVar19);
  auVar19 = vpsrld_avx2(auVar13,0xd);
  auVar20 = vpslld_avx2(auVar13,0x13);
  auVar39 = vpor_avx2(auVar20,auVar19);
  auVar19 = vpsrld_avx2(auVar13,0x16);
  auVar20 = vpslld_avx2(auVar13,10);
  auVar70 = vpor_avx2(auVar20,auVar19);
  auVar19 = vpand_avx2(auVar13,auVar12);
  auVar20 = vpor_avx2(auVar13,auVar12);
  auVar20 = vpand_avx2(auVar20,auVar11);
  auVar19 = vpor_avx2(auVar20,auVar19);
  auVar18 = vpaddd_avx2(auVar15,auVar18);
  auVar15 = vpaddd_avx2(auVar39 ^ auVar38 ^ auVar70,auVar15);
  auVar15 = vpaddd_avx2(auVar15,auVar19);
  auVar107 = auVar15;
  anon_unknown_0::Read8((__m256i *)out,(uchar *)0x34,offset_11);
  auVar20 = vpsrld_avx2(auVar18,6);
  auVar19 = vpslld_avx2(auVar18,0x1a);
  auVar38 = vpor_avx2(auVar19,auVar20);
  auVar19 = vpsrld_avx2(auVar18,0xb);
  auVar20 = vpslld_avx2(auVar18,0x15);
  auVar39 = vpor_avx2(auVar20,auVar19);
  auVar19 = vpsrld_avx2(auVar18,0x19);
  auVar20 = vpslld_avx2(auVar18,7);
  auVar70 = vpor_avx2(auVar20,auVar19);
  auVar20 = vpandn_avx2(auVar18,auVar34);
  auVar19 = vpand_avx2(auVar18,auVar94);
  auVar19 = vpor_avx2(auVar19,auVar20);
  auVar3 = vpaddd_avx2(auVar107,auVar3);
  auVar3 = vpaddd_avx2(auVar3,auVar19);
  auVar29._8_4_ = 0x80deb1fe;
  auVar29._0_8_ = 0x80deb1fe80deb1fe;
  auVar29._12_4_ = 0x80deb1fe;
  auVar29._16_4_ = 0x80deb1fe;
  auVar29._20_4_ = 0x80deb1fe;
  auVar29._24_4_ = 0x80deb1fe;
  auVar29._28_4_ = 0x80deb1fe;
  auVar3 = vpaddd_avx2(auVar3,auVar29);
  auVar3 = vpaddd_avx2(auVar3,auVar39 ^ auVar38 ^ auVar70);
  auVar19 = vpsrld_avx2(auVar15,2);
  auVar20 = vpslld_avx2(auVar15,0x1e);
  auVar38 = vpor_avx2(auVar20,auVar19);
  auVar19 = vpsrld_avx2(auVar15,0xd);
  auVar20 = vpslld_avx2(auVar15,0x13);
  auVar39 = vpor_avx2(auVar20,auVar19);
  auVar19 = vpsrld_avx2(auVar15,0x16);
  auVar20 = vpslld_avx2(auVar15,10);
  auVar70 = vpor_avx2(auVar20,auVar19);
  auVar19 = vpand_avx2(auVar15,auVar13);
  auVar20 = vpor_avx2(auVar15,auVar13);
  auVar20 = vpand_avx2(auVar20,auVar12);
  auVar19 = vpor_avx2(auVar20,auVar19);
  auVar11 = vpaddd_avx2(auVar3,auVar11);
  auVar3 = vpaddd_avx2(auVar39 ^ auVar38 ^ auVar70,auVar3);
  auVar3 = vpaddd_avx2(auVar3,auVar19);
  auVar108 = auVar3;
  anon_unknown_0::Read8((__m256i *)out,(uchar *)0x38,offset_12);
  auVar20 = vpsrld_avx2(auVar11,6);
  auVar19 = vpslld_avx2(auVar11,0x1a);
  auVar38 = vpor_avx2(auVar19,auVar20);
  auVar19 = vpsrld_avx2(auVar11,0xb);
  auVar20 = vpslld_avx2(auVar11,0x15);
  auVar39 = vpor_avx2(auVar20,auVar19);
  auVar19 = vpsrld_avx2(auVar11,0x19);
  auVar20 = vpslld_avx2(auVar11,7);
  auVar70 = vpor_avx2(auVar20,auVar19);
  auVar20 = vpandn_avx2(auVar11,auVar94);
  auVar19 = vpand_avx2(auVar11,auVar18);
  auVar19 = vpor_avx2(auVar19,auVar20);
  auVar34 = vpaddd_avx2(auVar108,auVar34);
  auVar34 = vpaddd_avx2(auVar34,auVar19);
  auVar30._8_4_ = 0x9bdc06a7;
  auVar30._0_8_ = 0x9bdc06a79bdc06a7;
  auVar30._12_4_ = 0x9bdc06a7;
  auVar30._16_4_ = 0x9bdc06a7;
  auVar30._20_4_ = 0x9bdc06a7;
  auVar30._24_4_ = 0x9bdc06a7;
  auVar30._28_4_ = 0x9bdc06a7;
  auVar34 = vpaddd_avx2(auVar34,auVar30);
  auVar34 = vpaddd_avx2(auVar34,auVar39 ^ auVar38 ^ auVar70);
  auVar19 = vpsrld_avx2(auVar3,2);
  auVar20 = vpslld_avx2(auVar3,0x1e);
  auVar38 = vpor_avx2(auVar20,auVar19);
  auVar19 = vpsrld_avx2(auVar3,0xd);
  auVar20 = vpslld_avx2(auVar3,0x13);
  auVar39 = vpor_avx2(auVar20,auVar19);
  auVar19 = vpsrld_avx2(auVar3,0x16);
  auVar20 = vpslld_avx2(auVar3,10);
  auVar70 = vpor_avx2(auVar20,auVar19);
  auVar19 = vpand_avx2(auVar3,auVar15);
  auVar20 = vpor_avx2(auVar3,auVar15);
  auVar20 = vpand_avx2(auVar20,auVar13);
  auVar19 = vpor_avx2(auVar20,auVar19);
  auVar12 = vpaddd_avx2(auVar34,auVar12);
  auVar34 = vpaddd_avx2(auVar39 ^ auVar38 ^ auVar70,auVar34);
  auVar34 = vpaddd_avx2(auVar34,auVar19);
  auVar110 = auVar34;
  anon_unknown_0::Read8((__m256i *)out,(uchar *)0x3c,offset_13);
  auVar19 = vpsrld_avx2(auVar12,6);
  auVar20 = vpslld_avx2(auVar12,0x1a);
  auVar38 = vpor_avx2(auVar20,auVar19);
  auVar19 = vpsrld_avx2(auVar12,0xb);
  auVar20 = vpslld_avx2(auVar12,0x15);
  auVar39 = vpor_avx2(auVar20,auVar19);
  auVar19 = vpsrld_avx2(auVar12,0x19);
  auVar20 = vpslld_avx2(auVar12,7);
  auVar70 = vpor_avx2(auVar20,auVar19);
  auVar20 = vpandn_avx2(auVar12,auVar18);
  auVar19 = vpand_avx2(auVar11,auVar12);
  auVar19 = vpor_avx2(auVar19,auVar20);
  auVar94 = vpaddd_avx2(auVar110,auVar94);
  auVar94 = vpaddd_avx2(auVar94,auVar19);
  auVar19._8_4_ = 0xc19bf174;
  auVar19._0_8_ = 0xc19bf174c19bf174;
  auVar19._12_4_ = 0xc19bf174;
  auVar19._16_4_ = 0xc19bf174;
  auVar19._20_4_ = 0xc19bf174;
  auVar19._24_4_ = 0xc19bf174;
  auVar19._28_4_ = 0xc19bf174;
  auVar94 = vpaddd_avx2(auVar94,auVar19);
  auVar94 = vpaddd_avx2(auVar94,auVar39 ^ auVar38 ^ auVar70);
  auVar19 = vpsrld_avx2(auVar34,2);
  auVar20 = vpslld_avx2(auVar34,0x1e);
  auVar38 = vpor_avx2(auVar20,auVar19);
  auVar19 = vpsrld_avx2(auVar34,0xd);
  auVar20 = vpslld_avx2(auVar34,0x13);
  auVar39 = vpor_avx2(auVar20,auVar19);
  auVar19 = vpsrld_avx2(auVar34,0x16);
  auVar20 = vpslld_avx2(auVar34,10);
  auVar70 = vpor_avx2(auVar20,auVar19);
  auVar19 = vpor_avx2(auVar34,auVar3);
  auVar19 = vpand_avx2(auVar15,auVar19);
  auVar20 = vpand_avx2(auVar34,auVar3);
  auVar19 = vpor_avx2(auVar19,auVar20);
  auVar13 = vpaddd_avx2(auVar94,auVar13);
  auVar94 = vpaddd_avx2(auVar39 ^ auVar38 ^ auVar70,auVar94);
  auVar94 = vpaddd_avx2(auVar94,auVar19);
  auVar19 = vpsrld_avx2(auVar108,0x11);
  auVar20 = vpslld_avx2(auVar108,0xf);
  auVar20 = vpor_avx2(auVar20,auVar19);
  auVar19 = vpsrld_avx2(auVar108,0x13);
  auVar38 = vpslld_avx2(auVar108,0xd);
  auVar38 = vpor_avx2(auVar38,auVar19);
  auVar31 = vpsrld_avx2(auVar108,10);
  auVar19 = vpsrld_avx2(auVar8,7);
  auVar39 = vpslld_avx2(auVar8,0x19);
  auVar39 = vpor_avx2(auVar39,auVar19);
  auVar19 = vpsrld_avx2(auVar8,0x12);
  auVar70 = vpslld_avx2(auVar8,0xe);
  auVar70 = vpor_avx2(auVar70,auVar19);
  auVar40 = vpsrld_avx2(auVar8,3);
  auVar19 = vpaddd_avx2(auVar42,auVar7);
  auVar19 = vpaddd_avx2(auVar70 ^ auVar39 ^ auVar40,auVar19);
  auVar19 = vpaddd_avx2(auVar19,auVar38 ^ auVar20 ^ auVar31);
  auVar20 = vpsrld_avx2(auVar13,6);
  auVar38 = vpslld_avx2(auVar13,0x1a);
  auVar39 = vpor_avx2(auVar38,auVar20);
  auVar20 = vpsrld_avx2(auVar13,0xb);
  auVar38 = vpslld_avx2(auVar13,0x15);
  auVar70 = vpor_avx2(auVar38,auVar20);
  auVar20 = vpsrld_avx2(auVar13,0x19);
  auVar38 = vpslld_avx2(auVar13,7);
  auVar42 = vpor_avx2(auVar38,auVar20);
  auVar38 = vpandn_avx2(auVar13,auVar11);
  auVar20 = vpand_avx2(auVar12,auVar13);
  auVar20 = vpor_avx2(auVar20,auVar38);
  auVar18 = vpaddd_avx2(auVar19,auVar18);
  auVar18 = vpaddd_avx2(auVar18,auVar20);
  auVar41._8_4_ = 0xe49b69c1;
  auVar41._0_8_ = 0xe49b69c1e49b69c1;
  auVar41._12_4_ = 0xe49b69c1;
  auVar41._16_4_ = 0xe49b69c1;
  auVar41._20_4_ = 0xe49b69c1;
  auVar41._24_4_ = 0xe49b69c1;
  auVar41._28_4_ = 0xe49b69c1;
  auVar18 = vpaddd_avx2(auVar18,auVar41);
  auVar18 = vpaddd_avx2(auVar18,auVar70 ^ auVar39 ^ auVar42);
  auVar20 = vpsrld_avx2(auVar94,2);
  auVar38 = vpslld_avx2(auVar94,0x1e);
  auVar39 = vpor_avx2(auVar38,auVar20);
  auVar20 = vpsrld_avx2(auVar94,0xd);
  auVar38 = vpslld_avx2(auVar94,0x13);
  auVar70 = vpor_avx2(auVar38,auVar20);
  auVar20 = vpsrld_avx2(auVar94,0x16);
  auVar38 = vpslld_avx2(auVar94,10);
  auVar42 = vpor_avx2(auVar38,auVar20);
  auVar20 = vpor_avx2(auVar34,auVar94);
  auVar20 = vpand_avx2(auVar3,auVar20);
  auVar38 = vpand_avx2(auVar34,auVar94);
  auVar20 = vpor_avx2(auVar20,auVar38);
  auVar15 = vpaddd_avx2(auVar15,auVar18);
  auVar18 = vpaddd_avx2(auVar70 ^ auVar39 ^ auVar42,auVar18);
  auVar18 = vpaddd_avx2(auVar18,auVar20);
  auVar20 = vpsrld_avx2(auVar110,0x11);
  auVar38 = vpslld_avx2(auVar110,0xf);
  auVar20 = vpor_avx2(auVar38,auVar20);
  auVar38 = vpsrld_avx2(auVar110,0x13);
  auVar39 = vpslld_avx2(auVar110,0xd);
  auVar38 = vpor_avx2(auVar39,auVar38);
  auVar42 = vpsrld_avx2(auVar110,10);
  auVar39 = vpsrld_avx2(auVar141,7);
  auVar70 = vpslld_avx2(auVar141,0x19);
  auVar39 = vpor_avx2(auVar70,auVar39);
  auVar70 = vpsrld_avx2(auVar141,0x12);
  auVar31 = vpslld_avx2(auVar141,0xe);
  auVar70 = vpor_avx2(auVar31,auVar70);
  auVar31 = vpsrld_avx2(auVar141,3);
  auVar8 = vpaddd_avx2(auVar8,auVar33);
  auVar8 = vpaddd_avx2(auVar70 ^ auVar39 ^ auVar31,auVar8);
  auVar8 = vpaddd_avx2(auVar8,auVar38 ^ auVar20 ^ auVar42);
  auVar20 = vpsrld_avx2(auVar15,6);
  auVar38 = vpslld_avx2(auVar15,0x1a);
  auVar39 = vpor_avx2(auVar38,auVar20);
  auVar20 = vpsrld_avx2(auVar15,0xb);
  auVar38 = vpslld_avx2(auVar15,0x15);
  auVar70 = vpor_avx2(auVar38,auVar20);
  auVar20 = vpsrld_avx2(auVar15,0x19);
  auVar38 = vpslld_avx2(auVar15,7);
  auVar42 = vpor_avx2(auVar38,auVar20);
  auVar38 = vpandn_avx2(auVar15,auVar12);
  auVar20 = vpand_avx2(auVar13,auVar15);
  auVar20 = vpor_avx2(auVar20,auVar38);
  auVar11 = vpaddd_avx2(auVar8,auVar11);
  auVar11 = vpaddd_avx2(auVar11,auVar20);
  auVar71._8_4_ = 0xefbe4786;
  auVar71._0_8_ = 0xefbe4786efbe4786;
  auVar71._12_4_ = 0xefbe4786;
  auVar71._16_4_ = 0xefbe4786;
  auVar71._20_4_ = 0xefbe4786;
  auVar71._24_4_ = 0xefbe4786;
  auVar71._28_4_ = 0xefbe4786;
  auVar11 = vpaddd_avx2(auVar11,auVar71);
  auVar11 = vpaddd_avx2(auVar11,auVar70 ^ auVar39 ^ auVar42);
  auVar20 = vpsrld_avx2(auVar18,2);
  auVar38 = vpslld_avx2(auVar18,0x1e);
  auVar39 = vpor_avx2(auVar38,auVar20);
  auVar20 = vpsrld_avx2(auVar18,0xd);
  auVar38 = vpslld_avx2(auVar18,0x13);
  auVar70 = vpor_avx2(auVar38,auVar20);
  auVar20 = vpsrld_avx2(auVar18,0x16);
  auVar38 = vpslld_avx2(auVar18,10);
  auVar42 = vpor_avx2(auVar38,auVar20);
  auVar20 = vpor_avx2(auVar18,auVar94);
  auVar20 = vpand_avx2(auVar34,auVar20);
  auVar38 = vpand_avx2(auVar18,auVar94);
  auVar20 = vpor_avx2(auVar20,auVar38);
  auVar3 = vpaddd_avx2(auVar3,auVar11);
  auVar11 = vpaddd_avx2(auVar70 ^ auVar39 ^ auVar42,auVar11);
  auVar11 = vpaddd_avx2(auVar11,auVar20);
  auVar20 = vpsrld_avx2(auVar19,0x11);
  auVar38 = vpslld_avx2(auVar19,0xf);
  auVar38 = vpor_avx2(auVar38,auVar20);
  auVar20 = vpsrld_avx2(auVar19,0x13);
  auVar39 = vpslld_avx2(auVar19,0xd);
  auVar39 = vpor_avx2(auVar39,auVar20);
  auVar31 = vpsrld_avx2(auVar19,10);
  auVar20 = vpsrld_avx2(auVar142,7);
  auVar70 = vpslld_avx2(auVar142,0x19);
  auVar70 = vpor_avx2(auVar70,auVar20);
  auVar20 = vpsrld_avx2(auVar142,0x12);
  auVar42 = vpslld_avx2(auVar142,0xe);
  auVar42 = vpor_avx2(auVar42,auVar20);
  auVar40 = vpsrld_avx2(auVar142,3);
  auVar20 = vpaddd_avx2(auVar141,auVar44);
  auVar20 = vpaddd_avx2(auVar20,auVar40 ^ auVar42 ^ auVar70);
  auVar20 = vpaddd_avx2(auVar20,auVar39 ^ auVar38 ^ auVar31);
  auVar38 = vpsrld_avx2(auVar3,6);
  auVar39 = vpslld_avx2(auVar3,0x1a);
  auVar70 = vpor_avx2(auVar39,auVar38);
  auVar38 = vpsrld_avx2(auVar3,0xb);
  auVar39 = vpslld_avx2(auVar3,0x15);
  auVar42 = vpor_avx2(auVar39,auVar38);
  auVar38 = vpsrld_avx2(auVar3,0x19);
  auVar39 = vpslld_avx2(auVar3,7);
  auVar141 = vpor_avx2(auVar39,auVar38);
  auVar39 = vpandn_avx2(auVar3,auVar13);
  auVar38 = vpand_avx2(auVar15,auVar3);
  auVar38 = vpor_avx2(auVar38,auVar39);
  auVar12 = vpaddd_avx2(auVar20,auVar12);
  auVar105._8_4_ = 0xfc19dc6;
  auVar105._0_8_ = 0xfc19dc60fc19dc6;
  auVar105._12_4_ = 0xfc19dc6;
  auVar105._16_4_ = 0xfc19dc6;
  auVar105._20_4_ = 0xfc19dc6;
  auVar105._24_4_ = 0xfc19dc6;
  auVar105._28_4_ = 0xfc19dc6;
  auVar12 = vpaddd_avx2(auVar12,auVar38);
  auVar12 = vpaddd_avx2(auVar105,auVar12);
  auVar12 = vpaddd_avx2(auVar12,auVar42 ^ auVar70 ^ auVar141);
  auVar38 = vpsrld_avx2(auVar11,2);
  auVar39 = vpslld_avx2(auVar11,0x1e);
  auVar70 = vpor_avx2(auVar39,auVar38);
  auVar38 = vpsrld_avx2(auVar11,0xd);
  auVar39 = vpslld_avx2(auVar11,0x13);
  auVar42 = vpor_avx2(auVar39,auVar38);
  auVar38 = vpsrld_avx2(auVar11,0x16);
  auVar39 = vpslld_avx2(auVar11,10);
  auVar141 = vpor_avx2(auVar39,auVar38);
  auVar38 = vpor_avx2(auVar11,auVar18);
  auVar38 = vpand_avx2(auVar38,auVar94);
  auVar39 = vpand_avx2(auVar11,auVar18);
  auVar38 = vpor_avx2(auVar39,auVar38);
  auVar34 = vpaddd_avx2(auVar34,auVar12);
  auVar12 = vpaddd_avx2(auVar141 ^ auVar42 ^ auVar70,auVar12);
  auVar12 = vpaddd_avx2(auVar38,auVar12);
  auVar38 = vpsrld_avx2(auVar8,0x11);
  auVar39 = vpslld_avx2(auVar8,0xf);
  auVar39 = vpor_avx2(auVar39,auVar38);
  auVar38 = vpsrld_avx2(auVar8,0x13);
  auVar70 = vpslld_avx2(auVar8,0xd);
  auVar70 = vpor_avx2(auVar70,auVar38);
  auVar31 = vpsrld_avx2(auVar8,10);
  auVar38 = vpsrld_avx2(auVar143,7);
  auVar42 = vpslld_avx2(auVar143,0x19);
  auVar42 = vpor_avx2(auVar42,auVar38);
  auVar38 = vpsrld_avx2(auVar143,0x12);
  auVar141 = vpslld_avx2(auVar143,0xe);
  auVar141 = vpor_avx2(auVar141,auVar38);
  auVar40 = vpsrld_avx2(auVar143,3);
  auVar38 = vpaddd_avx2(auVar142,auVar100);
  auVar38 = vpaddd_avx2(auVar141 ^ auVar42 ^ auVar40,auVar38);
  auVar38 = vpaddd_avx2(auVar38,auVar31 ^ auVar70 ^ auVar39);
  auVar39 = vpsrld_avx2(auVar34,6);
  auVar70 = vpslld_avx2(auVar34,0x1a);
  auVar42 = vpor_avx2(auVar70,auVar39);
  auVar39 = vpsrld_avx2(auVar34,0xb);
  auVar70 = vpslld_avx2(auVar34,0x15);
  auVar141 = vpor_avx2(auVar70,auVar39);
  auVar39 = vpsrld_avx2(auVar34,0x19);
  auVar70 = vpslld_avx2(auVar34,7);
  auVar142 = vpor_avx2(auVar70,auVar39);
  auVar70 = vpandn_avx2(auVar34,auVar15);
  auVar39 = vpand_avx2(auVar3,auVar34);
  auVar39 = vpor_avx2(auVar39,auVar70);
  auVar13 = vpaddd_avx2(auVar38,auVar13);
  auVar13 = vpaddd_avx2(auVar39,auVar13);
  auVar106._8_4_ = 0x240ca1cc;
  auVar106._0_8_ = 0x240ca1cc240ca1cc;
  auVar106._12_4_ = 0x240ca1cc;
  auVar106._16_4_ = 0x240ca1cc;
  auVar106._20_4_ = 0x240ca1cc;
  auVar106._24_4_ = 0x240ca1cc;
  auVar106._28_4_ = 0x240ca1cc;
  auVar13 = vpaddd_avx2(auVar106,auVar13);
  auVar13 = vpaddd_avx2(auVar13,auVar142 ^ auVar141 ^ auVar42);
  auVar39 = vpsrld_avx2(auVar12,2);
  auVar70 = vpslld_avx2(auVar12,0x1e);
  auVar42 = vpor_avx2(auVar70,auVar39);
  auVar39 = vpsrld_avx2(auVar12,0xd);
  auVar70 = vpslld_avx2(auVar12,0x13);
  auVar141 = vpor_avx2(auVar70,auVar39);
  auVar39 = vpsrld_avx2(auVar12,0x16);
  auVar70 = vpslld_avx2(auVar12,10);
  auVar142 = vpor_avx2(auVar70,auVar39);
  auVar39 = vpor_avx2(auVar12,auVar11);
  auVar39 = vpand_avx2(auVar39,auVar18);
  auVar70 = vpand_avx2(auVar12,auVar11);
  auVar39 = vpor_avx2(auVar70,auVar39);
  auVar94 = vpaddd_avx2(auVar13,auVar94);
  auVar13 = vpaddd_avx2(auVar142 ^ auVar141 ^ auVar42,auVar13);
  auVar13 = vpaddd_avx2(auVar39,auVar13);
  auVar39 = vpsrld_avx2(auVar20,0x11);
  auVar70 = vpslld_avx2(auVar20,0xf);
  auVar70 = vpor_avx2(auVar70,auVar39);
  auVar39 = vpsrld_avx2(auVar20,0x13);
  auVar42 = vpslld_avx2(auVar20,0xd);
  auVar42 = vpor_avx2(auVar42,auVar39);
  auVar31 = vpsrld_avx2(auVar20,10);
  auVar39 = vpsrld_avx2(auVar95,7);
  auVar141 = vpslld_avx2(auVar95,0x19);
  auVar141 = vpor_avx2(auVar141,auVar39);
  auVar39 = vpsrld_avx2(auVar95,0x12);
  auVar142 = vpslld_avx2(auVar95,0xe);
  auVar142 = vpor_avx2(auVar142,auVar39);
  auVar40 = vpsrld_avx2(auVar95,3);
  auVar39 = vpaddd_avx2(auVar143,auVar107);
  auVar39 = vpaddd_avx2(auVar39,auVar40 ^ auVar142 ^ auVar141);
  auVar39 = vpaddd_avx2(auVar39,auVar42 ^ auVar70 ^ auVar31);
  auVar70 = vpsrld_avx2(auVar94,6);
  auVar42 = vpslld_avx2(auVar94,0x1a);
  auVar141 = vpor_avx2(auVar42,auVar70);
  auVar70 = vpsrld_avx2(auVar94,0xb);
  auVar42 = vpslld_avx2(auVar94,0x15);
  auVar142 = vpor_avx2(auVar42,auVar70);
  auVar70 = vpsrld_avx2(auVar94,0x19);
  auVar42 = vpslld_avx2(auVar94,7);
  auVar143 = vpor_avx2(auVar42,auVar70);
  auVar42 = vpandn_avx2(auVar94,auVar3);
  auVar70 = vpand_avx2(auVar34,auVar94);
  auVar70 = vpor_avx2(auVar70,auVar42);
  auVar15 = vpaddd_avx2(auVar39,auVar15);
  auVar15 = vpaddd_avx2(auVar15,auVar70);
  auVar88._8_4_ = 0x2de92c6f;
  auVar88._0_8_ = 0x2de92c6f2de92c6f;
  auVar88._12_4_ = 0x2de92c6f;
  auVar88._16_4_ = 0x2de92c6f;
  auVar88._20_4_ = 0x2de92c6f;
  auVar88._24_4_ = 0x2de92c6f;
  auVar88._28_4_ = 0x2de92c6f;
  auVar15 = vpaddd_avx2(auVar15,auVar88);
  auVar15 = vpaddd_avx2(auVar15,auVar142 ^ auVar141 ^ auVar143);
  auVar70 = vpsrld_avx2(auVar13,2);
  auVar42 = vpslld_avx2(auVar13,0x1e);
  auVar141 = vpor_avx2(auVar42,auVar70);
  auVar70 = vpsrld_avx2(auVar13,0xd);
  auVar42 = vpslld_avx2(auVar13,0x13);
  auVar142 = vpor_avx2(auVar42,auVar70);
  auVar70 = vpsrld_avx2(auVar13,0x16);
  auVar42 = vpslld_avx2(auVar13,10);
  auVar143 = vpor_avx2(auVar42,auVar70);
  auVar70 = vpor_avx2(auVar13,auVar12);
  auVar70 = vpand_avx2(auVar70,auVar11);
  auVar42 = vpand_avx2(auVar13,auVar12);
  auVar70 = vpor_avx2(auVar42,auVar70);
  auVar18 = vpaddd_avx2(auVar15,auVar18);
  auVar15 = vpaddd_avx2(auVar142 ^ auVar141 ^ auVar143,auVar15);
  auVar15 = vpaddd_avx2(auVar70,auVar15);
  auVar70 = vpsrld_avx2(auVar38,0x11);
  auVar42 = vpslld_avx2(auVar38,0xf);
  auVar42 = vpor_avx2(auVar42,auVar70);
  auVar70 = vpsrld_avx2(auVar38,0x13);
  auVar141 = vpslld_avx2(auVar38,0xd);
  auVar141 = vpor_avx2(auVar141,auVar70);
  auVar31 = vpsrld_avx2(auVar38,10);
  auVar70 = vpsrld_avx2(auVar72,7);
  auVar142 = vpslld_avx2(auVar72,0x19);
  auVar142 = vpor_avx2(auVar142,auVar70);
  auVar70 = vpsrld_avx2(auVar72,0x12);
  auVar143 = vpslld_avx2(auVar72,0xe);
  auVar143 = vpor_avx2(auVar143,auVar70);
  auVar40 = vpsrld_avx2(auVar72,3);
  auVar70 = vpaddd_avx2(auVar95,auVar108);
  auVar70 = vpaddd_avx2(auVar143 ^ auVar142 ^ auVar40,auVar70);
  auVar70 = vpaddd_avx2(auVar70,auVar141 ^ auVar42 ^ auVar31);
  auVar42 = vpsrld_avx2(auVar18,6);
  auVar141 = vpslld_avx2(auVar18,0x1a);
  auVar142 = vpor_avx2(auVar141,auVar42);
  auVar42 = vpsrld_avx2(auVar18,0xb);
  auVar141 = vpslld_avx2(auVar18,0x15);
  auVar143 = vpor_avx2(auVar141,auVar42);
  auVar42 = vpsrld_avx2(auVar18,0x19);
  auVar141 = vpslld_avx2(auVar18,7);
  auVar95 = vpor_avx2(auVar141,auVar42);
  auVar141 = vpandn_avx2(auVar18,auVar34);
  auVar42 = vpand_avx2(auVar94,auVar18);
  auVar42 = vpor_avx2(auVar42,auVar141);
  auVar3 = vpaddd_avx2(auVar70,auVar3);
  auVar3 = vpaddd_avx2(auVar3,auVar42);
  auVar89._8_4_ = 0x4a7484aa;
  auVar89._0_8_ = 0x4a7484aa4a7484aa;
  auVar89._12_4_ = 0x4a7484aa;
  auVar89._16_4_ = 0x4a7484aa;
  auVar89._20_4_ = 0x4a7484aa;
  auVar89._24_4_ = 0x4a7484aa;
  auVar89._28_4_ = 0x4a7484aa;
  auVar3 = vpaddd_avx2(auVar3,auVar89);
  auVar3 = vpaddd_avx2(auVar3,auVar143 ^ auVar142 ^ auVar95);
  auVar42 = vpsrld_avx2(auVar15,2);
  auVar141 = vpslld_avx2(auVar15,0x1e);
  auVar142 = vpor_avx2(auVar141,auVar42);
  auVar42 = vpsrld_avx2(auVar15,0xd);
  auVar141 = vpslld_avx2(auVar15,0x13);
  auVar143 = vpor_avx2(auVar141,auVar42);
  auVar42 = vpsrld_avx2(auVar15,0x16);
  auVar141 = vpslld_avx2(auVar15,10);
  auVar95 = vpor_avx2(auVar141,auVar42);
  auVar42 = vpor_avx2(auVar15,auVar13);
  auVar42 = vpand_avx2(auVar12,auVar42);
  auVar141 = vpand_avx2(auVar15,auVar13);
  auVar42 = vpor_avx2(auVar42,auVar141);
  auVar11 = vpaddd_avx2(auVar3,auVar11);
  auVar3 = vpaddd_avx2(auVar143 ^ auVar142 ^ auVar95,auVar3);
  auVar3 = vpaddd_avx2(auVar3,auVar42);
  auVar42 = vpsrld_avx2(auVar39,0x11);
  auVar141 = vpslld_avx2(auVar39,0xf);
  auVar141 = vpor_avx2(auVar141,auVar42);
  auVar42 = vpsrld_avx2(auVar39,0x13);
  auVar142 = vpslld_avx2(auVar39,0xd);
  auVar142 = vpor_avx2(auVar142,auVar42);
  auVar31 = vpsrld_avx2(auVar39,10);
  auVar42 = vpsrld_avx2(auVar74,7);
  auVar143 = vpslld_avx2(auVar74,0x19);
  auVar143 = vpor_avx2(auVar143,auVar42);
  auVar42 = vpsrld_avx2(auVar74,0x12);
  auVar95 = vpslld_avx2(auVar74,0xe);
  auVar95 = vpor_avx2(auVar95,auVar42);
  auVar40 = vpsrld_avx2(auVar74,3);
  auVar42 = vpaddd_avx2(auVar72,auVar110);
  auVar42 = vpaddd_avx2(auVar95 ^ auVar143 ^ auVar40,auVar42);
  auVar42 = vpaddd_avx2(auVar42,auVar142 ^ auVar141 ^ auVar31);
  auVar141 = vpsrld_avx2(auVar11,6);
  auVar142 = vpslld_avx2(auVar11,0x1a);
  auVar143 = vpor_avx2(auVar142,auVar141);
  auVar141 = vpsrld_avx2(auVar11,0xb);
  auVar142 = vpslld_avx2(auVar11,0x15);
  auVar95 = vpor_avx2(auVar142,auVar141);
  auVar141 = vpsrld_avx2(auVar11,0x19);
  auVar142 = vpslld_avx2(auVar11,7);
  auVar72 = vpor_avx2(auVar142,auVar141);
  auVar142 = vpandn_avx2(auVar11,auVar94);
  auVar141 = vpand_avx2(auVar18,auVar11);
  auVar141 = vpor_avx2(auVar141,auVar142);
  auVar34 = vpaddd_avx2(auVar42,auVar34);
  auVar90._8_4_ = 0x5cb0a9dc;
  auVar90._0_8_ = 0x5cb0a9dc5cb0a9dc;
  auVar90._12_4_ = 0x5cb0a9dc;
  auVar90._16_4_ = 0x5cb0a9dc;
  auVar90._20_4_ = 0x5cb0a9dc;
  auVar90._24_4_ = 0x5cb0a9dc;
  auVar90._28_4_ = 0x5cb0a9dc;
  auVar34 = vpaddd_avx2(auVar34,auVar141);
  auVar34 = vpaddd_avx2(auVar34,auVar90);
  auVar34 = vpaddd_avx2(auVar34,auVar95 ^ auVar143 ^ auVar72);
  auVar141 = vpsrld_avx2(auVar3,2);
  auVar142 = vpslld_avx2(auVar3,0x1e);
  auVar143 = vpor_avx2(auVar142,auVar141);
  auVar141 = vpsrld_avx2(auVar3,0xd);
  auVar142 = vpslld_avx2(auVar3,0x13);
  auVar95 = vpor_avx2(auVar142,auVar141);
  auVar141 = vpsrld_avx2(auVar3,0x16);
  auVar142 = vpslld_avx2(auVar3,10);
  auVar72 = vpor_avx2(auVar142,auVar141);
  auVar141 = vpor_avx2(auVar3,auVar15);
  auVar141 = vpand_avx2(auVar13,auVar141);
  auVar142 = vpand_avx2(auVar3,auVar15);
  auVar141 = vpor_avx2(auVar141,auVar142);
  auVar12 = vpaddd_avx2(auVar12,auVar34);
  auVar34 = vpaddd_avx2(auVar95 ^ auVar143 ^ auVar72,auVar34);
  auVar34 = vpaddd_avx2(auVar34,auVar141);
  auVar141 = vpsrld_avx2(auVar70,0x11);
  auVar142 = vpslld_avx2(auVar70,0xf);
  auVar142 = vpor_avx2(auVar142,auVar141);
  auVar141 = vpsrld_avx2(auVar70,0x13);
  auVar143 = vpslld_avx2(auVar70,0xd);
  auVar143 = vpor_avx2(auVar143,auVar141);
  auVar72 = vpsrld_avx2(auVar70,10);
  auVar141 = vpsrld_avx2(auVar6,7);
  auVar95 = vpslld_avx2(auVar6,0x19);
  auVar141 = vpor_avx2(auVar95,auVar141);
  auVar95 = vpsrld_avx2(auVar6,0x12);
  auVar31 = vpslld_avx2(auVar6,0xe);
  auVar95 = vpor_avx2(auVar31,auVar95);
  auVar31 = vpsrld_avx2(auVar6,3);
  auVar141 = vpaddd_avx2(auVar74,auVar95 ^ auVar141 ^ auVar31);
  auVar141 = vpaddd_avx2(auVar141,auVar19);
  auVar141 = vpaddd_avx2(auVar141,auVar143 ^ auVar142 ^ auVar72);
  auVar142 = vpsrld_avx2(auVar12,6);
  auVar143 = vpslld_avx2(auVar12,0x1a);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar12,0xb);
  auVar143 = vpslld_avx2(auVar12,0x15);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar12,0x19);
  auVar143 = vpslld_avx2(auVar12,7);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpandn_avx2(auVar12,auVar18);
  auVar142 = vpand_avx2(auVar11,auVar12);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar94 = vpaddd_avx2(auVar141,auVar94);
  auVar94 = vpaddd_avx2(auVar94,auVar142);
  auVar73._8_4_ = 0x76f988da;
  auVar73._0_8_ = 0x76f988da76f988da;
  auVar73._12_4_ = 0x76f988da;
  auVar73._16_4_ = 0x76f988da;
  auVar73._20_4_ = 0x76f988da;
  auVar73._24_4_ = 0x76f988da;
  auVar73._28_4_ = 0x76f988da;
  auVar94 = vpaddd_avx2(auVar94,auVar73);
  auVar94 = vpaddd_avx2(auVar94,auVar72 ^ auVar95 ^ auVar74);
  auVar142 = vpsrld_avx2(auVar34,2);
  auVar143 = vpslld_avx2(auVar34,0x1e);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar34,0xd);
  auVar143 = vpslld_avx2(auVar34,0x13);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar34,0x16);
  auVar143 = vpslld_avx2(auVar34,10);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpor_avx2(auVar34,auVar3);
  auVar142 = vpand_avx2(auVar15,auVar142);
  auVar143 = vpand_avx2(auVar34,auVar3);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar13 = vpaddd_avx2(auVar13,auVar94);
  auVar94 = vpaddd_avx2(auVar72 ^ auVar95 ^ auVar74,auVar94);
  auVar94 = vpaddd_avx2(auVar94,auVar142);
  auVar142 = vpsrld_avx2(auVar42,0x11);
  auVar143 = vpslld_avx2(auVar42,0xf);
  auVar143 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar42,0x13);
  auVar95 = vpslld_avx2(auVar42,0xd);
  auVar95 = vpor_avx2(auVar95,auVar142);
  auVar74 = vpsrld_avx2(auVar42,10);
  auVar142 = vpsrld_avx2(auVar7,7);
  auVar72 = vpslld_avx2(auVar7,0x19);
  auVar142 = vpor_avx2(auVar72,auVar142);
  auVar72 = vpsrld_avx2(auVar7,0x12);
  auVar31 = vpslld_avx2(auVar7,0xe);
  auVar72 = vpor_avx2(auVar31,auVar72);
  auVar31 = vpsrld_avx2(auVar7,3);
  auVar142 = vpaddd_avx2(auVar6,auVar72 ^ auVar142 ^ auVar31);
  auVar142 = vpaddd_avx2(auVar142,auVar8);
  auVar142 = vpaddd_avx2(auVar142,auVar95 ^ auVar143 ^ auVar74);
  auVar143 = vpsrld_avx2(auVar13,6);
  auVar95 = vpslld_avx2(auVar13,0x1a);
  auVar72 = vpor_avx2(auVar95,auVar143);
  auVar143 = vpsrld_avx2(auVar13,0xb);
  auVar95 = vpslld_avx2(auVar13,0x15);
  auVar74 = vpor_avx2(auVar95,auVar143);
  auVar143 = vpsrld_avx2(auVar13,0x19);
  auVar95 = vpslld_avx2(auVar13,7);
  auVar6 = vpor_avx2(auVar95,auVar143);
  auVar95 = vpandn_avx2(auVar13,auVar11);
  auVar143 = vpand_avx2(auVar12,auVar13);
  auVar143 = vpor_avx2(auVar143,auVar95);
  auVar18 = vpaddd_avx2(auVar142,auVar18);
  auVar18 = vpaddd_avx2(auVar18,auVar143);
  auVar75._8_4_ = 0x983e5152;
  auVar75._0_8_ = 0x983e5152983e5152;
  auVar75._12_4_ = 0x983e5152;
  auVar75._16_4_ = 0x983e5152;
  auVar75._20_4_ = 0x983e5152;
  auVar75._24_4_ = 0x983e5152;
  auVar75._28_4_ = 0x983e5152;
  auVar18 = vpaddd_avx2(auVar18,auVar75);
  auVar18 = vpaddd_avx2(auVar18,auVar74 ^ auVar72 ^ auVar6);
  auVar143 = vpsrld_avx2(auVar94,2);
  auVar95 = vpslld_avx2(auVar94,0x1e);
  auVar72 = vpor_avx2(auVar95,auVar143);
  auVar143 = vpsrld_avx2(auVar94,0xd);
  auVar95 = vpslld_avx2(auVar94,0x13);
  auVar74 = vpor_avx2(auVar95,auVar143);
  auVar143 = vpsrld_avx2(auVar94,0x16);
  auVar95 = vpslld_avx2(auVar94,10);
  auVar6 = vpor_avx2(auVar95,auVar143);
  auVar143 = vpor_avx2(auVar94,auVar34);
  auVar143 = vpand_avx2(auVar3,auVar143);
  auVar95 = vpand_avx2(auVar94,auVar34);
  auVar143 = vpor_avx2(auVar143,auVar95);
  auVar15 = vpaddd_avx2(auVar15,auVar18);
  auVar18 = vpaddd_avx2(auVar74 ^ auVar72 ^ auVar6,auVar18);
  auVar18 = vpaddd_avx2(auVar18,auVar143);
  auVar143 = vpsrld_avx2(auVar141,0x11);
  auVar95 = vpslld_avx2(auVar141,0xf);
  auVar95 = vpor_avx2(auVar95,auVar143);
  auVar143 = vpsrld_avx2(auVar141,0x13);
  auVar72 = vpslld_avx2(auVar141,0xd);
  auVar72 = vpor_avx2(auVar72,auVar143);
  auVar6 = vpsrld_avx2(auVar141,10);
  auVar143 = vpsrld_avx2(auVar33,7);
  auVar74 = vpslld_avx2(auVar33,0x19);
  auVar143 = vpor_avx2(auVar74,auVar143);
  auVar74 = vpsrld_avx2(auVar33,0x12);
  auVar31 = vpslld_avx2(auVar33,0xe);
  auVar74 = vpor_avx2(auVar31,auVar74);
  auVar31 = vpsrld_avx2(auVar33,3);
  auVar143 = vpaddd_avx2(auVar7,auVar74 ^ auVar143 ^ auVar31);
  auVar143 = vpaddd_avx2(auVar143,auVar20);
  auVar143 = vpaddd_avx2(auVar143,auVar72 ^ auVar95 ^ auVar6);
  auVar95 = vpsrld_avx2(auVar15,6);
  auVar72 = vpslld_avx2(auVar15,0x1a);
  auVar74 = vpor_avx2(auVar72,auVar95);
  auVar95 = vpsrld_avx2(auVar15,0xb);
  auVar72 = vpslld_avx2(auVar15,0x15);
  auVar6 = vpor_avx2(auVar72,auVar95);
  auVar95 = vpsrld_avx2(auVar15,0x19);
  auVar72 = vpslld_avx2(auVar15,7);
  auVar7 = vpor_avx2(auVar72,auVar95);
  auVar72 = vpandn_avx2(auVar15,auVar12);
  auVar95 = vpand_avx2(auVar13,auVar15);
  auVar95 = vpor_avx2(auVar95,auVar72);
  auVar11 = vpaddd_avx2(auVar143,auVar11);
  auVar11 = vpaddd_avx2(auVar11,auVar95);
  auVar32._8_4_ = 0xa831c66d;
  auVar32._0_8_ = 0xa831c66da831c66d;
  auVar32._12_4_ = 0xa831c66d;
  auVar32._16_4_ = 0xa831c66d;
  auVar32._20_4_ = 0xa831c66d;
  auVar32._24_4_ = 0xa831c66d;
  auVar32._28_4_ = 0xa831c66d;
  auVar11 = vpaddd_avx2(auVar11,auVar32);
  auVar11 = vpaddd_avx2(auVar11,auVar6 ^ auVar74 ^ auVar7);
  auVar95 = vpsrld_avx2(auVar18,2);
  auVar72 = vpslld_avx2(auVar18,0x1e);
  auVar74 = vpor_avx2(auVar72,auVar95);
  auVar95 = vpsrld_avx2(auVar18,0xd);
  auVar72 = vpslld_avx2(auVar18,0x13);
  auVar6 = vpor_avx2(auVar72,auVar95);
  auVar95 = vpsrld_avx2(auVar18,0x16);
  auVar72 = vpslld_avx2(auVar18,10);
  auVar7 = vpor_avx2(auVar72,auVar95);
  auVar95 = vpor_avx2(auVar18,auVar94);
  auVar95 = vpand_avx2(auVar34,auVar95);
  auVar72 = vpand_avx2(auVar18,auVar94);
  auVar95 = vpor_avx2(auVar95,auVar72);
  auVar3 = vpaddd_avx2(auVar3,auVar11);
  auVar11 = vpaddd_avx2(auVar6 ^ auVar74 ^ auVar7,auVar11);
  auVar11 = vpaddd_avx2(auVar11,auVar95);
  auVar95 = vpsrld_avx2(auVar142,0x11);
  auVar72 = vpslld_avx2(auVar142,0xf);
  auVar72 = vpor_avx2(auVar72,auVar95);
  auVar95 = vpsrld_avx2(auVar142,0x13);
  auVar74 = vpslld_avx2(auVar142,0xd);
  auVar74 = vpor_avx2(auVar74,auVar95);
  auVar7 = vpsrld_avx2(auVar142,10);
  auVar95 = vpsrld_avx2(auVar44,7);
  auVar6 = vpslld_avx2(auVar44,0x19);
  auVar95 = vpor_avx2(auVar6,auVar95);
  auVar6 = vpsrld_avx2(auVar44,0x12);
  auVar31 = vpslld_avx2(auVar44,0xe);
  auVar6 = vpor_avx2(auVar31,auVar6);
  auVar31 = vpsrld_avx2(auVar44,3);
  auVar95 = vpaddd_avx2(auVar33,auVar6 ^ auVar95 ^ auVar31);
  auVar95 = vpaddd_avx2(auVar95,auVar38);
  auVar95 = vpaddd_avx2(auVar95,auVar74 ^ auVar72 ^ auVar7);
  auVar72 = vpsrld_avx2(auVar3,6);
  auVar74 = vpslld_avx2(auVar3,0x1a);
  auVar6 = vpor_avx2(auVar74,auVar72);
  auVar72 = vpsrld_avx2(auVar3,0xb);
  auVar74 = vpslld_avx2(auVar3,0x15);
  auVar7 = vpor_avx2(auVar74,auVar72);
  auVar72 = vpsrld_avx2(auVar3,0x19);
  auVar74 = vpslld_avx2(auVar3,7);
  auVar33 = vpor_avx2(auVar74,auVar72);
  auVar74 = vpandn_avx2(auVar3,auVar13);
  auVar72 = vpand_avx2(auVar15,auVar3);
  auVar72 = vpor_avx2(auVar72,auVar74);
  auVar12 = vpaddd_avx2(auVar95,auVar12);
  auVar76._8_4_ = 0xb00327c8;
  auVar76._0_8_ = 0xb00327c8b00327c8;
  auVar76._12_4_ = 0xb00327c8;
  auVar76._16_4_ = 0xb00327c8;
  auVar76._20_4_ = 0xb00327c8;
  auVar76._24_4_ = 0xb00327c8;
  auVar76._28_4_ = 0xb00327c8;
  auVar12 = vpaddd_avx2(auVar12,auVar72);
  auVar12 = vpaddd_avx2(auVar12,auVar76);
  auVar12 = vpaddd_avx2(auVar12,auVar7 ^ auVar6 ^ auVar33);
  auVar72 = vpsrld_avx2(auVar11,2);
  auVar74 = vpslld_avx2(auVar11,0x1e);
  auVar6 = vpor_avx2(auVar74,auVar72);
  auVar72 = vpsrld_avx2(auVar11,0xd);
  auVar74 = vpslld_avx2(auVar11,0x13);
  auVar7 = vpor_avx2(auVar74,auVar72);
  auVar72 = vpsrld_avx2(auVar11,0x16);
  auVar74 = vpslld_avx2(auVar11,10);
  auVar33 = vpor_avx2(auVar74,auVar72);
  auVar72 = vpor_avx2(auVar11,auVar18);
  auVar72 = vpand_avx2(auVar94,auVar72);
  auVar74 = vpand_avx2(auVar11,auVar18);
  auVar72 = vpor_avx2(auVar72,auVar74);
  auVar34 = vpaddd_avx2(auVar34,auVar12);
  auVar12 = vpaddd_avx2(auVar7 ^ auVar6 ^ auVar33,auVar12);
  auVar12 = vpaddd_avx2(auVar12,auVar72);
  auVar72 = vpsrld_avx2(auVar143,0x11);
  auVar74 = vpslld_avx2(auVar143,0xf);
  auVar74 = vpor_avx2(auVar74,auVar72);
  auVar72 = vpsrld_avx2(auVar143,0x13);
  auVar6 = vpslld_avx2(auVar143,0xd);
  auVar6 = vpor_avx2(auVar6,auVar72);
  auVar33 = vpsrld_avx2(auVar143,10);
  auVar72 = vpsrld_avx2(auVar100,7);
  auVar7 = vpslld_avx2(auVar100,0x19);
  auVar72 = vpor_avx2(auVar7,auVar72);
  auVar7 = vpsrld_avx2(auVar100,0x12);
  auVar31 = vpslld_avx2(auVar100,0xe);
  auVar7 = vpor_avx2(auVar31,auVar7);
  auVar31 = vpsrld_avx2(auVar100,3);
  auVar72 = vpaddd_avx2(auVar44,auVar7 ^ auVar72 ^ auVar31);
  auVar72 = vpaddd_avx2(auVar72,auVar39);
  auVar72 = vpaddd_avx2(auVar72,auVar6 ^ auVar74 ^ auVar33);
  auVar74 = vpsrld_avx2(auVar34,6);
  auVar6 = vpslld_avx2(auVar34,0x1a);
  auVar7 = vpor_avx2(auVar6,auVar74);
  auVar74 = vpsrld_avx2(auVar34,0xb);
  auVar6 = vpslld_avx2(auVar34,0x15);
  auVar33 = vpor_avx2(auVar6,auVar74);
  auVar74 = vpsrld_avx2(auVar34,0x19);
  auVar6 = vpslld_avx2(auVar34,7);
  auVar44 = vpor_avx2(auVar6,auVar74);
  auVar6 = vpandn_avx2(auVar34,auVar15);
  auVar74 = vpand_avx2(auVar3,auVar34);
  auVar74 = vpor_avx2(auVar74,auVar6);
  auVar13 = vpaddd_avx2(auVar72,auVar13);
  auVar13 = vpaddd_avx2(auVar13,auVar74);
  auVar43._8_4_ = 0xbf597fc7;
  auVar43._0_8_ = 0xbf597fc7bf597fc7;
  auVar43._12_4_ = 0xbf597fc7;
  auVar43._16_4_ = 0xbf597fc7;
  auVar43._20_4_ = 0xbf597fc7;
  auVar43._24_4_ = 0xbf597fc7;
  auVar43._28_4_ = 0xbf597fc7;
  auVar13 = vpaddd_avx2(auVar13,auVar43);
  auVar13 = vpaddd_avx2(auVar13,auVar33 ^ auVar7 ^ auVar44);
  auVar74 = vpsrld_avx2(auVar12,2);
  auVar6 = vpslld_avx2(auVar12,0x1e);
  auVar7 = vpor_avx2(auVar6,auVar74);
  auVar74 = vpsrld_avx2(auVar12,0xd);
  auVar6 = vpslld_avx2(auVar12,0x13);
  auVar33 = vpor_avx2(auVar6,auVar74);
  auVar74 = vpsrld_avx2(auVar12,0x16);
  auVar6 = vpslld_avx2(auVar12,10);
  auVar44 = vpor_avx2(auVar6,auVar74);
  auVar74 = vpor_avx2(auVar11,auVar12);
  auVar74 = vpand_avx2(auVar18,auVar74);
  auVar6 = vpand_avx2(auVar11,auVar12);
  auVar74 = vpor_avx2(auVar74,auVar6);
  auVar94 = vpaddd_avx2(auVar94,auVar13);
  auVar13 = vpaddd_avx2(auVar33 ^ auVar7 ^ auVar44,auVar13);
  auVar13 = vpaddd_avx2(auVar13,auVar74);
  auVar74 = vpsrld_avx2(auVar95,0x11);
  auVar6 = vpslld_avx2(auVar95,0xf);
  auVar6 = vpor_avx2(auVar6,auVar74);
  auVar74 = vpsrld_avx2(auVar95,0x13);
  auVar7 = vpslld_avx2(auVar95,0xd);
  auVar7 = vpor_avx2(auVar7,auVar74);
  auVar44 = vpsrld_avx2(auVar95,10);
  auVar74 = vpsrld_avx2(auVar107,7);
  auVar33 = vpslld_avx2(auVar107,0x19);
  auVar74 = vpor_avx2(auVar33,auVar74);
  auVar31 = vpsrld_avx2(auVar107,0x12);
  auVar33 = vpslld_avx2(auVar107,0xe);
  auVar33 = vpor_avx2(auVar33,auVar31);
  auVar31 = vpsrld_avx2(auVar107,3);
  auVar74 = vpaddd_avx2(auVar100,auVar31 ^ auVar33 ^ auVar74);
  auVar74 = vpaddd_avx2(auVar74,auVar70);
  auVar74 = vpaddd_avx2(auVar74,auVar7 ^ auVar6 ^ auVar44);
  auVar6 = vpsrld_avx2(auVar94,6);
  auVar7 = vpslld_avx2(auVar94,0x1a);
  auVar33 = vpor_avx2(auVar7,auVar6);
  auVar6 = vpsrld_avx2(auVar94,0xb);
  auVar7 = vpslld_avx2(auVar94,0x15);
  auVar44 = vpor_avx2(auVar7,auVar6);
  auVar6 = vpsrld_avx2(auVar94,0x19);
  auVar7 = vpslld_avx2(auVar94,7);
  auVar100 = vpor_avx2(auVar7,auVar6);
  auVar7 = vpandn_avx2(auVar94,auVar3);
  auVar6 = vpand_avx2(auVar34,auVar94);
  auVar6 = vpor_avx2(auVar6,auVar7);
  auVar15 = vpaddd_avx2(auVar74,auVar15);
  auVar15 = vpaddd_avx2(auVar15,auVar6);
  auVar96._8_4_ = 0xc6e00bf3;
  auVar96._0_8_ = 0xc6e00bf3c6e00bf3;
  auVar96._12_4_ = 0xc6e00bf3;
  auVar96._16_4_ = 0xc6e00bf3;
  auVar96._20_4_ = 0xc6e00bf3;
  auVar96._24_4_ = 0xc6e00bf3;
  auVar96._28_4_ = 0xc6e00bf3;
  auVar15 = vpaddd_avx2(auVar15,auVar96);
  auVar15 = vpaddd_avx2(auVar15,auVar44 ^ auVar33 ^ auVar100);
  auVar6 = vpsrld_avx2(auVar13,2);
  auVar7 = vpslld_avx2(auVar13,0x1e);
  auVar33 = vpor_avx2(auVar7,auVar6);
  auVar6 = vpsrld_avx2(auVar13,0xd);
  auVar7 = vpslld_avx2(auVar13,0x13);
  auVar44 = vpor_avx2(auVar7,auVar6);
  auVar6 = vpsrld_avx2(auVar13,0x16);
  auVar7 = vpslld_avx2(auVar13,10);
  auVar100 = vpor_avx2(auVar7,auVar6);
  auVar6 = vpor_avx2(auVar13,auVar12);
  auVar6 = vpand_avx2(auVar11,auVar6);
  auVar7 = vpand_avx2(auVar13,auVar12);
  auVar6 = vpor_avx2(auVar7,auVar6);
  auVar18 = vpaddd_avx2(auVar18,auVar15);
  auVar15 = vpaddd_avx2(auVar44 ^ auVar33 ^ auVar100,auVar15);
  auVar15 = vpaddd_avx2(auVar6,auVar15);
  auVar6 = vpsrld_avx2(auVar72,0x11);
  auVar7 = vpslld_avx2(auVar72,0xf);
  auVar7 = vpor_avx2(auVar7,auVar6);
  auVar6 = vpsrld_avx2(auVar72,0x13);
  auVar33 = vpslld_avx2(auVar72,0xd);
  auVar33 = vpor_avx2(auVar33,auVar6);
  auVar100 = vpsrld_avx2(auVar72,10);
  auVar6 = vpsrld_avx2(auVar108,7);
  auVar44 = vpslld_avx2(auVar108,0x19);
  auVar6 = vpor_avx2(auVar44,auVar6);
  auVar31 = vpsrld_avx2(auVar108,0x12);
  auVar44 = vpslld_avx2(auVar108,0xe);
  auVar44 = vpor_avx2(auVar44,auVar31);
  auVar31 = vpsrld_avx2(auVar108,3);
  auVar6 = vpaddd_avx2(auVar44 ^ auVar6 ^ auVar31,auVar107);
  auVar6 = vpaddd_avx2(auVar6,auVar42);
  auVar6 = vpaddd_avx2(auVar6,auVar100 ^ auVar33 ^ auVar7);
  auVar7 = vpsrld_avx2(auVar18,6);
  auVar33 = vpslld_avx2(auVar18,0x1a);
  auVar44 = vpor_avx2(auVar33,auVar7);
  auVar7 = vpsrld_avx2(auVar18,0xb);
  auVar33 = vpslld_avx2(auVar18,0x15);
  auVar100 = vpor_avx2(auVar33,auVar7);
  auVar7 = vpsrld_avx2(auVar18,0x19);
  auVar33 = vpslld_avx2(auVar18,7);
  auVar107 = vpor_avx2(auVar33,auVar7);
  auVar33 = vpandn_avx2(auVar18,auVar34);
  auVar7 = vpand_avx2(auVar94,auVar18);
  auVar7 = vpor_avx2(auVar7,auVar33);
  auVar3 = vpaddd_avx2(auVar6,auVar3);
  auVar3 = vpaddd_avx2(auVar7,auVar3);
  auVar101._8_4_ = 0xd5a79147;
  auVar101._0_8_ = 0xd5a79147d5a79147;
  auVar101._12_4_ = 0xd5a79147;
  auVar101._16_4_ = 0xd5a79147;
  auVar101._20_4_ = 0xd5a79147;
  auVar101._24_4_ = 0xd5a79147;
  auVar101._28_4_ = 0xd5a79147;
  auVar3 = vpaddd_avx2(auVar101,auVar3);
  auVar3 = vpaddd_avx2(auVar3,auVar107 ^ auVar100 ^ auVar44);
  auVar7 = vpsrld_avx2(auVar15,2);
  auVar33 = vpslld_avx2(auVar15,0x1e);
  auVar44 = vpor_avx2(auVar33,auVar7);
  auVar7 = vpsrld_avx2(auVar15,0xd);
  auVar33 = vpslld_avx2(auVar15,0x13);
  auVar100 = vpor_avx2(auVar33,auVar7);
  auVar7 = vpsrld_avx2(auVar15,0x16);
  auVar33 = vpslld_avx2(auVar15,10);
  auVar107 = vpor_avx2(auVar33,auVar7);
  auVar7 = vpor_avx2(auVar15,auVar13);
  auVar7 = vpand_avx2(auVar7,auVar12);
  auVar33 = vpand_avx2(auVar15,auVar13);
  auVar7 = vpor_avx2(auVar33,auVar7);
  auVar11 = vpaddd_avx2(auVar11,auVar3);
  auVar3 = vpaddd_avx2(auVar107 ^ auVar100 ^ auVar44,auVar3);
  auVar3 = vpaddd_avx2(auVar7,auVar3);
  auVar7 = vpsrld_avx2(auVar74,0x11);
  auVar33 = vpslld_avx2(auVar74,0xf);
  auVar33 = vpor_avx2(auVar33,auVar7);
  auVar7 = vpsrld_avx2(auVar74,0x13);
  auVar44 = vpslld_avx2(auVar74,0xd);
  auVar44 = vpor_avx2(auVar44,auVar7);
  auVar107 = vpsrld_avx2(auVar74,10);
  auVar7 = vpsrld_avx2(auVar110,7);
  auVar100 = vpslld_avx2(auVar110,0x19);
  auVar7 = vpor_avx2(auVar100,auVar7);
  auVar31 = vpsrld_avx2(auVar110,0x12);
  auVar100 = vpslld_avx2(auVar110,0xe);
  auVar100 = vpor_avx2(auVar100,auVar31);
  auVar31 = vpsrld_avx2(auVar110,3);
  auVar7 = vpaddd_avx2(auVar100 ^ auVar7 ^ auVar31,auVar108);
  auVar7 = vpaddd_avx2(auVar7,auVar141);
  auVar7 = vpaddd_avx2(auVar7,auVar44 ^ auVar33 ^ auVar107);
  auVar33 = vpsrld_avx2(auVar11,6);
  auVar44 = vpslld_avx2(auVar11,0x1a);
  auVar100 = vpor_avx2(auVar44,auVar33);
  auVar33 = vpsrld_avx2(auVar11,0xb);
  auVar44 = vpslld_avx2(auVar11,0x15);
  auVar107 = vpor_avx2(auVar44,auVar33);
  auVar33 = vpsrld_avx2(auVar11,0x19);
  auVar44 = vpslld_avx2(auVar11,7);
  auVar108 = vpor_avx2(auVar44,auVar33);
  auVar44 = vpandn_avx2(auVar11,auVar94);
  auVar33 = vpand_avx2(auVar18,auVar11);
  auVar33 = vpor_avx2(auVar33,auVar44);
  auVar34 = vpaddd_avx2(auVar7,auVar34);
  auVar130._8_4_ = 0x6ca6351;
  auVar130._0_8_ = 0x6ca635106ca6351;
  auVar130._12_4_ = 0x6ca6351;
  auVar130._16_4_ = 0x6ca6351;
  auVar130._20_4_ = 0x6ca6351;
  auVar130._24_4_ = 0x6ca6351;
  auVar130._28_4_ = 0x6ca6351;
  auVar34 = vpaddd_avx2(auVar33,auVar34);
  auVar34 = vpaddd_avx2(auVar130,auVar34);
  auVar34 = vpaddd_avx2(auVar107 ^ auVar100 ^ auVar108,auVar34);
  auVar33 = vpsrld_avx2(auVar3,2);
  auVar44 = vpslld_avx2(auVar3,0x1e);
  auVar100 = vpor_avx2(auVar44,auVar33);
  auVar33 = vpsrld_avx2(auVar3,0xd);
  auVar44 = vpslld_avx2(auVar3,0x13);
  auVar107 = vpor_avx2(auVar44,auVar33);
  auVar33 = vpsrld_avx2(auVar3,0x16);
  auVar44 = vpslld_avx2(auVar3,10);
  auVar108 = vpor_avx2(auVar44,auVar33);
  auVar33 = vpor_avx2(auVar3,auVar15);
  auVar33 = vpand_avx2(auVar33,auVar13);
  auVar44 = vpand_avx2(auVar3,auVar15);
  auVar33 = vpor_avx2(auVar44,auVar33);
  auVar12 = vpaddd_avx2(auVar34,auVar12);
  auVar34 = vpaddd_avx2(auVar108 ^ auVar107 ^ auVar100,auVar34);
  auVar34 = vpaddd_avx2(auVar33,auVar34);
  auVar33 = vpsrld_avx2(auVar6,0x11);
  auVar44 = vpslld_avx2(auVar6,0xf);
  auVar44 = vpor_avx2(auVar44,auVar33);
  auVar33 = vpsrld_avx2(auVar6,0x13);
  auVar100 = vpslld_avx2(auVar6,0xd);
  auVar100 = vpor_avx2(auVar100,auVar33);
  auVar108 = vpsrld_avx2(auVar6,10);
  auVar33 = vpsrld_avx2(auVar19,7);
  auVar107 = vpslld_avx2(auVar19,0x19);
  auVar33 = vpor_avx2(auVar107,auVar33);
  auVar107 = vpsrld_avx2(auVar19,0x12);
  auVar31 = vpslld_avx2(auVar19,0xe);
  auVar107 = vpor_avx2(auVar31,auVar107);
  auVar31 = vpsrld_avx2(auVar19,3);
  auVar33 = vpaddd_avx2(auVar107 ^ auVar33 ^ auVar31,auVar110);
  auVar33 = vpaddd_avx2(auVar33,auVar142);
  auVar33 = vpaddd_avx2(auVar33,auVar100 ^ auVar44 ^ auVar108);
  auVar44 = vpsrld_avx2(auVar12,6);
  auVar100 = vpslld_avx2(auVar12,0x1a);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar12,0xb);
  auVar100 = vpslld_avx2(auVar12,0x15);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar12,0x19);
  auVar100 = vpslld_avx2(auVar12,7);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpandn_avx2(auVar12,auVar18);
  auVar44 = vpand_avx2(auVar11,auVar12);
  auVar44 = vpor_avx2(auVar44,auVar100);
  auVar94 = vpaddd_avx2(auVar33,auVar94);
  auVar94 = vpaddd_avx2(auVar44,auVar94);
  auVar109._8_4_ = 0x14292967;
  auVar109._0_8_ = 0x1429296714292967;
  auVar109._12_4_ = 0x14292967;
  auVar109._16_4_ = 0x14292967;
  auVar109._20_4_ = 0x14292967;
  auVar109._24_4_ = 0x14292967;
  auVar109._28_4_ = 0x14292967;
  auVar94 = vpaddd_avx2(auVar109,auVar94);
  auVar94 = vpaddd_avx2(auVar108 ^ auVar107 ^ auVar110,auVar94);
  auVar44 = vpsrld_avx2(auVar34,2);
  auVar100 = vpslld_avx2(auVar34,0x1e);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar34,0xd);
  auVar100 = vpslld_avx2(auVar34,0x13);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar34,0x16);
  auVar100 = vpslld_avx2(auVar34,10);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpor_avx2(auVar34,auVar3);
  auVar44 = vpand_avx2(auVar44,auVar15);
  auVar100 = vpand_avx2(auVar34,auVar3);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar13 = vpaddd_avx2(auVar94,auVar13);
  auVar94 = vpaddd_avx2(auVar110 ^ auVar108 ^ auVar107,auVar94);
  auVar94 = vpaddd_avx2(auVar44,auVar94);
  auVar44 = vpsrld_avx2(auVar7,0x11);
  auVar100 = vpslld_avx2(auVar7,0xf);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpsrld_avx2(auVar7,0x13);
  auVar107 = vpslld_avx2(auVar7,0xd);
  auVar100 = vpor_avx2(auVar107,auVar100);
  auVar110 = vpsrld_avx2(auVar7,10);
  auVar107 = vpsrld_avx2(auVar8,7);
  auVar108 = vpslld_avx2(auVar8,0x19);
  auVar107 = vpor_avx2(auVar108,auVar107);
  auVar108 = vpsrld_avx2(auVar8,0x12);
  auVar31 = vpslld_avx2(auVar8,0xe);
  auVar108 = vpor_avx2(auVar31,auVar108);
  auVar31 = vpsrld_avx2(auVar8,3);
  auVar19 = vpaddd_avx2(auVar108 ^ auVar107 ^ auVar31,auVar19);
  auVar19 = vpaddd_avx2(auVar19,auVar143);
  auVar19 = vpaddd_avx2(auVar19,auVar100 ^ auVar44 ^ auVar110);
  auVar44 = vpsrld_avx2(auVar13,6);
  auVar100 = vpslld_avx2(auVar13,0x1a);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar13,0xb);
  auVar100 = vpslld_avx2(auVar13,0x15);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar13,0x19);
  auVar100 = vpslld_avx2(auVar13,7);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpandn_avx2(auVar13,auVar11);
  auVar44 = vpand_avx2(auVar12,auVar13);
  auVar44 = vpor_avx2(auVar44,auVar100);
  auVar18 = vpaddd_avx2(auVar19,auVar18);
  auVar18 = vpaddd_avx2(auVar44,auVar18);
  auVar111._8_4_ = 0x27b70a85;
  auVar111._0_8_ = 0x27b70a8527b70a85;
  auVar111._12_4_ = 0x27b70a85;
  auVar111._16_4_ = 0x27b70a85;
  auVar111._20_4_ = 0x27b70a85;
  auVar111._24_4_ = 0x27b70a85;
  auVar111._28_4_ = 0x27b70a85;
  auVar18 = vpaddd_avx2(auVar111,auVar18);
  auVar18 = vpaddd_avx2(auVar108 ^ auVar107 ^ auVar110,auVar18);
  auVar44 = vpsrld_avx2(auVar94,2);
  auVar100 = vpslld_avx2(auVar94,0x1e);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar94,0xd);
  auVar100 = vpslld_avx2(auVar94,0x13);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar94,0x16);
  auVar100 = vpslld_avx2(auVar94,10);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpor_avx2(auVar94,auVar34);
  auVar44 = vpand_avx2(auVar44,auVar3);
  auVar100 = vpand_avx2(auVar94,auVar34);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar15 = vpaddd_avx2(auVar18,auVar15);
  auVar18 = vpaddd_avx2(auVar110 ^ auVar108 ^ auVar107,auVar18);
  auVar18 = vpaddd_avx2(auVar44,auVar18);
  auVar44 = vpsrld_avx2(auVar33,0x11);
  auVar100 = vpslld_avx2(auVar33,0xf);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpsrld_avx2(auVar33,0x13);
  auVar107 = vpslld_avx2(auVar33,0xd);
  auVar100 = vpor_avx2(auVar107,auVar100);
  auVar110 = vpsrld_avx2(auVar33,10);
  auVar107 = vpsrld_avx2(auVar20,7);
  auVar108 = vpslld_avx2(auVar20,0x19);
  auVar107 = vpor_avx2(auVar108,auVar107);
  auVar108 = vpsrld_avx2(auVar20,0x12);
  auVar31 = vpslld_avx2(auVar20,0xe);
  auVar108 = vpor_avx2(auVar31,auVar108);
  auVar31 = vpsrld_avx2(auVar20,3);
  auVar8 = vpaddd_avx2(auVar108 ^ auVar107 ^ auVar31,auVar8);
  auVar8 = vpaddd_avx2(auVar8,auVar95);
  auVar8 = vpaddd_avx2(auVar8,auVar100 ^ auVar44 ^ auVar110);
  auVar44 = vpsrld_avx2(auVar15,6);
  auVar100 = vpslld_avx2(auVar15,0x1a);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar15,0xb);
  auVar100 = vpslld_avx2(auVar15,0x15);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar15,0x19);
  auVar100 = vpslld_avx2(auVar15,7);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpandn_avx2(auVar15,auVar12);
  auVar44 = vpand_avx2(auVar13,auVar15);
  auVar44 = vpor_avx2(auVar44,auVar100);
  auVar11 = vpaddd_avx2(auVar8,auVar11);
  auVar11 = vpaddd_avx2(auVar44,auVar11);
  auVar112._8_4_ = 0x2e1b2138;
  auVar112._0_8_ = 0x2e1b21382e1b2138;
  auVar112._12_4_ = 0x2e1b2138;
  auVar112._16_4_ = 0x2e1b2138;
  auVar112._20_4_ = 0x2e1b2138;
  auVar112._24_4_ = 0x2e1b2138;
  auVar112._28_4_ = 0x2e1b2138;
  auVar11 = vpaddd_avx2(auVar112,auVar11);
  auVar11 = vpaddd_avx2(auVar108 ^ auVar107 ^ auVar110,auVar11);
  auVar44 = vpsrld_avx2(auVar18,2);
  auVar100 = vpslld_avx2(auVar18,0x1e);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar18,0xd);
  auVar100 = vpslld_avx2(auVar18,0x13);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar18,0x16);
  auVar100 = vpslld_avx2(auVar18,10);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpor_avx2(auVar18,auVar94);
  auVar44 = vpand_avx2(auVar44,auVar34);
  auVar100 = vpand_avx2(auVar18,auVar94);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar3 = vpaddd_avx2(auVar11,auVar3);
  auVar11 = vpaddd_avx2(auVar110 ^ auVar108 ^ auVar107,auVar11);
  auVar11 = vpaddd_avx2(auVar44,auVar11);
  auVar44 = vpsrld_avx2(auVar19,0x11);
  auVar100 = vpslld_avx2(auVar19,0xf);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpsrld_avx2(auVar19,0x13);
  auVar107 = vpslld_avx2(auVar19,0xd);
  auVar100 = vpor_avx2(auVar107,auVar100);
  auVar110 = vpsrld_avx2(auVar19,10);
  auVar107 = vpsrld_avx2(auVar38,7);
  auVar108 = vpslld_avx2(auVar38,0x19);
  auVar107 = vpor_avx2(auVar108,auVar107);
  auVar108 = vpsrld_avx2(auVar38,0x12);
  auVar31 = vpslld_avx2(auVar38,0xe);
  auVar108 = vpor_avx2(auVar31,auVar108);
  auVar31 = vpsrld_avx2(auVar38,3);
  auVar20 = vpaddd_avx2(auVar108 ^ auVar107 ^ auVar31,auVar20);
  auVar20 = vpaddd_avx2(auVar20,auVar72);
  auVar20 = vpaddd_avx2(auVar20,auVar100 ^ auVar44 ^ auVar110);
  auVar44 = vpsrld_avx2(auVar3,6);
  auVar100 = vpslld_avx2(auVar3,0x1a);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar3,0xb);
  auVar100 = vpslld_avx2(auVar3,0x15);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar3,0x19);
  auVar100 = vpslld_avx2(auVar3,7);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpandn_avx2(auVar3,auVar13);
  auVar44 = vpand_avx2(auVar15,auVar3);
  auVar44 = vpor_avx2(auVar44,auVar100);
  auVar12 = vpaddd_avx2(auVar20,auVar12);
  auVar131._8_4_ = 0x4d2c6dfc;
  auVar131._0_8_ = 0x4d2c6dfc4d2c6dfc;
  auVar131._12_4_ = 0x4d2c6dfc;
  auVar131._16_4_ = 0x4d2c6dfc;
  auVar131._20_4_ = 0x4d2c6dfc;
  auVar131._24_4_ = 0x4d2c6dfc;
  auVar131._28_4_ = 0x4d2c6dfc;
  auVar12 = vpaddd_avx2(auVar44,auVar12);
  auVar12 = vpaddd_avx2(auVar131,auVar12);
  auVar12 = vpaddd_avx2(auVar108 ^ auVar107 ^ auVar110,auVar12);
  auVar44 = vpsrld_avx2(auVar11,2);
  auVar100 = vpslld_avx2(auVar11,0x1e);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar11,0xd);
  auVar100 = vpslld_avx2(auVar11,0x13);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar11,0x16);
  auVar100 = vpslld_avx2(auVar11,10);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpor_avx2(auVar11,auVar18);
  auVar44 = vpand_avx2(auVar44,auVar94);
  auVar100 = vpand_avx2(auVar11,auVar18);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar34 = vpaddd_avx2(auVar12,auVar34);
  auVar12 = vpaddd_avx2(auVar110 ^ auVar108 ^ auVar107,auVar12);
  auVar12 = vpaddd_avx2(auVar44,auVar12);
  auVar44 = vpsrld_avx2(auVar8,0x11);
  auVar100 = vpslld_avx2(auVar8,0xf);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpsrld_avx2(auVar8,0x13);
  auVar107 = vpslld_avx2(auVar8,0xd);
  auVar100 = vpor_avx2(auVar107,auVar100);
  auVar110 = vpsrld_avx2(auVar8,10);
  auVar107 = vpsrld_avx2(auVar39,7);
  auVar108 = vpslld_avx2(auVar39,0x19);
  auVar107 = vpor_avx2(auVar108,auVar107);
  auVar108 = vpsrld_avx2(auVar39,0x12);
  auVar31 = vpslld_avx2(auVar39,0xe);
  auVar108 = vpor_avx2(auVar31,auVar108);
  auVar31 = vpsrld_avx2(auVar39,3);
  auVar38 = vpaddd_avx2(auVar108 ^ auVar107 ^ auVar31,auVar38);
  auVar38 = vpaddd_avx2(auVar38,auVar74);
  auVar38 = vpaddd_avx2(auVar38,auVar100 ^ auVar44 ^ auVar110);
  auVar44 = vpsrld_avx2(auVar34,6);
  auVar100 = vpslld_avx2(auVar34,0x1a);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar34,0xb);
  auVar100 = vpslld_avx2(auVar34,0x15);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar34,0x19);
  auVar100 = vpslld_avx2(auVar34,7);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpandn_avx2(auVar34,auVar15);
  auVar44 = vpand_avx2(auVar3,auVar34);
  auVar44 = vpor_avx2(auVar44,auVar100);
  auVar13 = vpaddd_avx2(auVar38,auVar13);
  auVar13 = vpaddd_avx2(auVar44,auVar13);
  auVar113._8_4_ = 0x53380d13;
  auVar113._0_8_ = 0x53380d1353380d13;
  auVar113._12_4_ = 0x53380d13;
  auVar113._16_4_ = 0x53380d13;
  auVar113._20_4_ = 0x53380d13;
  auVar113._24_4_ = 0x53380d13;
  auVar113._28_4_ = 0x53380d13;
  auVar13 = vpaddd_avx2(auVar113,auVar13);
  auVar13 = vpaddd_avx2(auVar108 ^ auVar107 ^ auVar110,auVar13);
  auVar44 = vpsrld_avx2(auVar12,2);
  auVar100 = vpslld_avx2(auVar12,0x1e);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar12,0xd);
  auVar100 = vpslld_avx2(auVar12,0x13);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar12,0x16);
  auVar100 = vpslld_avx2(auVar12,10);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpor_avx2(auVar12,auVar11);
  auVar44 = vpand_avx2(auVar44,auVar18);
  auVar100 = vpand_avx2(auVar12,auVar11);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar94 = vpaddd_avx2(auVar13,auVar94);
  auVar13 = vpaddd_avx2(auVar110 ^ auVar108 ^ auVar107,auVar13);
  auVar13 = vpaddd_avx2(auVar44,auVar13);
  auVar44 = vpsrld_avx2(auVar20,0x11);
  auVar100 = vpslld_avx2(auVar20,0xf);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpsrld_avx2(auVar20,0x13);
  auVar107 = vpslld_avx2(auVar20,0xd);
  auVar100 = vpor_avx2(auVar107,auVar100);
  auVar110 = vpsrld_avx2(auVar20,10);
  auVar107 = vpsrld_avx2(auVar70,7);
  auVar108 = vpslld_avx2(auVar70,0x19);
  auVar107 = vpor_avx2(auVar108,auVar107);
  auVar108 = vpsrld_avx2(auVar70,0x12);
  auVar31 = vpslld_avx2(auVar70,0xe);
  auVar108 = vpor_avx2(auVar31,auVar108);
  auVar31 = vpsrld_avx2(auVar70,3);
  auVar39 = vpaddd_avx2(auVar108 ^ auVar107 ^ auVar31,auVar39);
  auVar39 = vpaddd_avx2(auVar39,auVar6);
  auVar39 = vpaddd_avx2(auVar39,auVar100 ^ auVar44 ^ auVar110);
  auVar44 = vpsrld_avx2(auVar94,6);
  auVar100 = vpslld_avx2(auVar94,0x1a);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar94,0xb);
  auVar100 = vpslld_avx2(auVar94,0x15);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar94,0x19);
  auVar100 = vpslld_avx2(auVar94,7);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpandn_avx2(auVar94,auVar3);
  auVar44 = vpand_avx2(auVar34,auVar94);
  auVar44 = vpor_avx2(auVar44,auVar100);
  auVar15 = vpaddd_avx2(auVar39,auVar15);
  auVar15 = vpaddd_avx2(auVar44,auVar15);
  auVar114._8_4_ = 0x650a7354;
  auVar114._0_8_ = 0x650a7354650a7354;
  auVar114._12_4_ = 0x650a7354;
  auVar114._16_4_ = 0x650a7354;
  auVar114._20_4_ = 0x650a7354;
  auVar114._24_4_ = 0x650a7354;
  auVar114._28_4_ = 0x650a7354;
  auVar15 = vpaddd_avx2(auVar114,auVar15);
  auVar15 = vpaddd_avx2(auVar108 ^ auVar107 ^ auVar110,auVar15);
  auVar44 = vpsrld_avx2(auVar13,2);
  auVar100 = vpslld_avx2(auVar13,0x1e);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar13,0xd);
  auVar100 = vpslld_avx2(auVar13,0x13);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar13,0x16);
  auVar100 = vpslld_avx2(auVar13,10);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpor_avx2(auVar13,auVar12);
  auVar44 = vpand_avx2(auVar44,auVar11);
  auVar100 = vpand_avx2(auVar13,auVar12);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar18 = vpaddd_avx2(auVar15,auVar18);
  auVar15 = vpaddd_avx2(auVar110 ^ auVar108 ^ auVar107,auVar15);
  auVar15 = vpaddd_avx2(auVar44,auVar15);
  auVar44 = vpsrld_avx2(auVar38,0x11);
  auVar100 = vpslld_avx2(auVar38,0xf);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpsrld_avx2(auVar38,0x13);
  auVar107 = vpslld_avx2(auVar38,0xd);
  auVar100 = vpor_avx2(auVar107,auVar100);
  auVar110 = vpsrld_avx2(auVar38,10);
  auVar107 = vpsrld_avx2(auVar42,7);
  auVar108 = vpslld_avx2(auVar42,0x19);
  auVar107 = vpor_avx2(auVar108,auVar107);
  auVar108 = vpsrld_avx2(auVar42,0x12);
  auVar31 = vpslld_avx2(auVar42,0xe);
  auVar108 = vpor_avx2(auVar31,auVar108);
  auVar31 = vpsrld_avx2(auVar42,3);
  auVar70 = vpaddd_avx2(auVar108 ^ auVar107 ^ auVar31,auVar70);
  auVar70 = vpaddd_avx2(auVar70,auVar7);
  auVar70 = vpaddd_avx2(auVar70,auVar100 ^ auVar44 ^ auVar110);
  auVar44 = vpsrld_avx2(auVar18,6);
  auVar100 = vpslld_avx2(auVar18,0x1a);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar18,0xb);
  auVar100 = vpslld_avx2(auVar18,0x15);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar18,0x19);
  auVar100 = vpslld_avx2(auVar18,7);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpandn_avx2(auVar18,auVar34);
  auVar44 = vpand_avx2(auVar94,auVar18);
  auVar44 = vpor_avx2(auVar44,auVar100);
  auVar3 = vpaddd_avx2(auVar70,auVar3);
  auVar3 = vpaddd_avx2(auVar44,auVar3);
  auVar115._8_4_ = 0x766a0abb;
  auVar115._0_8_ = 0x766a0abb766a0abb;
  auVar115._12_4_ = 0x766a0abb;
  auVar115._16_4_ = 0x766a0abb;
  auVar115._20_4_ = 0x766a0abb;
  auVar115._24_4_ = 0x766a0abb;
  auVar115._28_4_ = 0x766a0abb;
  auVar3 = vpaddd_avx2(auVar115,auVar3);
  auVar3 = vpaddd_avx2(auVar108 ^ auVar107 ^ auVar110,auVar3);
  auVar44 = vpsrld_avx2(auVar15,2);
  auVar100 = vpslld_avx2(auVar15,0x1e);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar15,0xd);
  auVar100 = vpslld_avx2(auVar15,0x13);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar15,0x16);
  auVar100 = vpslld_avx2(auVar15,10);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpor_avx2(auVar15,auVar13);
  auVar44 = vpand_avx2(auVar44,auVar12);
  auVar100 = vpand_avx2(auVar15,auVar13);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar11 = vpaddd_avx2(auVar3,auVar11);
  auVar3 = vpaddd_avx2(auVar110 ^ auVar108 ^ auVar107,auVar3);
  auVar3 = vpaddd_avx2(auVar44,auVar3);
  auVar44 = vpsrld_avx2(auVar39,0x11);
  auVar100 = vpslld_avx2(auVar39,0xf);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpsrld_avx2(auVar39,0x13);
  auVar107 = vpslld_avx2(auVar39,0xd);
  auVar100 = vpor_avx2(auVar107,auVar100);
  auVar110 = vpsrld_avx2(auVar39,10);
  auVar107 = vpsrld_avx2(auVar141,7);
  auVar108 = vpslld_avx2(auVar141,0x19);
  auVar107 = vpor_avx2(auVar108,auVar107);
  auVar108 = vpsrld_avx2(auVar141,0x12);
  auVar31 = vpslld_avx2(auVar141,0xe);
  auVar108 = vpor_avx2(auVar31,auVar108);
  auVar31 = vpsrld_avx2(auVar141,3);
  auVar42 = vpaddd_avx2(auVar108 ^ auVar107 ^ auVar31,auVar42);
  auVar42 = vpaddd_avx2(auVar42,auVar33);
  auVar42 = vpaddd_avx2(auVar42,auVar100 ^ auVar44 ^ auVar110);
  auVar44 = vpsrld_avx2(auVar11,6);
  auVar100 = vpslld_avx2(auVar11,0x1a);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar11,0xb);
  auVar100 = vpslld_avx2(auVar11,0x15);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar11,0x19);
  auVar100 = vpslld_avx2(auVar11,7);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpandn_avx2(auVar11,auVar94);
  auVar44 = vpand_avx2(auVar18,auVar11);
  auVar44 = vpor_avx2(auVar44,auVar100);
  auVar34 = vpaddd_avx2(auVar42,auVar34);
  auVar132._8_4_ = 0x81c2c92e;
  auVar132._0_8_ = 0x81c2c92e81c2c92e;
  auVar132._12_4_ = 0x81c2c92e;
  auVar132._16_4_ = 0x81c2c92e;
  auVar132._20_4_ = 0x81c2c92e;
  auVar132._24_4_ = 0x81c2c92e;
  auVar132._28_4_ = 0x81c2c92e;
  auVar34 = vpaddd_avx2(auVar44,auVar34);
  auVar34 = vpaddd_avx2(auVar132,auVar34);
  auVar34 = vpaddd_avx2(auVar108 ^ auVar107 ^ auVar110,auVar34);
  auVar44 = vpsrld_avx2(auVar3,2);
  auVar100 = vpslld_avx2(auVar3,0x1e);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar3,0xd);
  auVar100 = vpslld_avx2(auVar3,0x13);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar3,0x16);
  auVar100 = vpslld_avx2(auVar3,10);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpor_avx2(auVar3,auVar15);
  auVar44 = vpand_avx2(auVar44,auVar13);
  auVar100 = vpand_avx2(auVar3,auVar15);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar12 = vpaddd_avx2(auVar34,auVar12);
  auVar34 = vpaddd_avx2(auVar110 ^ auVar108 ^ auVar107,auVar34);
  auVar34 = vpaddd_avx2(auVar44,auVar34);
  auVar44 = vpsrld_avx2(auVar70,0x11);
  auVar100 = vpslld_avx2(auVar70,0xf);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpsrld_avx2(auVar70,0x13);
  auVar107 = vpslld_avx2(auVar70,0xd);
  auVar100 = vpor_avx2(auVar107,auVar100);
  auVar110 = vpsrld_avx2(auVar70,10);
  auVar107 = vpsrld_avx2(auVar142,7);
  auVar108 = vpslld_avx2(auVar142,0x19);
  auVar107 = vpor_avx2(auVar108,auVar107);
  auVar108 = vpsrld_avx2(auVar142,0x12);
  auVar31 = vpslld_avx2(auVar142,0xe);
  auVar108 = vpor_avx2(auVar31,auVar108);
  auVar31 = vpsrld_avx2(auVar142,3);
  auVar141 = vpaddd_avx2(auVar108 ^ auVar107 ^ auVar31,auVar141);
  auVar141 = vpaddd_avx2(auVar141,auVar19);
  auVar141 = vpaddd_avx2(auVar141,auVar100 ^ auVar44 ^ auVar110);
  auVar44 = vpsrld_avx2(auVar12,6);
  auVar100 = vpslld_avx2(auVar12,0x1a);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar12,0xb);
  auVar100 = vpslld_avx2(auVar12,0x15);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar12,0x19);
  auVar100 = vpslld_avx2(auVar12,7);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpandn_avx2(auVar12,auVar18);
  auVar44 = vpand_avx2(auVar11,auVar12);
  auVar44 = vpor_avx2(auVar44,auVar100);
  auVar94 = vpaddd_avx2(auVar141,auVar94);
  auVar94 = vpaddd_avx2(auVar44,auVar94);
  auVar116._8_4_ = 0x92722c85;
  auVar116._0_8_ = 0x92722c8592722c85;
  auVar116._12_4_ = 0x92722c85;
  auVar116._16_4_ = 0x92722c85;
  auVar116._20_4_ = 0x92722c85;
  auVar116._24_4_ = 0x92722c85;
  auVar116._28_4_ = 0x92722c85;
  auVar94 = vpaddd_avx2(auVar116,auVar94);
  auVar94 = vpaddd_avx2(auVar108 ^ auVar107 ^ auVar110,auVar94);
  auVar44 = vpsrld_avx2(auVar34,2);
  auVar100 = vpslld_avx2(auVar34,0x1e);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar34,0xd);
  auVar100 = vpslld_avx2(auVar34,0x13);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar34,0x16);
  auVar100 = vpslld_avx2(auVar34,10);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpor_avx2(auVar34,auVar3);
  auVar44 = vpand_avx2(auVar44,auVar15);
  auVar100 = vpand_avx2(auVar34,auVar3);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar13 = vpaddd_avx2(auVar94,auVar13);
  auVar94 = vpaddd_avx2(auVar110 ^ auVar108 ^ auVar107,auVar94);
  auVar94 = vpaddd_avx2(auVar44,auVar94);
  auVar44 = vpsrld_avx2(auVar42,0x11);
  auVar100 = vpslld_avx2(auVar42,0xf);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpsrld_avx2(auVar42,0x13);
  auVar107 = vpslld_avx2(auVar42,0xd);
  auVar100 = vpor_avx2(auVar107,auVar100);
  auVar110 = vpsrld_avx2(auVar42,10);
  auVar107 = vpsrld_avx2(auVar143,7);
  auVar108 = vpslld_avx2(auVar143,0x19);
  auVar107 = vpor_avx2(auVar108,auVar107);
  auVar108 = vpsrld_avx2(auVar143,0x12);
  auVar31 = vpslld_avx2(auVar143,0xe);
  auVar108 = vpor_avx2(auVar31,auVar108);
  auVar31 = vpsrld_avx2(auVar143,3);
  auVar142 = vpaddd_avx2(auVar108 ^ auVar107 ^ auVar31,auVar142);
  auVar142 = vpaddd_avx2(auVar142,auVar8);
  auVar142 = vpaddd_avx2(auVar142,auVar100 ^ auVar44 ^ auVar110);
  auVar44 = vpsrld_avx2(auVar13,6);
  auVar100 = vpslld_avx2(auVar13,0x1a);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar13,0xb);
  auVar100 = vpslld_avx2(auVar13,0x15);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar13,0x19);
  auVar100 = vpslld_avx2(auVar13,7);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpandn_avx2(auVar13,auVar11);
  auVar44 = vpand_avx2(auVar12,auVar13);
  auVar44 = vpor_avx2(auVar44,auVar100);
  auVar18 = vpaddd_avx2(auVar142,auVar18);
  auVar18 = vpaddd_avx2(auVar44,auVar18);
  auVar117._8_4_ = 0xa2bfe8a1;
  auVar117._0_8_ = 0xa2bfe8a1a2bfe8a1;
  auVar117._12_4_ = 0xa2bfe8a1;
  auVar117._16_4_ = 0xa2bfe8a1;
  auVar117._20_4_ = 0xa2bfe8a1;
  auVar117._24_4_ = 0xa2bfe8a1;
  auVar117._28_4_ = 0xa2bfe8a1;
  auVar18 = vpaddd_avx2(auVar117,auVar18);
  auVar18 = vpaddd_avx2(auVar108 ^ auVar107 ^ auVar110,auVar18);
  auVar44 = vpsrld_avx2(auVar94,2);
  auVar100 = vpslld_avx2(auVar94,0x1e);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar94,0xd);
  auVar100 = vpslld_avx2(auVar94,0x13);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar94,0x16);
  auVar100 = vpslld_avx2(auVar94,10);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpor_avx2(auVar94,auVar34);
  auVar44 = vpand_avx2(auVar44,auVar3);
  auVar100 = vpand_avx2(auVar94,auVar34);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar15 = vpaddd_avx2(auVar18,auVar15);
  auVar18 = vpaddd_avx2(auVar110 ^ auVar108 ^ auVar107,auVar18);
  auVar18 = vpaddd_avx2(auVar44,auVar18);
  auVar44 = vpsrld_avx2(auVar141,0x11);
  auVar100 = vpslld_avx2(auVar141,0xf);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpsrld_avx2(auVar141,0x13);
  auVar107 = vpslld_avx2(auVar141,0xd);
  auVar100 = vpor_avx2(auVar107,auVar100);
  auVar110 = vpsrld_avx2(auVar141,10);
  auVar107 = vpsrld_avx2(auVar95,7);
  auVar108 = vpslld_avx2(auVar95,0x19);
  auVar107 = vpor_avx2(auVar108,auVar107);
  auVar108 = vpsrld_avx2(auVar95,0x12);
  auVar31 = vpslld_avx2(auVar95,0xe);
  auVar108 = vpor_avx2(auVar31,auVar108);
  auVar31 = vpsrld_avx2(auVar95,3);
  auVar143 = vpaddd_avx2(auVar108 ^ auVar107 ^ auVar31,auVar143);
  auVar143 = vpaddd_avx2(auVar143,auVar20);
  auVar143 = vpaddd_avx2(auVar143,auVar100 ^ auVar44 ^ auVar110);
  auVar44 = vpsrld_avx2(auVar15,6);
  auVar100 = vpslld_avx2(auVar15,0x1a);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar15,0xb);
  auVar100 = vpslld_avx2(auVar15,0x15);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar15,0x19);
  auVar100 = vpslld_avx2(auVar15,7);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpandn_avx2(auVar15,auVar12);
  auVar44 = vpand_avx2(auVar13,auVar15);
  auVar44 = vpor_avx2(auVar44,auVar100);
  auVar11 = vpaddd_avx2(auVar143,auVar11);
  auVar11 = vpaddd_avx2(auVar44,auVar11);
  auVar118._8_4_ = 0xa81a664b;
  auVar118._0_8_ = 0xa81a664ba81a664b;
  auVar118._12_4_ = 0xa81a664b;
  auVar118._16_4_ = 0xa81a664b;
  auVar118._20_4_ = 0xa81a664b;
  auVar118._24_4_ = 0xa81a664b;
  auVar118._28_4_ = 0xa81a664b;
  auVar11 = vpaddd_avx2(auVar118,auVar11);
  auVar11 = vpaddd_avx2(auVar108 ^ auVar107 ^ auVar110,auVar11);
  auVar44 = vpsrld_avx2(auVar18,2);
  auVar100 = vpslld_avx2(auVar18,0x1e);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar18,0xd);
  auVar100 = vpslld_avx2(auVar18,0x13);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar18,0x16);
  auVar100 = vpslld_avx2(auVar18,10);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpor_avx2(auVar18,auVar94);
  auVar44 = vpand_avx2(auVar44,auVar34);
  auVar100 = vpand_avx2(auVar18,auVar94);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar3 = vpaddd_avx2(auVar11,auVar3);
  auVar11 = vpaddd_avx2(auVar110 ^ auVar108 ^ auVar107,auVar11);
  auVar11 = vpaddd_avx2(auVar44,auVar11);
  auVar44 = vpsrld_avx2(auVar142,0x11);
  auVar100 = vpslld_avx2(auVar142,0xf);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpsrld_avx2(auVar142,0x13);
  auVar107 = vpslld_avx2(auVar142,0xd);
  auVar100 = vpor_avx2(auVar107,auVar100);
  auVar110 = vpsrld_avx2(auVar142,10);
  auVar107 = vpsrld_avx2(auVar72,7);
  auVar108 = vpslld_avx2(auVar72,0x19);
  auVar107 = vpor_avx2(auVar108,auVar107);
  auVar108 = vpsrld_avx2(auVar72,0x12);
  auVar31 = vpslld_avx2(auVar72,0xe);
  auVar108 = vpor_avx2(auVar31,auVar108);
  auVar31 = vpsrld_avx2(auVar72,3);
  auVar95 = vpaddd_avx2(auVar108 ^ auVar107 ^ auVar31,auVar95);
  auVar95 = vpaddd_avx2(auVar95,auVar38);
  auVar95 = vpaddd_avx2(auVar95,auVar100 ^ auVar44 ^ auVar110);
  auVar44 = vpsrld_avx2(auVar3,6);
  auVar100 = vpslld_avx2(auVar3,0x1a);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar3,0xb);
  auVar100 = vpslld_avx2(auVar3,0x15);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar3,0x19);
  auVar100 = vpslld_avx2(auVar3,7);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpandn_avx2(auVar3,auVar13);
  auVar44 = vpand_avx2(auVar15,auVar3);
  auVar44 = vpor_avx2(auVar44,auVar100);
  auVar12 = vpaddd_avx2(auVar95,auVar12);
  auVar133._8_4_ = 0xc24b8b70;
  auVar133._0_8_ = 0xc24b8b70c24b8b70;
  auVar133._12_4_ = 0xc24b8b70;
  auVar133._16_4_ = 0xc24b8b70;
  auVar133._20_4_ = 0xc24b8b70;
  auVar133._24_4_ = 0xc24b8b70;
  auVar133._28_4_ = 0xc24b8b70;
  auVar12 = vpaddd_avx2(auVar44,auVar12);
  auVar12 = vpaddd_avx2(auVar133,auVar12);
  auVar12 = vpaddd_avx2(auVar108 ^ auVar107 ^ auVar110,auVar12);
  auVar44 = vpsrld_avx2(auVar11,2);
  auVar100 = vpslld_avx2(auVar11,0x1e);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar11,0xd);
  auVar100 = vpslld_avx2(auVar11,0x13);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar11,0x16);
  auVar100 = vpslld_avx2(auVar11,10);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpor_avx2(auVar11,auVar18);
  auVar44 = vpand_avx2(auVar44,auVar94);
  auVar100 = vpand_avx2(auVar11,auVar18);
  auVar44 = vpor_avx2(auVar44,auVar100);
  auVar34 = vpaddd_avx2(auVar34,auVar12);
  auVar12 = vpaddd_avx2(auVar108 ^ auVar107 ^ auVar110,auVar12);
  auVar12 = vpaddd_avx2(auVar44,auVar12);
  auVar44 = vpsrld_avx2(auVar143,0x11);
  auVar100 = vpslld_avx2(auVar143,0xf);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpsrld_avx2(auVar143,0x13);
  auVar107 = vpslld_avx2(auVar143,0xd);
  auVar100 = vpor_avx2(auVar107,auVar100);
  auVar110 = vpsrld_avx2(auVar143,10);
  auVar107 = vpsrld_avx2(auVar74,7);
  auVar108 = vpslld_avx2(auVar74,0x19);
  auVar107 = vpor_avx2(auVar108,auVar107);
  auVar108 = vpsrld_avx2(auVar74,0x12);
  auVar31 = vpslld_avx2(auVar74,0xe);
  auVar108 = vpor_avx2(auVar31,auVar108);
  auVar31 = vpsrld_avx2(auVar74,3);
  auVar72 = vpaddd_avx2(auVar108 ^ auVar107 ^ auVar31,auVar72);
  auVar72 = vpaddd_avx2(auVar72,auVar39);
  auVar72 = vpaddd_avx2(auVar72,auVar110 ^ auVar100 ^ auVar44);
  auVar44 = vpsrld_avx2(auVar34,6);
  auVar100 = vpslld_avx2(auVar34,0x1a);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar34,0xb);
  auVar100 = vpslld_avx2(auVar34,0x15);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar34,0x19);
  auVar100 = vpslld_avx2(auVar34,7);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpandn_avx2(auVar34,auVar15);
  auVar44 = vpand_avx2(auVar34,auVar3);
  auVar44 = vpor_avx2(auVar44,auVar100);
  auVar13 = vpaddd_avx2(auVar72,auVar13);
  auVar13 = vpaddd_avx2(auVar44,auVar13);
  auVar119._8_4_ = 0xc76c51a3;
  auVar119._0_8_ = 0xc76c51a3c76c51a3;
  auVar119._12_4_ = 0xc76c51a3;
  auVar119._16_4_ = 0xc76c51a3;
  auVar119._20_4_ = 0xc76c51a3;
  auVar119._24_4_ = 0xc76c51a3;
  auVar119._28_4_ = 0xc76c51a3;
  auVar13 = vpaddd_avx2(auVar119,auVar13);
  auVar13 = vpaddd_avx2(auVar13,auVar110 ^ auVar108 ^ auVar107);
  auVar44 = vpsrld_avx2(auVar12,2);
  auVar100 = vpslld_avx2(auVar12,0x1e);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar12,0xd);
  auVar100 = vpslld_avx2(auVar12,0x13);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar12,0x16);
  auVar100 = vpslld_avx2(auVar12,10);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpor_avx2(auVar12,auVar11);
  auVar44 = vpand_avx2(auVar44,auVar18);
  auVar100 = vpand_avx2(auVar12,auVar11);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar94 = vpaddd_avx2(auVar94,auVar13);
  auVar13 = vpaddd_avx2(auVar110 ^ auVar108 ^ auVar107,auVar13);
  auVar13 = vpaddd_avx2(auVar44,auVar13);
  auVar44 = vpsrld_avx2(auVar95,0x11);
  auVar100 = vpslld_avx2(auVar95,0xf);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpsrld_avx2(auVar95,0x13);
  auVar107 = vpslld_avx2(auVar95,0xd);
  auVar100 = vpor_avx2(auVar107,auVar100);
  auVar110 = vpsrld_avx2(auVar95,10);
  auVar107 = vpsrld_avx2(auVar6,7);
  auVar108 = vpslld_avx2(auVar6,0x19);
  auVar107 = vpor_avx2(auVar108,auVar107);
  auVar108 = vpsrld_avx2(auVar6,0x12);
  auVar31 = vpslld_avx2(auVar6,0xe);
  auVar108 = vpor_avx2(auVar31,auVar108);
  auVar31 = vpsrld_avx2(auVar6,3);
  auVar74 = vpaddd_avx2(auVar108 ^ auVar107 ^ auVar31,auVar74);
  auVar74 = vpaddd_avx2(auVar74,auVar70);
  auVar74 = vpaddd_avx2(auVar74,auVar110 ^ auVar100 ^ auVar44);
  auVar44 = vpsrld_avx2(auVar94,6);
  auVar100 = vpslld_avx2(auVar94,0x1a);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar94,0xb);
  auVar100 = vpslld_avx2(auVar94,0x15);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar94,0x19);
  auVar100 = vpslld_avx2(auVar94,7);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpandn_avx2(auVar94,auVar3);
  auVar44 = vpand_avx2(auVar34,auVar94);
  auVar44 = vpor_avx2(auVar44,auVar100);
  auVar15 = vpaddd_avx2(auVar74,auVar15);
  auVar15 = vpaddd_avx2(auVar44,auVar15);
  auVar120._8_4_ = 0xd192e819;
  auVar120._0_8_ = 0xd192e819d192e819;
  auVar120._12_4_ = 0xd192e819;
  auVar120._16_4_ = 0xd192e819;
  auVar120._20_4_ = 0xd192e819;
  auVar120._24_4_ = 0xd192e819;
  auVar120._28_4_ = 0xd192e819;
  auVar15 = vpaddd_avx2(auVar120,auVar15);
  auVar15 = vpaddd_avx2(auVar15,auVar110 ^ auVar108 ^ auVar107);
  auVar44 = vpsrld_avx2(auVar13,2);
  auVar100 = vpslld_avx2(auVar13,0x1e);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar13,0xd);
  auVar100 = vpslld_avx2(auVar13,0x13);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar13,0x16);
  auVar100 = vpslld_avx2(auVar13,10);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpor_avx2(auVar13,auVar12);
  auVar44 = vpand_avx2(auVar44,auVar11);
  auVar100 = vpand_avx2(auVar13,auVar12);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar18 = vpaddd_avx2(auVar18,auVar15);
  auVar15 = vpaddd_avx2(auVar110 ^ auVar108 ^ auVar107,auVar15);
  auVar15 = vpaddd_avx2(auVar44,auVar15);
  auVar44 = vpsrld_avx2(auVar72,0x11);
  auVar100 = vpslld_avx2(auVar72,0xf);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpsrld_avx2(auVar72,0x13);
  auVar107 = vpslld_avx2(auVar72,0xd);
  auVar100 = vpor_avx2(auVar107,auVar100);
  auVar110 = vpsrld_avx2(auVar72,10);
  auVar107 = vpsrld_avx2(auVar7,7);
  auVar108 = vpslld_avx2(auVar7,0x19);
  auVar107 = vpor_avx2(auVar108,auVar107);
  auVar108 = vpsrld_avx2(auVar7,0x12);
  auVar31 = vpslld_avx2(auVar7,0xe);
  auVar108 = vpor_avx2(auVar31,auVar108);
  auVar31 = vpsrld_avx2(auVar7,3);
  auVar6 = vpaddd_avx2(auVar108 ^ auVar107 ^ auVar31,auVar6);
  auVar6 = vpaddd_avx2(auVar6,auVar42);
  auVar6 = vpaddd_avx2(auVar6,auVar110 ^ auVar100 ^ auVar44);
  auVar44 = vpsrld_avx2(auVar18,6);
  auVar100 = vpslld_avx2(auVar18,0x1a);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar18,0xb);
  auVar100 = vpslld_avx2(auVar18,0x15);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar18,0x19);
  auVar100 = vpslld_avx2(auVar18,7);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpandn_avx2(auVar18,auVar34);
  auVar44 = vpand_avx2(auVar94,auVar18);
  auVar44 = vpor_avx2(auVar44,auVar100);
  auVar3 = vpaddd_avx2(auVar6,auVar3);
  auVar3 = vpaddd_avx2(auVar44,auVar3);
  auVar121._8_4_ = 0xd6990624;
  auVar121._0_8_ = 0xd6990624d6990624;
  auVar121._12_4_ = 0xd6990624;
  auVar121._16_4_ = 0xd6990624;
  auVar121._20_4_ = 0xd6990624;
  auVar121._24_4_ = 0xd6990624;
  auVar121._28_4_ = 0xd6990624;
  auVar3 = vpaddd_avx2(auVar121,auVar3);
  auVar3 = vpaddd_avx2(auVar3,auVar110 ^ auVar108 ^ auVar107);
  auVar44 = vpsrld_avx2(auVar15,2);
  auVar100 = vpslld_avx2(auVar15,0x1e);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar15,0xd);
  auVar100 = vpslld_avx2(auVar15,0x13);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar15,0x16);
  auVar100 = vpslld_avx2(auVar15,10);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpor_avx2(auVar15,auVar13);
  auVar44 = vpand_avx2(auVar44,auVar12);
  auVar100 = vpand_avx2(auVar15,auVar13);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar11 = vpaddd_avx2(auVar11,auVar3);
  auVar3 = vpaddd_avx2(auVar110 ^ auVar108 ^ auVar107,auVar3);
  auVar3 = vpaddd_avx2(auVar44,auVar3);
  auVar44 = vpsrld_avx2(auVar74,0x11);
  auVar100 = vpslld_avx2(auVar74,0xf);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpsrld_avx2(auVar74,0x13);
  auVar107 = vpslld_avx2(auVar74,0xd);
  auVar100 = vpor_avx2(auVar107,auVar100);
  auVar110 = vpsrld_avx2(auVar74,10);
  auVar107 = vpsrld_avx2(auVar33,7);
  auVar108 = vpslld_avx2(auVar33,0x19);
  auVar107 = vpor_avx2(auVar108,auVar107);
  auVar108 = vpsrld_avx2(auVar33,0x12);
  auVar31 = vpslld_avx2(auVar33,0xe);
  auVar108 = vpor_avx2(auVar31,auVar108);
  auVar31 = vpsrld_avx2(auVar33,3);
  auVar7 = vpaddd_avx2(auVar108 ^ auVar107 ^ auVar31,auVar7);
  auVar7 = vpaddd_avx2(auVar7,auVar141);
  auVar7 = vpaddd_avx2(auVar7,auVar110 ^ auVar100 ^ auVar44);
  auVar44 = vpsrld_avx2(auVar11,6);
  auVar100 = vpslld_avx2(auVar11,0x1a);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar11,0xb);
  auVar100 = vpslld_avx2(auVar11,0x15);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar11,0x19);
  auVar100 = vpslld_avx2(auVar11,7);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpandn_avx2(auVar11,auVar94);
  auVar44 = vpand_avx2(auVar18,auVar11);
  auVar44 = vpor_avx2(auVar44,auVar100);
  auVar34 = vpaddd_avx2(auVar7,auVar34);
  auVar134._8_4_ = 0xf40e3585;
  auVar134._0_8_ = 0xf40e3585f40e3585;
  auVar134._12_4_ = 0xf40e3585;
  auVar134._16_4_ = 0xf40e3585;
  auVar134._20_4_ = 0xf40e3585;
  auVar134._24_4_ = 0xf40e3585;
  auVar134._28_4_ = 0xf40e3585;
  auVar34 = vpaddd_avx2(auVar34,auVar44);
  auVar34 = vpaddd_avx2(auVar34,auVar134);
  auVar34 = vpaddd_avx2(auVar34,auVar110 ^ auVar108 ^ auVar107);
  auVar44 = vpsrld_avx2(auVar3,2);
  auVar100 = vpslld_avx2(auVar3,0x1e);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar3,0xd);
  auVar100 = vpslld_avx2(auVar3,0x13);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar3,0x16);
  auVar100 = vpslld_avx2(auVar3,10);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpor_avx2(auVar3,auVar15);
  auVar44 = vpand_avx2(auVar44,auVar13);
  auVar100 = vpand_avx2(auVar3,auVar15);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar12 = vpaddd_avx2(auVar34,auVar12);
  auVar34 = vpaddd_avx2(auVar110 ^ auVar108 ^ auVar107,auVar34);
  auVar34 = vpaddd_avx2(auVar44,auVar34);
  auVar44 = vpsrld_avx2(auVar6,0x11);
  auVar100 = vpslld_avx2(auVar6,0xf);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpsrld_avx2(auVar6,0x13);
  auVar107 = vpslld_avx2(auVar6,0xd);
  auVar100 = vpor_avx2(auVar107,auVar100);
  auVar110 = vpsrld_avx2(auVar6,10);
  auVar107 = vpsrld_avx2(auVar19,7);
  auVar108 = vpslld_avx2(auVar19,0x19);
  auVar107 = vpor_avx2(auVar108,auVar107);
  auVar108 = vpsrld_avx2(auVar19,0x12);
  auVar31 = vpslld_avx2(auVar19,0xe);
  auVar108 = vpor_avx2(auVar31,auVar108);
  auVar31 = vpsrld_avx2(auVar19,3);
  auVar33 = vpaddd_avx2(auVar108 ^ auVar107 ^ auVar31,auVar33);
  auVar33 = vpaddd_avx2(auVar33,auVar142);
  auVar33 = vpaddd_avx2(auVar33,auVar100 ^ auVar44 ^ auVar110);
  auVar44 = vpsrld_avx2(auVar12,6);
  auVar100 = vpslld_avx2(auVar12,0x1a);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar12,0xb);
  auVar100 = vpslld_avx2(auVar12,0x15);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar12,0x19);
  auVar100 = vpslld_avx2(auVar12,7);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpandn_avx2(auVar12,auVar18);
  auVar44 = vpand_avx2(auVar11,auVar12);
  auVar44 = vpor_avx2(auVar44,auVar100);
  auVar94 = vpaddd_avx2(auVar33,auVar94);
  auVar94 = vpaddd_avx2(auVar44,auVar94);
  auVar122._8_4_ = 0x106aa070;
  auVar122._0_8_ = 0x106aa070106aa070;
  auVar122._12_4_ = 0x106aa070;
  auVar122._16_4_ = 0x106aa070;
  auVar122._20_4_ = 0x106aa070;
  auVar122._24_4_ = 0x106aa070;
  auVar122._28_4_ = 0x106aa070;
  auVar94 = vpaddd_avx2(auVar122,auVar94);
  auVar94 = vpaddd_avx2(auVar108 ^ auVar107 ^ auVar110,auVar94);
  auVar44 = vpsrld_avx2(auVar34,2);
  auVar100 = vpslld_avx2(auVar34,0x1e);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar34,0xd);
  auVar100 = vpslld_avx2(auVar34,0x13);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar34,0x16);
  auVar100 = vpslld_avx2(auVar34,10);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpor_avx2(auVar34,auVar3);
  auVar44 = vpand_avx2(auVar44,auVar15);
  auVar100 = vpand_avx2(auVar34,auVar3);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar13 = vpaddd_avx2(auVar94,auVar13);
  auVar94 = vpaddd_avx2(auVar110 ^ auVar108 ^ auVar107,auVar94);
  auVar94 = vpaddd_avx2(auVar44,auVar94);
  auVar44 = vpsrld_avx2(auVar7,0x11);
  auVar100 = vpslld_avx2(auVar7,0xf);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpsrld_avx2(auVar7,0x13);
  auVar107 = vpslld_avx2(auVar7,0xd);
  auVar100 = vpor_avx2(auVar107,auVar100);
  auVar110 = vpsrld_avx2(auVar7,10);
  auVar107 = vpsrld_avx2(auVar8,7);
  auVar108 = vpslld_avx2(auVar8,0x19);
  auVar107 = vpor_avx2(auVar108,auVar107);
  auVar108 = vpsrld_avx2(auVar8,0x12);
  auVar31 = vpslld_avx2(auVar8,0xe);
  auVar108 = vpor_avx2(auVar31,auVar108);
  auVar31 = vpsrld_avx2(auVar8,3);
  auVar19 = vpaddd_avx2(auVar108 ^ auVar107 ^ auVar31,auVar19);
  auVar19 = vpaddd_avx2(auVar19,auVar143);
  auVar19 = vpaddd_avx2(auVar19,auVar100 ^ auVar44 ^ auVar110);
  auVar44 = vpsrld_avx2(auVar13,6);
  auVar100 = vpslld_avx2(auVar13,0x1a);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar13,0xb);
  auVar100 = vpslld_avx2(auVar13,0x15);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar13,0x19);
  auVar100 = vpslld_avx2(auVar13,7);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpandn_avx2(auVar13,auVar11);
  auVar44 = vpand_avx2(auVar12,auVar13);
  auVar44 = vpor_avx2(auVar44,auVar100);
  auVar18 = vpaddd_avx2(auVar19,auVar18);
  auVar18 = vpaddd_avx2(auVar44,auVar18);
  auVar123._8_4_ = 0x19a4c116;
  auVar123._0_8_ = 0x19a4c11619a4c116;
  auVar123._12_4_ = 0x19a4c116;
  auVar123._16_4_ = 0x19a4c116;
  auVar123._20_4_ = 0x19a4c116;
  auVar123._24_4_ = 0x19a4c116;
  auVar123._28_4_ = 0x19a4c116;
  auVar18 = vpaddd_avx2(auVar123,auVar18);
  auVar18 = vpaddd_avx2(auVar108 ^ auVar107 ^ auVar110,auVar18);
  auVar44 = vpsrld_avx2(auVar94,2);
  auVar100 = vpslld_avx2(auVar94,0x1e);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar94,0xd);
  auVar100 = vpslld_avx2(auVar94,0x13);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar94,0x16);
  auVar100 = vpslld_avx2(auVar94,10);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpor_avx2(auVar94,auVar34);
  auVar44 = vpand_avx2(auVar44,auVar3);
  auVar100 = vpand_avx2(auVar94,auVar34);
  auVar44 = vpor_avx2(auVar44,auVar100);
  auVar15 = vpaddd_avx2(auVar15,auVar18);
  auVar18 = vpaddd_avx2(auVar108 ^ auVar107 ^ auVar110,auVar18);
  auVar18 = vpaddd_avx2(auVar44,auVar18);
  auVar44 = vpsrld_avx2(auVar33,0x11);
  auVar100 = vpslld_avx2(auVar33,0xf);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpsrld_avx2(auVar33,0x13);
  auVar107 = vpslld_avx2(auVar33,0xd);
  auVar100 = vpor_avx2(auVar107,auVar100);
  auVar110 = vpsrld_avx2(auVar33,10);
  auVar107 = vpsrld_avx2(auVar20,7);
  auVar108 = vpslld_avx2(auVar20,0x19);
  auVar107 = vpor_avx2(auVar108,auVar107);
  auVar108 = vpsrld_avx2(auVar20,0x12);
  auVar31 = vpslld_avx2(auVar20,0xe);
  auVar108 = vpor_avx2(auVar31,auVar108);
  auVar31 = vpsrld_avx2(auVar20,3);
  auVar8 = vpaddd_avx2(auVar108 ^ auVar107 ^ auVar31,auVar8);
  auVar8 = vpaddd_avx2(auVar8,auVar95);
  auVar8 = vpaddd_avx2(auVar8,auVar110 ^ auVar100 ^ auVar44);
  auVar44 = vpsrld_avx2(auVar15,6);
  auVar100 = vpslld_avx2(auVar15,0x1a);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar15,0xb);
  auVar100 = vpslld_avx2(auVar15,0x15);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar15,0x19);
  auVar100 = vpslld_avx2(auVar15,7);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpandn_avx2(auVar15,auVar12);
  auVar44 = vpand_avx2(auVar15,auVar13);
  auVar44 = vpor_avx2(auVar44,auVar100);
  auVar11 = vpaddd_avx2(auVar8,auVar11);
  auVar11 = vpaddd_avx2(auVar44,auVar11);
  auVar102._8_4_ = 0x1e376c08;
  auVar102._0_8_ = 0x1e376c081e376c08;
  auVar102._12_4_ = 0x1e376c08;
  auVar102._16_4_ = 0x1e376c08;
  auVar102._20_4_ = 0x1e376c08;
  auVar102._24_4_ = 0x1e376c08;
  auVar102._28_4_ = 0x1e376c08;
  auVar11 = vpaddd_avx2(auVar102,auVar11);
  auVar11 = vpaddd_avx2(auVar11,auVar110 ^ auVar108 ^ auVar107);
  auVar44 = vpsrld_avx2(auVar18,2);
  auVar100 = vpslld_avx2(auVar18,0x1e);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar18,0xd);
  auVar100 = vpslld_avx2(auVar18,0x13);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar18,0x16);
  auVar100 = vpslld_avx2(auVar18,10);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpor_avx2(auVar18,auVar94);
  auVar44 = vpand_avx2(auVar44,auVar34);
  auVar100 = vpand_avx2(auVar18,auVar94);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar3 = vpaddd_avx2(auVar3,auVar11);
  auVar11 = vpaddd_avx2(auVar110 ^ auVar108 ^ auVar107,auVar11);
  auVar11 = vpaddd_avx2(auVar44,auVar11);
  auVar44 = vpsrld_avx2(auVar19,0x11);
  auVar100 = vpslld_avx2(auVar19,0xf);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpsrld_avx2(auVar19,0x13);
  auVar107 = vpslld_avx2(auVar19,0xd);
  auVar100 = vpor_avx2(auVar107,auVar100);
  auVar110 = vpsrld_avx2(auVar19,10);
  auVar107 = vpsrld_avx2(auVar38,7);
  auVar108 = vpslld_avx2(auVar38,0x19);
  auVar107 = vpor_avx2(auVar108,auVar107);
  auVar108 = vpsrld_avx2(auVar38,0x12);
  auVar31 = vpslld_avx2(auVar38,0xe);
  auVar108 = vpor_avx2(auVar31,auVar108);
  auVar31 = vpsrld_avx2(auVar38,3);
  auVar20 = vpaddd_avx2(auVar108 ^ auVar107 ^ auVar31,auVar20);
  auVar20 = vpaddd_avx2(auVar20,auVar72);
  auVar20 = vpaddd_avx2(auVar20,auVar110 ^ auVar100 ^ auVar44);
  auVar44 = vpsrld_avx2(auVar3,6);
  auVar100 = vpslld_avx2(auVar3,0x1a);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar3,0xb);
  auVar100 = vpslld_avx2(auVar3,0x15);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar3,0x19);
  auVar100 = vpslld_avx2(auVar3,7);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpandn_avx2(auVar3,auVar13);
  auVar44 = vpand_avx2(auVar15,auVar3);
  auVar44 = vpor_avx2(auVar44,auVar100);
  auVar12 = vpaddd_avx2(auVar20,auVar12);
  auVar124._8_4_ = 0x2748774c;
  auVar124._0_8_ = 0x2748774c2748774c;
  auVar124._12_4_ = 0x2748774c;
  auVar124._16_4_ = 0x2748774c;
  auVar124._20_4_ = 0x2748774c;
  auVar124._24_4_ = 0x2748774c;
  auVar124._28_4_ = 0x2748774c;
  auVar12 = vpaddd_avx2(auVar44,auVar12);
  auVar12 = vpaddd_avx2(auVar124,auVar12);
  auVar12 = vpaddd_avx2(auVar12,auVar110 ^ auVar108 ^ auVar107);
  auVar44 = vpsrld_avx2(auVar11,2);
  auVar100 = vpslld_avx2(auVar11,0x1e);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar11,0xd);
  auVar100 = vpslld_avx2(auVar11,0x13);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar11,0x16);
  auVar100 = vpslld_avx2(auVar11,10);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpor_avx2(auVar11,auVar18);
  auVar44 = vpand_avx2(auVar44,auVar94);
  auVar100 = vpand_avx2(auVar11,auVar18);
  auVar44 = vpor_avx2(auVar44,auVar100);
  auVar34 = vpaddd_avx2(auVar34,auVar12);
  auVar12 = vpaddd_avx2(auVar110 ^ auVar108 ^ auVar107,auVar12);
  auVar12 = vpaddd_avx2(auVar44,auVar12);
  auVar44 = vpsrld_avx2(auVar8,0x11);
  auVar100 = vpslld_avx2(auVar8,0xf);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpsrld_avx2(auVar8,0x13);
  auVar107 = vpslld_avx2(auVar8,0xd);
  auVar100 = vpor_avx2(auVar107,auVar100);
  auVar110 = vpsrld_avx2(auVar8,10);
  auVar107 = vpsrld_avx2(auVar39,7);
  auVar108 = vpslld_avx2(auVar39,0x19);
  auVar107 = vpor_avx2(auVar108,auVar107);
  auVar108 = vpsrld_avx2(auVar39,0x12);
  auVar31 = vpslld_avx2(auVar39,0xe);
  auVar108 = vpor_avx2(auVar31,auVar108);
  auVar31 = vpsrld_avx2(auVar39,3);
  auVar38 = vpaddd_avx2(auVar38,auVar31 ^ auVar108 ^ auVar107);
  auVar38 = vpaddd_avx2(auVar38,auVar74);
  auVar38 = vpaddd_avx2(auVar38,auVar100 ^ auVar44 ^ auVar110);
  auVar44 = vpsrld_avx2(auVar34,6);
  auVar100 = vpslld_avx2(auVar34,0x1a);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar34,0xb);
  auVar100 = vpslld_avx2(auVar34,0x15);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar34,0x19);
  auVar100 = vpslld_avx2(auVar34,7);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpandn_avx2(auVar34,auVar15);
  auVar44 = vpand_avx2(auVar34,auVar3);
  auVar44 = vpor_avx2(auVar44,auVar100);
  auVar13 = vpaddd_avx2(auVar38,auVar13);
  auVar13 = vpaddd_avx2(auVar13,auVar44);
  auVar97._8_4_ = 0x34b0bcb5;
  auVar97._0_8_ = 0x34b0bcb534b0bcb5;
  auVar97._12_4_ = 0x34b0bcb5;
  auVar97._16_4_ = 0x34b0bcb5;
  auVar97._20_4_ = 0x34b0bcb5;
  auVar97._24_4_ = 0x34b0bcb5;
  auVar97._28_4_ = 0x34b0bcb5;
  auVar13 = vpaddd_avx2(auVar13,auVar97);
  auVar13 = vpaddd_avx2(auVar13,auVar108 ^ auVar107 ^ auVar110);
  auVar44 = vpsrld_avx2(auVar12,2);
  auVar100 = vpslld_avx2(auVar12,0x1e);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar12,0xd);
  auVar100 = vpslld_avx2(auVar12,0x13);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar12,0x16);
  auVar100 = vpslld_avx2(auVar12,10);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpor_avx2(auVar12,auVar11);
  auVar44 = vpand_avx2(auVar44,auVar18);
  auVar100 = vpand_avx2(auVar12,auVar11);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar94 = vpaddd_avx2(auVar94,auVar13);
  auVar13 = vpaddd_avx2(auVar108 ^ auVar107 ^ auVar110,auVar13);
  auVar13 = vpaddd_avx2(auVar13,auVar44);
  auVar44 = vpsrld_avx2(auVar20,0x11);
  auVar100 = vpslld_avx2(auVar20,0xf);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpsrld_avx2(auVar20,0x13);
  auVar107 = vpslld_avx2(auVar20,0xd);
  auVar100 = vpor_avx2(auVar107,auVar100);
  auVar110 = vpsrld_avx2(auVar20,10);
  auVar107 = vpsrld_avx2(auVar70,7);
  auVar108 = vpslld_avx2(auVar70,0x19);
  auVar107 = vpor_avx2(auVar108,auVar107);
  auVar108 = vpsrld_avx2(auVar70,0x12);
  auVar31 = vpslld_avx2(auVar70,0xe);
  auVar108 = vpor_avx2(auVar31,auVar108);
  auVar31 = vpsrld_avx2(auVar70,3);
  auVar39 = vpaddd_avx2(auVar39,auVar108 ^ auVar107 ^ auVar31);
  auVar39 = vpaddd_avx2(auVar39,auVar6);
  auVar39 = vpaddd_avx2(auVar39,auVar100 ^ auVar44 ^ auVar110);
  auVar44 = vpsrld_avx2(auVar94,6);
  auVar100 = vpslld_avx2(auVar94,0x1a);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar94,0xb);
  auVar100 = vpslld_avx2(auVar94,0x15);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar94,0x19);
  auVar100 = vpslld_avx2(auVar94,7);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpandn_avx2(auVar94,auVar3);
  auVar44 = vpand_avx2(auVar34,auVar94);
  auVar44 = vpor_avx2(auVar44,auVar100);
  auVar15 = vpaddd_avx2(auVar39,auVar15);
  auVar15 = vpaddd_avx2(auVar15,auVar44);
  auVar98._8_4_ = 0x391c0cb3;
  auVar98._0_8_ = 0x391c0cb3391c0cb3;
  auVar98._12_4_ = 0x391c0cb3;
  auVar98._16_4_ = 0x391c0cb3;
  auVar98._20_4_ = 0x391c0cb3;
  auVar98._24_4_ = 0x391c0cb3;
  auVar98._28_4_ = 0x391c0cb3;
  auVar15 = vpaddd_avx2(auVar15,auVar98);
  auVar15 = vpaddd_avx2(auVar15,auVar108 ^ auVar107 ^ auVar110);
  auVar44 = vpsrld_avx2(auVar13,2);
  auVar100 = vpslld_avx2(auVar13,0x1e);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar13,0xd);
  auVar100 = vpslld_avx2(auVar13,0x13);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar13,0x16);
  auVar100 = vpslld_avx2(auVar13,10);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpor_avx2(auVar13,auVar12);
  auVar44 = vpand_avx2(auVar44,auVar11);
  auVar100 = vpand_avx2(auVar13,auVar12);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar18 = vpaddd_avx2(auVar18,auVar15);
  auVar15 = vpaddd_avx2(auVar108 ^ auVar107 ^ auVar110,auVar15);
  auVar15 = vpaddd_avx2(auVar44,auVar15);
  auVar44 = vpsrld_avx2(auVar38,0x11);
  auVar100 = vpslld_avx2(auVar38,0xf);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpsrld_avx2(auVar38,0x13);
  auVar107 = vpslld_avx2(auVar38,0xd);
  auVar100 = vpor_avx2(auVar107,auVar100);
  auVar110 = vpsrld_avx2(auVar38,10);
  auVar107 = vpsrld_avx2(auVar42,7);
  auVar108 = vpslld_avx2(auVar42,0x19);
  auVar107 = vpor_avx2(auVar108,auVar107);
  auVar108 = vpsrld_avx2(auVar42,0x12);
  auVar31 = vpslld_avx2(auVar42,0xe);
  auVar108 = vpor_avx2(auVar31,auVar108);
  auVar31 = vpsrld_avx2(auVar42,3);
  auVar70 = vpaddd_avx2(auVar70,auVar31 ^ auVar108 ^ auVar107);
  auVar70 = vpaddd_avx2(auVar70,auVar7);
  auVar70 = vpaddd_avx2(auVar70,auVar100 ^ auVar44 ^ auVar110);
  auVar44 = vpsrld_avx2(auVar18,6);
  auVar100 = vpslld_avx2(auVar18,0x1a);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar18,0xb);
  auVar100 = vpslld_avx2(auVar18,0x15);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar18,0x19);
  auVar100 = vpslld_avx2(auVar18,7);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpandn_avx2(auVar18,auVar34);
  auVar44 = vpand_avx2(auVar94,auVar18);
  auVar44 = vpor_avx2(auVar44,auVar100);
  auVar3 = vpaddd_avx2(auVar70,auVar3);
  auVar3 = vpaddd_avx2(auVar3,auVar44);
  auVar99._8_4_ = 0x4ed8aa4a;
  auVar99._0_8_ = 0x4ed8aa4a4ed8aa4a;
  auVar99._12_4_ = 0x4ed8aa4a;
  auVar99._16_4_ = 0x4ed8aa4a;
  auVar99._20_4_ = 0x4ed8aa4a;
  auVar99._24_4_ = 0x4ed8aa4a;
  auVar99._28_4_ = 0x4ed8aa4a;
  auVar3 = vpaddd_avx2(auVar3,auVar99);
  auVar3 = vpaddd_avx2(auVar3,auVar108 ^ auVar107 ^ auVar110);
  auVar44 = vpsrld_avx2(auVar15,2);
  auVar100 = vpslld_avx2(auVar15,0x1e);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar15,0xd);
  auVar100 = vpslld_avx2(auVar15,0x13);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar15,0x16);
  auVar100 = vpslld_avx2(auVar15,10);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpor_avx2(auVar15,auVar13);
  auVar44 = vpand_avx2(auVar44,auVar12);
  auVar100 = vpand_avx2(auVar15,auVar13);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar11 = vpaddd_avx2(auVar11,auVar3);
  auVar3 = vpaddd_avx2(auVar108 ^ auVar107 ^ auVar110,auVar3);
  auVar3 = vpaddd_avx2(auVar44,auVar3);
  auVar44 = vpsrld_avx2(auVar39,0x11);
  auVar100 = vpslld_avx2(auVar39,0xf);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpsrld_avx2(auVar39,0x13);
  auVar107 = vpslld_avx2(auVar39,0xd);
  auVar100 = vpor_avx2(auVar107,auVar100);
  auVar110 = vpsrld_avx2(auVar39,10);
  auVar107 = vpsrld_avx2(auVar141,7);
  auVar108 = vpslld_avx2(auVar141,0x19);
  auVar107 = vpor_avx2(auVar108,auVar107);
  auVar31 = vpsrld_avx2(auVar141,0x12);
  auVar108 = vpslld_avx2(auVar141,0xe);
  auVar108 = vpor_avx2(auVar108,auVar31);
  auVar31 = vpsrld_avx2(auVar141,3);
  auVar42 = vpaddd_avx2(auVar42,auVar31 ^ auVar108 ^ auVar107);
  auVar42 = vpaddd_avx2(auVar42,auVar33);
  auVar42 = vpaddd_avx2(auVar42,auVar100 ^ auVar44 ^ auVar110);
  auVar44 = vpsrld_avx2(auVar11,6);
  auVar100 = vpslld_avx2(auVar11,0x1a);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar11,0xb);
  auVar100 = vpslld_avx2(auVar11,0x15);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar11,0x19);
  auVar100 = vpslld_avx2(auVar11,7);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpandn_avx2(auVar11,auVar94);
  auVar44 = vpand_avx2(auVar18,auVar11);
  auVar44 = vpor_avx2(auVar44,auVar100);
  auVar34 = vpaddd_avx2(auVar42,auVar34);
  auVar135._8_4_ = 0x5b9cca4f;
  auVar135._0_8_ = 0x5b9cca4f5b9cca4f;
  auVar135._12_4_ = 0x5b9cca4f;
  auVar135._16_4_ = 0x5b9cca4f;
  auVar135._20_4_ = 0x5b9cca4f;
  auVar135._24_4_ = 0x5b9cca4f;
  auVar135._28_4_ = 0x5b9cca4f;
  auVar34 = vpaddd_avx2(auVar34,auVar44);
  auVar34 = vpaddd_avx2(auVar135,auVar34);
  auVar34 = vpaddd_avx2(auVar34,auVar108 ^ auVar107 ^ auVar110);
  auVar44 = vpsrld_avx2(auVar3,2);
  auVar100 = vpslld_avx2(auVar3,0x1e);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar3,0xd);
  auVar100 = vpslld_avx2(auVar3,0x13);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar3,0x16);
  auVar100 = vpslld_avx2(auVar3,10);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpor_avx2(auVar3,auVar15);
  auVar44 = vpand_avx2(auVar44,auVar13);
  auVar100 = vpand_avx2(auVar3,auVar15);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar12 = vpaddd_avx2(auVar12,auVar34);
  auVar34 = vpaddd_avx2(auVar110 ^ auVar108 ^ auVar107,auVar34);
  auVar34 = vpaddd_avx2(auVar44,auVar34);
  auVar44 = vpsrld_avx2(auVar70,0x11);
  auVar100 = vpslld_avx2(auVar70,0xf);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpsrld_avx2(auVar70,0x13);
  auVar107 = vpslld_avx2(auVar70,0xd);
  auVar100 = vpor_avx2(auVar107,auVar100);
  auVar110 = vpsrld_avx2(auVar70,10);
  auVar107 = vpsrld_avx2(auVar142,7);
  auVar108 = vpslld_avx2(auVar142,0x19);
  auVar107 = vpor_avx2(auVar108,auVar107);
  auVar31 = vpsrld_avx2(auVar142,0x12);
  auVar108 = vpslld_avx2(auVar142,0xe);
  auVar108 = vpor_avx2(auVar108,auVar31);
  auVar31 = vpsrld_avx2(auVar142,3);
  auVar141 = vpaddd_avx2(auVar108 ^ auVar107 ^ auVar31,auVar141);
  auVar141 = vpaddd_avx2(auVar141,auVar19);
  auVar141 = vpaddd_avx2(auVar141,auVar110 ^ auVar100 ^ auVar44);
  auVar44 = vpsrld_avx2(auVar12,6);
  auVar100 = vpslld_avx2(auVar12,0x1a);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar12,0xb);
  auVar100 = vpslld_avx2(auVar12,0x15);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar12,0x19);
  auVar100 = vpslld_avx2(auVar12,7);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpandn_avx2(auVar12,auVar18);
  auVar44 = vpand_avx2(auVar11,auVar12);
  auVar44 = vpor_avx2(auVar44,auVar100);
  auVar94 = vpaddd_avx2(auVar141,auVar94);
  auVar94 = vpaddd_avx2(auVar94,auVar44);
  auVar125._8_4_ = 0x682e6ff3;
  auVar125._0_8_ = 0x682e6ff3682e6ff3;
  auVar125._12_4_ = 0x682e6ff3;
  auVar125._16_4_ = 0x682e6ff3;
  auVar125._20_4_ = 0x682e6ff3;
  auVar125._24_4_ = 0x682e6ff3;
  auVar125._28_4_ = 0x682e6ff3;
  auVar94 = vpaddd_avx2(auVar94,auVar125);
  auVar94 = vpaddd_avx2(auVar94,auVar110 ^ auVar108 ^ auVar107);
  auVar44 = vpsrld_avx2(auVar34,2);
  auVar100 = vpslld_avx2(auVar34,0x1e);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar34,0xd);
  auVar100 = vpslld_avx2(auVar34,0x13);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar34,0x16);
  auVar100 = vpslld_avx2(auVar34,10);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpor_avx2(auVar34,auVar3);
  auVar44 = vpand_avx2(auVar44,auVar15);
  auVar100 = vpand_avx2(auVar34,auVar3);
  auVar44 = vpor_avx2(auVar44,auVar100);
  auVar13 = vpaddd_avx2(auVar13,auVar94);
  auVar94 = vpaddd_avx2(auVar108 ^ auVar107 ^ auVar110,auVar94);
  auVar94 = vpaddd_avx2(auVar44,auVar94);
  auVar44 = vpsrld_avx2(auVar42,0x11);
  auVar100 = vpslld_avx2(auVar42,0xf);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpsrld_avx2(auVar42,0x13);
  auVar107 = vpslld_avx2(auVar42,0xd);
  auVar100 = vpor_avx2(auVar107,auVar100);
  auVar110 = vpsrld_avx2(auVar42,10);
  auVar107 = vpsrld_avx2(auVar143,7);
  auVar108 = vpslld_avx2(auVar143,0x19);
  auVar107 = vpor_avx2(auVar108,auVar107);
  auVar108 = vpsrld_avx2(auVar143,0x12);
  auVar31 = vpslld_avx2(auVar143,0xe);
  auVar108 = vpor_avx2(auVar31,auVar108);
  auVar31 = vpsrld_avx2(auVar143,3);
  auVar142 = vpaddd_avx2(auVar108 ^ auVar107 ^ auVar31,auVar142);
  auVar8 = vpaddd_avx2(auVar142,auVar8);
  auVar8 = vpaddd_avx2(auVar8,auVar110 ^ auVar100 ^ auVar44);
  auVar142 = vpsrld_avx2(auVar13,6);
  auVar44 = vpslld_avx2(auVar13,0x1a);
  auVar100 = vpor_avx2(auVar44,auVar142);
  auVar142 = vpsrld_avx2(auVar13,0xb);
  auVar44 = vpslld_avx2(auVar13,0x15);
  auVar107 = vpor_avx2(auVar44,auVar142);
  auVar142 = vpsrld_avx2(auVar13,0x19);
  auVar44 = vpslld_avx2(auVar13,7);
  auVar108 = vpor_avx2(auVar44,auVar142);
  auVar44 = vpandn_avx2(auVar13,auVar11);
  auVar142 = vpand_avx2(auVar13,auVar12);
  auVar142 = vpor_avx2(auVar142,auVar44);
  auVar18 = vpaddd_avx2(auVar8,auVar18);
  auVar18 = vpaddd_avx2(auVar142,auVar18);
  auVar126._8_4_ = 0x748f82ee;
  auVar126._0_8_ = 0x748f82ee748f82ee;
  auVar126._12_4_ = 0x748f82ee;
  auVar126._16_4_ = 0x748f82ee;
  auVar126._20_4_ = 0x748f82ee;
  auVar126._24_4_ = 0x748f82ee;
  auVar126._28_4_ = 0x748f82ee;
  auVar18 = vpaddd_avx2(auVar126,auVar18);
  auVar18 = vpaddd_avx2(auVar18,auVar108 ^ auVar107 ^ auVar100);
  auVar142 = vpsrld_avx2(auVar94,2);
  auVar44 = vpslld_avx2(auVar94,0x1e);
  auVar100 = vpor_avx2(auVar44,auVar142);
  auVar142 = vpsrld_avx2(auVar94,0xd);
  auVar44 = vpslld_avx2(auVar94,0x13);
  auVar107 = vpor_avx2(auVar44,auVar142);
  auVar142 = vpsrld_avx2(auVar94,0x16);
  auVar44 = vpslld_avx2(auVar94,10);
  auVar108 = vpor_avx2(auVar44,auVar142);
  auVar142 = vpor_avx2(auVar94,auVar34);
  auVar142 = vpand_avx2(auVar142,auVar3);
  auVar44 = vpand_avx2(auVar94,auVar34);
  auVar142 = vpor_avx2(auVar44,auVar142);
  auVar15 = vpaddd_avx2(auVar15,auVar18);
  auVar18 = vpaddd_avx2(auVar108 ^ auVar107 ^ auVar100,auVar18);
  auVar18 = vpaddd_avx2(auVar142,auVar18);
  auVar142 = vpsrld_avx2(auVar141,0x11);
  auVar44 = vpslld_avx2(auVar141,0xf);
  auVar44 = vpor_avx2(auVar44,auVar142);
  auVar142 = vpsrld_avx2(auVar141,0x13);
  auVar100 = vpslld_avx2(auVar141,0xd);
  auVar100 = vpor_avx2(auVar100,auVar142);
  auVar108 = vpsrld_avx2(auVar141,10);
  auVar142 = vpsrld_avx2(auVar95,7);
  auVar107 = vpslld_avx2(auVar95,0x19);
  auVar142 = vpor_avx2(auVar107,auVar142);
  auVar107 = vpsrld_avx2(auVar95,0x12);
  auVar110 = vpslld_avx2(auVar95,0xe);
  auVar107 = vpor_avx2(auVar110,auVar107);
  auVar110 = vpsrld_avx2(auVar95,3);
  auVar142 = vpaddd_avx2(auVar107 ^ auVar142 ^ auVar110,auVar143);
  auVar20 = vpaddd_avx2(auVar142,auVar20);
  auVar20 = vpaddd_avx2(auVar20,auVar108 ^ auVar100 ^ auVar44);
  auVar142 = vpsrld_avx2(auVar15,6);
  auVar143 = vpslld_avx2(auVar15,0x1a);
  auVar44 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar15,0xb);
  auVar143 = vpslld_avx2(auVar15,0x15);
  auVar100 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar15,0x19);
  auVar143 = vpslld_avx2(auVar15,7);
  auVar107 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpandn_avx2(auVar15,auVar12);
  auVar142 = vpand_avx2(auVar13,auVar15);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar11 = vpaddd_avx2(auVar20,auVar11);
  auVar11 = vpaddd_avx2(auVar142,auVar11);
  auVar136._8_4_ = 0x78a5636f;
  auVar136._0_8_ = 0x78a5636f78a5636f;
  auVar136._12_4_ = 0x78a5636f;
  auVar136._16_4_ = 0x78a5636f;
  auVar136._20_4_ = 0x78a5636f;
  auVar136._24_4_ = 0x78a5636f;
  auVar136._28_4_ = 0x78a5636f;
  auVar11 = vpaddd_avx2(auVar136,auVar11);
  auVar11 = vpaddd_avx2(auVar100 ^ auVar44 ^ auVar107,auVar11);
  auVar142 = vpsrld_avx2(auVar18,2);
  auVar143 = vpslld_avx2(auVar18,0x1e);
  auVar44 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar18,0xd);
  auVar143 = vpslld_avx2(auVar18,0x13);
  auVar100 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar18,0x16);
  auVar143 = vpslld_avx2(auVar18,10);
  auVar107 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpor_avx2(auVar18,auVar94);
  auVar142 = vpand_avx2(auVar142,auVar34);
  auVar143 = vpand_avx2(auVar18,auVar94);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar3 = vpaddd_avx2(auVar3,auVar11);
  auVar11 = vpaddd_avx2(auVar100 ^ auVar44 ^ auVar107,auVar11);
  auVar11 = vpaddd_avx2(auVar142,auVar11);
  auVar142 = vpsrld_avx2(auVar8,0x11);
  auVar143 = vpslld_avx2(auVar8,0xf);
  auVar143 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar8,0x13);
  auVar44 = vpslld_avx2(auVar8,0xd);
  auVar44 = vpor_avx2(auVar44,auVar142);
  auVar107 = vpsrld_avx2(auVar8,10);
  auVar142 = vpsrld_avx2(auVar72,7);
  auVar100 = vpslld_avx2(auVar72,0x19);
  auVar142 = vpor_avx2(auVar100,auVar142);
  auVar100 = vpsrld_avx2(auVar72,0x12);
  auVar108 = vpslld_avx2(auVar72,0xe);
  auVar100 = vpor_avx2(auVar108,auVar100);
  auVar108 = vpsrld_avx2(auVar72,3);
  auVar142 = vpaddd_avx2(auVar100 ^ auVar142 ^ auVar108,auVar95);
  auVar38 = vpaddd_avx2(auVar142,auVar38);
  auVar38 = vpaddd_avx2(auVar38,auVar107 ^ auVar44 ^ auVar143);
  auVar142 = vpsrld_avx2(auVar3,6);
  auVar143 = vpslld_avx2(auVar3,0x1a);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar3,0xb);
  auVar143 = vpslld_avx2(auVar3,0x15);
  auVar44 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar3,0x19);
  auVar143 = vpslld_avx2(auVar3,7);
  auVar100 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpandn_avx2(auVar3,auVar13);
  auVar142 = vpand_avx2(auVar15,auVar3);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar12 = vpaddd_avx2(auVar38,auVar12);
  auVar147._8_4_ = 0x84c87814;
  auVar147._0_8_ = 0x84c8781484c87814;
  auVar147._12_4_ = 0x84c87814;
  auVar147._16_4_ = 0x84c87814;
  auVar147._20_4_ = 0x84c87814;
  auVar147._24_4_ = 0x84c87814;
  auVar147._28_4_ = 0x84c87814;
  auVar12 = vpaddd_avx2(auVar142,auVar12);
  auVar12 = vpaddd_avx2(auVar147,auVar12);
  auVar12 = vpaddd_avx2(auVar12,auVar100 ^ auVar44 ^ auVar95);
  auVar142 = vpsrld_avx2(auVar11,2);
  auVar143 = vpslld_avx2(auVar11,0x1e);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar11,0xd);
  auVar143 = vpslld_avx2(auVar11,0x13);
  auVar44 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar11,0x16);
  auVar143 = vpslld_avx2(auVar11,10);
  auVar100 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpor_avx2(auVar11,auVar18);
  auVar142 = vpand_avx2(auVar142,auVar94);
  auVar143 = vpand_avx2(auVar11,auVar18);
  auVar142 = vpor_avx2(auVar143,auVar142);
  auVar34 = vpaddd_avx2(auVar34,auVar12);
  auVar12 = vpaddd_avx2(auVar100 ^ auVar44 ^ auVar95,auVar12);
  auVar12 = vpaddd_avx2(auVar142,auVar12);
  auVar142 = vpsrld_avx2(auVar20,0x11);
  auVar143 = vpslld_avx2(auVar20,0xf);
  auVar142 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpsrld_avx2(auVar20,0x13);
  auVar95 = vpslld_avx2(auVar20,0xd);
  auVar143 = vpor_avx2(auVar95,auVar143);
  auVar44 = vpsrld_avx2(auVar20,10);
  auVar20 = vpsrld_avx2(auVar74,7);
  auVar95 = vpslld_avx2(auVar74,0x19);
  auVar20 = vpor_avx2(auVar95,auVar20);
  auVar95 = vpsrld_avx2(auVar74,0x12);
  auVar100 = vpslld_avx2(auVar74,0xe);
  auVar95 = vpor_avx2(auVar100,auVar95);
  auVar100 = vpsrld_avx2(auVar74,3);
  auVar20 = vpaddd_avx2(auVar72,auVar100 ^ auVar95 ^ auVar20);
  auVar20 = vpaddd_avx2(auVar20,auVar39);
  auVar20 = vpaddd_avx2(auVar20,auVar143 ^ auVar142 ^ auVar44);
  auVar39 = vpsrld_avx2(auVar34,6);
  auVar142 = vpslld_avx2(auVar34,0x1a);
  auVar143 = vpor_avx2(auVar142,auVar39);
  auVar39 = vpsrld_avx2(auVar34,0xb);
  auVar142 = vpslld_avx2(auVar34,0x15);
  auVar95 = vpor_avx2(auVar142,auVar39);
  auVar39 = vpsrld_avx2(auVar34,0x19);
  auVar142 = vpslld_avx2(auVar34,7);
  auVar72 = vpor_avx2(auVar142,auVar39);
  auVar142 = vpandn_avx2(auVar34,auVar15);
  auVar39 = vpand_avx2(auVar3,auVar34);
  auVar39 = vpor_avx2(auVar39,auVar142);
  auVar13 = vpaddd_avx2(auVar13,auVar20);
  auVar13 = vpaddd_avx2(auVar13,auVar39);
  auVar137._8_4_ = 0x8cc70208;
  auVar137._0_8_ = 0x8cc702088cc70208;
  auVar137._12_4_ = 0x8cc70208;
  auVar137._16_4_ = 0x8cc70208;
  auVar137._20_4_ = 0x8cc70208;
  auVar137._24_4_ = 0x8cc70208;
  auVar137._28_4_ = 0x8cc70208;
  auVar13 = vpaddd_avx2(auVar13,auVar137);
  auVar13 = vpaddd_avx2(auVar13,auVar72 ^ auVar95 ^ auVar143);
  auVar39 = vpsrld_avx2(auVar12,2);
  auVar142 = vpslld_avx2(auVar12,0x1e);
  auVar143 = vpor_avx2(auVar142,auVar39);
  auVar39 = vpsrld_avx2(auVar12,0xd);
  auVar142 = vpslld_avx2(auVar12,0x13);
  auVar95 = vpor_avx2(auVar142,auVar39);
  auVar39 = vpsrld_avx2(auVar12,0x16);
  auVar142 = vpslld_avx2(auVar12,10);
  auVar72 = vpor_avx2(auVar142,auVar39);
  auVar39 = vpor_avx2(auVar11,auVar12);
  auVar39 = vpand_avx2(auVar39,auVar18);
  auVar142 = vpand_avx2(auVar11,auVar12);
  auVar39 = vpor_avx2(auVar39,auVar142);
  auVar94 = vpaddd_avx2(auVar94,auVar13);
  auVar13 = vpaddd_avx2(auVar95 ^ auVar143 ^ auVar72,auVar13);
  auVar13 = vpaddd_avx2(auVar39,auVar13);
  auVar39 = vpsrld_avx2(auVar38,0x11);
  auVar142 = vpslld_avx2(auVar38,0xf);
  auVar39 = vpor_avx2(auVar142,auVar39);
  auVar142 = vpsrld_avx2(auVar38,0x13);
  auVar143 = vpslld_avx2(auVar38,0xd);
  auVar142 = vpor_avx2(auVar143,auVar142);
  auVar95 = vpsrld_avx2(auVar38,10);
  auVar38 = vpsrld_avx2(auVar6,7);
  auVar143 = vpslld_avx2(auVar6,0x19);
  auVar38 = vpor_avx2(auVar143,auVar38);
  auVar143 = vpsrld_avx2(auVar6,0x12);
  auVar72 = vpslld_avx2(auVar6,0xe);
  auVar143 = vpor_avx2(auVar72,auVar143);
  auVar72 = vpsrld_avx2(auVar6,3);
  auVar38 = vpaddd_avx2(auVar143 ^ auVar38 ^ auVar72,auVar74);
  auVar38 = vpaddd_avx2(auVar38,auVar70);
  auVar38 = vpaddd_avx2(auVar38,auVar142 ^ auVar39 ^ auVar95);
  auVar39 = vpsrld_avx2(auVar94,6);
  auVar70 = vpslld_avx2(auVar94,0x1a);
  auVar142 = vpor_avx2(auVar70,auVar39);
  auVar39 = vpsrld_avx2(auVar94,0xb);
  auVar70 = vpslld_avx2(auVar94,0x15);
  auVar143 = vpor_avx2(auVar70,auVar39);
  auVar39 = vpsrld_avx2(auVar94,0x19);
  auVar70 = vpslld_avx2(auVar94,7);
  auVar95 = vpor_avx2(auVar70,auVar39);
  auVar70 = vpandn_avx2(auVar94,auVar3);
  auVar39 = vpand_avx2(auVar34,auVar94);
  auVar39 = vpor_avx2(auVar39,auVar70);
  auVar15 = vpaddd_avx2(auVar38,auVar15);
  auVar15 = vpaddd_avx2(auVar39,auVar15);
  auVar138._8_4_ = 0x90befffa;
  auVar138._0_8_ = 0x90befffa90befffa;
  auVar138._12_4_ = 0x90befffa;
  auVar138._16_4_ = 0x90befffa;
  auVar138._20_4_ = 0x90befffa;
  auVar138._24_4_ = 0x90befffa;
  auVar138._28_4_ = 0x90befffa;
  auVar15 = vpaddd_avx2(auVar138,auVar15);
  auVar15 = vpaddd_avx2(auVar143 ^ auVar142 ^ auVar95,auVar15);
  auVar39 = vpsrld_avx2(auVar13,2);
  auVar70 = vpslld_avx2(auVar13,0x1e);
  auVar142 = vpor_avx2(auVar70,auVar39);
  auVar39 = vpsrld_avx2(auVar13,0xd);
  auVar70 = vpslld_avx2(auVar13,0x13);
  auVar143 = vpor_avx2(auVar70,auVar39);
  auVar39 = vpsrld_avx2(auVar13,0x16);
  auVar70 = vpslld_avx2(auVar13,10);
  auVar95 = vpor_avx2(auVar70,auVar39);
  auVar39 = vpor_avx2(auVar13,auVar12);
  auVar39 = vpand_avx2(auVar39,auVar11);
  auVar70 = vpand_avx2(auVar13,auVar12);
  auVar39 = vpor_avx2(auVar39,auVar70);
  auVar18 = vpaddd_avx2(auVar18,auVar15);
  auVar15 = vpaddd_avx2(auVar143 ^ auVar142 ^ auVar95,auVar15);
  auVar15 = vpaddd_avx2(auVar39,auVar15);
  auVar39 = vpsrld_avx2(auVar20,0x11);
  auVar70 = vpslld_avx2(auVar20,0xf);
  auVar39 = vpor_avx2(auVar70,auVar39);
  auVar70 = vpsrld_avx2(auVar20,0x13);
  auVar142 = vpslld_avx2(auVar20,0xd);
  auVar70 = vpor_avx2(auVar142,auVar70);
  auVar143 = vpsrld_avx2(auVar20,10);
  auVar20 = vpsrld_avx2(auVar7,7);
  auVar142 = vpslld_avx2(auVar7,0x19);
  auVar20 = vpor_avx2(auVar142,auVar20);
  auVar142 = vpsrld_avx2(auVar7,0x12);
  auVar95 = vpslld_avx2(auVar7,0xe);
  auVar142 = vpor_avx2(auVar95,auVar142);
  auVar95 = vpsrld_avx2(auVar7,3);
  auVar20 = vpaddd_avx2(auVar6,auVar95 ^ auVar142 ^ auVar20);
  auVar20 = vpaddd_avx2(auVar20,auVar42);
  auVar20 = vpaddd_avx2(auVar20,auVar70 ^ auVar39 ^ auVar143);
  auVar39 = vpsrld_avx2(auVar18,6);
  auVar70 = vpslld_avx2(auVar18,0x1a);
  auVar42 = vpor_avx2(auVar70,auVar39);
  auVar39 = vpsrld_avx2(auVar18,0xb);
  auVar70 = vpslld_avx2(auVar18,0x15);
  auVar142 = vpor_avx2(auVar70,auVar39);
  auVar39 = vpsrld_avx2(auVar18,0x19);
  auVar70 = vpslld_avx2(auVar18,7);
  auVar143 = vpor_avx2(auVar70,auVar39);
  auVar70 = vpandn_avx2(auVar18,auVar34);
  auVar39 = vpand_avx2(auVar18,auVar94);
  auVar39 = vpor_avx2(auVar39,auVar70);
  auVar3 = vpaddd_avx2(auVar20,auVar3);
  auVar3 = vpaddd_avx2(auVar39,auVar3);
  auVar103._8_4_ = 0xa4506ceb;
  auVar103._0_8_ = 0xa4506ceba4506ceb;
  auVar103._12_4_ = 0xa4506ceb;
  auVar103._16_4_ = 0xa4506ceb;
  auVar103._20_4_ = 0xa4506ceb;
  auVar103._24_4_ = 0xa4506ceb;
  auVar103._28_4_ = 0xa4506ceb;
  auVar3 = vpaddd_avx2(auVar103,auVar3);
  auVar3 = vpaddd_avx2(auVar3,auVar143 ^ auVar142 ^ auVar42);
  auVar39 = vpsrld_avx2(auVar15,2);
  auVar70 = vpslld_avx2(auVar15,0x1e);
  auVar42 = vpor_avx2(auVar70,auVar39);
  auVar39 = vpsrld_avx2(auVar15,0xd);
  auVar70 = vpslld_avx2(auVar15,0x13);
  auVar142 = vpor_avx2(auVar70,auVar39);
  auVar39 = vpsrld_avx2(auVar15,0x16);
  auVar70 = vpslld_avx2(auVar15,10);
  auVar143 = vpor_avx2(auVar70,auVar39);
  auVar39 = vpor_avx2(auVar15,auVar13);
  auVar39 = vpand_avx2(auVar39,auVar12);
  auVar70 = vpand_avx2(auVar15,auVar13);
  auVar39 = vpor_avx2(auVar39,auVar70);
  auVar11 = vpaddd_avx2(auVar11,auVar3);
  auVar3 = vpaddd_avx2(auVar143 ^ auVar142 ^ auVar42,auVar3);
  auVar3 = vpaddd_avx2(auVar39,auVar3);
  auVar39 = vpsrld_avx2(auVar38,0x11);
  auVar70 = vpslld_avx2(auVar38,0xf);
  auVar70 = vpor_avx2(auVar70,auVar39);
  auVar39 = vpsrld_avx2(auVar38,0x13);
  auVar42 = vpslld_avx2(auVar38,0xd);
  auVar42 = vpor_avx2(auVar42,auVar39);
  auVar6 = vpsrld_avx2(auVar38,10);
  auVar38 = vpsrld_avx2(auVar33,7);
  auVar39 = vpslld_avx2(auVar33,0x19);
  auVar142 = vpor_avx2(auVar39,auVar38);
  auVar38 = vpsrld_avx2(auVar33,0x12);
  auVar39 = vpslld_avx2(auVar33,0xe);
  auVar143 = vpor_avx2(auVar39,auVar38);
  auVar44 = vpsrld_avx2(auVar33,3);
  auVar38 = vpsrld_avx2(auVar11,6);
  auVar39 = vpslld_avx2(auVar11,0x1a);
  auVar95 = vpor_avx2(auVar39,auVar38);
  auVar38 = vpsrld_avx2(auVar11,0xb);
  auVar39 = vpslld_avx2(auVar11,0x15);
  auVar72 = vpor_avx2(auVar39,auVar38);
  auVar38 = vpsrld_avx2(auVar11,0x19);
  auVar39 = vpslld_avx2(auVar11,7);
  auVar74 = vpor_avx2(auVar39,auVar38);
  auVar39 = vpandn_avx2(auVar11,auVar94);
  auVar38 = vpand_avx2(auVar18,auVar11);
  auVar39 = vpor_avx2(auVar38,auVar39);
  auVar38 = vpaddd_avx2(auVar7,auVar44 ^ auVar143 ^ auVar142);
  auVar38 = vpaddd_avx2(auVar38,auVar141);
  auVar38 = vpaddd_avx2(auVar38,auVar42 ^ auVar70 ^ auVar6);
  auVar34 = vpaddd_avx2(auVar38,auVar34);
  auVar45._8_4_ = 0xbef9a3f7;
  auVar45._0_8_ = 0xbef9a3f7bef9a3f7;
  auVar45._12_4_ = 0xbef9a3f7;
  auVar45._16_4_ = 0xbef9a3f7;
  auVar45._20_4_ = 0xbef9a3f7;
  auVar45._24_4_ = 0xbef9a3f7;
  auVar45._28_4_ = 0xbef9a3f7;
  auVar34 = vpaddd_avx2(auVar39,auVar34);
  auVar34 = vpaddd_avx2(auVar34,auVar45);
  auVar34 = vpaddd_avx2(auVar72 ^ auVar95 ^ auVar74,auVar34);
  auVar38 = vpsrld_avx2(auVar3,2);
  auVar39 = vpslld_avx2(auVar3,0x1e);
  auVar70 = vpor_avx2(auVar39,auVar38);
  auVar38 = vpsrld_avx2(auVar3,0xd);
  auVar39 = vpslld_avx2(auVar3,0x13);
  auVar42 = vpor_avx2(auVar39,auVar38);
  auVar38 = vpsrld_avx2(auVar3,0x16);
  auVar39 = vpslld_avx2(auVar3,10);
  auVar141 = vpor_avx2(auVar39,auVar38);
  auVar38 = vpor_avx2(auVar3,auVar15);
  auVar38 = vpand_avx2(auVar38,auVar13);
  auVar39 = vpand_avx2(auVar3,auVar15);
  auVar38 = vpor_avx2(auVar39,auVar38);
  auVar12 = vpaddd_avx2(auVar12,auVar34);
  auVar34 = vpaddd_avx2(auVar42 ^ auVar70 ^ auVar141,auVar34);
  auVar34 = vpaddd_avx2(auVar38,auVar34);
  auVar38 = vpsrld_avx2(auVar20,0x11);
  auVar39 = vpslld_avx2(auVar20,0xf);
  auVar38 = vpor_avx2(auVar39,auVar38);
  auVar39 = vpsrld_avx2(auVar20,0x13);
  auVar70 = vpslld_avx2(auVar20,0xd);
  auVar39 = vpor_avx2(auVar70,auVar39);
  auVar95 = vpsrld_avx2(auVar20,10);
  auVar20 = vpsrld_avx2(auVar19,7);
  auVar70 = vpslld_avx2(auVar19,0x19);
  auVar70 = vpor_avx2(auVar70,auVar20);
  auVar20 = vpsrld_avx2(auVar19,0x12);
  auVar42 = vpslld_avx2(auVar19,0xe);
  auVar42 = vpor_avx2(auVar42,auVar20);
  auVar72 = vpsrld_avx2(auVar19,3);
  auVar19 = vpsrld_avx2(auVar12,6);
  auVar20 = vpslld_avx2(auVar12,0x1a);
  auVar141 = vpor_avx2(auVar20,auVar19);
  auVar19 = vpsrld_avx2(auVar12,0xb);
  auVar20 = vpslld_avx2(auVar12,0x15);
  auVar142 = vpor_avx2(auVar20,auVar19);
  auVar19 = vpsrld_avx2(auVar12,0x19);
  auVar20 = vpslld_avx2(auVar12,7);
  auVar143 = vpor_avx2(auVar20,auVar19);
  auVar20 = vpandn_avx2(auVar12,auVar18);
  auVar19 = vpand_avx2(auVar11,auVar12);
  auVar20 = vpor_avx2(auVar19,auVar20);
  auVar19 = vpaddd_avx2(auVar33,auVar42 ^ auVar70 ^ auVar72);
  auVar8 = vpaddd_avx2(auVar19,auVar8);
  auVar8 = vpaddd_avx2(auVar8,auVar39 ^ auVar38 ^ auVar95);
  auVar94 = vpaddd_avx2(auVar8,auVar94);
  auVar94 = vpaddd_avx2(auVar20,auVar94);
  auVar31._8_4_ = 0xc67178f2;
  auVar31._0_8_ = 0xc67178f2c67178f2;
  auVar31._12_4_ = 0xc67178f2;
  auVar31._16_4_ = 0xc67178f2;
  auVar31._20_4_ = 0xc67178f2;
  auVar31._24_4_ = 0xc67178f2;
  auVar31._28_4_ = 0xc67178f2;
  auVar94 = vpaddd_avx2(auVar94,auVar31);
  auVar94 = vpaddd_avx2(auVar94,auVar143 ^ auVar142 ^ auVar141);
  auVar8 = vpsrld_avx2(auVar34,2);
  auVar19 = vpslld_avx2(auVar34,0x1e);
  auVar20 = vpor_avx2(auVar19,auVar8);
  auVar8 = vpsrld_avx2(auVar34,0xd);
  auVar19 = vpslld_avx2(auVar34,0x13);
  auVar38 = vpor_avx2(auVar19,auVar8);
  auVar8 = vpsrld_avx2(auVar34,0x16);
  auVar19 = vpslld_avx2(auVar34,10);
  auVar39 = vpor_avx2(auVar19,auVar8);
  auVar8 = vpor_avx2(auVar3,auVar34);
  auVar8 = vpand_avx2(auVar8,auVar15);
  auVar19 = vpand_avx2(auVar3,auVar34);
  auVar19 = vpor_avx2(auVar8,auVar19);
  auVar8 = vpaddd_avx2(auVar94,auVar38 ^ auVar20 ^ auVar39);
  auVar20._8_4_ = 0x6a09e667;
  auVar20._0_8_ = 0x6a09e6676a09e667;
  auVar20._12_4_ = 0x6a09e667;
  auVar20._16_4_ = 0x6a09e667;
  auVar20._20_4_ = 0x6a09e667;
  auVar20._24_4_ = 0x6a09e667;
  auVar20._28_4_ = 0x6a09e667;
  auVar19 = vpaddd_avx2(auVar19,auVar20);
  auVar8 = vpaddd_avx2(auVar8,auVar19);
  auVar13 = vpaddd_avx2(auVar13,auVar16);
  auVar94 = vpaddd_avx2(auVar94,auVar13);
  auVar13 = vpsrld_avx2(auVar94,6);
  auVar19 = vpslld_avx2(auVar94,0x1a);
  auVar39 = vpor_avx2(auVar19,auVar13);
  auVar13 = vpsrld_avx2(auVar94,0xb);
  auVar19 = vpslld_avx2(auVar94,0x15);
  auVar70 = vpor_avx2(auVar19,auVar13);
  auVar13 = vpsrld_avx2(auVar94,0x19);
  auVar19 = vpslld_avx2(auVar94,7);
  auVar42 = vpor_avx2(auVar19,auVar13);
  auVar13 = vpaddd_avx2(auVar12,auVar14);
  auVar40._8_4_ = 0x1f83d9ab;
  auVar40._0_8_ = 0x1f83d9ab1f83d9ab;
  auVar40._12_4_ = 0x1f83d9ab;
  auVar40._16_4_ = 0x1f83d9ab;
  auVar40._20_4_ = 0x1f83d9ab;
  auVar40._24_4_ = 0x1f83d9ab;
  auVar40._28_4_ = 0x1f83d9ab;
  auVar19 = vpaddd_avx2(auVar11,auVar40);
  auVar38 = vpandn_avx2(auVar94,auVar19);
  auVar20 = vpand_avx2(auVar94,auVar13);
  auVar20 = vpor_avx2(auVar20,auVar38);
  auVar20 = vpaddd_avx2(auVar18,auVar20);
  auVar141._8_4_ = 0x1e6afcb1;
  auVar141._0_8_ = 0x1e6afcb11e6afcb1;
  auVar141._12_4_ = 0x1e6afcb1;
  auVar141._16_4_ = 0x1e6afcb1;
  auVar141._20_4_ = 0x1e6afcb1;
  auVar141._24_4_ = 0x1e6afcb1;
  auVar141._28_4_ = 0x1e6afcb1;
  auVar20 = vpaddd_avx2(auVar20,auVar141);
  auVar20 = vpaddd_avx2(auVar20,auVar70 ^ auVar39 ^ auVar42);
  auVar38 = vpsrld_avx2(auVar8,2);
  auVar39 = vpslld_avx2(auVar8,0x1e);
  auVar70 = vpor_avx2(auVar39,auVar38);
  auVar38 = vpsrld_avx2(auVar8,0xd);
  auVar39 = vpslld_avx2(auVar8,0x13);
  auVar42 = vpor_avx2(auVar39,auVar38);
  auVar38 = vpsrld_avx2(auVar8,0x16);
  auVar39 = vpslld_avx2(auVar8,10);
  auVar141 = vpor_avx2(auVar39,auVar38);
  auVar38._8_4_ = 0xbb67ae85;
  auVar38._0_8_ = 0xbb67ae85bb67ae85;
  auVar38._12_4_ = 0xbb67ae85;
  auVar38._16_4_ = 0xbb67ae85;
  auVar38._20_4_ = 0xbb67ae85;
  auVar38._24_4_ = 0xbb67ae85;
  auVar38._28_4_ = 0xbb67ae85;
  auVar34 = vpaddd_avx2(auVar34,auVar38);
  auVar39._8_4_ = 0x3c6ef372;
  auVar39._0_8_ = 0x3c6ef3723c6ef372;
  auVar39._12_4_ = 0x3c6ef372;
  auVar39._16_4_ = 0x3c6ef372;
  auVar39._20_4_ = 0x3c6ef372;
  auVar39._24_4_ = 0x3c6ef372;
  auVar39._28_4_ = 0x3c6ef372;
  auVar3 = vpaddd_avx2(auVar3,auVar39);
  auVar38 = vpor_avx2(auVar8,auVar34);
  auVar38 = vpand_avx2(auVar38,auVar3);
  auVar39 = vpand_avx2(auVar8,auVar34);
  auVar39 = vpor_avx2(auVar38,auVar39);
  auVar38 = vpaddd_avx2(auVar42 ^ auVar70 ^ auVar141,auVar20);
  auVar38 = vpaddd_avx2(auVar38,auVar39);
  auVar9._8_4_ = 0xa54ff53a;
  auVar9._0_8_ = 0xa54ff53aa54ff53a;
  auVar9._12_4_ = 0xa54ff53a;
  auVar9._16_4_ = 0xa54ff53a;
  auVar9._20_4_ = 0xa54ff53a;
  auVar9._24_4_ = 0xa54ff53a;
  auVar9._28_4_ = 0xa54ff53a;
  auVar15 = vpaddd_avx2(auVar15,auVar9);
  auVar20 = vpaddd_avx2(auVar15,auVar20);
  auVar39 = vpsrld_avx2(auVar20,6);
  auVar70 = vpslld_avx2(auVar20,0x1a);
  auVar42 = vpor_avx2(auVar70,auVar39);
  auVar39 = vpsrld_avx2(auVar20,0xb);
  auVar70 = vpslld_avx2(auVar20,0x15);
  auVar141 = vpor_avx2(auVar70,auVar39);
  auVar39 = vpsrld_avx2(auVar20,0x19);
  auVar70 = vpslld_avx2(auVar20,7);
  auVar142 = vpor_avx2(auVar70,auVar39);
  auVar70 = vpandn_avx2(auVar20,auVar13);
  auVar39 = vpand_avx2(auVar94,auVar20);
  auVar39 = vpor_avx2(auVar39,auVar70);
  auVar11 = vpaddd_avx2(auVar11,auVar39);
  auVar11 = vpaddd_avx2(auVar11,local_738);
  auVar11 = vpaddd_avx2(auVar11,auVar141 ^ auVar42 ^ auVar142);
  auVar39 = vpsrld_avx2(auVar38,2);
  auVar70 = vpslld_avx2(auVar38,0x1e);
  auVar42 = vpor_avx2(auVar70,auVar39);
  auVar39 = vpsrld_avx2(auVar38,0xd);
  auVar70 = vpslld_avx2(auVar38,0x13);
  auVar141 = vpor_avx2(auVar70,auVar39);
  auVar39 = vpsrld_avx2(auVar38,0x16);
  auVar70 = vpslld_avx2(auVar38,10);
  auVar142 = vpor_avx2(auVar70,auVar39);
  auVar39 = vpor_avx2(auVar38,auVar8);
  auVar39 = vpand_avx2(auVar34,auVar39);
  auVar70 = vpand_avx2(auVar38,auVar8);
  auVar70 = vpor_avx2(auVar39,auVar70);
  auVar39 = vpaddd_avx2(auVar141 ^ auVar42 ^ auVar142,auVar11);
  auVar39 = vpaddd_avx2(auVar39,auVar70);
  auVar11 = vpaddd_avx2(auVar3,auVar11);
  auVar70 = vpsrld_avx2(auVar11,6);
  auVar42 = vpslld_avx2(auVar11,0x1a);
  auVar141 = vpor_avx2(auVar42,auVar70);
  auVar70 = vpsrld_avx2(auVar11,0xb);
  auVar42 = vpslld_avx2(auVar11,0x15);
  auVar142 = vpor_avx2(auVar42,auVar70);
  auVar70 = vpsrld_avx2(auVar11,0x19);
  auVar42 = vpslld_avx2(auVar11,7);
  auVar143 = vpor_avx2(auVar42,auVar70);
  auVar42 = vpandn_avx2(auVar11,auVar94);
  auVar70 = vpand_avx2(auVar20,auVar11);
  auVar70 = vpor_avx2(auVar70,auVar42);
  auVar12 = vpaddd_avx2(auVar12,auVar70);
  auVar12 = vpaddd_avx2(auVar12,auVar68);
  auVar12 = vpaddd_avx2(auVar12,auVar142 ^ auVar141 ^ auVar143);
  auVar70 = vpsrld_avx2(auVar39,2);
  auVar42 = vpslld_avx2(auVar39,0x1e);
  auVar141 = vpor_avx2(auVar42,auVar70);
  auVar70 = vpsrld_avx2(auVar39,0xd);
  auVar42 = vpslld_avx2(auVar39,0x13);
  auVar142 = vpor_avx2(auVar42,auVar70);
  auVar70 = vpsrld_avx2(auVar39,0x16);
  auVar42 = vpslld_avx2(auVar39,10);
  auVar143 = vpor_avx2(auVar42,auVar70);
  auVar70 = vpor_avx2(auVar39,auVar38);
  auVar70 = vpand_avx2(auVar70,auVar8);
  auVar42 = vpand_avx2(auVar39,auVar38);
  auVar42 = vpor_avx2(auVar70,auVar42);
  auVar70 = vpaddd_avx2(auVar142 ^ auVar141 ^ auVar143,auVar12);
  auVar70 = vpaddd_avx2(auVar70,auVar42);
  auVar12 = vpaddd_avx2(auVar34,auVar12);
  auVar42 = vpsrld_avx2(auVar12,6);
  auVar141 = vpslld_avx2(auVar12,0x1a);
  auVar142 = vpor_avx2(auVar141,auVar42);
  auVar42 = vpsrld_avx2(auVar12,0xb);
  auVar141 = vpslld_avx2(auVar12,0x15);
  auVar143 = vpor_avx2(auVar141,auVar42);
  auVar42 = vpsrld_avx2(auVar12,0x19);
  auVar141 = vpslld_avx2(auVar12,7);
  auVar95 = vpor_avx2(auVar141,auVar42);
  auVar141 = vpandn_avx2(auVar12,auVar20);
  auVar42 = vpand_avx2(auVar11,auVar12);
  auVar42 = vpor_avx2(auVar42,auVar141);
  auVar42 = vpaddd_avx2(auVar94,auVar42);
  auVar74._8_4_ = 0xe9b5dba5;
  auVar74._0_8_ = 0xe9b5dba5e9b5dba5;
  auVar74._12_4_ = 0xe9b5dba5;
  auVar74._16_4_ = 0xe9b5dba5;
  auVar74._20_4_ = 0xe9b5dba5;
  auVar74._24_4_ = 0xe9b5dba5;
  auVar74._28_4_ = 0xe9b5dba5;
  auVar42 = vpaddd_avx2(auVar42,auVar74);
  auVar42 = vpaddd_avx2(auVar42,auVar143 ^ auVar142 ^ auVar95);
  auVar141 = vpsrld_avx2(auVar70,2);
  auVar142 = vpslld_avx2(auVar70,0x1e);
  auVar143 = vpor_avx2(auVar142,auVar141);
  auVar141 = vpsrld_avx2(auVar70,0xd);
  auVar142 = vpslld_avx2(auVar70,0x13);
  auVar95 = vpor_avx2(auVar142,auVar141);
  auVar141 = vpsrld_avx2(auVar70,0x16);
  auVar142 = vpslld_avx2(auVar70,10);
  auVar72 = vpor_avx2(auVar142,auVar141);
  auVar141 = vpor_avx2(auVar70,auVar39);
  auVar141 = vpand_avx2(auVar38,auVar141);
  auVar142 = vpand_avx2(auVar70,auVar39);
  auVar142 = vpor_avx2(auVar142,auVar141);
  auVar141 = vpaddd_avx2(auVar95 ^ auVar143 ^ auVar72,auVar42);
  auVar141 = vpaddd_avx2(auVar141,auVar142);
  auVar42 = vpaddd_avx2(auVar42,auVar8);
  auVar142 = vpsrld_avx2(auVar42,6);
  auVar143 = vpslld_avx2(auVar42,0x1a);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar42,0xb);
  auVar143 = vpslld_avx2(auVar42,0x15);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar42,0x19);
  auVar143 = vpslld_avx2(auVar42,7);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpandn_avx2(auVar42,auVar11);
  auVar142 = vpand_avx2(auVar42,auVar12);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar20 = vpaddd_avx2(auVar20,auVar142);
  auVar77._8_4_ = 0x3956c25b;
  auVar77._0_8_ = 0x3956c25b3956c25b;
  auVar77._12_4_ = 0x3956c25b;
  auVar77._16_4_ = 0x3956c25b;
  auVar77._20_4_ = 0x3956c25b;
  auVar77._24_4_ = 0x3956c25b;
  auVar77._28_4_ = 0x3956c25b;
  auVar20 = vpaddd_avx2(auVar20,auVar77);
  auVar20 = vpaddd_avx2(auVar20,auVar72 ^ auVar95 ^ auVar74);
  auVar142 = vpsrld_avx2(auVar141,2);
  auVar143 = vpslld_avx2(auVar141,0x1e);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar141,0xd);
  auVar143 = vpslld_avx2(auVar141,0x13);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar141,0x16);
  auVar143 = vpslld_avx2(auVar141,10);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpor_avx2(auVar141,auVar70);
  auVar142 = vpand_avx2(auVar39,auVar142);
  auVar143 = vpand_avx2(auVar141,auVar70);
  auVar142 = vpor_avx2(auVar143,auVar142);
  auVar38 = vpaddd_avx2(auVar38,auVar20);
  auVar20 = vpaddd_avx2(auVar72 ^ auVar95 ^ auVar74,auVar20);
  auVar20 = vpaddd_avx2(auVar142,auVar20);
  auVar142 = vpsrld_avx2(auVar38,6);
  auVar143 = vpslld_avx2(auVar38,0x1a);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar38,0xb);
  auVar143 = vpslld_avx2(auVar38,0x15);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar38,0x19);
  auVar143 = vpslld_avx2(auVar38,7);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpandn_avx2(auVar38,auVar12);
  auVar142 = vpand_avx2(auVar42,auVar38);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar11 = vpaddd_avx2(auVar11,auVar142);
  auVar11 = vpaddd_avx2(auVar11,auVar21);
  auVar11 = vpaddd_avx2(auVar11,auVar72 ^ auVar95 ^ auVar74);
  auVar142 = vpsrld_avx2(auVar20,2);
  auVar143 = vpslld_avx2(auVar20,0x1e);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar20,0xd);
  auVar143 = vpslld_avx2(auVar20,0x13);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar20,0x16);
  auVar143 = vpslld_avx2(auVar20,10);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpor_avx2(auVar20,auVar141);
  auVar142 = vpand_avx2(auVar70,auVar142);
  auVar143 = vpand_avx2(auVar20,auVar141);
  auVar142 = vpor_avx2(auVar143,auVar142);
  auVar39 = vpaddd_avx2(auVar39,auVar11);
  auVar11 = vpaddd_avx2(auVar72 ^ auVar95 ^ auVar74,auVar11);
  auVar11 = vpaddd_avx2(auVar142,auVar11);
  auVar142 = vpsrld_avx2(auVar39,6);
  auVar143 = vpslld_avx2(auVar39,0x1a);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar39,0xb);
  auVar143 = vpslld_avx2(auVar39,0x15);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar39,0x19);
  auVar143 = vpslld_avx2(auVar39,7);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpandn_avx2(auVar39,auVar42);
  auVar142 = vpand_avx2(auVar38,auVar39);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar12 = vpaddd_avx2(auVar12,auVar142);
  auVar12 = vpaddd_avx2(auVar12,auVar22);
  auVar12 = vpaddd_avx2(auVar12,auVar72 ^ auVar95 ^ auVar74);
  auVar142 = vpsrld_avx2(auVar11,2);
  auVar143 = vpslld_avx2(auVar11,0x1e);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar11,0xd);
  auVar143 = vpslld_avx2(auVar11,0x13);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar11,0x16);
  auVar143 = vpslld_avx2(auVar11,10);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpor_avx2(auVar11,auVar20);
  auVar142 = vpand_avx2(auVar141,auVar142);
  auVar143 = vpand_avx2(auVar11,auVar20);
  auVar142 = vpor_avx2(auVar143,auVar142);
  auVar70 = vpaddd_avx2(auVar70,auVar12);
  auVar12 = vpaddd_avx2(auVar72 ^ auVar95 ^ auVar74,auVar12);
  auVar12 = vpaddd_avx2(auVar142,auVar12);
  auVar142 = vpsrld_avx2(auVar70,6);
  auVar143 = vpslld_avx2(auVar70,0x1a);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar70,0xb);
  auVar143 = vpslld_avx2(auVar70,0x15);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar70,0x19);
  auVar143 = vpslld_avx2(auVar70,7);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpandn_avx2(auVar70,auVar38);
  auVar142 = vpand_avx2(auVar39,auVar70);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar42 = vpaddd_avx2(auVar42,auVar142);
  auVar42 = vpaddd_avx2(auVar42,auVar23);
  auVar42 = vpaddd_avx2(auVar42,auVar72 ^ auVar95 ^ auVar74);
  auVar142 = vpsrld_avx2(auVar12,2);
  auVar143 = vpslld_avx2(auVar12,0x1e);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar12,0xd);
  auVar143 = vpslld_avx2(auVar12,0x13);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar12,0x16);
  auVar143 = vpslld_avx2(auVar12,10);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpor_avx2(auVar12,auVar11);
  auVar142 = vpand_avx2(auVar142,auVar20);
  auVar143 = vpand_avx2(auVar12,auVar11);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar141 = vpaddd_avx2(auVar141,auVar42);
  auVar42 = vpaddd_avx2(auVar74 ^ auVar72 ^ auVar95,auVar42);
  auVar42 = vpaddd_avx2(auVar142,auVar42);
  auVar142 = vpsrld_avx2(auVar141,6);
  auVar143 = vpslld_avx2(auVar141,0x1a);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar141,0xb);
  auVar143 = vpslld_avx2(auVar141,0x15);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar141,0x19);
  auVar143 = vpslld_avx2(auVar141,7);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpandn_avx2(auVar141,auVar39);
  auVar142 = vpand_avx2(auVar141,auVar70);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar38 = vpaddd_avx2(auVar38,auVar142);
  auVar38 = vpaddd_avx2(auVar38,auVar24);
  auVar38 = vpaddd_avx2(auVar38,auVar72 ^ auVar95 ^ auVar74);
  auVar142 = vpsrld_avx2(auVar42,2);
  auVar143 = vpslld_avx2(auVar42,0x1e);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar42,0xd);
  auVar143 = vpslld_avx2(auVar42,0x13);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar42,0x16);
  auVar143 = vpslld_avx2(auVar42,10);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpor_avx2(auVar42,auVar12);
  auVar142 = vpand_avx2(auVar11,auVar142);
  auVar143 = vpand_avx2(auVar42,auVar12);
  auVar142 = vpor_avx2(auVar143,auVar142);
  auVar20 = vpaddd_avx2(auVar20,auVar38);
  auVar38 = vpaddd_avx2(auVar72 ^ auVar95 ^ auVar74,auVar38);
  auVar38 = vpaddd_avx2(auVar142,auVar38);
  auVar142 = vpsrld_avx2(auVar20,6);
  auVar143 = vpslld_avx2(auVar20,0x1a);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar20,0xb);
  auVar143 = vpslld_avx2(auVar20,0x15);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar20,0x19);
  auVar143 = vpslld_avx2(auVar20,7);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpandn_avx2(auVar20,auVar70);
  auVar142 = vpand_avx2(auVar141,auVar20);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar39 = vpaddd_avx2(auVar39,auVar142);
  auVar39 = vpaddd_avx2(auVar39,auVar25);
  auVar39 = vpaddd_avx2(auVar39,auVar72 ^ auVar95 ^ auVar74);
  auVar142 = vpsrld_avx2(auVar38,2);
  auVar143 = vpslld_avx2(auVar38,0x1e);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar38,0xd);
  auVar143 = vpslld_avx2(auVar38,0x13);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar38,0x16);
  auVar143 = vpslld_avx2(auVar38,10);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpor_avx2(auVar38,auVar42);
  auVar142 = vpand_avx2(auVar12,auVar142);
  auVar143 = vpand_avx2(auVar38,auVar42);
  auVar142 = vpor_avx2(auVar143,auVar142);
  auVar11 = vpaddd_avx2(auVar11,auVar39);
  auVar39 = vpaddd_avx2(auVar72 ^ auVar95 ^ auVar74,auVar39);
  auVar39 = vpaddd_avx2(auVar142,auVar39);
  auVar142 = vpsrld_avx2(auVar11,6);
  auVar143 = vpslld_avx2(auVar11,0x1a);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar11,0xb);
  auVar143 = vpslld_avx2(auVar11,0x15);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar11,0x19);
  auVar143 = vpslld_avx2(auVar11,7);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpandn_avx2(auVar11,auVar141);
  auVar142 = vpand_avx2(auVar20,auVar11);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar70 = vpaddd_avx2(auVar70,auVar142);
  auVar70 = vpaddd_avx2(auVar70,auVar26);
  auVar70 = vpaddd_avx2(auVar70,auVar72 ^ auVar95 ^ auVar74);
  auVar142 = vpsrld_avx2(auVar39,2);
  auVar143 = vpslld_avx2(auVar39,0x1e);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar39,0xd);
  auVar143 = vpslld_avx2(auVar39,0x13);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar39,0x16);
  auVar143 = vpslld_avx2(auVar39,10);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpor_avx2(auVar39,auVar38);
  auVar142 = vpand_avx2(auVar42,auVar142);
  auVar143 = vpand_avx2(auVar39,auVar38);
  auVar142 = vpor_avx2(auVar143,auVar142);
  auVar12 = vpaddd_avx2(auVar12,auVar70);
  auVar70 = vpaddd_avx2(auVar72 ^ auVar95 ^ auVar74,auVar70);
  auVar70 = vpaddd_avx2(auVar70,auVar142);
  auVar142 = vpsrld_avx2(auVar12,6);
  auVar143 = vpslld_avx2(auVar12,0x1a);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar12,0xb);
  auVar143 = vpslld_avx2(auVar12,0x15);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar12,0x19);
  auVar143 = vpslld_avx2(auVar12,7);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpandn_avx2(auVar12,auVar20);
  auVar142 = vpand_avx2(auVar12,auVar11);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar141 = vpaddd_avx2(auVar141,auVar142);
  auVar141 = vpaddd_avx2(auVar141,auVar27);
  auVar141 = vpaddd_avx2(auVar141,auVar72 ^ auVar95 ^ auVar74);
  auVar142 = vpsrld_avx2(auVar70,2);
  auVar143 = vpslld_avx2(auVar70,0x1e);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar70,0xd);
  auVar143 = vpslld_avx2(auVar70,0x13);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar70,0x16);
  auVar143 = vpslld_avx2(auVar70,10);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpor_avx2(auVar70,auVar39);
  auVar142 = vpand_avx2(auVar38,auVar142);
  auVar143 = vpand_avx2(auVar70,auVar39);
  auVar142 = vpor_avx2(auVar143,auVar142);
  auVar42 = vpaddd_avx2(auVar42,auVar141);
  auVar141 = vpaddd_avx2(auVar72 ^ auVar95 ^ auVar74,auVar141);
  auVar141 = vpaddd_avx2(auVar142,auVar141);
  auVar142 = vpsrld_avx2(auVar42,6);
  auVar143 = vpslld_avx2(auVar42,0x1a);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar42,0xb);
  auVar143 = vpslld_avx2(auVar42,0x15);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar42,0x19);
  auVar143 = vpslld_avx2(auVar42,7);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpandn_avx2(auVar42,auVar11);
  auVar142 = vpand_avx2(auVar12,auVar42);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar20 = vpaddd_avx2(auVar20,auVar142);
  auVar20 = vpaddd_avx2(auVar20,auVar28);
  auVar20 = vpaddd_avx2(auVar20,auVar72 ^ auVar95 ^ auVar74);
  auVar142 = vpsrld_avx2(auVar141,2);
  auVar143 = vpslld_avx2(auVar141,0x1e);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar141,0xd);
  auVar143 = vpslld_avx2(auVar141,0x13);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar141,0x16);
  auVar143 = vpslld_avx2(auVar141,10);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpor_avx2(auVar141,auVar70);
  auVar142 = vpand_avx2(auVar39,auVar142);
  auVar143 = vpand_avx2(auVar141,auVar70);
  auVar142 = vpor_avx2(auVar143,auVar142);
  auVar38 = vpaddd_avx2(auVar38,auVar20);
  auVar20 = vpaddd_avx2(auVar72 ^ auVar95 ^ auVar74,auVar20);
  auVar20 = vpaddd_avx2(auVar142,auVar20);
  auVar142 = vpsrld_avx2(auVar38,6);
  auVar143 = vpslld_avx2(auVar38,0x1a);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar38,0xb);
  auVar143 = vpslld_avx2(auVar38,0x15);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar38,0x19);
  auVar143 = vpslld_avx2(auVar38,7);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpandn_avx2(auVar38,auVar12);
  auVar142 = vpand_avx2(auVar42,auVar38);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar11 = vpaddd_avx2(auVar11,auVar142);
  auVar11 = vpaddd_avx2(auVar11,auVar29);
  auVar11 = vpaddd_avx2(auVar11,auVar72 ^ auVar95 ^ auVar74);
  auVar142 = vpsrld_avx2(auVar20,2);
  auVar143 = vpslld_avx2(auVar20,0x1e);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar20,0xd);
  auVar143 = vpslld_avx2(auVar20,0x13);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar20,0x16);
  auVar143 = vpslld_avx2(auVar20,10);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpor_avx2(auVar20,auVar141);
  auVar142 = vpand_avx2(auVar70,auVar142);
  auVar143 = vpand_avx2(auVar20,auVar141);
  auVar142 = vpor_avx2(auVar143,auVar142);
  auVar39 = vpaddd_avx2(auVar39,auVar11);
  auVar11 = vpaddd_avx2(auVar72 ^ auVar95 ^ auVar74,auVar11);
  auVar11 = vpaddd_avx2(auVar142,auVar11);
  auVar142 = vpsrld_avx2(auVar39,6);
  auVar143 = vpslld_avx2(auVar39,0x1a);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar39,0xb);
  auVar143 = vpslld_avx2(auVar39,0x15);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar39,0x19);
  auVar143 = vpslld_avx2(auVar39,7);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpandn_avx2(auVar39,auVar42);
  auVar142 = vpand_avx2(auVar38,auVar39);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar12 = vpaddd_avx2(auVar12,auVar142);
  auVar12 = vpaddd_avx2(auVar12,auVar30);
  auVar12 = vpaddd_avx2(auVar12,auVar72 ^ auVar95 ^ auVar74);
  auVar142 = vpsrld_avx2(auVar11,2);
  auVar143 = vpslld_avx2(auVar11,0x1e);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar11,0xd);
  auVar143 = vpslld_avx2(auVar11,0x13);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar11,0x16);
  auVar143 = vpslld_avx2(auVar11,10);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpor_avx2(auVar11,auVar20);
  auVar142 = vpand_avx2(auVar142,auVar141);
  auVar143 = vpand_avx2(auVar11,auVar20);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar70 = vpaddd_avx2(auVar70,auVar12);
  auVar12 = vpaddd_avx2(auVar74 ^ auVar72 ^ auVar95,auVar12);
  auVar12 = vpaddd_avx2(auVar142,auVar12);
  auVar142 = vpsrld_avx2(auVar70,6);
  auVar143 = vpslld_avx2(auVar70,0x1a);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar70,0xb);
  auVar143 = vpslld_avx2(auVar70,0x15);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar70,0x19);
  auVar143 = vpslld_avx2(auVar70,7);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpandn_avx2(auVar70,auVar38);
  auVar142 = vpand_avx2(auVar70,auVar39);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar42 = vpaddd_avx2(auVar42,auVar142);
  auVar78._8_4_ = 0xc19bf374;
  auVar78._0_8_ = 0xc19bf374c19bf374;
  auVar78._12_4_ = 0xc19bf374;
  auVar78._16_4_ = 0xc19bf374;
  auVar78._20_4_ = 0xc19bf374;
  auVar78._24_4_ = 0xc19bf374;
  auVar78._28_4_ = 0xc19bf374;
  auVar42 = vpaddd_avx2(auVar42,auVar78);
  auVar42 = vpaddd_avx2(auVar42,auVar72 ^ auVar95 ^ auVar74);
  auVar142 = vpsrld_avx2(auVar12,2);
  auVar143 = vpslld_avx2(auVar12,0x1e);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar12,0xd);
  auVar143 = vpslld_avx2(auVar12,0x13);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar12,0x16);
  auVar143 = vpslld_avx2(auVar12,10);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpor_avx2(auVar12,auVar11);
  auVar142 = vpand_avx2(auVar20,auVar142);
  auVar143 = vpand_avx2(auVar12,auVar11);
  auVar142 = vpor_avx2(auVar143,auVar142);
  auVar141 = vpaddd_avx2(auVar141,auVar42);
  auVar42 = vpaddd_avx2(auVar72 ^ auVar95 ^ auVar74,auVar42);
  auVar42 = vpaddd_avx2(auVar42,auVar142);
  auVar142 = vpsrld_avx2(auVar141,6);
  auVar143 = vpslld_avx2(auVar141,0x1a);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar141,0xb);
  auVar143 = vpslld_avx2(auVar141,0x15);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar141,0x19);
  auVar143 = vpslld_avx2(auVar141,7);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpandn_avx2(auVar141,auVar39);
  auVar142 = vpand_avx2(auVar70,auVar141);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar38 = vpaddd_avx2(auVar38,auVar142);
  auVar107._8_4_ = 0x649b69c1;
  auVar107._0_8_ = 0x649b69c1649b69c1;
  auVar107._12_4_ = 0x649b69c1;
  auVar107._16_4_ = 0x649b69c1;
  auVar107._20_4_ = 0x649b69c1;
  auVar107._24_4_ = 0x649b69c1;
  auVar107._28_4_ = 0x649b69c1;
  auVar38 = vpaddd_avx2(auVar38,auVar107);
  auVar38 = vpaddd_avx2(auVar38,auVar72 ^ auVar95 ^ auVar74);
  auVar142 = vpsrld_avx2(auVar42,2);
  auVar143 = vpslld_avx2(auVar42,0x1e);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar42,0xd);
  auVar143 = vpslld_avx2(auVar42,0x13);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar42,0x16);
  auVar143 = vpslld_avx2(auVar42,10);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpor_avx2(auVar42,auVar12);
  auVar142 = vpand_avx2(auVar11,auVar142);
  auVar143 = vpand_avx2(auVar42,auVar12);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar20 = vpaddd_avx2(auVar20,auVar38);
  auVar38 = vpaddd_avx2(auVar72 ^ auVar95 ^ auVar74,auVar38);
  auVar38 = vpaddd_avx2(auVar38,auVar142);
  auVar142 = vpsrld_avx2(auVar20,6);
  auVar143 = vpslld_avx2(auVar20,0x1a);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar20,0xb);
  auVar143 = vpslld_avx2(auVar20,0x15);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar20,0x19);
  auVar143 = vpslld_avx2(auVar20,7);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpandn_avx2(auVar20,auVar70);
  auVar142 = vpand_avx2(auVar141,auVar20);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar79._8_4_ = 0xf0fe4786;
  auVar79._0_8_ = 0xf0fe4786f0fe4786;
  auVar79._12_4_ = 0xf0fe4786;
  auVar79._16_4_ = 0xf0fe4786;
  auVar79._20_4_ = 0xf0fe4786;
  auVar79._24_4_ = 0xf0fe4786;
  auVar79._28_4_ = 0xf0fe4786;
  auVar39 = vpaddd_avx2(auVar39,auVar142);
  auVar39 = vpaddd_avx2(auVar39,auVar79);
  auVar39 = vpaddd_avx2(auVar39,auVar72 ^ auVar95 ^ auVar74);
  auVar142 = vpsrld_avx2(auVar38,2);
  auVar143 = vpslld_avx2(auVar38,0x1e);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar38,0xd);
  auVar143 = vpslld_avx2(auVar38,0x13);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar38,0x16);
  auVar143 = vpslld_avx2(auVar38,10);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpor_avx2(auVar38,auVar42);
  auVar142 = vpand_avx2(auVar12,auVar142);
  auVar143 = vpand_avx2(auVar38,auVar42);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar11 = vpaddd_avx2(auVar11,auVar39);
  auVar39 = vpaddd_avx2(auVar72 ^ auVar95 ^ auVar74,auVar39);
  auVar39 = vpaddd_avx2(auVar39,auVar142);
  auVar142 = vpsrld_avx2(auVar11,6);
  auVar143 = vpslld_avx2(auVar11,0x1a);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar11,0xb);
  auVar143 = vpslld_avx2(auVar11,0x15);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar11,0x19);
  auVar143 = vpslld_avx2(auVar11,7);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpandn_avx2(auVar11,auVar141);
  auVar142 = vpand_avx2(auVar11,auVar20);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar70 = vpaddd_avx2(auVar70,auVar142);
  auVar108._8_4_ = 0xfe1edc6;
  auVar108._0_8_ = 0xfe1edc60fe1edc6;
  auVar108._12_4_ = 0xfe1edc6;
  auVar108._16_4_ = 0xfe1edc6;
  auVar108._20_4_ = 0xfe1edc6;
  auVar108._24_4_ = 0xfe1edc6;
  auVar108._28_4_ = 0xfe1edc6;
  auVar70 = vpaddd_avx2(auVar70,auVar108);
  auVar70 = vpaddd_avx2(auVar70,auVar72 ^ auVar95 ^ auVar74);
  auVar142 = vpsrld_avx2(auVar39,2);
  auVar143 = vpslld_avx2(auVar39,0x1e);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar39,0xd);
  auVar143 = vpslld_avx2(auVar39,0x13);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar39,0x16);
  auVar143 = vpslld_avx2(auVar39,10);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpor_avx2(auVar39,auVar38);
  auVar142 = vpand_avx2(auVar42,auVar142);
  auVar143 = vpand_avx2(auVar39,auVar38);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar12 = vpaddd_avx2(auVar12,auVar70);
  auVar70 = vpaddd_avx2(auVar72 ^ auVar95 ^ auVar74,auVar70);
  auVar70 = vpaddd_avx2(auVar70,auVar142);
  auVar142 = vpsrld_avx2(auVar12,6);
  auVar143 = vpslld_avx2(auVar12,0x1a);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar12,0xb);
  auVar143 = vpslld_avx2(auVar12,0x15);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar12,0x19);
  auVar143 = vpslld_avx2(auVar12,7);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpandn_avx2(auVar12,auVar20);
  auVar142 = vpand_avx2(auVar11,auVar12);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar141 = vpaddd_avx2(auVar141,auVar142);
  auVar110._8_4_ = 0x240cf254;
  auVar110._0_8_ = 0x240cf254240cf254;
  auVar110._12_4_ = 0x240cf254;
  auVar110._16_4_ = 0x240cf254;
  auVar110._20_4_ = 0x240cf254;
  auVar110._24_4_ = 0x240cf254;
  auVar110._28_4_ = 0x240cf254;
  auVar141 = vpaddd_avx2(auVar141,auVar110);
  auVar141 = vpaddd_avx2(auVar141,auVar72 ^ auVar95 ^ auVar74);
  auVar142 = vpsrld_avx2(auVar70,2);
  auVar143 = vpslld_avx2(auVar70,0x1e);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar70,0xd);
  auVar143 = vpslld_avx2(auVar70,0x13);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar70,0x16);
  auVar143 = vpslld_avx2(auVar70,10);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpor_avx2(auVar70,auVar39);
  auVar142 = vpand_avx2(auVar38,auVar142);
  auVar143 = vpand_avx2(auVar70,auVar39);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar42 = vpaddd_avx2(auVar42,auVar141);
  auVar141 = vpaddd_avx2(auVar72 ^ auVar95 ^ auVar74,auVar141);
  auVar141 = vpaddd_avx2(auVar141,auVar142);
  auVar142 = vpsrld_avx2(auVar42,6);
  auVar143 = vpslld_avx2(auVar42,0x1a);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar42,0xb);
  auVar143 = vpslld_avx2(auVar42,0x15);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar42,0x19);
  auVar143 = vpslld_avx2(auVar42,7);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpandn_avx2(auVar42,auVar11);
  auVar142 = vpand_avx2(auVar12,auVar42);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar20 = vpaddd_avx2(auVar20,auVar142);
  auVar142._8_4_ = 0x4fe9346f;
  auVar142._0_8_ = 0x4fe9346f4fe9346f;
  auVar142._12_4_ = 0x4fe9346f;
  auVar142._16_4_ = 0x4fe9346f;
  auVar142._20_4_ = 0x4fe9346f;
  auVar142._24_4_ = 0x4fe9346f;
  auVar142._28_4_ = 0x4fe9346f;
  auVar20 = vpaddd_avx2(auVar20,auVar142);
  auVar20 = vpaddd_avx2(auVar20,auVar72 ^ auVar95 ^ auVar74);
  auVar142 = vpsrld_avx2(auVar141,2);
  auVar143 = vpslld_avx2(auVar141,0x1e);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar141,0xd);
  auVar143 = vpslld_avx2(auVar141,0x13);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar141,0x16);
  auVar143 = vpslld_avx2(auVar141,10);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpor_avx2(auVar141,auVar70);
  auVar142 = vpand_avx2(auVar39,auVar142);
  auVar143 = vpand_avx2(auVar141,auVar70);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar38 = vpaddd_avx2(auVar38,auVar20);
  auVar20 = vpaddd_avx2(auVar72 ^ auVar95 ^ auVar74,auVar20);
  auVar20 = vpaddd_avx2(auVar20,auVar142);
  auVar142 = vpsrld_avx2(auVar38,6);
  auVar143 = vpslld_avx2(auVar38,0x1a);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar38,0xb);
  auVar143 = vpslld_avx2(auVar38,0x15);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar38,0x19);
  auVar143 = vpslld_avx2(auVar38,7);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpandn_avx2(auVar38,auVar12);
  auVar142 = vpand_avx2(auVar42,auVar38);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar46._8_4_ = 0x6cc984be;
  auVar46._0_8_ = 0x6cc984be6cc984be;
  auVar46._12_4_ = 0x6cc984be;
  auVar46._16_4_ = 0x6cc984be;
  auVar46._20_4_ = 0x6cc984be;
  auVar46._24_4_ = 0x6cc984be;
  auVar46._28_4_ = 0x6cc984be;
  auVar11 = vpaddd_avx2(auVar11,auVar142);
  auVar11 = vpaddd_avx2(auVar11,auVar46);
  auVar11 = vpaddd_avx2(auVar11,auVar72 ^ auVar95 ^ auVar74);
  auVar142 = vpsrld_avx2(auVar20,2);
  auVar143 = vpslld_avx2(auVar20,0x1e);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar20,0xd);
  auVar143 = vpslld_avx2(auVar20,0x13);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar20,0x16);
  auVar143 = vpslld_avx2(auVar20,10);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpor_avx2(auVar20,auVar141);
  auVar142 = vpand_avx2(auVar70,auVar142);
  auVar143 = vpand_avx2(auVar20,auVar141);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar39 = vpaddd_avx2(auVar39,auVar11);
  auVar11 = vpaddd_avx2(auVar72 ^ auVar95 ^ auVar74,auVar11);
  auVar11 = vpaddd_avx2(auVar11,auVar142);
  auVar142 = vpsrld_avx2(auVar39,6);
  auVar143 = vpslld_avx2(auVar39,0x1a);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar39,0xb);
  auVar143 = vpslld_avx2(auVar39,0x15);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar39,0x19);
  auVar143 = vpslld_avx2(auVar39,7);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpandn_avx2(auVar39,auVar42);
  auVar142 = vpand_avx2(auVar39,auVar38);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar12 = vpaddd_avx2(auVar12,auVar142);
  auVar47._8_4_ = 0x61b9411e;
  auVar47._0_8_ = 0x61b9411e61b9411e;
  auVar47._12_4_ = 0x61b9411e;
  auVar47._16_4_ = 0x61b9411e;
  auVar47._20_4_ = 0x61b9411e;
  auVar47._24_4_ = 0x61b9411e;
  auVar47._28_4_ = 0x61b9411e;
  auVar12 = vpaddd_avx2(auVar12,auVar47);
  auVar12 = vpaddd_avx2(auVar12,auVar72 ^ auVar95 ^ auVar74);
  auVar142 = vpsrld_avx2(auVar11,2);
  auVar143 = vpslld_avx2(auVar11,0x1e);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar11,0xd);
  auVar143 = vpslld_avx2(auVar11,0x13);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar11,0x16);
  auVar143 = vpslld_avx2(auVar11,10);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpor_avx2(auVar11,auVar20);
  auVar142 = vpand_avx2(auVar141,auVar142);
  auVar143 = vpand_avx2(auVar11,auVar20);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar70 = vpaddd_avx2(auVar70,auVar12);
  auVar12 = vpaddd_avx2(auVar72 ^ auVar95 ^ auVar74,auVar12);
  auVar12 = vpaddd_avx2(auVar12,auVar142);
  auVar142 = vpsrld_avx2(auVar70,6);
  auVar143 = vpslld_avx2(auVar70,0x1a);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar70,0xb);
  auVar143 = vpslld_avx2(auVar70,0x15);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar70,0x19);
  auVar143 = vpslld_avx2(auVar70,7);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpandn_avx2(auVar70,auVar38);
  auVar142 = vpand_avx2(auVar39,auVar70);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar42 = vpaddd_avx2(auVar42,auVar142);
  auVar48._8_4_ = 0x16f988fa;
  auVar48._0_8_ = 0x16f988fa16f988fa;
  auVar48._12_4_ = 0x16f988fa;
  auVar48._16_4_ = 0x16f988fa;
  auVar48._20_4_ = 0x16f988fa;
  auVar48._24_4_ = 0x16f988fa;
  auVar48._28_4_ = 0x16f988fa;
  auVar42 = vpaddd_avx2(auVar42,auVar48);
  auVar42 = vpaddd_avx2(auVar42,auVar72 ^ auVar95 ^ auVar74);
  auVar142 = vpsrld_avx2(auVar12,2);
  auVar143 = vpslld_avx2(auVar12,0x1e);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar12,0xd);
  auVar143 = vpslld_avx2(auVar12,0x13);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar12,0x16);
  auVar143 = vpslld_avx2(auVar12,10);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpor_avx2(auVar12,auVar11);
  auVar142 = vpand_avx2(auVar20,auVar142);
  auVar143 = vpand_avx2(auVar12,auVar11);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar141 = vpaddd_avx2(auVar141,auVar42);
  auVar42 = vpaddd_avx2(auVar72 ^ auVar95 ^ auVar74,auVar42);
  auVar42 = vpaddd_avx2(auVar42,auVar142);
  auVar142 = vpsrld_avx2(auVar141,6);
  auVar143 = vpslld_avx2(auVar141,0x1a);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar141,0xb);
  auVar143 = vpslld_avx2(auVar141,0x15);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar141,0x19);
  auVar143 = vpslld_avx2(auVar141,7);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpandn_avx2(auVar141,auVar39);
  auVar142 = vpand_avx2(auVar70,auVar141);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar38 = vpaddd_avx2(auVar38,auVar142);
  auVar143._8_4_ = 0xf2c65152;
  auVar143._0_8_ = 0xf2c65152f2c65152;
  auVar143._12_4_ = 0xf2c65152;
  auVar143._16_4_ = 0xf2c65152;
  auVar143._20_4_ = 0xf2c65152;
  auVar143._24_4_ = 0xf2c65152;
  auVar143._28_4_ = 0xf2c65152;
  auVar38 = vpaddd_avx2(auVar38,auVar143);
  auVar38 = vpaddd_avx2(auVar38,auVar72 ^ auVar95 ^ auVar74);
  auVar142 = vpsrld_avx2(auVar42,2);
  auVar143 = vpslld_avx2(auVar42,0x1e);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar42,0xd);
  auVar143 = vpslld_avx2(auVar42,0x13);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar42,0x16);
  auVar143 = vpslld_avx2(auVar42,10);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpor_avx2(auVar42,auVar12);
  auVar142 = vpand_avx2(auVar11,auVar142);
  auVar143 = vpand_avx2(auVar42,auVar12);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar20 = vpaddd_avx2(auVar20,auVar38);
  auVar38 = vpaddd_avx2(auVar72 ^ auVar95 ^ auVar74,auVar38);
  auVar38 = vpaddd_avx2(auVar38,auVar142);
  auVar142 = vpsrld_avx2(auVar20,6);
  auVar143 = vpslld_avx2(auVar20,0x1a);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar20,0xb);
  auVar143 = vpslld_avx2(auVar20,0x15);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar20,0x19);
  auVar143 = vpslld_avx2(auVar20,7);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpandn_avx2(auVar20,auVar70);
  auVar142 = vpand_avx2(auVar141,auVar20);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar49._8_4_ = 0xa88e5a6d;
  auVar49._0_8_ = 0xa88e5a6da88e5a6d;
  auVar49._12_4_ = 0xa88e5a6d;
  auVar49._16_4_ = 0xa88e5a6d;
  auVar49._20_4_ = 0xa88e5a6d;
  auVar49._24_4_ = 0xa88e5a6d;
  auVar49._28_4_ = 0xa88e5a6d;
  auVar39 = vpaddd_avx2(auVar39,auVar142);
  auVar39 = vpaddd_avx2(auVar39,auVar49);
  auVar39 = vpaddd_avx2(auVar39,auVar72 ^ auVar95 ^ auVar74);
  auVar142 = vpsrld_avx2(auVar38,2);
  auVar143 = vpslld_avx2(auVar38,0x1e);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar38,0xd);
  auVar143 = vpslld_avx2(auVar38,0x13);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar38,0x16);
  auVar143 = vpslld_avx2(auVar38,10);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpor_avx2(auVar38,auVar42);
  auVar142 = vpand_avx2(auVar12,auVar142);
  auVar143 = vpand_avx2(auVar38,auVar42);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar11 = vpaddd_avx2(auVar11,auVar39);
  auVar39 = vpaddd_avx2(auVar72 ^ auVar95 ^ auVar74,auVar39);
  auVar39 = vpaddd_avx2(auVar39,auVar142);
  auVar142 = vpsrld_avx2(auVar11,6);
  auVar143 = vpslld_avx2(auVar11,0x1a);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar11,0xb);
  auVar143 = vpslld_avx2(auVar11,0x15);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar11,0x19);
  auVar143 = vpslld_avx2(auVar11,7);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpandn_avx2(auVar11,auVar141);
  auVar142 = vpand_avx2(auVar11,auVar20);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar70 = vpaddd_avx2(auVar70,auVar142);
  auVar50._8_4_ = 0xb019fc65;
  auVar50._0_8_ = 0xb019fc65b019fc65;
  auVar50._12_4_ = 0xb019fc65;
  auVar50._16_4_ = 0xb019fc65;
  auVar50._20_4_ = 0xb019fc65;
  auVar50._24_4_ = 0xb019fc65;
  auVar50._28_4_ = 0xb019fc65;
  auVar70 = vpaddd_avx2(auVar70,auVar50);
  auVar70 = vpaddd_avx2(auVar70,auVar72 ^ auVar95 ^ auVar74);
  auVar142 = vpsrld_avx2(auVar39,2);
  auVar143 = vpslld_avx2(auVar39,0x1e);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar39,0xd);
  auVar143 = vpslld_avx2(auVar39,0x13);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar39,0x16);
  auVar143 = vpslld_avx2(auVar39,10);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpor_avx2(auVar39,auVar38);
  auVar142 = vpand_avx2(auVar42,auVar142);
  auVar143 = vpand_avx2(auVar39,auVar38);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar12 = vpaddd_avx2(auVar12,auVar70);
  auVar70 = vpaddd_avx2(auVar72 ^ auVar95 ^ auVar74,auVar70);
  auVar70 = vpaddd_avx2(auVar70,auVar142);
  auVar142 = vpsrld_avx2(auVar12,6);
  auVar143 = vpslld_avx2(auVar12,0x1a);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar12,0xb);
  auVar143 = vpslld_avx2(auVar12,0x15);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar12,0x19);
  auVar143 = vpslld_avx2(auVar12,7);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpandn_avx2(auVar12,auVar20);
  auVar142 = vpand_avx2(auVar11,auVar12);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar141 = vpaddd_avx2(auVar141,auVar142);
  auVar51._8_4_ = 0xb9d99ec7;
  auVar51._0_8_ = 0xb9d99ec7b9d99ec7;
  auVar51._12_4_ = 0xb9d99ec7;
  auVar51._16_4_ = 0xb9d99ec7;
  auVar51._20_4_ = 0xb9d99ec7;
  auVar51._24_4_ = 0xb9d99ec7;
  auVar51._28_4_ = 0xb9d99ec7;
  auVar141 = vpaddd_avx2(auVar141,auVar51);
  auVar141 = vpaddd_avx2(auVar141,auVar72 ^ auVar95 ^ auVar74);
  auVar142 = vpsrld_avx2(auVar70,2);
  auVar143 = vpslld_avx2(auVar70,0x1e);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar70,0xd);
  auVar143 = vpslld_avx2(auVar70,0x13);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar70,0x16);
  auVar143 = vpslld_avx2(auVar70,10);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpor_avx2(auVar70,auVar39);
  auVar142 = vpand_avx2(auVar38,auVar142);
  auVar143 = vpand_avx2(auVar70,auVar39);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar42 = vpaddd_avx2(auVar42,auVar141);
  auVar141 = vpaddd_avx2(auVar72 ^ auVar95 ^ auVar74,auVar141);
  auVar141 = vpaddd_avx2(auVar141,auVar142);
  auVar142 = vpsrld_avx2(auVar42,6);
  auVar143 = vpslld_avx2(auVar42,0x1a);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar42,0xb);
  auVar143 = vpslld_avx2(auVar42,0x15);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar42,0x19);
  auVar143 = vpslld_avx2(auVar42,7);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpandn_avx2(auVar42,auVar11);
  auVar142 = vpand_avx2(auVar12,auVar42);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar20 = vpaddd_avx2(auVar20,auVar142);
  auVar6._8_4_ = 0x9a1231c3;
  auVar6._0_8_ = 0x9a1231c39a1231c3;
  auVar6._12_4_ = 0x9a1231c3;
  auVar6._16_4_ = 0x9a1231c3;
  auVar6._20_4_ = 0x9a1231c3;
  auVar6._24_4_ = 0x9a1231c3;
  auVar6._28_4_ = 0x9a1231c3;
  auVar20 = vpaddd_avx2(auVar20,auVar6);
  auVar20 = vpaddd_avx2(auVar20,auVar72 ^ auVar95 ^ auVar74);
  auVar142 = vpsrld_avx2(auVar141,2);
  auVar143 = vpslld_avx2(auVar141,0x1e);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar141,0xd);
  auVar143 = vpslld_avx2(auVar141,0x13);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar141,0x16);
  auVar143 = vpslld_avx2(auVar141,10);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpor_avx2(auVar141,auVar70);
  auVar142 = vpand_avx2(auVar39,auVar142);
  auVar143 = vpand_avx2(auVar141,auVar70);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar38 = vpaddd_avx2(auVar38,auVar20);
  auVar20 = vpaddd_avx2(auVar72 ^ auVar95 ^ auVar74,auVar20);
  auVar20 = vpaddd_avx2(auVar20,auVar142);
  auVar142 = vpsrld_avx2(auVar38,6);
  auVar143 = vpslld_avx2(auVar38,0x1a);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar38,0xb);
  auVar143 = vpslld_avx2(auVar38,0x15);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar38,0x19);
  auVar143 = vpslld_avx2(auVar38,7);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpandn_avx2(auVar38,auVar12);
  auVar142 = vpand_avx2(auVar42,auVar38);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar52._8_4_ = 0xe70eeaa0;
  auVar52._0_8_ = 0xe70eeaa0e70eeaa0;
  auVar52._12_4_ = 0xe70eeaa0;
  auVar52._16_4_ = 0xe70eeaa0;
  auVar52._20_4_ = 0xe70eeaa0;
  auVar52._24_4_ = 0xe70eeaa0;
  auVar52._28_4_ = 0xe70eeaa0;
  auVar11 = vpaddd_avx2(auVar11,auVar142);
  auVar11 = vpaddd_avx2(auVar11,auVar52);
  auVar11 = vpaddd_avx2(auVar11,auVar72 ^ auVar95 ^ auVar74);
  auVar142 = vpsrld_avx2(auVar20,2);
  auVar143 = vpslld_avx2(auVar20,0x1e);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar20,0xd);
  auVar143 = vpslld_avx2(auVar20,0x13);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar20,0x16);
  auVar143 = vpslld_avx2(auVar20,10);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpor_avx2(auVar20,auVar141);
  auVar142 = vpand_avx2(auVar70,auVar142);
  auVar143 = vpand_avx2(auVar20,auVar141);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar39 = vpaddd_avx2(auVar39,auVar11);
  auVar11 = vpaddd_avx2(auVar72 ^ auVar95 ^ auVar74,auVar11);
  auVar11 = vpaddd_avx2(auVar11,auVar142);
  auVar142 = vpsrld_avx2(auVar39,6);
  auVar143 = vpslld_avx2(auVar39,0x1a);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar39,0xb);
  auVar143 = vpslld_avx2(auVar39,0x15);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar39,0x19);
  auVar143 = vpslld_avx2(auVar39,7);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpandn_avx2(auVar39,auVar42);
  auVar142 = vpand_avx2(auVar39,auVar38);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar12 = vpaddd_avx2(auVar12,auVar142);
  auVar53._8_4_ = 0xfdb1232b;
  auVar53._0_8_ = 0xfdb1232bfdb1232b;
  auVar53._12_4_ = 0xfdb1232b;
  auVar53._16_4_ = 0xfdb1232b;
  auVar53._20_4_ = 0xfdb1232b;
  auVar53._24_4_ = 0xfdb1232b;
  auVar53._28_4_ = 0xfdb1232b;
  auVar12 = vpaddd_avx2(auVar12,auVar53);
  auVar12 = vpaddd_avx2(auVar12,auVar72 ^ auVar95 ^ auVar74);
  auVar142 = vpsrld_avx2(auVar11,2);
  auVar143 = vpslld_avx2(auVar11,0x1e);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar11,0xd);
  auVar143 = vpslld_avx2(auVar11,0x13);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar11,0x16);
  auVar143 = vpslld_avx2(auVar11,10);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpor_avx2(auVar11,auVar20);
  auVar142 = vpand_avx2(auVar141,auVar142);
  auVar143 = vpand_avx2(auVar11,auVar20);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar70 = vpaddd_avx2(auVar70,auVar12);
  auVar12 = vpaddd_avx2(auVar72 ^ auVar95 ^ auVar74,auVar12);
  auVar12 = vpaddd_avx2(auVar12,auVar142);
  auVar142 = vpsrld_avx2(auVar70,6);
  auVar143 = vpslld_avx2(auVar70,0x1a);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar70,0xb);
  auVar143 = vpslld_avx2(auVar70,0x15);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar70,0x19);
  auVar143 = vpslld_avx2(auVar70,7);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpandn_avx2(auVar70,auVar38);
  auVar142 = vpand_avx2(auVar39,auVar70);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar42 = vpaddd_avx2(auVar42,auVar142);
  auVar54._8_4_ = 0xc7353eb0;
  auVar54._0_8_ = 0xc7353eb0c7353eb0;
  auVar54._12_4_ = 0xc7353eb0;
  auVar54._16_4_ = 0xc7353eb0;
  auVar54._20_4_ = 0xc7353eb0;
  auVar54._24_4_ = 0xc7353eb0;
  auVar54._28_4_ = 0xc7353eb0;
  auVar42 = vpaddd_avx2(auVar42,auVar54);
  auVar42 = vpaddd_avx2(auVar42,auVar72 ^ auVar95 ^ auVar74);
  auVar142 = vpsrld_avx2(auVar12,2);
  auVar143 = vpslld_avx2(auVar12,0x1e);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar12,0xd);
  auVar143 = vpslld_avx2(auVar12,0x13);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar12,0x16);
  auVar143 = vpslld_avx2(auVar12,10);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpor_avx2(auVar12,auVar11);
  auVar142 = vpand_avx2(auVar20,auVar142);
  auVar143 = vpand_avx2(auVar12,auVar11);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar141 = vpaddd_avx2(auVar141,auVar42);
  auVar42 = vpaddd_avx2(auVar72 ^ auVar95 ^ auVar74,auVar42);
  auVar42 = vpaddd_avx2(auVar42,auVar142);
  auVar142 = vpsrld_avx2(auVar141,6);
  auVar143 = vpslld_avx2(auVar141,0x1a);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar141,0xb);
  auVar143 = vpslld_avx2(auVar141,0x15);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar141,0x19);
  auVar143 = vpslld_avx2(auVar141,7);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpandn_avx2(auVar141,auVar39);
  auVar142 = vpand_avx2(auVar70,auVar141);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar38 = vpaddd_avx2(auVar38,auVar142);
  auVar7._8_4_ = 0x3069bad5;
  auVar7._0_8_ = 0x3069bad53069bad5;
  auVar7._12_4_ = 0x3069bad5;
  auVar7._16_4_ = 0x3069bad5;
  auVar7._20_4_ = 0x3069bad5;
  auVar7._24_4_ = 0x3069bad5;
  auVar7._28_4_ = 0x3069bad5;
  auVar38 = vpaddd_avx2(auVar38,auVar7);
  auVar38 = vpaddd_avx2(auVar38,auVar72 ^ auVar95 ^ auVar74);
  auVar142 = vpsrld_avx2(auVar42,2);
  auVar143 = vpslld_avx2(auVar42,0x1e);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar42,0xd);
  auVar143 = vpslld_avx2(auVar42,0x13);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar42,0x16);
  auVar143 = vpslld_avx2(auVar42,10);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpor_avx2(auVar42,auVar12);
  auVar142 = vpand_avx2(auVar11,auVar142);
  auVar143 = vpand_avx2(auVar42,auVar12);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar20 = vpaddd_avx2(auVar20,auVar38);
  auVar38 = vpaddd_avx2(auVar72 ^ auVar95 ^ auVar74,auVar38);
  auVar38 = vpaddd_avx2(auVar38,auVar142);
  auVar142 = vpsrld_avx2(auVar20,6);
  auVar143 = vpslld_avx2(auVar20,0x1a);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar20,0xb);
  auVar143 = vpslld_avx2(auVar20,0x15);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar20,0x19);
  auVar143 = vpslld_avx2(auVar20,7);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpandn_avx2(auVar20,auVar70);
  auVar142 = vpand_avx2(auVar141,auVar20);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar55._8_4_ = 0xcb976d5f;
  auVar55._0_8_ = 0xcb976d5fcb976d5f;
  auVar55._12_4_ = 0xcb976d5f;
  auVar55._16_4_ = 0xcb976d5f;
  auVar55._20_4_ = 0xcb976d5f;
  auVar55._24_4_ = 0xcb976d5f;
  auVar55._28_4_ = 0xcb976d5f;
  auVar39 = vpaddd_avx2(auVar39,auVar142);
  auVar39 = vpaddd_avx2(auVar39,auVar55);
  auVar39 = vpaddd_avx2(auVar39,auVar72 ^ auVar95 ^ auVar74);
  auVar142 = vpsrld_avx2(auVar38,2);
  auVar143 = vpslld_avx2(auVar38,0x1e);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar38,0xd);
  auVar143 = vpslld_avx2(auVar38,0x13);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar38,0x16);
  auVar143 = vpslld_avx2(auVar38,10);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpor_avx2(auVar38,auVar42);
  auVar142 = vpand_avx2(auVar12,auVar142);
  auVar143 = vpand_avx2(auVar38,auVar42);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar11 = vpaddd_avx2(auVar11,auVar39);
  auVar39 = vpaddd_avx2(auVar72 ^ auVar95 ^ auVar74,auVar39);
  auVar39 = vpaddd_avx2(auVar39,auVar142);
  auVar142 = vpsrld_avx2(auVar11,6);
  auVar143 = vpslld_avx2(auVar11,0x1a);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar11,0xb);
  auVar143 = vpslld_avx2(auVar11,0x15);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar11,0x19);
  auVar143 = vpslld_avx2(auVar11,7);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpandn_avx2(auVar11,auVar141);
  auVar142 = vpand_avx2(auVar11,auVar20);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar70 = vpaddd_avx2(auVar70,auVar142);
  auVar56._8_4_ = 0x5a0f118f;
  auVar56._0_8_ = 0x5a0f118f5a0f118f;
  auVar56._12_4_ = 0x5a0f118f;
  auVar56._16_4_ = 0x5a0f118f;
  auVar56._20_4_ = 0x5a0f118f;
  auVar56._24_4_ = 0x5a0f118f;
  auVar56._28_4_ = 0x5a0f118f;
  auVar70 = vpaddd_avx2(auVar70,auVar56);
  auVar70 = vpaddd_avx2(auVar70,auVar72 ^ auVar95 ^ auVar74);
  auVar142 = vpsrld_avx2(auVar39,2);
  auVar143 = vpslld_avx2(auVar39,0x1e);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar39,0xd);
  auVar143 = vpslld_avx2(auVar39,0x13);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar39,0x16);
  auVar143 = vpslld_avx2(auVar39,10);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpor_avx2(auVar39,auVar38);
  auVar142 = vpand_avx2(auVar42,auVar142);
  auVar143 = vpand_avx2(auVar39,auVar38);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar12 = vpaddd_avx2(auVar12,auVar70);
  auVar70 = vpaddd_avx2(auVar72 ^ auVar95 ^ auVar74,auVar70);
  auVar70 = vpaddd_avx2(auVar70,auVar142);
  auVar142 = vpsrld_avx2(auVar12,6);
  auVar143 = vpslld_avx2(auVar12,0x1a);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar12,0xb);
  auVar143 = vpslld_avx2(auVar12,0x15);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar12,0x19);
  auVar143 = vpslld_avx2(auVar12,7);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpandn_avx2(auVar12,auVar20);
  auVar142 = vpand_avx2(auVar11,auVar12);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar141 = vpaddd_avx2(auVar141,auVar142);
  auVar57._8_4_ = 0xdc1eeefd;
  auVar57._0_8_ = 0xdc1eeefddc1eeefd;
  auVar57._12_4_ = 0xdc1eeefd;
  auVar57._16_4_ = 0xdc1eeefd;
  auVar57._20_4_ = 0xdc1eeefd;
  auVar57._24_4_ = 0xdc1eeefd;
  auVar57._28_4_ = 0xdc1eeefd;
  auVar141 = vpaddd_avx2(auVar141,auVar57);
  auVar141 = vpaddd_avx2(auVar141,auVar72 ^ auVar95 ^ auVar74);
  auVar142 = vpsrld_avx2(auVar70,2);
  auVar143 = vpslld_avx2(auVar70,0x1e);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar70,0xd);
  auVar143 = vpslld_avx2(auVar70,0x13);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar70,0x16);
  auVar143 = vpslld_avx2(auVar70,10);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpor_avx2(auVar70,auVar39);
  auVar142 = vpand_avx2(auVar38,auVar142);
  auVar143 = vpand_avx2(auVar70,auVar39);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar42 = vpaddd_avx2(auVar42,auVar141);
  auVar141 = vpaddd_avx2(auVar72 ^ auVar95 ^ auVar74,auVar141);
  auVar141 = vpaddd_avx2(auVar141,auVar142);
  auVar142 = vpsrld_avx2(auVar42,6);
  auVar143 = vpslld_avx2(auVar42,0x1a);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar42,0xb);
  auVar143 = vpslld_avx2(auVar42,0x15);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar42,0x19);
  auVar143 = vpslld_avx2(auVar42,7);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpandn_avx2(auVar42,auVar11);
  auVar142 = vpand_avx2(auVar12,auVar42);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar20 = vpaddd_avx2(auVar20,auVar142);
  auVar33._8_4_ = 0xa35b689;
  auVar33._0_8_ = 0xa35b6890a35b689;
  auVar33._12_4_ = 0xa35b689;
  auVar33._16_4_ = 0xa35b689;
  auVar33._20_4_ = 0xa35b689;
  auVar33._24_4_ = 0xa35b689;
  auVar33._28_4_ = 0xa35b689;
  auVar20 = vpaddd_avx2(auVar20,auVar33);
  auVar20 = vpaddd_avx2(auVar20,auVar72 ^ auVar95 ^ auVar74);
  auVar142 = vpsrld_avx2(auVar141,2);
  auVar143 = vpslld_avx2(auVar141,0x1e);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar141,0xd);
  auVar143 = vpslld_avx2(auVar141,0x13);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar141,0x16);
  auVar143 = vpslld_avx2(auVar141,10);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpor_avx2(auVar141,auVar70);
  auVar142 = vpand_avx2(auVar39,auVar142);
  auVar143 = vpand_avx2(auVar141,auVar70);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar38 = vpaddd_avx2(auVar38,auVar20);
  auVar20 = vpaddd_avx2(auVar72 ^ auVar95 ^ auVar74,auVar20);
  auVar20 = vpaddd_avx2(auVar20,auVar142);
  auVar142 = vpsrld_avx2(auVar38,6);
  auVar143 = vpslld_avx2(auVar38,0x1a);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar38,0xb);
  auVar143 = vpslld_avx2(auVar38,0x15);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar38,0x19);
  auVar143 = vpslld_avx2(auVar38,7);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpandn_avx2(auVar38,auVar12);
  auVar142 = vpand_avx2(auVar42,auVar38);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar58._8_4_ = 0xde0b7a04;
  auVar58._0_8_ = 0xde0b7a04de0b7a04;
  auVar58._12_4_ = 0xde0b7a04;
  auVar58._16_4_ = 0xde0b7a04;
  auVar58._20_4_ = 0xde0b7a04;
  auVar58._24_4_ = 0xde0b7a04;
  auVar58._28_4_ = 0xde0b7a04;
  auVar11 = vpaddd_avx2(auVar11,auVar142);
  auVar11 = vpaddd_avx2(auVar11,auVar58);
  auVar11 = vpaddd_avx2(auVar11,auVar72 ^ auVar95 ^ auVar74);
  auVar142 = vpsrld_avx2(auVar20,2);
  auVar143 = vpslld_avx2(auVar20,0x1e);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar20,0xd);
  auVar143 = vpslld_avx2(auVar20,0x13);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar20,0x16);
  auVar143 = vpslld_avx2(auVar20,10);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpor_avx2(auVar20,auVar141);
  auVar142 = vpand_avx2(auVar70,auVar142);
  auVar143 = vpand_avx2(auVar20,auVar141);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar39 = vpaddd_avx2(auVar39,auVar11);
  auVar11 = vpaddd_avx2(auVar72 ^ auVar95 ^ auVar74,auVar11);
  auVar11 = vpaddd_avx2(auVar11,auVar142);
  auVar142 = vpsrld_avx2(auVar39,6);
  auVar143 = vpslld_avx2(auVar39,0x1a);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar39,0xb);
  auVar143 = vpslld_avx2(auVar39,0x15);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar39,0x19);
  auVar143 = vpslld_avx2(auVar39,7);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpandn_avx2(auVar39,auVar42);
  auVar142 = vpand_avx2(auVar39,auVar38);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar12 = vpaddd_avx2(auVar12,auVar142);
  auVar59._8_4_ = 0x58f4ca9d;
  auVar59._0_8_ = 0x58f4ca9d58f4ca9d;
  auVar59._12_4_ = 0x58f4ca9d;
  auVar59._16_4_ = 0x58f4ca9d;
  auVar59._20_4_ = 0x58f4ca9d;
  auVar59._24_4_ = 0x58f4ca9d;
  auVar59._28_4_ = 0x58f4ca9d;
  auVar12 = vpaddd_avx2(auVar12,auVar59);
  auVar12 = vpaddd_avx2(auVar12,auVar72 ^ auVar95 ^ auVar74);
  auVar142 = vpsrld_avx2(auVar11,2);
  auVar143 = vpslld_avx2(auVar11,0x1e);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar11,0xd);
  auVar143 = vpslld_avx2(auVar11,0x13);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar11,0x16);
  auVar143 = vpslld_avx2(auVar11,10);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpor_avx2(auVar11,auVar20);
  auVar142 = vpand_avx2(auVar141,auVar142);
  auVar143 = vpand_avx2(auVar11,auVar20);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar70 = vpaddd_avx2(auVar70,auVar12);
  auVar12 = vpaddd_avx2(auVar72 ^ auVar95 ^ auVar74,auVar12);
  auVar12 = vpaddd_avx2(auVar12,auVar142);
  auVar142 = vpsrld_avx2(auVar70,6);
  auVar143 = vpslld_avx2(auVar70,0x1a);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar70,0xb);
  auVar143 = vpslld_avx2(auVar70,0x15);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar70,0x19);
  auVar143 = vpslld_avx2(auVar70,7);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpandn_avx2(auVar70,auVar38);
  auVar142 = vpand_avx2(auVar39,auVar70);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar42 = vpaddd_avx2(auVar42,auVar142);
  auVar60._8_4_ = 0xe15d5b16;
  auVar60._0_8_ = 0xe15d5b16e15d5b16;
  auVar60._12_4_ = 0xe15d5b16;
  auVar60._16_4_ = 0xe15d5b16;
  auVar60._20_4_ = 0xe15d5b16;
  auVar60._24_4_ = 0xe15d5b16;
  auVar60._28_4_ = 0xe15d5b16;
  auVar42 = vpaddd_avx2(auVar42,auVar60);
  auVar42 = vpaddd_avx2(auVar42,auVar72 ^ auVar95 ^ auVar74);
  auVar142 = vpsrld_avx2(auVar12,2);
  auVar143 = vpslld_avx2(auVar12,0x1e);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar12,0xd);
  auVar143 = vpslld_avx2(auVar12,0x13);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar12,0x16);
  auVar143 = vpslld_avx2(auVar12,10);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpor_avx2(auVar12,auVar11);
  auVar142 = vpand_avx2(auVar20,auVar142);
  auVar143 = vpand_avx2(auVar12,auVar11);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar141 = vpaddd_avx2(auVar141,auVar42);
  auVar42 = vpaddd_avx2(auVar72 ^ auVar95 ^ auVar74,auVar42);
  auVar42 = vpaddd_avx2(auVar42,auVar142);
  auVar142 = vpsrld_avx2(auVar141,6);
  auVar143 = vpslld_avx2(auVar141,0x1a);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar141,0xb);
  auVar143 = vpslld_avx2(auVar141,0x15);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar141,0x19);
  auVar143 = vpslld_avx2(auVar141,7);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpandn_avx2(auVar141,auVar39);
  auVar142 = vpand_avx2(auVar70,auVar141);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar38 = vpaddd_avx2(auVar38,auVar142);
  auVar44._8_4_ = 0x7f3e86;
  auVar44._0_8_ = 0x7f3e86007f3e86;
  auVar44._12_4_ = 0x7f3e86;
  auVar44._16_4_ = 0x7f3e86;
  auVar44._20_4_ = 0x7f3e86;
  auVar44._24_4_ = 0x7f3e86;
  auVar44._28_4_ = 0x7f3e86;
  auVar38 = vpaddd_avx2(auVar38,auVar44);
  auVar38 = vpaddd_avx2(auVar38,auVar72 ^ auVar95 ^ auVar74);
  auVar142 = vpsrld_avx2(auVar42,2);
  auVar143 = vpslld_avx2(auVar42,0x1e);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar42,0xd);
  auVar143 = vpslld_avx2(auVar42,0x13);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar42,0x16);
  auVar143 = vpslld_avx2(auVar42,10);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpor_avx2(auVar42,auVar12);
  auVar142 = vpand_avx2(auVar11,auVar142);
  auVar143 = vpand_avx2(auVar42,auVar12);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar20 = vpaddd_avx2(auVar20,auVar38);
  auVar38 = vpaddd_avx2(auVar72 ^ auVar95 ^ auVar74,auVar38);
  auVar38 = vpaddd_avx2(auVar38,auVar142);
  auVar142 = vpsrld_avx2(auVar20,6);
  auVar143 = vpslld_avx2(auVar20,0x1a);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar20,0xb);
  auVar143 = vpslld_avx2(auVar20,0x15);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar20,0x19);
  auVar143 = vpslld_avx2(auVar20,7);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpandn_avx2(auVar20,auVar70);
  auVar142 = vpand_avx2(auVar141,auVar20);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar61._8_4_ = 0x37088980;
  auVar61._0_8_ = 0x3708898037088980;
  auVar61._12_4_ = 0x37088980;
  auVar61._16_4_ = 0x37088980;
  auVar61._20_4_ = 0x37088980;
  auVar61._24_4_ = 0x37088980;
  auVar61._28_4_ = 0x37088980;
  auVar39 = vpaddd_avx2(auVar39,auVar142);
  auVar39 = vpaddd_avx2(auVar39,auVar61);
  auVar39 = vpaddd_avx2(auVar39,auVar72 ^ auVar95 ^ auVar74);
  auVar142 = vpsrld_avx2(auVar38,2);
  auVar143 = vpslld_avx2(auVar38,0x1e);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar38,0xd);
  auVar143 = vpslld_avx2(auVar38,0x13);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar38,0x16);
  auVar143 = vpslld_avx2(auVar38,10);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpor_avx2(auVar38,auVar42);
  auVar142 = vpand_avx2(auVar12,auVar142);
  auVar143 = vpand_avx2(auVar38,auVar42);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar11 = vpaddd_avx2(auVar11,auVar39);
  auVar39 = vpaddd_avx2(auVar72 ^ auVar95 ^ auVar74,auVar39);
  auVar39 = vpaddd_avx2(auVar39,auVar142);
  auVar142 = vpsrld_avx2(auVar11,6);
  auVar143 = vpslld_avx2(auVar11,0x1a);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar11,0xb);
  auVar143 = vpslld_avx2(auVar11,0x15);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar11,0x19);
  auVar143 = vpslld_avx2(auVar11,7);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpandn_avx2(auVar11,auVar141);
  auVar142 = vpand_avx2(auVar11,auVar20);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar70 = vpaddd_avx2(auVar70,auVar142);
  auVar62._8_4_ = 0xa507ea32;
  auVar62._0_8_ = 0xa507ea32a507ea32;
  auVar62._12_4_ = 0xa507ea32;
  auVar62._16_4_ = 0xa507ea32;
  auVar62._20_4_ = 0xa507ea32;
  auVar62._24_4_ = 0xa507ea32;
  auVar62._28_4_ = 0xa507ea32;
  auVar70 = vpaddd_avx2(auVar70,auVar62);
  auVar70 = vpaddd_avx2(auVar70,auVar72 ^ auVar95 ^ auVar74);
  auVar142 = vpsrld_avx2(auVar39,2);
  auVar143 = vpslld_avx2(auVar39,0x1e);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar39,0xd);
  auVar143 = vpslld_avx2(auVar39,0x13);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar39,0x16);
  auVar143 = vpslld_avx2(auVar39,10);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpor_avx2(auVar39,auVar38);
  auVar142 = vpand_avx2(auVar42,auVar142);
  auVar143 = vpand_avx2(auVar39,auVar38);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar12 = vpaddd_avx2(auVar12,auVar70);
  auVar70 = vpaddd_avx2(auVar72 ^ auVar95 ^ auVar74,auVar70);
  auVar70 = vpaddd_avx2(auVar70,auVar142);
  auVar142 = vpsrld_avx2(auVar12,6);
  auVar143 = vpslld_avx2(auVar12,0x1a);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar12,0xb);
  auVar143 = vpslld_avx2(auVar12,0x15);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar12,0x19);
  auVar143 = vpslld_avx2(auVar12,7);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpandn_avx2(auVar12,auVar20);
  auVar142 = vpand_avx2(auVar11,auVar12);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar141 = vpaddd_avx2(auVar141,auVar142);
  auVar63._8_4_ = 0x6fab9537;
  auVar63._0_8_ = 0x6fab95376fab9537;
  auVar63._12_4_ = 0x6fab9537;
  auVar63._16_4_ = 0x6fab9537;
  auVar63._20_4_ = 0x6fab9537;
  auVar63._24_4_ = 0x6fab9537;
  auVar63._28_4_ = 0x6fab9537;
  auVar141 = vpaddd_avx2(auVar141,auVar63);
  auVar141 = vpaddd_avx2(auVar141,auVar72 ^ auVar95 ^ auVar74);
  auVar142 = vpsrld_avx2(auVar70,2);
  auVar143 = vpslld_avx2(auVar70,0x1e);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar70,0xd);
  auVar143 = vpslld_avx2(auVar70,0x13);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar70,0x16);
  auVar143 = vpslld_avx2(auVar70,10);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpor_avx2(auVar70,auVar39);
  auVar142 = vpand_avx2(auVar38,auVar142);
  auVar143 = vpand_avx2(auVar70,auVar39);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar42 = vpaddd_avx2(auVar42,auVar141);
  auVar141 = vpaddd_avx2(auVar72 ^ auVar95 ^ auVar74,auVar141);
  auVar141 = vpaddd_avx2(auVar141,auVar142);
  auVar142 = vpsrld_avx2(auVar42,6);
  auVar143 = vpslld_avx2(auVar42,0x1a);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar42,0xb);
  auVar143 = vpslld_avx2(auVar42,0x15);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar42,0x19);
  auVar143 = vpslld_avx2(auVar42,7);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpandn_avx2(auVar42,auVar11);
  auVar142 = vpand_avx2(auVar12,auVar42);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar20 = vpaddd_avx2(auVar20,auVar142);
  auVar100._8_4_ = 0x17406110;
  auVar100._0_8_ = 0x1740611017406110;
  auVar100._12_4_ = 0x17406110;
  auVar100._16_4_ = 0x17406110;
  auVar100._20_4_ = 0x17406110;
  auVar100._24_4_ = 0x17406110;
  auVar100._28_4_ = 0x17406110;
  auVar20 = vpaddd_avx2(auVar20,auVar100);
  auVar20 = vpaddd_avx2(auVar20,auVar72 ^ auVar95 ^ auVar74);
  auVar142 = vpsrld_avx2(auVar141,2);
  auVar143 = vpslld_avx2(auVar141,0x1e);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar141,0xd);
  auVar143 = vpslld_avx2(auVar141,0x13);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar141,0x16);
  auVar143 = vpslld_avx2(auVar141,10);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpor_avx2(auVar141,auVar70);
  auVar142 = vpand_avx2(auVar39,auVar142);
  auVar143 = vpand_avx2(auVar141,auVar70);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar38 = vpaddd_avx2(auVar38,auVar20);
  auVar20 = vpaddd_avx2(auVar72 ^ auVar95 ^ auVar74,auVar20);
  auVar20 = vpaddd_avx2(auVar20,auVar142);
  auVar142 = vpsrld_avx2(auVar38,6);
  auVar143 = vpslld_avx2(auVar38,0x1a);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar38,0xb);
  auVar143 = vpslld_avx2(auVar38,0x15);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar38,0x19);
  auVar143 = vpslld_avx2(auVar38,7);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpandn_avx2(auVar38,auVar12);
  auVar142 = vpand_avx2(auVar42,auVar38);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar64._8_4_ = 0xd8cd6f1;
  auVar64._0_8_ = 0xd8cd6f10d8cd6f1;
  auVar64._12_4_ = 0xd8cd6f1;
  auVar64._16_4_ = 0xd8cd6f1;
  auVar64._20_4_ = 0xd8cd6f1;
  auVar64._24_4_ = 0xd8cd6f1;
  auVar64._28_4_ = 0xd8cd6f1;
  auVar11 = vpaddd_avx2(auVar11,auVar142);
  auVar11 = vpaddd_avx2(auVar11,auVar64);
  auVar11 = vpaddd_avx2(auVar11,auVar72 ^ auVar95 ^ auVar74);
  auVar142 = vpsrld_avx2(auVar20,2);
  auVar143 = vpslld_avx2(auVar20,0x1e);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar20,0xd);
  auVar143 = vpslld_avx2(auVar20,0x13);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar20,0x16);
  auVar143 = vpslld_avx2(auVar20,10);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpor_avx2(auVar20,auVar141);
  auVar142 = vpand_avx2(auVar70,auVar142);
  auVar143 = vpand_avx2(auVar20,auVar141);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar39 = vpaddd_avx2(auVar39,auVar11);
  auVar11 = vpaddd_avx2(auVar72 ^ auVar95 ^ auVar74,auVar11);
  auVar11 = vpaddd_avx2(auVar11,auVar142);
  auVar142 = vpsrld_avx2(auVar39,6);
  auVar143 = vpslld_avx2(auVar39,0x1a);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar39,0xb);
  auVar143 = vpslld_avx2(auVar39,0x15);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar39,0x19);
  auVar143 = vpslld_avx2(auVar39,7);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpandn_avx2(auVar39,auVar42);
  auVar142 = vpand_avx2(auVar39,auVar38);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar12 = vpaddd_avx2(auVar12,auVar142);
  auVar65._8_4_ = 0xcdaa3b6d;
  auVar65._0_8_ = 0xcdaa3b6dcdaa3b6d;
  auVar65._12_4_ = 0xcdaa3b6d;
  auVar65._16_4_ = 0xcdaa3b6d;
  auVar65._20_4_ = 0xcdaa3b6d;
  auVar65._24_4_ = 0xcdaa3b6d;
  auVar65._28_4_ = 0xcdaa3b6d;
  auVar12 = vpaddd_avx2(auVar12,auVar65);
  auVar12 = vpaddd_avx2(auVar12,auVar72 ^ auVar95 ^ auVar74);
  auVar142 = vpsrld_avx2(auVar11,2);
  auVar143 = vpslld_avx2(auVar11,0x1e);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar11,0xd);
  auVar143 = vpslld_avx2(auVar11,0x13);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar11,0x16);
  auVar143 = vpslld_avx2(auVar11,10);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpor_avx2(auVar11,auVar20);
  auVar142 = vpand_avx2(auVar141,auVar142);
  auVar143 = vpand_avx2(auVar11,auVar20);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar70 = vpaddd_avx2(auVar70,auVar12);
  auVar12 = vpaddd_avx2(auVar72 ^ auVar95 ^ auVar74,auVar12);
  auVar12 = vpaddd_avx2(auVar12,auVar142);
  auVar142 = vpsrld_avx2(auVar70,6);
  auVar143 = vpslld_avx2(auVar70,0x1a);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar70,0xb);
  auVar143 = vpslld_avx2(auVar70,0x15);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar70,0x19);
  auVar143 = vpslld_avx2(auVar70,7);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpandn_avx2(auVar70,auVar38);
  auVar142 = vpand_avx2(auVar39,auVar70);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar42 = vpaddd_avx2(auVar42,auVar142);
  auVar80._8_4_ = 0xc0bbbe37;
  auVar80._0_8_ = 0xc0bbbe37c0bbbe37;
  auVar80._12_4_ = 0xc0bbbe37;
  auVar80._16_4_ = 0xc0bbbe37;
  auVar80._20_4_ = 0xc0bbbe37;
  auVar80._24_4_ = 0xc0bbbe37;
  auVar80._28_4_ = 0xc0bbbe37;
  auVar42 = vpaddd_avx2(auVar42,auVar80);
  auVar42 = vpaddd_avx2(auVar42,auVar72 ^ auVar95 ^ auVar74);
  auVar142 = vpsrld_avx2(auVar12,2);
  auVar143 = vpslld_avx2(auVar12,0x1e);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar12,0xd);
  auVar143 = vpslld_avx2(auVar12,0x13);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar12,0x16);
  auVar143 = vpslld_avx2(auVar12,10);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpor_avx2(auVar12,auVar11);
  auVar142 = vpand_avx2(auVar20,auVar142);
  auVar143 = vpand_avx2(auVar12,auVar11);
  auVar142 = vpor_avx2(auVar143,auVar142);
  auVar141 = vpaddd_avx2(auVar141,auVar42);
  auVar42 = vpaddd_avx2(auVar72 ^ auVar95 ^ auVar74,auVar42);
  auVar42 = vpaddd_avx2(auVar42,auVar142);
  auVar142 = vpsrld_avx2(auVar141,6);
  auVar143 = vpslld_avx2(auVar141,0x1a);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar141,0xb);
  auVar143 = vpslld_avx2(auVar141,0x15);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar141,0x19);
  auVar143 = vpslld_avx2(auVar141,7);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpandn_avx2(auVar141,auVar39);
  auVar142 = vpand_avx2(auVar141,auVar70);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar38 = vpaddd_avx2(auVar38,auVar142);
  auVar66._8_4_ = 0x83613bda;
  auVar66._0_8_ = 0x83613bda83613bda;
  auVar66._12_4_ = 0x83613bda;
  auVar66._16_4_ = 0x83613bda;
  auVar66._20_4_ = 0x83613bda;
  auVar66._24_4_ = 0x83613bda;
  auVar66._28_4_ = 0x83613bda;
  auVar38 = vpaddd_avx2(auVar38,auVar66);
  auVar38 = vpaddd_avx2(auVar38,auVar72 ^ auVar95 ^ auVar74);
  auVar142 = vpsrld_avx2(auVar42,2);
  auVar143 = vpslld_avx2(auVar42,0x1e);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar42,0xd);
  auVar143 = vpslld_avx2(auVar42,0x13);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar42,0x16);
  auVar143 = vpslld_avx2(auVar42,10);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpor_avx2(auVar42,auVar12);
  auVar142 = vpand_avx2(auVar11,auVar142);
  auVar143 = vpand_avx2(auVar42,auVar12);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar20 = vpaddd_avx2(auVar20,auVar38);
  auVar38 = vpaddd_avx2(auVar72 ^ auVar95 ^ auVar74,auVar38);
  auVar38 = vpaddd_avx2(auVar38,auVar142);
  auVar142 = vpsrld_avx2(auVar20,6);
  auVar143 = vpslld_avx2(auVar20,0x1a);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar20,0xb);
  auVar143 = vpslld_avx2(auVar20,0x15);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar20,0x19);
  auVar143 = vpslld_avx2(auVar20,7);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpandn_avx2(auVar20,auVar70);
  auVar142 = vpand_avx2(auVar141,auVar20);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar81._8_4_ = 0xdb48a363;
  auVar81._0_8_ = 0xdb48a363db48a363;
  auVar81._12_4_ = 0xdb48a363;
  auVar81._16_4_ = 0xdb48a363;
  auVar81._20_4_ = 0xdb48a363;
  auVar81._24_4_ = 0xdb48a363;
  auVar81._28_4_ = 0xdb48a363;
  auVar39 = vpaddd_avx2(auVar39,auVar142);
  auVar39 = vpaddd_avx2(auVar39,auVar81);
  auVar39 = vpaddd_avx2(auVar39,auVar72 ^ auVar95 ^ auVar74);
  auVar142 = vpsrld_avx2(auVar38,2);
  auVar143 = vpslld_avx2(auVar38,0x1e);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar38,0xd);
  auVar143 = vpslld_avx2(auVar38,0x13);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar38,0x16);
  auVar143 = vpslld_avx2(auVar38,10);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpor_avx2(auVar38,auVar42);
  auVar142 = vpand_avx2(auVar12,auVar142);
  auVar143 = vpand_avx2(auVar38,auVar42);
  auVar142 = vpor_avx2(auVar143,auVar142);
  auVar11 = vpaddd_avx2(auVar11,auVar39);
  auVar39 = vpaddd_avx2(auVar72 ^ auVar95 ^ auVar74,auVar39);
  auVar39 = vpaddd_avx2(auVar39,auVar142);
  auVar142 = vpsrld_avx2(auVar11,6);
  auVar143 = vpslld_avx2(auVar11,0x1a);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar11,0xb);
  auVar143 = vpslld_avx2(auVar11,0x15);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar11,0x19);
  auVar143 = vpslld_avx2(auVar11,7);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpandn_avx2(auVar11,auVar141);
  auVar142 = vpand_avx2(auVar11,auVar20);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar70 = vpaddd_avx2(auVar70,auVar142);
  auVar67._8_4_ = 0xb02e931;
  auVar67._0_8_ = 0xb02e9310b02e931;
  auVar67._12_4_ = 0xb02e931;
  auVar67._16_4_ = 0xb02e931;
  auVar67._20_4_ = 0xb02e931;
  auVar67._24_4_ = 0xb02e931;
  auVar67._28_4_ = 0xb02e931;
  auVar70 = vpaddd_avx2(auVar70,auVar67);
  auVar70 = vpaddd_avx2(auVar70,auVar72 ^ auVar95 ^ auVar74);
  auVar142 = vpsrld_avx2(auVar39,2);
  auVar143 = vpslld_avx2(auVar39,0x1e);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar39,0xd);
  auVar143 = vpslld_avx2(auVar39,0x13);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar39,0x16);
  auVar143 = vpslld_avx2(auVar39,10);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpor_avx2(auVar39,auVar38);
  auVar142 = vpand_avx2(auVar42,auVar142);
  auVar143 = vpand_avx2(auVar39,auVar38);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar12 = vpaddd_avx2(auVar12,auVar70);
  auVar70 = vpaddd_avx2(auVar72 ^ auVar95 ^ auVar74,auVar70);
  auVar70 = vpaddd_avx2(auVar70,auVar142);
  auVar142 = vpsrld_avx2(auVar12,6);
  auVar143 = vpslld_avx2(auVar12,0x1a);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar12,0xb);
  auVar143 = vpslld_avx2(auVar12,0x15);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar12,0x19);
  auVar143 = vpslld_avx2(auVar12,7);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpandn_avx2(auVar12,auVar20);
  auVar142 = vpand_avx2(auVar11,auVar12);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar141 = vpaddd_avx2(auVar141,auVar142);
  auVar82._8_4_ = 0x6fd15ca7;
  auVar82._0_8_ = 0x6fd15ca76fd15ca7;
  auVar82._12_4_ = 0x6fd15ca7;
  auVar82._16_4_ = 0x6fd15ca7;
  auVar82._20_4_ = 0x6fd15ca7;
  auVar82._24_4_ = 0x6fd15ca7;
  auVar82._28_4_ = 0x6fd15ca7;
  auVar141 = vpaddd_avx2(auVar141,auVar82);
  auVar141 = vpaddd_avx2(auVar141,auVar72 ^ auVar95 ^ auVar74);
  auVar142 = vpsrld_avx2(auVar70,2);
  auVar143 = vpslld_avx2(auVar70,0x1e);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar70,0xd);
  auVar143 = vpslld_avx2(auVar70,0x13);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar70,0x16);
  auVar143 = vpslld_avx2(auVar70,10);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpor_avx2(auVar70,auVar39);
  auVar142 = vpand_avx2(auVar38,auVar142);
  auVar143 = vpand_avx2(auVar70,auVar39);
  auVar142 = vpor_avx2(auVar143,auVar142);
  auVar42 = vpaddd_avx2(auVar42,auVar141);
  auVar141 = vpaddd_avx2(auVar72 ^ auVar95 ^ auVar74,auVar141);
  auVar141 = vpaddd_avx2(auVar142,auVar141);
  auVar142 = vpsrld_avx2(auVar42,6);
  auVar143 = vpslld_avx2(auVar42,0x1a);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar42,0xb);
  auVar143 = vpslld_avx2(auVar42,0x15);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar42,0x19);
  auVar143 = vpslld_avx2(auVar42,7);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpandn_avx2(auVar42,auVar11);
  auVar142 = vpand_avx2(auVar12,auVar42);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar20 = vpaddd_avx2(auVar20,auVar142);
  auVar83._8_4_ = 0x521afaca;
  auVar83._0_8_ = 0x521afaca521afaca;
  auVar83._12_4_ = 0x521afaca;
  auVar83._16_4_ = 0x521afaca;
  auVar83._20_4_ = 0x521afaca;
  auVar83._24_4_ = 0x521afaca;
  auVar83._28_4_ = 0x521afaca;
  auVar20 = vpaddd_avx2(auVar20,auVar83);
  auVar20 = vpaddd_avx2(auVar20,auVar72 ^ auVar95 ^ auVar74);
  auVar142 = vpsrld_avx2(auVar141,2);
  auVar143 = vpslld_avx2(auVar141,0x1e);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar141,0xd);
  auVar143 = vpslld_avx2(auVar141,0x13);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar141,0x16);
  auVar143 = vpslld_avx2(auVar141,10);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpor_avx2(auVar141,auVar70);
  auVar142 = vpand_avx2(auVar39,auVar142);
  auVar143 = vpand_avx2(auVar141,auVar70);
  auVar142 = vpor_avx2(auVar143,auVar142);
  auVar38 = vpaddd_avx2(auVar38,auVar20);
  auVar20 = vpaddd_avx2(auVar72 ^ auVar95 ^ auVar74,auVar20);
  auVar20 = vpaddd_avx2(auVar142,auVar20);
  auVar142 = vpsrld_avx2(auVar38,6);
  auVar143 = vpslld_avx2(auVar38,0x1a);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar38,0xb);
  auVar143 = vpslld_avx2(auVar38,0x15);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar38,0x19);
  auVar143 = vpslld_avx2(auVar38,7);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpandn_avx2(auVar38,auVar12);
  auVar142 = vpand_avx2(auVar42,auVar38);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar139._8_4_ = 0x31338431;
  auVar139._0_8_ = 0x3133843131338431;
  auVar139._12_4_ = 0x31338431;
  auVar139._16_4_ = 0x31338431;
  auVar139._20_4_ = 0x31338431;
  auVar139._24_4_ = 0x31338431;
  auVar139._28_4_ = 0x31338431;
  auVar11 = vpaddd_avx2(auVar11,auVar142);
  auVar11 = vpaddd_avx2(auVar139,auVar11);
  auVar11 = vpaddd_avx2(auVar11,auVar72 ^ auVar95 ^ auVar74);
  auVar142 = vpsrld_avx2(auVar20,2);
  auVar143 = vpslld_avx2(auVar20,0x1e);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar20,0xd);
  auVar143 = vpslld_avx2(auVar20,0x13);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar20,0x16);
  auVar143 = vpslld_avx2(auVar20,10);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpor_avx2(auVar20,auVar141);
  auVar142 = vpand_avx2(auVar142,auVar70);
  auVar143 = vpand_avx2(auVar20,auVar141);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar39 = vpaddd_avx2(auVar39,auVar11);
  auVar11 = vpaddd_avx2(auVar74 ^ auVar72 ^ auVar95,auVar11);
  auVar11 = vpaddd_avx2(auVar142,auVar11);
  auVar142 = vpsrld_avx2(auVar39,6);
  auVar143 = vpslld_avx2(auVar39,0x1a);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar39,0xb);
  auVar143 = vpslld_avx2(auVar39,0x15);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar39,0x19);
  auVar143 = vpslld_avx2(auVar39,7);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpandn_avx2(auVar39,auVar42);
  auVar142 = vpand_avx2(auVar39,auVar38);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar12 = vpaddd_avx2(auVar12,auVar142);
  auVar84._8_4_ = 0x6ed41a95;
  auVar84._0_8_ = 0x6ed41a956ed41a95;
  auVar84._12_4_ = 0x6ed41a95;
  auVar84._16_4_ = 0x6ed41a95;
  auVar84._20_4_ = 0x6ed41a95;
  auVar84._24_4_ = 0x6ed41a95;
  auVar84._28_4_ = 0x6ed41a95;
  auVar12 = vpaddd_avx2(auVar12,auVar84);
  auVar12 = vpaddd_avx2(auVar12,auVar72 ^ auVar95 ^ auVar74);
  auVar142 = vpsrld_avx2(auVar11,2);
  auVar143 = vpslld_avx2(auVar11,0x1e);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar11,0xd);
  auVar143 = vpslld_avx2(auVar11,0x13);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar11,0x16);
  auVar143 = vpslld_avx2(auVar11,10);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpor_avx2(auVar11,auVar20);
  auVar142 = vpand_avx2(auVar141,auVar142);
  auVar143 = vpand_avx2(auVar11,auVar20);
  auVar142 = vpor_avx2(auVar143,auVar142);
  auVar70 = vpaddd_avx2(auVar70,auVar12);
  auVar12 = vpaddd_avx2(auVar72 ^ auVar95 ^ auVar74,auVar12);
  auVar12 = vpaddd_avx2(auVar142,auVar12);
  auVar142 = vpsrld_avx2(auVar70,6);
  auVar143 = vpslld_avx2(auVar70,0x1a);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar70,0xb);
  auVar143 = vpslld_avx2(auVar70,0x15);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar70,0x19);
  auVar143 = vpslld_avx2(auVar70,7);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpandn_avx2(auVar70,auVar38);
  auVar142 = vpand_avx2(auVar39,auVar70);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar42 = vpaddd_avx2(auVar42,auVar142);
  auVar85._8_4_ = 0x6d437890;
  auVar85._0_8_ = 0x6d4378906d437890;
  auVar85._12_4_ = 0x6d437890;
  auVar85._16_4_ = 0x6d437890;
  auVar85._20_4_ = 0x6d437890;
  auVar85._24_4_ = 0x6d437890;
  auVar85._28_4_ = 0x6d437890;
  auVar42 = vpaddd_avx2(auVar42,auVar85);
  auVar42 = vpaddd_avx2(auVar42,auVar72 ^ auVar95 ^ auVar74);
  auVar142 = vpsrld_avx2(auVar12,2);
  auVar143 = vpslld_avx2(auVar12,0x1e);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar12,0xd);
  auVar143 = vpslld_avx2(auVar12,0x13);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar12,0x16);
  auVar143 = vpslld_avx2(auVar12,10);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpor_avx2(auVar12,auVar11);
  auVar142 = vpand_avx2(auVar20,auVar142);
  auVar143 = vpand_avx2(auVar12,auVar11);
  auVar142 = vpor_avx2(auVar143,auVar142);
  auVar141 = vpaddd_avx2(auVar141,auVar42);
  auVar42 = vpaddd_avx2(auVar72 ^ auVar95 ^ auVar74,auVar42);
  auVar42 = vpaddd_avx2(auVar142,auVar42);
  auVar142 = vpsrld_avx2(auVar141,6);
  auVar143 = vpslld_avx2(auVar141,0x1a);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar141,0xb);
  auVar143 = vpslld_avx2(auVar141,0x15);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar141,0x19);
  auVar143 = vpslld_avx2(auVar141,7);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpandn_avx2(auVar141,auVar39);
  auVar142 = vpand_avx2(auVar70,auVar141);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar38 = vpaddd_avx2(auVar38,auVar142);
  auVar86._8_4_ = 0xc39c91f2;
  auVar86._0_8_ = 0xc39c91f2c39c91f2;
  auVar86._12_4_ = 0xc39c91f2;
  auVar86._16_4_ = 0xc39c91f2;
  auVar86._20_4_ = 0xc39c91f2;
  auVar86._24_4_ = 0xc39c91f2;
  auVar86._28_4_ = 0xc39c91f2;
  auVar38 = vpaddd_avx2(auVar38,auVar86);
  auVar38 = vpaddd_avx2(auVar38,auVar72 ^ auVar95 ^ auVar74);
  auVar142 = vpsrld_avx2(auVar42,2);
  auVar143 = vpslld_avx2(auVar42,0x1e);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar42,0xd);
  auVar143 = vpslld_avx2(auVar42,0x13);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar42,0x16);
  auVar143 = vpslld_avx2(auVar42,10);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpor_avx2(auVar42,auVar12);
  auVar142 = vpand_avx2(auVar11,auVar142);
  auVar143 = vpand_avx2(auVar42,auVar12);
  auVar142 = vpor_avx2(auVar143,auVar142);
  auVar20 = vpaddd_avx2(auVar20,auVar38);
  auVar38 = vpaddd_avx2(auVar72 ^ auVar95 ^ auVar74,auVar38);
  auVar38 = vpaddd_avx2(auVar142,auVar38);
  auVar142 = vpsrld_avx2(auVar20,6);
  auVar143 = vpslld_avx2(auVar20,0x1a);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar20,0xb);
  auVar143 = vpslld_avx2(auVar20,0x15);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar20,0x19);
  auVar143 = vpslld_avx2(auVar20,7);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpandn_avx2(auVar20,auVar70);
  auVar142 = vpand_avx2(auVar141,auVar20);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar127._8_4_ = 0x9eccabbd;
  auVar127._0_8_ = 0x9eccabbd9eccabbd;
  auVar127._12_4_ = 0x9eccabbd;
  auVar127._16_4_ = 0x9eccabbd;
  auVar127._20_4_ = 0x9eccabbd;
  auVar127._24_4_ = 0x9eccabbd;
  auVar127._28_4_ = 0x9eccabbd;
  auVar39 = vpaddd_avx2(auVar39,auVar142);
  auVar39 = vpaddd_avx2(auVar127,auVar39);
  auVar39 = vpaddd_avx2(auVar39,auVar72 ^ auVar95 ^ auVar74);
  auVar11 = vpaddd_avx2(auVar39,auVar11);
  auVar142 = vpsrld_avx2(auVar11,6);
  auVar143 = vpslld_avx2(auVar11,0x1a);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar11,0xb);
  auVar143 = vpslld_avx2(auVar11,0x15);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar11,0x19);
  auVar143 = vpslld_avx2(auVar11,7);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpandn_avx2(auVar11,auVar141);
  auVar142 = vpand_avx2(auVar11,auVar20);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar128._8_4_ = 0xb5c9a0e6;
  auVar128._0_8_ = 0xb5c9a0e6b5c9a0e6;
  auVar128._12_4_ = 0xb5c9a0e6;
  auVar128._16_4_ = 0xb5c9a0e6;
  auVar128._20_4_ = 0xb5c9a0e6;
  auVar128._24_4_ = 0xb5c9a0e6;
  auVar128._28_4_ = 0xb5c9a0e6;
  auVar70 = vpaddd_avx2(auVar70,auVar142);
  auVar70 = vpaddd_avx2(auVar128,auVar70);
  auVar70 = vpaddd_avx2(auVar70,auVar72 ^ auVar95 ^ auVar74);
  auVar142 = vpaddd_avx2(auVar12,auVar70);
  auVar143 = vpsrld_avx2(auVar142,6);
  auVar95 = vpslld_avx2(auVar142,0x1a);
  auVar72 = vpor_avx2(auVar95,auVar143);
  auVar143 = vpsrld_avx2(auVar142,0xb);
  auVar95 = vpslld_avx2(auVar142,0x15);
  auVar74 = vpor_avx2(auVar95,auVar143);
  auVar143 = vpsrld_avx2(auVar142,0x19);
  auVar95 = vpslld_avx2(auVar142,7);
  auVar6 = vpor_avx2(auVar95,auVar143);
  auVar95 = vpandn_avx2(auVar142,auVar20);
  auVar143 = vpand_avx2(auVar11,auVar142);
  auVar143 = vpor_avx2(auVar143,auVar95);
  auVar95._8_4_ = 0x532fb63c;
  auVar95._0_8_ = 0x532fb63c532fb63c;
  auVar95._12_4_ = 0x532fb63c;
  auVar95._16_4_ = 0x532fb63c;
  auVar95._20_4_ = 0x532fb63c;
  auVar95._24_4_ = 0x532fb63c;
  auVar95._28_4_ = 0x532fb63c;
  auVar141 = vpaddd_avx2(auVar141,auVar143);
  auVar141 = vpaddd_avx2(auVar95,auVar141);
  auVar141 = vpaddd_avx2(auVar141,auVar74 ^ auVar72 ^ auVar6);
  auVar143 = vpaddd_avx2(auVar42,auVar141);
  auVar95 = vpsrld_avx2(auVar143,6);
  auVar72 = vpslld_avx2(auVar143,0x1a);
  auVar74 = vpor_avx2(auVar72,auVar95);
  auVar95 = vpsrld_avx2(auVar143,0xb);
  auVar72 = vpslld_avx2(auVar143,0x15);
  auVar6 = vpor_avx2(auVar72,auVar95);
  auVar95 = vpsrld_avx2(auVar143,0x19);
  auVar72 = vpslld_avx2(auVar143,7);
  auVar7 = vpor_avx2(auVar72,auVar95);
  auVar72 = vpandn_avx2(auVar143,auVar11);
  auVar95 = vpand_avx2(auVar142,auVar143);
  auVar95 = vpor_avx2(auVar95,auVar72);
  auVar91._8_4_ = 0xd2c741c6;
  auVar91._0_8_ = 0xd2c741c6d2c741c6;
  auVar91._12_4_ = 0xd2c741c6;
  auVar91._16_4_ = 0xd2c741c6;
  auVar91._20_4_ = 0xd2c741c6;
  auVar91._24_4_ = 0xd2c741c6;
  auVar91._28_4_ = 0xd2c741c6;
  auVar20 = vpaddd_avx2(auVar20,auVar95);
  auVar20 = vpaddd_avx2(auVar20,auVar91);
  auVar20 = vpaddd_avx2(auVar20,auVar6 ^ auVar74 ^ auVar7);
  auVar95 = vpsrld_avx2(auVar38,2);
  auVar72 = vpslld_avx2(auVar38,0x1e);
  auVar72 = vpor_avx2(auVar72,auVar95);
  auVar95 = vpsrld_avx2(auVar38,0xd);
  auVar74 = vpslld_avx2(auVar38,0x13);
  auVar74 = vpor_avx2(auVar74,auVar95);
  auVar95 = vpsrld_avx2(auVar38,0x16);
  auVar6 = vpslld_avx2(auVar38,10);
  auVar6 = vpor_avx2(auVar6,auVar95);
  auVar95 = vpor_avx2(auVar38,auVar42);
  auVar12 = vpand_avx2(auVar12,auVar95);
  auVar95 = vpand_avx2(auVar38,auVar42);
  auVar95 = vpor_avx2(auVar12,auVar95);
  auVar12 = vpaddd_avx2(auVar39,auVar74 ^ auVar72 ^ auVar6);
  auVar12 = vpaddd_avx2(auVar12,auVar95);
  auVar39 = vpsrld_avx2(auVar12,2);
  auVar95 = vpslld_avx2(auVar12,0x1e);
  auVar95 = vpor_avx2(auVar95,auVar39);
  auVar39 = vpsrld_avx2(auVar12,0xd);
  auVar72 = vpslld_avx2(auVar12,0x13);
  auVar72 = vpor_avx2(auVar72,auVar39);
  auVar39 = vpsrld_avx2(auVar12,0x16);
  auVar74 = vpslld_avx2(auVar12,10);
  auVar74 = vpor_avx2(auVar74,auVar39);
  auVar39 = vpor_avx2(auVar12,auVar38);
  auVar39 = vpand_avx2(auVar42,auVar39);
  auVar42 = vpand_avx2(auVar12,auVar38);
  auVar42 = vpor_avx2(auVar39,auVar42);
  auVar39 = vpaddd_avx2(auVar72 ^ auVar95 ^ auVar74,auVar70);
  auVar39 = vpaddd_avx2(auVar39,auVar42);
  auVar70 = vpsrld_avx2(auVar39,2);
  auVar42 = vpslld_avx2(auVar39,0x1e);
  auVar95 = vpor_avx2(auVar42,auVar70);
  auVar70 = vpsrld_avx2(auVar39,0xd);
  auVar42 = vpslld_avx2(auVar39,0x13);
  auVar72 = vpor_avx2(auVar42,auVar70);
  auVar70 = vpsrld_avx2(auVar39,0x16);
  auVar42 = vpslld_avx2(auVar39,10);
  auVar74 = vpor_avx2(auVar42,auVar70);
  auVar70 = vpor_avx2(auVar12,auVar39);
  auVar70 = vpand_avx2(auVar38,auVar70);
  auVar42 = vpand_avx2(auVar12,auVar39);
  auVar42 = vpor_avx2(auVar70,auVar42);
  auVar70 = vpaddd_avx2(auVar72 ^ auVar95 ^ auVar74,auVar141);
  auVar70 = vpaddd_avx2(auVar70,auVar42);
  auVar42 = vpsrld_avx2(auVar70,2);
  auVar141 = vpslld_avx2(auVar70,0x1e);
  auVar95 = vpor_avx2(auVar141,auVar42);
  auVar42 = vpsrld_avx2(auVar70,0xd);
  auVar141 = vpslld_avx2(auVar70,0x13);
  auVar72 = vpor_avx2(auVar141,auVar42);
  auVar42 = vpsrld_avx2(auVar70,0x16);
  auVar141 = vpslld_avx2(auVar70,10);
  auVar74 = vpor_avx2(auVar141,auVar42);
  auVar42 = vpor_avx2(auVar70,auVar39);
  auVar42 = vpand_avx2(auVar12,auVar42);
  auVar141 = vpand_avx2(auVar70,auVar39);
  auVar42 = vpor_avx2(auVar42,auVar141);
  auVar38 = vpaddd_avx2(auVar38,auVar20);
  auVar20 = vpaddd_avx2(auVar72 ^ auVar95 ^ auVar74,auVar20);
  auVar20 = vpaddd_avx2(auVar20,auVar42);
  auVar42 = vpsrld_avx2(auVar38,6);
  auVar141 = vpslld_avx2(auVar38,0x1a);
  auVar95 = vpor_avx2(auVar141,auVar42);
  auVar42 = vpsrld_avx2(auVar38,0xb);
  auVar141 = vpslld_avx2(auVar38,0x15);
  auVar72 = vpor_avx2(auVar141,auVar42);
  auVar42 = vpsrld_avx2(auVar38,0x19);
  auVar141 = vpslld_avx2(auVar38,7);
  auVar74 = vpor_avx2(auVar141,auVar42);
  auVar141 = vpandn_avx2(auVar38,auVar142);
  auVar42 = vpand_avx2(auVar143,auVar38);
  auVar42 = vpor_avx2(auVar42,auVar141);
  auVar92._8_4_ = 0x7237ea3;
  auVar92._0_8_ = 0x7237ea307237ea3;
  auVar92._12_4_ = 0x7237ea3;
  auVar92._16_4_ = 0x7237ea3;
  auVar92._20_4_ = 0x7237ea3;
  auVar92._24_4_ = 0x7237ea3;
  auVar92._28_4_ = 0x7237ea3;
  auVar11 = vpaddd_avx2(auVar11,auVar42);
  auVar11 = vpaddd_avx2(auVar11,auVar92);
  auVar11 = vpaddd_avx2(auVar11,auVar72 ^ auVar95 ^ auVar74);
  auVar42 = vpsrld_avx2(auVar20,2);
  auVar141 = vpslld_avx2(auVar20,0x1e);
  auVar95 = vpor_avx2(auVar141,auVar42);
  auVar42 = vpsrld_avx2(auVar20,0xd);
  auVar141 = vpslld_avx2(auVar20,0x13);
  auVar72 = vpor_avx2(auVar141,auVar42);
  auVar42 = vpsrld_avx2(auVar20,0x16);
  auVar141 = vpslld_avx2(auVar20,10);
  auVar74 = vpor_avx2(auVar141,auVar42);
  auVar42 = vpor_avx2(auVar70,auVar20);
  auVar42 = vpand_avx2(auVar42,auVar39);
  auVar141 = vpand_avx2(auVar70,auVar20);
  auVar42 = vpor_avx2(auVar141,auVar42);
  auVar12 = vpaddd_avx2(auVar12,auVar11);
  auVar11 = vpaddd_avx2(auVar72 ^ auVar95 ^ auVar74,auVar11);
  auVar11 = vpaddd_avx2(auVar11,auVar42);
  auVar42 = vpsrld_avx2(auVar12,6);
  auVar141 = vpslld_avx2(auVar12,0x1a);
  auVar95 = vpor_avx2(auVar141,auVar42);
  auVar42 = vpsrld_avx2(auVar12,0xb);
  auVar141 = vpslld_avx2(auVar12,0x15);
  auVar72 = vpor_avx2(auVar141,auVar42);
  auVar42 = vpsrld_avx2(auVar12,0x19);
  auVar141 = vpslld_avx2(auVar12,7);
  auVar74 = vpor_avx2(auVar141,auVar42);
  auVar141 = vpandn_avx2(auVar12,auVar143);
  auVar42 = vpand_avx2(auVar12,auVar38);
  auVar42 = vpor_avx2(auVar42,auVar141);
  auVar42 = vpaddd_avx2(auVar142,auVar42);
  auVar93._8_4_ = 0xa4954b68;
  auVar93._0_8_ = 0xa4954b68a4954b68;
  auVar93._12_4_ = 0xa4954b68;
  auVar93._16_4_ = 0xa4954b68;
  auVar93._20_4_ = 0xa4954b68;
  auVar93._24_4_ = 0xa4954b68;
  auVar93._28_4_ = 0xa4954b68;
  auVar42 = vpaddd_avx2(auVar42,auVar93);
  auVar42 = vpaddd_avx2(auVar42,auVar72 ^ auVar95 ^ auVar74);
  auVar141 = vpsrld_avx2(auVar11,2);
  auVar142 = vpslld_avx2(auVar11,0x1e);
  auVar95 = vpor_avx2(auVar142,auVar141);
  auVar141 = vpsrld_avx2(auVar11,0xd);
  auVar142 = vpslld_avx2(auVar11,0x13);
  auVar72 = vpor_avx2(auVar142,auVar141);
  auVar141 = vpsrld_avx2(auVar11,0x16);
  auVar142 = vpslld_avx2(auVar11,10);
  auVar74 = vpor_avx2(auVar142,auVar141);
  auVar141 = vpor_avx2(auVar11,auVar20);
  auVar141 = vpand_avx2(auVar70,auVar141);
  auVar142 = vpand_avx2(auVar11,auVar20);
  auVar141 = vpor_avx2(auVar142,auVar141);
  auVar39 = vpaddd_avx2(auVar42,auVar39);
  auVar42 = vpaddd_avx2(auVar72 ^ auVar95 ^ auVar74,auVar42);
  auVar42 = vpaddd_avx2(auVar141,auVar42);
  auVar141 = vpsrld_avx2(auVar39,6);
  auVar142 = vpslld_avx2(auVar39,0x1a);
  auVar95 = vpor_avx2(auVar142,auVar141);
  auVar141 = vpsrld_avx2(auVar39,0xb);
  auVar142 = vpslld_avx2(auVar39,0x15);
  auVar72 = vpor_avx2(auVar142,auVar141);
  auVar141 = vpsrld_avx2(auVar39,0x19);
  auVar142 = vpslld_avx2(auVar39,7);
  auVar74 = vpor_avx2(auVar142,auVar141);
  auVar142 = vpandn_avx2(auVar39,auVar38);
  auVar141 = vpand_avx2(auVar12,auVar39);
  auVar141 = vpor_avx2(auVar141,auVar142);
  auVar141 = vpaddd_avx2(auVar143,auVar141);
  auVar129._8_4_ = 0x4c191d76;
  auVar129._0_8_ = 0x4c191d764c191d76;
  auVar129._12_4_ = 0x4c191d76;
  auVar129._16_4_ = 0x4c191d76;
  auVar129._20_4_ = 0x4c191d76;
  auVar129._24_4_ = 0x4c191d76;
  auVar129._28_4_ = 0x4c191d76;
  auVar141 = vpaddd_avx2(auVar129,auVar141);
  auVar141 = vpaddd_avx2(auVar141,auVar72 ^ auVar95 ^ auVar74);
  auVar142 = vpsrld_avx2(auVar42,2);
  auVar143 = vpslld_avx2(auVar42,0x1e);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar42,0xd);
  auVar143 = vpslld_avx2(auVar42,0x13);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar42,0x16);
  auVar143 = vpslld_avx2(auVar42,10);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpor_avx2(auVar11,auVar42);
  auVar142 = vpand_avx2(auVar142,auVar20);
  auVar143 = vpand_avx2(auVar11,auVar42);
  auVar142 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpaddd_avx2(auVar72 ^ auVar95 ^ auVar74,auVar142);
  auVar8 = vpaddd_avx2(auVar141,auVar8);
  auVar8 = vpaddd_avx2(auVar8,auVar142);
  auVar34 = vpaddd_avx2(auVar42,auVar34);
  auVar3 = vpaddd_avx2(auVar11,auVar3);
  auVar11 = vpaddd_avx2(auVar20,auVar15);
  auVar94 = vpaddd_avx2(auVar70,auVar94);
  auVar94 = vpaddd_avx2(auVar141,auVar94);
  auVar13 = vpaddd_avx2(auVar39,auVar13);
  auVar12 = vpaddd_avx2(auVar12,auVar19);
  auVar10._8_4_ = 0x5be0cd19;
  auVar10._0_8_ = 0x5be0cd195be0cd19;
  auVar10._12_4_ = 0x5be0cd19;
  auVar10._16_4_ = 0x5be0cd19;
  auVar10._20_4_ = 0x5be0cd19;
  auVar10._24_4_ = 0x5be0cd19;
  auVar10._28_4_ = 0x5be0cd19;
  auVar15 = vpaddd_avx2(auVar10,auVar18);
  auVar15 = vpaddd_avx2(auVar15,auVar38);
  auVar18 = vpaddd_avx2(auVar8,auVar146);
  auVar19 = vpsrld_avx2(auVar18,6);
  auVar20 = vpslld_avx2(auVar18,0x1a);
  auVar20 = vpor_avx2(auVar20,auVar19);
  auVar19 = vpsrld_avx2(auVar18,0xb);
  auVar38 = vpslld_avx2(auVar18,0x15);
  auVar38 = vpor_avx2(auVar38,auVar19);
  auVar19 = vpsrld_avx2(auVar18,0x19);
  auVar39 = vpslld_avx2(auVar18,7);
  auVar39 = vpor_avx2(auVar39,auVar19);
  auVar19 = vpand_avx2(auVar18,auVar4);
  auVar19 = vpaddd_avx2(auVar34,auVar19 ^ auVar14);
  auVar19 = vpaddd_avx2(auVar19,auVar38 ^ auVar20 ^ auVar39);
  auVar20 = vpaddd_avx2(auVar8,auVar2);
  auVar38 = vpsrld_avx2(auVar20,2);
  auVar39 = vpslld_avx2(auVar20,0x1e);
  auVar39 = vpor_avx2(auVar39,auVar38);
  auVar38 = vpsrld_avx2(auVar20,0xd);
  auVar70 = vpslld_avx2(auVar20,0x13);
  auVar70 = vpor_avx2(auVar70,auVar38);
  auVar38 = vpsrld_avx2(auVar20,0x16);
  auVar42 = vpslld_avx2(auVar20,10);
  auVar42 = vpor_avx2(auVar42,auVar38);
  auVar38 = vpand_avx2(auVar20,auVar35);
  auVar38 = vpaddd_avx2(auVar70 ^ auVar39 ^ auVar42,auVar38);
  auVar38 = vpaddd_avx2(auVar38,auVar19);
  auVar19 = vpaddd_avx2(auVar19,auVar36);
  auVar38 = vpaddd_avx2(auVar38,auVar151);
  auVar39 = vpsrld_avx2(auVar19,6);
  auVar70 = vpslld_avx2(auVar19,0x1a);
  auVar70 = vpor_avx2(auVar70,auVar39);
  auVar39 = vpsrld_avx2(auVar19,0xb);
  auVar42 = vpslld_avx2(auVar19,0x15);
  auVar42 = vpor_avx2(auVar42,auVar39);
  auVar39 = vpsrld_avx2(auVar19,0x19);
  auVar141 = vpslld_avx2(auVar19,7);
  auVar141 = vpor_avx2(auVar141,auVar39);
  auVar39 = vpand_avx2(auVar18 ^ auVar5,auVar19);
  auVar39 = vpaddd_avx2(auVar3,auVar39 ^ auVar16);
  auVar39 = vpaddd_avx2(auVar39,auVar141 ^ auVar42 ^ auVar70);
  auVar70 = vpsrld_avx2(auVar38,2);
  auVar42 = vpslld_avx2(auVar38,0x1e);
  auVar141 = vpor_avx2(auVar42,auVar70);
  auVar70 = vpsrld_avx2(auVar38,0xd);
  auVar42 = vpslld_avx2(auVar38,0x13);
  auVar142 = vpor_avx2(auVar42,auVar70);
  auVar70 = vpsrld_avx2(auVar38,0x16);
  auVar42 = vpslld_avx2(auVar38,10);
  auVar143 = vpor_avx2(auVar42,auVar70);
  auVar70 = vpor_avx2(auVar38,auVar20);
  auVar70 = vpand_avx2(auVar70,auVar87);
  auVar42 = vpand_avx2(auVar38,auVar20);
  auVar70 = vpor_avx2(auVar42,auVar70);
  auVar70 = vpaddd_avx2(auVar142 ^ auVar141 ^ auVar143,auVar70);
  auVar42 = vpaddd_avx2(auVar39,auVar17);
  auVar39 = vpaddd_avx2(auVar39,auVar68);
  auVar39 = vpaddd_avx2(auVar70,auVar39);
  auVar70 = vpsrld_avx2(auVar42,6);
  auVar141 = vpslld_avx2(auVar42,0x1a);
  auVar142 = vpor_avx2(auVar141,auVar70);
  auVar70 = vpsrld_avx2(auVar42,0xb);
  auVar141 = vpslld_avx2(auVar42,0x15);
  auVar143 = vpor_avx2(auVar141,auVar70);
  auVar70 = vpsrld_avx2(auVar42,0x19);
  auVar141 = vpslld_avx2(auVar42,7);
  auVar95 = vpor_avx2(auVar141,auVar70);
  auVar141 = vpandn_avx2(auVar42,auVar18);
  auVar70 = vpand_avx2(auVar19,auVar42);
  auVar70 = vpor_avx2(auVar70,auVar141);
  auVar70 = vpaddd_avx2(auVar70,auVar11);
  auVar70 = vpaddd_avx2(auVar70,auVar143 ^ auVar142 ^ auVar95);
  auVar141 = vpsrld_avx2(auVar39,2);
  auVar142 = vpslld_avx2(auVar39,0x1e);
  auVar143 = vpor_avx2(auVar142,auVar141);
  auVar142 = vpsrld_avx2(auVar39,0xd);
  auVar141 = vpslld_avx2(auVar39,0x13);
  auVar95 = vpor_avx2(auVar142,auVar141);
  auVar141 = vpsrld_avx2(auVar39,0x16);
  auVar142 = vpslld_avx2(auVar39,10);
  auVar72 = vpor_avx2(auVar142,auVar141);
  auVar141 = vpor_avx2(auVar38,auVar39);
  auVar141 = vpand_avx2(auVar141,auVar20);
  auVar142 = vpand_avx2(auVar38,auVar39);
  auVar142 = vpor_avx2(auVar141,auVar142);
  auVar141 = vpaddd_avx2(auVar70,auVar72 ^ auVar143 ^ auVar95);
  auVar70 = vpaddd_avx2(auVar70,auVar37);
  auVar142 = vpaddd_avx2(auVar142,auVar69);
  auVar141 = vpaddd_avx2(auVar142,auVar141);
  auVar142 = vpsrld_avx2(auVar70,6);
  auVar143 = vpslld_avx2(auVar70,0x1a);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpsrld_avx2(auVar70,0xb);
  auVar142 = vpslld_avx2(auVar70,0x15);
  auVar72 = vpor_avx2(auVar142,auVar143);
  auVar142 = vpsrld_avx2(auVar70,0x19);
  auVar143 = vpslld_avx2(auVar70,7);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpandn_avx2(auVar70,auVar19);
  auVar142 = vpand_avx2(auVar42,auVar70);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar18 = vpaddd_avx2(auVar94,auVar18);
  auVar18 = vpaddd_avx2(auVar142,auVar18);
  auVar18 = vpaddd_avx2(auVar18,auVar77);
  auVar18 = vpaddd_avx2(auVar18,auVar74 ^ auVar72 ^ auVar95);
  auVar142 = vpsrld_avx2(auVar141,2);
  auVar143 = vpslld_avx2(auVar141,0x1e);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar141,0xd);
  auVar143 = vpslld_avx2(auVar141,0x13);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar141,0x16);
  auVar143 = vpslld_avx2(auVar141,10);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpor_avx2(auVar141,auVar39);
  auVar142 = vpand_avx2(auVar142,auVar38);
  auVar143 = vpand_avx2(auVar141,auVar39);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar20 = vpaddd_avx2(auVar18,auVar20);
  auVar18 = vpaddd_avx2(auVar18,auVar74 ^ auVar72 ^ auVar95);
  auVar18 = vpaddd_avx2(auVar142,auVar18);
  auVar142 = vpsrld_avx2(auVar20,6);
  auVar143 = vpslld_avx2(auVar20,0x1a);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar20,0xb);
  auVar143 = vpslld_avx2(auVar20,0x15);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar20,0x19);
  auVar143 = vpslld_avx2(auVar20,7);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpandn_avx2(auVar20,auVar42);
  auVar142 = vpand_avx2(auVar70,auVar20);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar19 = vpaddd_avx2(auVar13,auVar19);
  auVar19 = vpaddd_avx2(auVar19,auVar142);
  auVar19 = vpaddd_avx2(auVar19,auVar21);
  auVar19 = vpaddd_avx2(auVar19,auVar72 ^ auVar95 ^ auVar74);
  auVar142 = vpsrld_avx2(auVar18,2);
  auVar143 = vpslld_avx2(auVar18,0x1e);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar18,0xd);
  auVar143 = vpslld_avx2(auVar18,0x13);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar18,0x16);
  auVar143 = vpslld_avx2(auVar18,10);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpor_avx2(auVar141,auVar18);
  auVar142 = vpand_avx2(auVar142,auVar39);
  auVar143 = vpand_avx2(auVar141,auVar18);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar38 = vpaddd_avx2(auVar38,auVar19);
  auVar19 = vpaddd_avx2(auVar74 ^ auVar72 ^ auVar95,auVar19);
  auVar19 = vpaddd_avx2(auVar142,auVar19);
  auVar142 = vpsrld_avx2(auVar38,6);
  auVar143 = vpslld_avx2(auVar38,0x1a);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar38,0xb);
  auVar143 = vpslld_avx2(auVar38,0x15);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar38,0x19);
  auVar143 = vpslld_avx2(auVar38,7);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpandn_avx2(auVar38,auVar70);
  auVar142 = vpand_avx2(auVar20,auVar38);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar42 = vpaddd_avx2(auVar42,auVar12);
  auVar42 = vpaddd_avx2(auVar42,auVar142);
  auVar42 = vpaddd_avx2(auVar42,auVar22);
  auVar42 = vpaddd_avx2(auVar42,auVar74 ^ auVar72 ^ auVar95);
  auVar142 = vpsrld_avx2(auVar19,2);
  auVar143 = vpslld_avx2(auVar19,0x1e);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar19,0xd);
  auVar143 = vpslld_avx2(auVar19,0x13);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar19,0x16);
  auVar143 = vpslld_avx2(auVar19,10);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpor_avx2(auVar19,auVar18);
  auVar142 = vpand_avx2(auVar142,auVar141);
  auVar143 = vpand_avx2(auVar19,auVar18);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar39 = vpaddd_avx2(auVar42,auVar39);
  auVar42 = vpaddd_avx2(auVar72 ^ auVar95 ^ auVar74,auVar42);
  auVar42 = vpaddd_avx2(auVar142,auVar42);
  auVar142 = vpsrld_avx2(auVar39,6);
  auVar143 = vpslld_avx2(auVar39,0x1a);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar39,0xb);
  auVar143 = vpslld_avx2(auVar39,0x15);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar39,0x19);
  auVar143 = vpslld_avx2(auVar39,7);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpandn_avx2(auVar39,auVar20);
  auVar142 = vpand_avx2(auVar38,auVar39);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar70 = vpaddd_avx2(auVar70,auVar15);
  auVar70 = vpaddd_avx2(auVar70,auVar142);
  auVar70 = vpaddd_avx2(auVar70,auVar23);
  auVar70 = vpaddd_avx2(auVar70,auVar74 ^ auVar72 ^ auVar95);
  auVar142 = vpsrld_avx2(auVar42,2);
  auVar143 = vpslld_avx2(auVar42,0x1e);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar42,0xd);
  auVar143 = vpslld_avx2(auVar42,0x13);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar42,0x16);
  auVar143 = vpslld_avx2(auVar42,10);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpor_avx2(auVar42,auVar19);
  auVar142 = vpand_avx2(auVar142,auVar18);
  auVar143 = vpand_avx2(auVar42,auVar19);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar141 = vpaddd_avx2(auVar141,auVar70);
  auVar70 = vpaddd_avx2(auVar72 ^ auVar95 ^ auVar74,auVar70);
  auVar70 = vpaddd_avx2(auVar142,auVar70);
  auVar142 = vpsrld_avx2(auVar141,6);
  auVar143 = vpslld_avx2(auVar141,0x1a);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar141,0xb);
  auVar143 = vpslld_avx2(auVar141,0x15);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar141,0x19);
  auVar143 = vpslld_avx2(auVar141,7);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpandn_avx2(auVar141,auVar38);
  auVar142 = vpand_avx2(auVar39,auVar141);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar20 = vpaddd_avx2(auVar20,auVar142);
  auVar144._8_4_ = 0x5807aa98;
  auVar144._0_8_ = 0x5807aa985807aa98;
  auVar144._12_4_ = 0x5807aa98;
  auVar144._16_4_ = 0x5807aa98;
  auVar144._20_4_ = 0x5807aa98;
  auVar144._24_4_ = 0x5807aa98;
  auVar144._28_4_ = 0x5807aa98;
  auVar20 = vpaddd_avx2(auVar20,auVar144);
  auVar20 = vpaddd_avx2(auVar20,auVar74 ^ auVar72 ^ auVar95);
  auVar142 = vpsrld_avx2(auVar70,2);
  auVar143 = vpslld_avx2(auVar70,0x1e);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar70,0xd);
  auVar143 = vpslld_avx2(auVar70,0x13);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar70,0x16);
  auVar143 = vpslld_avx2(auVar70,10);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpor_avx2(auVar70,auVar42);
  auVar142 = vpand_avx2(auVar142,auVar19);
  auVar143 = vpand_avx2(auVar70,auVar42);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar18 = vpaddd_avx2(auVar20,auVar18);
  auVar20 = vpaddd_avx2(auVar72 ^ auVar95 ^ auVar74,auVar20);
  auVar20 = vpaddd_avx2(auVar142,auVar20);
  auVar142 = vpsrld_avx2(auVar18,6);
  auVar143 = vpslld_avx2(auVar18,0x1a);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar18,0xb);
  auVar143 = vpslld_avx2(auVar18,0x15);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar18,0x19);
  auVar143 = vpslld_avx2(auVar18,7);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpandn_avx2(auVar18,auVar39);
  auVar142 = vpand_avx2(auVar141,auVar18);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar38 = vpaddd_avx2(auVar38,auVar142);
  auVar38 = vpaddd_avx2(auVar38,auVar25);
  auVar38 = vpaddd_avx2(auVar38,auVar74 ^ auVar72 ^ auVar95);
  auVar142 = vpsrld_avx2(auVar20,2);
  auVar143 = vpslld_avx2(auVar20,0x1e);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar20,0xd);
  auVar143 = vpslld_avx2(auVar20,0x13);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar20,0x16);
  auVar143 = vpslld_avx2(auVar20,10);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpor_avx2(auVar70,auVar20);
  auVar142 = vpand_avx2(auVar142,auVar42);
  auVar143 = vpand_avx2(auVar70,auVar20);
  auVar142 = vpor_avx2(auVar143,auVar142);
  auVar19 = vpaddd_avx2(auVar38,auVar19);
  auVar38 = vpaddd_avx2(auVar74 ^ auVar72 ^ auVar95,auVar38);
  auVar38 = vpaddd_avx2(auVar142,auVar38);
  auVar142 = vpsrld_avx2(auVar19,6);
  auVar143 = vpslld_avx2(auVar19,0x1a);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar19,0xb);
  auVar143 = vpslld_avx2(auVar19,0x15);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar19,0x19);
  auVar143 = vpslld_avx2(auVar19,7);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpandn_avx2(auVar19,auVar141);
  auVar142 = vpand_avx2(auVar18,auVar19);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar39 = vpaddd_avx2(auVar39,auVar142);
  auVar39 = vpaddd_avx2(auVar39,auVar26);
  auVar39 = vpaddd_avx2(auVar39,auVar74 ^ auVar72 ^ auVar95);
  auVar142 = vpsrld_avx2(auVar38,2);
  auVar143 = vpslld_avx2(auVar38,0x1e);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar38,0xd);
  auVar143 = vpslld_avx2(auVar38,0x13);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar38,0x16);
  auVar143 = vpslld_avx2(auVar38,10);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpor_avx2(auVar38,auVar20);
  auVar142 = vpand_avx2(auVar142,auVar70);
  auVar143 = vpand_avx2(auVar38,auVar20);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar42 = vpaddd_avx2(auVar39,auVar42);
  auVar39 = vpaddd_avx2(auVar72 ^ auVar95 ^ auVar74,auVar39);
  auVar39 = vpaddd_avx2(auVar142,auVar39);
  auVar142 = vpsrld_avx2(auVar42,6);
  auVar143 = vpslld_avx2(auVar42,0x1a);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar42,0xb);
  auVar143 = vpslld_avx2(auVar42,0x15);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar42,0x19);
  auVar143 = vpslld_avx2(auVar42,7);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpandn_avx2(auVar42,auVar18);
  auVar142 = vpand_avx2(auVar42,auVar19);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar141 = vpaddd_avx2(auVar141,auVar142);
  auVar141 = vpaddd_avx2(auVar141,auVar27);
  auVar141 = vpaddd_avx2(auVar141,auVar74 ^ auVar72 ^ auVar95);
  auVar142 = vpsrld_avx2(auVar39,2);
  auVar143 = vpslld_avx2(auVar39,0x1e);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar39,0xd);
  auVar143 = vpslld_avx2(auVar39,0x13);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar39,0x16);
  auVar143 = vpslld_avx2(auVar39,10);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpor_avx2(auVar38,auVar39);
  auVar142 = vpand_avx2(auVar142,auVar20);
  auVar143 = vpand_avx2(auVar38,auVar39);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar70 = vpaddd_avx2(auVar70,auVar141);
  auVar141 = vpaddd_avx2(auVar72 ^ auVar95 ^ auVar74,auVar141);
  auVar141 = vpaddd_avx2(auVar142,auVar141);
  auVar142 = vpsrld_avx2(auVar70,6);
  auVar143 = vpslld_avx2(auVar70,0x1a);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar70,0xb);
  auVar143 = vpslld_avx2(auVar70,0x15);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar70,0x19);
  auVar143 = vpslld_avx2(auVar70,7);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpandn_avx2(auVar70,auVar19);
  auVar142 = vpand_avx2(auVar42,auVar70);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar18 = vpaddd_avx2(auVar18,auVar142);
  auVar18 = vpaddd_avx2(auVar18,auVar28);
  auVar18 = vpaddd_avx2(auVar18,auVar72 ^ auVar95 ^ auVar74);
  auVar142 = vpsrld_avx2(auVar141,2);
  auVar143 = vpslld_avx2(auVar141,0x1e);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar141,0xd);
  auVar143 = vpslld_avx2(auVar141,0x13);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar141,0x16);
  auVar143 = vpslld_avx2(auVar141,10);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpor_avx2(auVar141,auVar39);
  auVar142 = vpand_avx2(auVar142,auVar38);
  auVar143 = vpand_avx2(auVar141,auVar39);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar20 = vpaddd_avx2(auVar18,auVar20);
  auVar18 = vpaddd_avx2(auVar72 ^ auVar95 ^ auVar74,auVar18);
  auVar18 = vpaddd_avx2(auVar142,auVar18);
  auVar142 = vpsrld_avx2(auVar20,6);
  auVar143 = vpslld_avx2(auVar20,0x1a);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar20,0xb);
  auVar143 = vpslld_avx2(auVar20,0x15);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar20,0x19);
  auVar143 = vpslld_avx2(auVar20,7);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpandn_avx2(auVar20,auVar42);
  auVar142 = vpand_avx2(auVar70,auVar20);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar19 = vpaddd_avx2(auVar142,auVar19);
  auVar19 = vpaddd_avx2(auVar19,auVar29);
  auVar19 = vpaddd_avx2(auVar72 ^ auVar95 ^ auVar74,auVar19);
  auVar142 = vpsrld_avx2(auVar18,2);
  auVar143 = vpslld_avx2(auVar18,0x1e);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar18,0xd);
  auVar143 = vpslld_avx2(auVar18,0x13);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar18,0x16);
  auVar143 = vpslld_avx2(auVar18,10);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpor_avx2(auVar18,auVar141);
  auVar142 = vpand_avx2(auVar142,auVar39);
  auVar143 = vpand_avx2(auVar18,auVar141);
  auVar142 = vpor_avx2(auVar143,auVar142);
  auVar38 = vpaddd_avx2(auVar19,auVar38);
  auVar19 = vpaddd_avx2(auVar74 ^ auVar72 ^ auVar95,auVar19);
  auVar19 = vpaddd_avx2(auVar19,auVar142);
  auVar142 = vpsrld_avx2(auVar38,6);
  auVar143 = vpslld_avx2(auVar38,0x1a);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar38,0xb);
  auVar143 = vpslld_avx2(auVar38,0x15);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar38,0x19);
  auVar143 = vpslld_avx2(auVar38,7);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpandn_avx2(auVar38,auVar70);
  auVar142 = vpand_avx2(auVar20,auVar38);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar42 = vpaddd_avx2(auVar42,auVar142);
  auVar42 = vpaddd_avx2(auVar42,auVar30);
  auVar42 = vpaddd_avx2(auVar42,auVar72 ^ auVar95 ^ auVar74);
  auVar142 = vpsrld_avx2(auVar19,2);
  auVar143 = vpslld_avx2(auVar19,0x1e);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar19,0xd);
  auVar143 = vpslld_avx2(auVar19,0x13);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar19,0x16);
  auVar143 = vpslld_avx2(auVar19,10);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpor_avx2(auVar19,auVar18);
  auVar142 = vpand_avx2(auVar142,auVar141);
  auVar143 = vpand_avx2(auVar19,auVar18);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar39 = vpaddd_avx2(auVar42,auVar39);
  auVar42 = vpaddd_avx2(auVar72 ^ auVar95 ^ auVar74,auVar42);
  auVar42 = vpaddd_avx2(auVar142,auVar42);
  auVar142 = vpsrld_avx2(auVar39,6);
  auVar143 = vpslld_avx2(auVar39,0x1a);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar39,0xb);
  auVar143 = vpslld_avx2(auVar39,0x15);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar39,0x19);
  auVar143 = vpslld_avx2(auVar39,7);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpandn_avx2(auVar39,auVar20);
  auVar142 = vpand_avx2(auVar39,auVar38);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar149._8_4_ = 0xc19bf274;
  auVar149._0_8_ = 0xc19bf274c19bf274;
  auVar149._12_4_ = 0xc19bf274;
  auVar149._16_4_ = 0xc19bf274;
  auVar149._20_4_ = 0xc19bf274;
  auVar149._24_4_ = 0xc19bf274;
  auVar149._28_4_ = 0xc19bf274;
  auVar70 = vpaddd_avx2(auVar70,auVar142);
  auVar70 = vpaddd_avx2(auVar70,auVar149);
  auVar70 = vpaddd_avx2(auVar70,auVar72 ^ auVar95 ^ auVar74);
  auVar142 = vpsrld_avx2(auVar42,2);
  auVar143 = vpslld_avx2(auVar42,0x1e);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar42,0xd);
  auVar143 = vpslld_avx2(auVar42,0x13);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar42,0x16);
  auVar143 = vpslld_avx2(auVar42,10);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpor_avx2(auVar19,auVar42);
  auVar142 = vpand_avx2(auVar142,auVar18);
  auVar143 = vpand_avx2(auVar19,auVar42);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar141 = vpaddd_avx2(auVar70,auVar141);
  auVar70 = vpaddd_avx2(auVar72 ^ auVar95 ^ auVar74,auVar70);
  auVar70 = vpaddd_avx2(auVar142,auVar70);
  auVar142 = vpsrld_avx2(auVar34,7);
  auVar143 = vpslld_avx2(auVar34,0x19);
  auVar142 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpsrld_avx2(auVar34,0x12);
  auVar95 = vpslld_avx2(auVar34,0xe);
  auVar143 = vpor_avx2(auVar95,auVar143);
  auVar95 = vpsrld_avx2(auVar34,3);
  auVar8 = vpaddd_avx2(auVar95 ^ auVar143 ^ auVar142,auVar8);
  auVar142 = vpsrld_avx2(auVar141,6);
  auVar143 = vpslld_avx2(auVar141,0x1a);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpsrld_avx2(auVar141,0xb);
  auVar142 = vpslld_avx2(auVar141,0x15);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar141,0x19);
  auVar143 = vpslld_avx2(auVar141,7);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpandn_avx2(auVar141,auVar38);
  auVar142 = vpand_avx2(auVar39,auVar141);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar20 = vpaddd_avx2(auVar20,auVar8);
  auVar20 = vpaddd_avx2(auVar20,auVar142);
  auVar20 = vpaddd_avx2(auVar20,auVar41);
  auVar20 = vpaddd_avx2(auVar20,auVar74 ^ auVar95 ^ auVar72);
  auVar142 = vpsrld_avx2(auVar70,2);
  auVar143 = vpslld_avx2(auVar70,0x1e);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar70,0xd);
  auVar143 = vpslld_avx2(auVar70,0x13);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar70,0x16);
  auVar143 = vpslld_avx2(auVar70,10);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpor_avx2(auVar70,auVar42);
  auVar142 = vpand_avx2(auVar142,auVar19);
  auVar143 = vpand_avx2(auVar70,auVar42);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar18 = vpaddd_avx2(auVar20,auVar18);
  auVar20 = vpaddd_avx2(auVar72 ^ auVar95 ^ auVar74,auVar20);
  auVar20 = vpaddd_avx2(auVar142,auVar20);
  auVar142 = vpsrld_avx2(auVar3,7);
  auVar143 = vpslld_avx2(auVar3,0x19);
  auVar142 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpsrld_avx2(auVar3,0x12);
  auVar95 = vpslld_avx2(auVar3,0xe);
  auVar143 = vpor_avx2(auVar95,auVar143);
  auVar95 = vpsrld_avx2(auVar3,3);
  auVar72._8_4_ = 0xa00000;
  auVar72._0_8_ = 0xa0000000a00000;
  auVar72._12_4_ = 0xa00000;
  auVar72._16_4_ = 0xa00000;
  auVar72._20_4_ = 0xa00000;
  auVar72._24_4_ = 0xa00000;
  auVar72._28_4_ = 0xa00000;
  auVar142 = vpaddd_avx2(auVar143 ^ auVar142 ^ auVar95,auVar72);
  auVar34 = vpaddd_avx2(auVar142,auVar34);
  auVar142 = vpsrld_avx2(auVar18,6);
  auVar143 = vpslld_avx2(auVar18,0x1a);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar18,0xb);
  auVar143 = vpslld_avx2(auVar18,0x15);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar18,0x19);
  auVar143 = vpslld_avx2(auVar18,7);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpandn_avx2(auVar18,auVar39);
  auVar142 = vpand_avx2(auVar141,auVar18);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar38 = vpaddd_avx2(auVar34,auVar38);
  auVar38 = vpaddd_avx2(auVar38,auVar142);
  auVar38 = vpaddd_avx2(auVar38,auVar71);
  auVar38 = vpaddd_avx2(auVar38,auVar72 ^ auVar95 ^ auVar74);
  auVar142 = vpsrld_avx2(auVar20,2);
  auVar143 = vpslld_avx2(auVar20,0x1e);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar20,0xd);
  auVar143 = vpslld_avx2(auVar20,0x13);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar20,0x16);
  auVar143 = vpslld_avx2(auVar20,10);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpor_avx2(auVar20,auVar70);
  auVar142 = vpand_avx2(auVar142,auVar42);
  auVar143 = vpand_avx2(auVar20,auVar70);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar19 = vpaddd_avx2(auVar19,auVar38);
  auVar38 = vpaddd_avx2(auVar72 ^ auVar95 ^ auVar74,auVar38);
  auVar38 = vpaddd_avx2(auVar38,auVar142);
  auVar142 = vpsrld_avx2(auVar8,0x11);
  auVar143 = vpslld_avx2(auVar8,0xf);
  auVar142 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpsrld_avx2(auVar8,0x13);
  auVar95 = vpslld_avx2(auVar8,0xd);
  auVar143 = vpor_avx2(auVar95,auVar143);
  auVar74 = vpsrld_avx2(auVar8,10);
  auVar95 = vpsrld_avx2(auVar11,7);
  auVar72 = vpslld_avx2(auVar11,0x19);
  auVar95 = vpor_avx2(auVar72,auVar95);
  auVar6 = vpsrld_avx2(auVar11,0x12);
  auVar72 = vpslld_avx2(auVar11,0xe);
  auVar72 = vpor_avx2(auVar72,auVar6);
  auVar6 = vpsrld_avx2(auVar11,3);
  auVar3 = vpaddd_avx2(auVar3,auVar72 ^ auVar95 ^ auVar6);
  auVar3 = vpaddd_avx2(auVar3,auVar143 ^ auVar142 ^ auVar74);
  auVar142 = vpsrld_avx2(auVar19,6);
  auVar143 = vpslld_avx2(auVar19,0x1a);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar19,0xb);
  auVar143 = vpslld_avx2(auVar19,0x15);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar19,0x19);
  auVar143 = vpslld_avx2(auVar19,7);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpandn_avx2(auVar19,auVar141);
  auVar142 = vpand_avx2(auVar18,auVar19);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar39 = vpaddd_avx2(auVar39,auVar3);
  auVar39 = vpaddd_avx2(auVar39,auVar142);
  auVar39 = vpaddd_avx2(auVar39,auVar105);
  auVar39 = vpaddd_avx2(auVar39,auVar72 ^ auVar95 ^ auVar74);
  auVar142 = vpsrld_avx2(auVar38,2);
  auVar143 = vpslld_avx2(auVar38,0x1e);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar38,0xd);
  auVar143 = vpslld_avx2(auVar38,0x13);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar38,0x16);
  auVar143 = vpslld_avx2(auVar38,10);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpor_avx2(auVar38,auVar20);
  auVar142 = vpand_avx2(auVar70,auVar142);
  auVar143 = vpand_avx2(auVar38,auVar20);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar42 = vpaddd_avx2(auVar39,auVar42);
  auVar39 = vpaddd_avx2(auVar72 ^ auVar95 ^ auVar74,auVar39);
  auVar39 = vpaddd_avx2(auVar39,auVar142);
  auVar142 = vpsrld_avx2(auVar34,0x11);
  auVar143 = vpslld_avx2(auVar34,0xf);
  auVar142 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpsrld_avx2(auVar34,0x13);
  auVar95 = vpslld_avx2(auVar34,0xd);
  auVar143 = vpor_avx2(auVar95,auVar143);
  auVar74 = vpsrld_avx2(auVar34,10);
  auVar95 = vpsrld_avx2(auVar94,7);
  auVar72 = vpslld_avx2(auVar94,0x19);
  auVar95 = vpor_avx2(auVar72,auVar95);
  auVar72 = vpsrld_avx2(auVar94,0x12);
  auVar6 = vpslld_avx2(auVar94,0xe);
  auVar72 = vpor_avx2(auVar6,auVar72);
  auVar6 = vpsrld_avx2(auVar94,3);
  auVar11 = vpaddd_avx2(auVar11,auVar143 ^ auVar142 ^ auVar74);
  auVar11 = vpaddd_avx2(auVar11,auVar72 ^ auVar95 ^ auVar6);
  auVar142 = vpsrld_avx2(auVar42,6);
  auVar143 = vpslld_avx2(auVar42,0x1a);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar42,0xb);
  auVar143 = vpslld_avx2(auVar42,0x15);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar42,0x19);
  auVar143 = vpslld_avx2(auVar42,7);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpandn_avx2(auVar42,auVar18);
  auVar142 = vpand_avx2(auVar19,auVar42);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar141 = vpaddd_avx2(auVar141,auVar11);
  auVar141 = vpaddd_avx2(auVar141,auVar142);
  auVar141 = vpaddd_avx2(auVar141,auVar106);
  auVar141 = vpaddd_avx2(auVar141,auVar72 ^ auVar95 ^ auVar74);
  auVar142 = vpsrld_avx2(auVar39,2);
  auVar143 = vpslld_avx2(auVar39,0x1e);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar39,0xd);
  auVar143 = vpslld_avx2(auVar39,0x13);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar39,0x16);
  auVar143 = vpslld_avx2(auVar39,10);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpor_avx2(auVar39,auVar38);
  auVar142 = vpand_avx2(auVar20,auVar142);
  auVar143 = vpand_avx2(auVar39,auVar38);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar70 = vpaddd_avx2(auVar70,auVar141);
  auVar141 = vpaddd_avx2(auVar72 ^ auVar95 ^ auVar74,auVar141);
  auVar141 = vpaddd_avx2(auVar141,auVar142);
  auVar142 = vpsrld_avx2(auVar3,0x11);
  auVar143 = vpslld_avx2(auVar3,0xf);
  auVar142 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpsrld_avx2(auVar3,0x13);
  auVar95 = vpslld_avx2(auVar3,0xd);
  auVar143 = vpor_avx2(auVar95,auVar143);
  auVar74 = vpsrld_avx2(auVar3,10);
  auVar95 = vpsrld_avx2(auVar13,7);
  auVar72 = vpslld_avx2(auVar13,0x19);
  auVar95 = vpor_avx2(auVar72,auVar95);
  auVar72 = vpsrld_avx2(auVar13,0x12);
  auVar6 = vpslld_avx2(auVar13,0xe);
  auVar72 = vpor_avx2(auVar6,auVar72);
  auVar6 = vpsrld_avx2(auVar13,3);
  auVar94 = vpaddd_avx2(auVar94,auVar72 ^ auVar95 ^ auVar6);
  auVar94 = vpaddd_avx2(auVar94,auVar143 ^ auVar142 ^ auVar74);
  auVar142 = vpsrld_avx2(auVar70,6);
  auVar143 = vpslld_avx2(auVar70,0x1a);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar70,0xb);
  auVar143 = vpslld_avx2(auVar70,0x15);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar70,0x19);
  auVar143 = vpslld_avx2(auVar70,7);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpandn_avx2(auVar70,auVar19);
  auVar142 = vpand_avx2(auVar70,auVar42);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar18 = vpaddd_avx2(auVar94,auVar18);
  auVar18 = vpaddd_avx2(auVar18,auVar142);
  auVar18 = vpaddd_avx2(auVar18,auVar88);
  auVar18 = vpaddd_avx2(auVar18,auVar72 ^ auVar95 ^ auVar74);
  auVar142 = vpsrld_avx2(auVar141,2);
  auVar143 = vpslld_avx2(auVar141,0x1e);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar141,0xd);
  auVar143 = vpslld_avx2(auVar141,0x13);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar141,0x16);
  auVar143 = vpslld_avx2(auVar141,10);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpor_avx2(auVar39,auVar141);
  auVar142 = vpand_avx2(auVar38,auVar142);
  auVar143 = vpand_avx2(auVar39,auVar141);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar20 = vpaddd_avx2(auVar20,auVar18);
  auVar18 = vpaddd_avx2(auVar72 ^ auVar95 ^ auVar74,auVar18);
  auVar18 = vpaddd_avx2(auVar18,auVar142);
  auVar142 = vpsrld_avx2(auVar11,0x11);
  auVar143 = vpslld_avx2(auVar11,0xf);
  auVar142 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpsrld_avx2(auVar11,0x13);
  auVar95 = vpslld_avx2(auVar11,0xd);
  auVar143 = vpor_avx2(auVar95,auVar143);
  auVar74 = vpsrld_avx2(auVar11,10);
  auVar95 = vpsrld_avx2(auVar12,7);
  auVar72 = vpslld_avx2(auVar12,0x19);
  auVar95 = vpor_avx2(auVar72,auVar95);
  auVar72 = vpsrld_avx2(auVar12,0x12);
  auVar6 = vpslld_avx2(auVar12,0xe);
  auVar72 = vpor_avx2(auVar6,auVar72);
  auVar6 = vpsrld_avx2(auVar12,3);
  auVar13 = vpaddd_avx2(auVar13,auVar72 ^ auVar95 ^ auVar6);
  auVar13 = vpaddd_avx2(auVar13,auVar143 ^ auVar142 ^ auVar74);
  auVar142 = vpsrld_avx2(auVar20,6);
  auVar143 = vpslld_avx2(auVar20,0x1a);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar20,0xb);
  auVar143 = vpslld_avx2(auVar20,0x15);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar20,0x19);
  auVar143 = vpslld_avx2(auVar20,7);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpandn_avx2(auVar20,auVar42);
  auVar142 = vpand_avx2(auVar70,auVar20);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar19 = vpaddd_avx2(auVar13,auVar19);
  auVar19 = vpaddd_avx2(auVar19,auVar142);
  auVar19 = vpaddd_avx2(auVar19,auVar89);
  auVar19 = vpaddd_avx2(auVar19,auVar72 ^ auVar95 ^ auVar74);
  auVar142 = vpsrld_avx2(auVar18,2);
  auVar143 = vpslld_avx2(auVar18,0x1e);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar18,0xd);
  auVar143 = vpslld_avx2(auVar18,0x13);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar18,0x16);
  auVar143 = vpslld_avx2(auVar18,10);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpor_avx2(auVar18,auVar141);
  auVar142 = vpand_avx2(auVar39,auVar142);
  auVar143 = vpand_avx2(auVar18,auVar141);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar38 = vpaddd_avx2(auVar38,auVar19);
  auVar19 = vpaddd_avx2(auVar72 ^ auVar95 ^ auVar74,auVar19);
  auVar19 = vpaddd_avx2(auVar19,auVar142);
  auVar142 = vpsrld_avx2(auVar94,0x11);
  auVar143 = vpslld_avx2(auVar94,0xf);
  auVar142 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpsrld_avx2(auVar94,0x13);
  auVar95 = vpslld_avx2(auVar94,0xd);
  auVar143 = vpor_avx2(auVar95,auVar143);
  auVar74 = vpsrld_avx2(auVar94,10);
  auVar95 = vpsrld_avx2(auVar15,7);
  auVar72 = vpslld_avx2(auVar15,0x19);
  auVar95 = vpor_avx2(auVar72,auVar95);
  auVar72 = vpsrld_avx2(auVar15,0x12);
  auVar6 = vpslld_avx2(auVar15,0xe);
  auVar72 = vpor_avx2(auVar6,auVar72);
  auVar6 = vpsrld_avx2(auVar15,3);
  auVar104._8_4_ = 0x100;
  auVar104._0_8_ = 0x10000000100;
  auVar104._12_4_ = 0x100;
  auVar104._16_4_ = 0x100;
  auVar104._20_4_ = 0x100;
  auVar104._24_4_ = 0x100;
  auVar104._28_4_ = 0x100;
  auVar12 = vpaddd_avx2(auVar6 ^ auVar72 ^ auVar95,auVar12);
  auVar12 = vpaddd_avx2(auVar104,auVar12);
  auVar12 = vpaddd_avx2(auVar12,auVar143 ^ auVar142 ^ auVar74);
  auVar142 = vpsrld_avx2(auVar38,6);
  auVar143 = vpslld_avx2(auVar38,0x1a);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar38,0xb);
  auVar143 = vpslld_avx2(auVar38,0x15);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar38,0x19);
  auVar143 = vpslld_avx2(auVar38,7);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpandn_avx2(auVar38,auVar70);
  auVar142 = vpand_avx2(auVar20,auVar38);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar42 = vpaddd_avx2(auVar12,auVar42);
  auVar42 = vpaddd_avx2(auVar42,auVar142);
  auVar42 = vpaddd_avx2(auVar42,auVar90);
  auVar42 = vpaddd_avx2(auVar42,auVar72 ^ auVar95 ^ auVar74);
  auVar142 = vpsrld_avx2(auVar19,2);
  auVar143 = vpslld_avx2(auVar19,0x1e);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar19,0xd);
  auVar143 = vpslld_avx2(auVar19,0x13);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar19,0x16);
  auVar143 = vpslld_avx2(auVar19,10);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpor_avx2(auVar18,auVar19);
  auVar142 = vpand_avx2(auVar142,auVar141);
  auVar143 = vpand_avx2(auVar18,auVar19);
  auVar142 = vpor_avx2(auVar143,auVar142);
  auVar39 = vpaddd_avx2(auVar39,auVar42);
  auVar42 = vpaddd_avx2(auVar72 ^ auVar95 ^ auVar74,auVar42);
  auVar42 = vpaddd_avx2(auVar142,auVar42);
  auVar142 = vpsrld_avx2(auVar13,0x11);
  auVar143 = vpslld_avx2(auVar13,0xf);
  auVar142 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpsrld_avx2(auVar13,0x13);
  auVar95 = vpslld_avx2(auVar13,0xd);
  auVar143 = vpor_avx2(auVar95,auVar143);
  auVar95 = vpsrld_avx2(auVar13,10);
  auVar15 = vpaddd_avx2(auVar15,auVar8);
  auVar145._8_4_ = 0x11002000;
  auVar145._0_8_ = 0x1100200011002000;
  auVar145._12_4_ = 0x11002000;
  auVar145._16_4_ = 0x11002000;
  auVar145._20_4_ = 0x11002000;
  auVar145._24_4_ = 0x11002000;
  auVar145._28_4_ = 0x11002000;
  auVar15 = vpaddd_avx2(auVar15,auVar145);
  auVar15 = vpaddd_avx2(auVar15,auVar95 ^ auVar143 ^ auVar142);
  auVar142 = vpsrld_avx2(auVar39,6);
  auVar143 = vpslld_avx2(auVar39,0x1a);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar39,0xb);
  auVar143 = vpslld_avx2(auVar39,0x15);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar39,0x19);
  auVar143 = vpslld_avx2(auVar39,7);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpandn_avx2(auVar39,auVar20);
  auVar142 = vpand_avx2(auVar38,auVar39);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar70 = vpaddd_avx2(auVar15,auVar70);
  auVar70 = vpaddd_avx2(auVar70,auVar142);
  auVar70 = vpaddd_avx2(auVar70,auVar73);
  auVar70 = vpaddd_avx2(auVar70,auVar74 ^ auVar72 ^ auVar95);
  auVar142 = vpsrld_avx2(auVar42,2);
  auVar143 = vpslld_avx2(auVar42,0x1e);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar42,0xd);
  auVar143 = vpslld_avx2(auVar42,0x13);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar42,0x16);
  auVar143 = vpslld_avx2(auVar42,10);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpor_avx2(auVar42,auVar19);
  auVar142 = vpand_avx2(auVar18,auVar142);
  auVar143 = vpand_avx2(auVar42,auVar19);
  auVar142 = vpor_avx2(auVar143,auVar142);
  auVar141 = vpaddd_avx2(auVar70,auVar141);
  auVar70 = vpaddd_avx2(auVar74 ^ auVar72 ^ auVar95,auVar70);
  auVar70 = vpaddd_avx2(auVar142,auVar70);
  auVar142 = vpsrld_avx2(auVar12,0x11);
  auVar143 = vpslld_avx2(auVar12,0xf);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar12,0x13);
  auVar143 = vpslld_avx2(auVar12,0xd);
  auVar72 = vpor_avx2(auVar143,auVar142);
  auVar33 = vpsrld_avx2(auVar12,10);
  auVar148._8_4_ = 0x80000000;
  auVar148._0_8_ = 0x8000000080000000;
  auVar148._12_4_ = 0x80000000;
  auVar148._16_4_ = 0x80000000;
  auVar148._20_4_ = 0x80000000;
  auVar148._24_4_ = 0x80000000;
  auVar148._28_4_ = 0x80000000;
  auVar142 = vpsrld_avx2(auVar141,6);
  auVar143 = vpslld_avx2(auVar141,0x1a);
  auVar74 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar141,0xb);
  auVar143 = vpslld_avx2(auVar141,0x15);
  auVar6 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar141,0x19);
  auVar143 = vpslld_avx2(auVar141,7);
  auVar7 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpandn_avx2(auVar141,auVar38);
  auVar142 = vpand_avx2(auVar39,auVar141);
  auVar143 = vpor_avx2(auVar142,auVar143);
  auVar142 = vpaddd_avx2(auVar95 ^ auVar72 ^ auVar33 ^ auVar148,auVar34);
  auVar20 = vpaddd_avx2(auVar142,auVar20);
  auVar20 = vpaddd_avx2(auVar143,auVar20);
  auVar20 = vpaddd_avx2(auVar20,auVar75);
  auVar20 = vpaddd_avx2(auVar6 ^ auVar74 ^ auVar7,auVar20);
  auVar143 = vpsrld_avx2(auVar70,2);
  auVar95 = vpslld_avx2(auVar70,0x1e);
  auVar72 = vpor_avx2(auVar95,auVar143);
  auVar143 = vpsrld_avx2(auVar70,0xd);
  auVar95 = vpslld_avx2(auVar70,0x13);
  auVar74 = vpor_avx2(auVar95,auVar143);
  auVar143 = vpsrld_avx2(auVar70,0x16);
  auVar95 = vpslld_avx2(auVar70,10);
  auVar6 = vpor_avx2(auVar95,auVar143);
  auVar143 = vpor_avx2(auVar70,auVar42);
  auVar143 = vpand_avx2(auVar143,auVar19);
  auVar95 = vpand_avx2(auVar70,auVar42);
  auVar143 = vpor_avx2(auVar143,auVar95);
  auVar18 = vpaddd_avx2(auVar18,auVar20);
  auVar20 = vpaddd_avx2(auVar74 ^ auVar72 ^ auVar6,auVar20);
  auVar20 = vpaddd_avx2(auVar143,auVar20);
  auVar143 = vpsrld_avx2(auVar15,0x11);
  auVar95 = vpslld_avx2(auVar15,0xf);
  auVar72 = vpor_avx2(auVar95,auVar143);
  auVar143 = vpsrld_avx2(auVar15,0x13);
  auVar95 = vpslld_avx2(auVar15,0xd);
  auVar74 = vpor_avx2(auVar95,auVar143);
  auVar44 = vpsrld_avx2(auVar15,10);
  auVar143 = vpsrld_avx2(auVar18,6);
  auVar95 = vpslld_avx2(auVar18,0x1a);
  auVar6 = vpor_avx2(auVar95,auVar143);
  auVar95 = vpsrld_avx2(auVar18,0xb);
  auVar143 = vpslld_avx2(auVar18,0x15);
  auVar7 = vpor_avx2(auVar143,auVar95);
  auVar143 = vpsrld_avx2(auVar18,0x19);
  auVar95 = vpslld_avx2(auVar18,7);
  auVar33 = vpor_avx2(auVar95,auVar143);
  auVar95 = vpandn_avx2(auVar18,auVar39);
  auVar143 = vpand_avx2(auVar18,auVar141);
  auVar95 = vpor_avx2(auVar143,auVar95);
  auVar143 = vpaddd_avx2(auVar74 ^ auVar72 ^ auVar44,auVar3);
  auVar38 = vpaddd_avx2(auVar143,auVar38);
  auVar38 = vpaddd_avx2(auVar95,auVar38);
  auVar38 = vpaddd_avx2(auVar38,auVar32);
  auVar38 = vpaddd_avx2(auVar7 ^ auVar6 ^ auVar33,auVar38);
  auVar95 = vpsrld_avx2(auVar20,2);
  auVar72 = vpslld_avx2(auVar20,0x1e);
  auVar74 = vpor_avx2(auVar72,auVar95);
  auVar95 = vpsrld_avx2(auVar20,0xd);
  auVar72 = vpslld_avx2(auVar20,0x13);
  auVar6 = vpor_avx2(auVar72,auVar95);
  auVar95 = vpsrld_avx2(auVar20,0x16);
  auVar72 = vpslld_avx2(auVar20,10);
  auVar7 = vpor_avx2(auVar72,auVar95);
  auVar95 = vpor_avx2(auVar20,auVar70);
  auVar95 = vpand_avx2(auVar95,auVar42);
  auVar72 = vpand_avx2(auVar20,auVar70);
  auVar95 = vpor_avx2(auVar95,auVar72);
  auVar19 = vpaddd_avx2(auVar38,auVar19);
  auVar38 = vpaddd_avx2(auVar6 ^ auVar74 ^ auVar7,auVar38);
  auVar38 = vpaddd_avx2(auVar95,auVar38);
  auVar95 = vpsrld_avx2(auVar142,0x11);
  auVar72 = vpslld_avx2(auVar142,0xf);
  auVar74 = vpor_avx2(auVar72,auVar95);
  auVar95 = vpsrld_avx2(auVar142,0x13);
  auVar72 = vpslld_avx2(auVar142,0xd);
  auVar6 = vpor_avx2(auVar72,auVar95);
  auVar100 = vpsrld_avx2(auVar142,10);
  auVar95 = vpsrld_avx2(auVar19,6);
  auVar72 = vpslld_avx2(auVar19,0x1a);
  auVar7 = vpor_avx2(auVar72,auVar95);
  auVar95 = vpsrld_avx2(auVar19,0xb);
  auVar72 = vpslld_avx2(auVar19,0x15);
  auVar33 = vpor_avx2(auVar72,auVar95);
  auVar95 = vpsrld_avx2(auVar19,0x19);
  auVar72 = vpslld_avx2(auVar19,7);
  auVar44 = vpor_avx2(auVar72,auVar95);
  auVar72 = vpandn_avx2(auVar19,auVar141);
  auVar95 = vpand_avx2(auVar18,auVar19);
  auVar72 = vpor_avx2(auVar95,auVar72);
  auVar95 = vpaddd_avx2(auVar100 ^ auVar6 ^ auVar74,auVar11);
  auVar39 = vpaddd_avx2(auVar95,auVar39);
  auVar39 = vpaddd_avx2(auVar72,auVar39);
  auVar39 = vpaddd_avx2(auVar39,auVar76);
  auVar39 = vpaddd_avx2(auVar33 ^ auVar7 ^ auVar44,auVar39);
  auVar72 = vpsrld_avx2(auVar38,2);
  auVar74 = vpslld_avx2(auVar38,0x1e);
  auVar6 = vpor_avx2(auVar74,auVar72);
  auVar72 = vpsrld_avx2(auVar38,0xd);
  auVar74 = vpslld_avx2(auVar38,0x13);
  auVar7 = vpor_avx2(auVar74,auVar72);
  auVar72 = vpsrld_avx2(auVar38,0x16);
  auVar74 = vpslld_avx2(auVar38,10);
  auVar33 = vpor_avx2(auVar74,auVar72);
  auVar72 = vpor_avx2(auVar38,auVar20);
  auVar72 = vpand_avx2(auVar72,auVar70);
  auVar74 = vpand_avx2(auVar38,auVar20);
  auVar72 = vpor_avx2(auVar72,auVar74);
  auVar42 = vpaddd_avx2(auVar39,auVar42);
  auVar39 = vpaddd_avx2(auVar33 ^ auVar7 ^ auVar6,auVar39);
  auVar39 = vpaddd_avx2(auVar72,auVar39);
  auVar72 = vpsrld_avx2(auVar143,0x11);
  auVar74 = vpslld_avx2(auVar143,0xf);
  auVar6 = vpor_avx2(auVar74,auVar72);
  auVar72 = vpsrld_avx2(auVar143,0x13);
  auVar74 = vpslld_avx2(auVar143,0xd);
  auVar7 = vpor_avx2(auVar74,auVar72);
  auVar107 = vpsrld_avx2(auVar143,10);
  auVar72 = vpsrld_avx2(auVar42,6);
  auVar74 = vpslld_avx2(auVar42,0x1a);
  auVar33 = vpor_avx2(auVar74,auVar72);
  auVar72 = vpsrld_avx2(auVar42,0xb);
  auVar74 = vpslld_avx2(auVar42,0x15);
  auVar44 = vpor_avx2(auVar74,auVar72);
  auVar72 = vpsrld_avx2(auVar42,0x19);
  auVar74 = vpslld_avx2(auVar42,7);
  auVar100 = vpor_avx2(auVar74,auVar72);
  auVar74 = vpandn_avx2(auVar42,auVar18);
  auVar72 = vpand_avx2(auVar19,auVar42);
  auVar74 = vpor_avx2(auVar72,auVar74);
  auVar72 = vpaddd_avx2(auVar7 ^ auVar6 ^ auVar107,auVar94);
  auVar141 = vpaddd_avx2(auVar72,auVar141);
  auVar141 = vpaddd_avx2(auVar74,auVar141);
  auVar141 = vpaddd_avx2(auVar141,auVar43);
  auVar141 = vpaddd_avx2(auVar141,auVar100 ^ auVar44 ^ auVar33);
  auVar74 = vpsrld_avx2(auVar39,2);
  auVar6 = vpslld_avx2(auVar39,0x1e);
  auVar7 = vpor_avx2(auVar6,auVar74);
  auVar74 = vpsrld_avx2(auVar39,0xd);
  auVar6 = vpslld_avx2(auVar39,0x13);
  auVar33 = vpor_avx2(auVar6,auVar74);
  auVar74 = vpsrld_avx2(auVar39,0x16);
  auVar6 = vpslld_avx2(auVar39,10);
  auVar44 = vpor_avx2(auVar6,auVar74);
  auVar74 = vpor_avx2(auVar39,auVar38);
  auVar74 = vpand_avx2(auVar74,auVar20);
  auVar6 = vpand_avx2(auVar39,auVar38);
  auVar74 = vpor_avx2(auVar6,auVar74);
  auVar70 = vpaddd_avx2(auVar141,auVar70);
  auVar141 = vpaddd_avx2(auVar33 ^ auVar7 ^ auVar44,auVar141);
  auVar141 = vpaddd_avx2(auVar74,auVar141);
  auVar74 = vpsrld_avx2(auVar95,0x11);
  auVar6 = vpslld_avx2(auVar95,0xf);
  auVar7 = vpor_avx2(auVar6,auVar74);
  auVar74 = vpsrld_avx2(auVar95,0x13);
  auVar6 = vpslld_avx2(auVar95,0xd);
  auVar33 = vpor_avx2(auVar6,auVar74);
  auVar108 = vpsrld_avx2(auVar95,10);
  auVar74 = vpsrld_avx2(auVar70,6);
  auVar6 = vpslld_avx2(auVar70,0x1a);
  auVar44 = vpor_avx2(auVar6,auVar74);
  auVar74 = vpsrld_avx2(auVar70,0xb);
  auVar6 = vpslld_avx2(auVar70,0x15);
  auVar100 = vpor_avx2(auVar6,auVar74);
  auVar74 = vpsrld_avx2(auVar70,0x19);
  auVar6 = vpslld_avx2(auVar70,7);
  auVar107 = vpor_avx2(auVar6,auVar74);
  auVar6 = vpandn_avx2(auVar70,auVar19);
  auVar74 = vpand_avx2(auVar42,auVar70);
  auVar6 = vpor_avx2(auVar74,auVar6);
  auVar74 = vpaddd_avx2(auVar33 ^ auVar7 ^ auVar108,auVar13);
  auVar18 = vpaddd_avx2(auVar74,auVar18);
  auVar18 = vpaddd_avx2(auVar6,auVar18);
  auVar18 = vpaddd_avx2(auVar18,auVar96);
  auVar18 = vpaddd_avx2(auVar18,auVar107 ^ auVar100 ^ auVar44);
  auVar6 = vpsrld_avx2(auVar141,2);
  auVar7 = vpslld_avx2(auVar141,0x1e);
  auVar33 = vpor_avx2(auVar7,auVar6);
  auVar6 = vpsrld_avx2(auVar141,0xd);
  auVar7 = vpslld_avx2(auVar141,0x13);
  auVar44 = vpor_avx2(auVar7,auVar6);
  auVar6 = vpsrld_avx2(auVar141,0x16);
  auVar7 = vpslld_avx2(auVar141,10);
  auVar100 = vpor_avx2(auVar7,auVar6);
  auVar6 = vpor_avx2(auVar141,auVar39);
  auVar6 = vpand_avx2(auVar6,auVar38);
  auVar7 = vpand_avx2(auVar141,auVar39);
  auVar6 = vpor_avx2(auVar7,auVar6);
  auVar20 = vpaddd_avx2(auVar18,auVar20);
  auVar18 = vpaddd_avx2(auVar100 ^ auVar44 ^ auVar33,auVar18);
  auVar18 = vpaddd_avx2(auVar6,auVar18);
  auVar6 = vpsrld_avx2(auVar72,0x11);
  auVar7 = vpslld_avx2(auVar72,0xf);
  auVar33 = vpor_avx2(auVar7,auVar6);
  auVar6 = vpsrld_avx2(auVar72,0x13);
  auVar7 = vpslld_avx2(auVar72,0xd);
  auVar44 = vpor_avx2(auVar7,auVar6);
  auVar110 = vpsrld_avx2(auVar72,10);
  auVar6 = vpsrld_avx2(auVar20,6);
  auVar7 = vpslld_avx2(auVar20,0x1a);
  auVar100 = vpor_avx2(auVar7,auVar6);
  auVar6 = vpsrld_avx2(auVar20,0xb);
  auVar7 = vpslld_avx2(auVar20,0x15);
  auVar107 = vpor_avx2(auVar7,auVar6);
  auVar6 = vpsrld_avx2(auVar20,0x19);
  auVar7 = vpslld_avx2(auVar20,7);
  auVar108 = vpor_avx2(auVar7,auVar6);
  auVar7 = vpandn_avx2(auVar20,auVar42);
  auVar6 = vpand_avx2(auVar70,auVar20);
  auVar7 = vpor_avx2(auVar6,auVar7);
  auVar6 = vpaddd_avx2(auVar110 ^ auVar44 ^ auVar33,auVar12);
  auVar19 = vpaddd_avx2(auVar6,auVar19);
  auVar19 = vpaddd_avx2(auVar7,auVar19);
  auVar19 = vpaddd_avx2(auVar19,auVar101);
  auVar19 = vpaddd_avx2(auVar107 ^ auVar100 ^ auVar108,auVar19);
  auVar7 = vpsrld_avx2(auVar18,2);
  auVar33 = vpslld_avx2(auVar18,0x1e);
  auVar44 = vpor_avx2(auVar33,auVar7);
  auVar7 = vpsrld_avx2(auVar18,0xd);
  auVar33 = vpslld_avx2(auVar18,0x13);
  auVar100 = vpor_avx2(auVar33,auVar7);
  auVar7 = vpsrld_avx2(auVar18,0x16);
  auVar33 = vpslld_avx2(auVar18,10);
  auVar107 = vpor_avx2(auVar33,auVar7);
  auVar7 = vpor_avx2(auVar18,auVar141);
  auVar7 = vpand_avx2(auVar7,auVar39);
  auVar33 = vpand_avx2(auVar18,auVar141);
  auVar7 = vpor_avx2(auVar33,auVar7);
  auVar38 = vpaddd_avx2(auVar19,auVar38);
  auVar19 = vpaddd_avx2(auVar107 ^ auVar100 ^ auVar44,auVar19);
  auVar19 = vpaddd_avx2(auVar7,auVar19);
  auVar7 = vpsrld_avx2(auVar74,0x11);
  auVar33 = vpslld_avx2(auVar74,0xf);
  auVar44 = vpor_avx2(auVar33,auVar7);
  auVar7 = vpsrld_avx2(auVar74,0x13);
  auVar33 = vpslld_avx2(auVar74,0xd);
  auVar100 = vpor_avx2(auVar33,auVar7);
  auVar146 = vpsrld_avx2(auVar74,10);
  auVar7 = vpsrld_avx2(auVar38,6);
  auVar33 = vpslld_avx2(auVar38,0x1a);
  auVar107 = vpor_avx2(auVar33,auVar7);
  auVar7 = vpsrld_avx2(auVar38,0xb);
  auVar33 = vpslld_avx2(auVar38,0x15);
  auVar108 = vpor_avx2(auVar33,auVar7);
  auVar7 = vpsrld_avx2(auVar38,0x19);
  auVar33 = vpslld_avx2(auVar38,7);
  auVar110 = vpor_avx2(auVar33,auVar7);
  auVar33 = vpandn_avx2(auVar38,auVar70);
  auVar7 = vpand_avx2(auVar20,auVar38);
  auVar151 = vpor_avx2(auVar7,auVar33);
  auVar7 = vpaddd_avx2(auVar100 ^ auVar44 ^ auVar146,auVar15);
  auVar150._8_4_ = 0x400022;
  auVar150._0_8_ = 0x40002200400022;
  auVar150._12_4_ = 0x400022;
  auVar150._16_4_ = 0x400022;
  auVar150._20_4_ = 0x400022;
  auVar150._24_4_ = 0x400022;
  auVar150._28_4_ = 0x400022;
  auVar33 = vpaddd_avx2(auVar7,auVar150);
  auVar42 = vpaddd_avx2(auVar7,auVar42);
  auVar42 = vpaddd_avx2(auVar42,auVar151);
  auVar140._8_4_ = 0x70a6373;
  auVar140._0_8_ = 0x70a6373070a6373;
  auVar140._12_4_ = 0x70a6373;
  auVar140._16_4_ = 0x70a6373;
  auVar140._20_4_ = 0x70a6373;
  auVar140._24_4_ = 0x70a6373;
  auVar140._28_4_ = 0x70a6373;
  auVar42 = vpaddd_avx2(auVar42,auVar140);
  auVar42 = vpaddd_avx2(auVar42,auVar108 ^ auVar107 ^ auVar110);
  auVar7 = vpsrld_avx2(auVar19,2);
  auVar44 = vpslld_avx2(auVar19,0x1e);
  auVar100 = vpor_avx2(auVar44,auVar7);
  auVar7 = vpsrld_avx2(auVar19,0xd);
  auVar44 = vpslld_avx2(auVar19,0x13);
  auVar107 = vpor_avx2(auVar44,auVar7);
  auVar7 = vpsrld_avx2(auVar19,0x16);
  auVar44 = vpslld_avx2(auVar19,10);
  auVar108 = vpor_avx2(auVar44,auVar7);
  auVar7 = vpor_avx2(auVar19,auVar18);
  auVar7 = vpand_avx2(auVar7,auVar141);
  auVar44 = vpand_avx2(auVar19,auVar18);
  auVar7 = vpor_avx2(auVar7,auVar44);
  auVar39 = vpaddd_avx2(auVar42,auVar39);
  auVar42 = vpaddd_avx2(auVar107 ^ auVar100 ^ auVar108,auVar42);
  auVar42 = vpaddd_avx2(auVar7,auVar42);
  auVar7 = vpsrld_avx2(auVar6,0x11);
  auVar44 = vpslld_avx2(auVar6,0xf);
  auVar44 = vpor_avx2(auVar44,auVar7);
  auVar7 = vpsrld_avx2(auVar6,0x13);
  auVar100 = vpslld_avx2(auVar6,0xd);
  auVar100 = vpor_avx2(auVar100,auVar7);
  auVar108 = vpsrld_avx2(auVar6,10);
  auVar7 = vpsrld_avx2(auVar8,7);
  auVar107 = vpslld_avx2(auVar8,0x19);
  auVar7 = vpor_avx2(auVar107,auVar7);
  auVar107 = vpsrld_avx2(auVar8,0x12);
  auVar110 = vpslld_avx2(auVar8,0xe);
  auVar107 = vpor_avx2(auVar110,auVar107);
  auVar110 = vpsrld_avx2(auVar8,3);
  auVar7 = vpaddd_avx2(auVar107 ^ auVar7 ^ auVar110,auVar142);
  auVar7 = vpaddd_avx2(auVar7,auVar104);
  auVar7 = vpaddd_avx2(auVar7,auVar108 ^ auVar100 ^ auVar44);
  auVar44 = vpsrld_avx2(auVar39,6);
  auVar100 = vpslld_avx2(auVar39,0x1a);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar39,0xb);
  auVar100 = vpslld_avx2(auVar39,0x15);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar39,0x19);
  auVar100 = vpslld_avx2(auVar39,7);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpandn_avx2(auVar39,auVar20);
  auVar44 = vpand_avx2(auVar39,auVar38);
  auVar44 = vpor_avx2(auVar44,auVar100);
  auVar70 = vpaddd_avx2(auVar7,auVar70);
  auVar70 = vpaddd_avx2(auVar44,auVar70);
  auVar70 = vpaddd_avx2(auVar70,auVar109);
  auVar70 = vpaddd_avx2(auVar70,auVar110 ^ auVar108 ^ auVar107);
  auVar44 = vpsrld_avx2(auVar42,2);
  auVar100 = vpslld_avx2(auVar42,0x1e);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar42,0xd);
  auVar100 = vpslld_avx2(auVar42,0x13);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar42,0x16);
  auVar100 = vpslld_avx2(auVar42,10);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpor_avx2(auVar42,auVar19);
  auVar44 = vpand_avx2(auVar44,auVar18);
  auVar100 = vpand_avx2(auVar42,auVar19);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar141 = vpaddd_avx2(auVar70,auVar141);
  auVar70 = vpaddd_avx2(auVar110 ^ auVar108 ^ auVar107,auVar70);
  auVar70 = vpaddd_avx2(auVar44,auVar70);
  auVar44 = vpsrld_avx2(auVar33,0x11);
  auVar100 = vpslld_avx2(auVar33,0xf);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpsrld_avx2(auVar33,0x13);
  auVar107 = vpslld_avx2(auVar33,0xd);
  auVar100 = vpor_avx2(auVar107,auVar100);
  auVar110 = vpsrld_avx2(auVar33,10);
  auVar107 = vpsrld_avx2(auVar34,7);
  auVar108 = vpslld_avx2(auVar34,0x19);
  auVar107 = vpor_avx2(auVar108,auVar107);
  auVar108 = vpsrld_avx2(auVar34,0x12);
  auVar151 = vpslld_avx2(auVar34,0xe);
  auVar108 = vpor_avx2(auVar151,auVar108);
  auVar151 = vpsrld_avx2(auVar34,3);
  auVar8 = vpaddd_avx2(auVar108 ^ auVar107 ^ auVar151,auVar8);
  auVar8 = vpaddd_avx2(auVar8,auVar143);
  auVar8 = vpaddd_avx2(auVar8,auVar110 ^ auVar100 ^ auVar44);
  auVar44 = vpsrld_avx2(auVar141,6);
  auVar100 = vpslld_avx2(auVar141,0x1a);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar141,0xb);
  auVar100 = vpslld_avx2(auVar141,0x15);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar141,0x19);
  auVar100 = vpslld_avx2(auVar141,7);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpandn_avx2(auVar141,auVar38);
  auVar44 = vpand_avx2(auVar39,auVar141);
  auVar44 = vpor_avx2(auVar44,auVar100);
  auVar20 = vpaddd_avx2(auVar8,auVar20);
  auVar20 = vpaddd_avx2(auVar20,auVar44);
  auVar20 = vpaddd_avx2(auVar20,auVar111);
  auVar20 = vpaddd_avx2(auVar20,auVar108 ^ auVar107 ^ auVar110);
  auVar44 = vpsrld_avx2(auVar70,2);
  auVar100 = vpslld_avx2(auVar70,0x1e);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar70,0xd);
  auVar100 = vpslld_avx2(auVar70,0x13);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar70,0x16);
  auVar100 = vpslld_avx2(auVar70,10);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpor_avx2(auVar42,auVar70);
  auVar44 = vpand_avx2(auVar44,auVar19);
  auVar100 = vpand_avx2(auVar42,auVar70);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar18 = vpaddd_avx2(auVar20,auVar18);
  auVar20 = vpaddd_avx2(auVar108 ^ auVar107 ^ auVar110,auVar20);
  auVar20 = vpaddd_avx2(auVar20,auVar44);
  auVar44 = vpsrld_avx2(auVar7,0x11);
  auVar100 = vpslld_avx2(auVar7,0xf);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpsrld_avx2(auVar7,0x13);
  auVar107 = vpslld_avx2(auVar7,0xd);
  auVar100 = vpor_avx2(auVar107,auVar100);
  auVar110 = vpsrld_avx2(auVar7,10);
  auVar107 = vpsrld_avx2(auVar3,7);
  auVar108 = vpslld_avx2(auVar3,0x19);
  auVar107 = vpor_avx2(auVar108,auVar107);
  auVar108 = vpsrld_avx2(auVar3,0x12);
  auVar151 = vpslld_avx2(auVar3,0xe);
  auVar108 = vpor_avx2(auVar151,auVar108);
  auVar151 = vpsrld_avx2(auVar3,3);
  auVar34 = vpaddd_avx2(auVar34,auVar108 ^ auVar107 ^ auVar151);
  auVar34 = vpaddd_avx2(auVar34,auVar95);
  auVar34 = vpaddd_avx2(auVar34,auVar100 ^ auVar44 ^ auVar110);
  auVar44 = vpsrld_avx2(auVar18,6);
  auVar100 = vpslld_avx2(auVar18,0x1a);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar18,0xb);
  auVar100 = vpslld_avx2(auVar18,0x15);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar18,0x19);
  auVar100 = vpslld_avx2(auVar18,7);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpandn_avx2(auVar18,auVar39);
  auVar44 = vpand_avx2(auVar18,auVar141);
  auVar44 = vpor_avx2(auVar44,auVar100);
  auVar38 = vpaddd_avx2(auVar34,auVar38);
  auVar38 = vpaddd_avx2(auVar38,auVar44);
  auVar38 = vpaddd_avx2(auVar38,auVar112);
  auVar38 = vpaddd_avx2(auVar38,auVar108 ^ auVar107 ^ auVar110);
  auVar44 = vpsrld_avx2(auVar20,2);
  auVar100 = vpslld_avx2(auVar20,0x1e);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar20,0xd);
  auVar100 = vpslld_avx2(auVar20,0x13);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar20,0x16);
  auVar100 = vpslld_avx2(auVar20,10);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpor_avx2(auVar20,auVar70);
  auVar44 = vpand_avx2(auVar42,auVar44);
  auVar100 = vpand_avx2(auVar20,auVar70);
  auVar44 = vpor_avx2(auVar44,auVar100);
  auVar19 = vpaddd_avx2(auVar38,auVar19);
  auVar38 = vpaddd_avx2(auVar108 ^ auVar107 ^ auVar110,auVar38);
  auVar38 = vpaddd_avx2(auVar38,auVar44);
  auVar44 = vpsrld_avx2(auVar8,0x11);
  auVar100 = vpslld_avx2(auVar8,0xf);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpsrld_avx2(auVar8,0x13);
  auVar107 = vpslld_avx2(auVar8,0xd);
  auVar100 = vpor_avx2(auVar107,auVar100);
  auVar110 = vpsrld_avx2(auVar8,10);
  auVar107 = vpsrld_avx2(auVar11,7);
  auVar108 = vpslld_avx2(auVar11,0x19);
  auVar107 = vpor_avx2(auVar108,auVar107);
  auVar108 = vpsrld_avx2(auVar11,0x12);
  auVar151 = vpslld_avx2(auVar11,0xe);
  auVar108 = vpor_avx2(auVar151,auVar108);
  auVar151 = vpsrld_avx2(auVar11,3);
  auVar3 = vpaddd_avx2(auVar3,auVar108 ^ auVar107 ^ auVar151);
  auVar3 = vpaddd_avx2(auVar3,auVar72);
  auVar3 = vpaddd_avx2(auVar3,auVar100 ^ auVar44 ^ auVar110);
  auVar44 = vpsrld_avx2(auVar19,6);
  auVar100 = vpslld_avx2(auVar19,0x1a);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar19,0xb);
  auVar100 = vpslld_avx2(auVar19,0x15);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar19,0x19);
  auVar100 = vpslld_avx2(auVar19,7);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpandn_avx2(auVar19,auVar141);
  auVar44 = vpand_avx2(auVar18,auVar19);
  auVar44 = vpor_avx2(auVar44,auVar100);
  auVar39 = vpaddd_avx2(auVar3,auVar39);
  auVar39 = vpaddd_avx2(auVar39,auVar44);
  auVar39 = vpaddd_avx2(auVar39,auVar131);
  auVar39 = vpaddd_avx2(auVar39,auVar108 ^ auVar107 ^ auVar110);
  auVar44 = vpsrld_avx2(auVar38,2);
  auVar100 = vpslld_avx2(auVar38,0x1e);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar38,0xd);
  auVar100 = vpslld_avx2(auVar38,0x13);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar38,0x16);
  auVar100 = vpslld_avx2(auVar38,10);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpor_avx2(auVar38,auVar20);
  auVar44 = vpand_avx2(auVar44,auVar70);
  auVar100 = vpand_avx2(auVar38,auVar20);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar42 = vpaddd_avx2(auVar42,auVar39);
  auVar39 = vpaddd_avx2(auVar108 ^ auVar107 ^ auVar110,auVar39);
  auVar39 = vpaddd_avx2(auVar44,auVar39);
  auVar44 = vpsrld_avx2(auVar34,0x11);
  auVar100 = vpslld_avx2(auVar34,0xf);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpsrld_avx2(auVar34,0x13);
  auVar107 = vpslld_avx2(auVar34,0xd);
  auVar100 = vpor_avx2(auVar107,auVar100);
  auVar110 = vpsrld_avx2(auVar34,10);
  auVar107 = vpsrld_avx2(auVar94,7);
  auVar108 = vpslld_avx2(auVar94,0x19);
  auVar107 = vpor_avx2(auVar108,auVar107);
  auVar108 = vpsrld_avx2(auVar94,0x12);
  auVar151 = vpslld_avx2(auVar94,0xe);
  auVar108 = vpor_avx2(auVar151,auVar108);
  auVar151 = vpsrld_avx2(auVar94,3);
  auVar11 = vpaddd_avx2(auVar11,auVar151 ^ auVar108 ^ auVar107);
  auVar11 = vpaddd_avx2(auVar11,auVar74);
  auVar11 = vpaddd_avx2(auVar11,auVar100 ^ auVar44 ^ auVar110);
  auVar44 = vpsrld_avx2(auVar42,6);
  auVar100 = vpslld_avx2(auVar42,0x1a);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar42,0xb);
  auVar100 = vpslld_avx2(auVar42,0x15);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar42,0x19);
  auVar100 = vpslld_avx2(auVar42,7);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpandn_avx2(auVar42,auVar18);
  auVar44 = vpand_avx2(auVar19,auVar42);
  auVar44 = vpor_avx2(auVar44,auVar100);
  auVar141 = vpaddd_avx2(auVar11,auVar141);
  auVar141 = vpaddd_avx2(auVar141,auVar44);
  auVar141 = vpaddd_avx2(auVar141,auVar113);
  auVar141 = vpaddd_avx2(auVar141,auVar108 ^ auVar107 ^ auVar110);
  auVar44 = vpsrld_avx2(auVar39,2);
  auVar100 = vpslld_avx2(auVar39,0x1e);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar39,0xd);
  auVar100 = vpslld_avx2(auVar39,0x13);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar39,0x16);
  auVar100 = vpslld_avx2(auVar39,10);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpor_avx2(auVar39,auVar38);
  auVar44 = vpand_avx2(auVar44,auVar20);
  auVar100 = vpand_avx2(auVar39,auVar38);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar70 = vpaddd_avx2(auVar141,auVar70);
  auVar141 = vpaddd_avx2(auVar108 ^ auVar107 ^ auVar110,auVar141);
  auVar141 = vpaddd_avx2(auVar44,auVar141);
  auVar44 = vpsrld_avx2(auVar3,0x11);
  auVar100 = vpslld_avx2(auVar3,0xf);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpsrld_avx2(auVar3,0x13);
  auVar107 = vpslld_avx2(auVar3,0xd);
  auVar100 = vpor_avx2(auVar107,auVar100);
  auVar110 = vpsrld_avx2(auVar3,10);
  auVar107 = vpsrld_avx2(auVar13,7);
  auVar108 = vpslld_avx2(auVar13,0x19);
  auVar107 = vpor_avx2(auVar108,auVar107);
  auVar108 = vpsrld_avx2(auVar13,0x12);
  auVar151 = vpslld_avx2(auVar13,0xe);
  auVar108 = vpor_avx2(auVar151,auVar108);
  auVar151 = vpsrld_avx2(auVar13,3);
  auVar94 = vpaddd_avx2(auVar94,auVar151 ^ auVar108 ^ auVar107);
  auVar94 = vpaddd_avx2(auVar94,auVar6);
  auVar94 = vpaddd_avx2(auVar94,auVar100 ^ auVar44 ^ auVar110);
  auVar44 = vpsrld_avx2(auVar70,6);
  auVar100 = vpslld_avx2(auVar70,0x1a);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar70,0xb);
  auVar100 = vpslld_avx2(auVar70,0x15);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar70,0x19);
  auVar100 = vpslld_avx2(auVar70,7);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpandn_avx2(auVar70,auVar19);
  auVar44 = vpand_avx2(auVar42,auVar70);
  auVar44 = vpor_avx2(auVar44,auVar100);
  auVar18 = vpaddd_avx2(auVar94,auVar18);
  auVar18 = vpaddd_avx2(auVar18,auVar44);
  auVar18 = vpaddd_avx2(auVar18,auVar114);
  auVar18 = vpaddd_avx2(auVar18,auVar108 ^ auVar107 ^ auVar110);
  auVar44 = vpsrld_avx2(auVar141,2);
  auVar100 = vpslld_avx2(auVar141,0x1e);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar141,0xd);
  auVar100 = vpslld_avx2(auVar141,0x13);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar141,0x16);
  auVar100 = vpslld_avx2(auVar141,10);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpor_avx2(auVar39,auVar141);
  auVar44 = vpand_avx2(auVar44,auVar38);
  auVar100 = vpand_avx2(auVar39,auVar141);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar20 = vpaddd_avx2(auVar18,auVar20);
  auVar18 = vpaddd_avx2(auVar110 ^ auVar108 ^ auVar107,auVar18);
  auVar18 = vpaddd_avx2(auVar44,auVar18);
  auVar44 = vpsrld_avx2(auVar11,0x11);
  auVar100 = vpslld_avx2(auVar11,0xf);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpsrld_avx2(auVar11,0x13);
  auVar107 = vpslld_avx2(auVar11,0xd);
  auVar100 = vpor_avx2(auVar107,auVar100);
  auVar110 = vpsrld_avx2(auVar11,10);
  auVar107 = vpsrld_avx2(auVar12,7);
  auVar108 = vpslld_avx2(auVar12,0x19);
  auVar107 = vpor_avx2(auVar108,auVar107);
  auVar108 = vpsrld_avx2(auVar12,0x12);
  auVar151 = vpslld_avx2(auVar12,0xe);
  auVar108 = vpor_avx2(auVar151,auVar108);
  auVar151 = vpsrld_avx2(auVar12,3);
  auVar13 = vpaddd_avx2(auVar108 ^ auVar107 ^ auVar151,auVar13);
  auVar13 = vpaddd_avx2(auVar13,auVar33);
  auVar13 = vpaddd_avx2(auVar13,auVar110 ^ auVar100 ^ auVar44);
  auVar44 = vpsrld_avx2(auVar20,6);
  auVar100 = vpslld_avx2(auVar20,0x1a);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar20,0xb);
  auVar100 = vpslld_avx2(auVar20,0x15);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar20,0x19);
  auVar100 = vpslld_avx2(auVar20,7);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpandn_avx2(auVar20,auVar42);
  auVar44 = vpand_avx2(auVar70,auVar20);
  auVar44 = vpor_avx2(auVar44,auVar100);
  auVar19 = vpaddd_avx2(auVar13,auVar19);
  auVar19 = vpaddd_avx2(auVar44,auVar19);
  auVar19 = vpaddd_avx2(auVar19,auVar115);
  auVar19 = vpaddd_avx2(auVar19,auVar110 ^ auVar108 ^ auVar107);
  auVar44 = vpsrld_avx2(auVar18,2);
  auVar100 = vpslld_avx2(auVar18,0x1e);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar18,0xd);
  auVar100 = vpslld_avx2(auVar18,0x13);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar18,0x16);
  auVar100 = vpslld_avx2(auVar18,10);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpor_avx2(auVar18,auVar141);
  auVar44 = vpand_avx2(auVar39,auVar44);
  auVar100 = vpand_avx2(auVar18,auVar141);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar38 = vpaddd_avx2(auVar38,auVar19);
  auVar19 = vpaddd_avx2(auVar110 ^ auVar108 ^ auVar107,auVar19);
  auVar19 = vpaddd_avx2(auVar44,auVar19);
  auVar44 = vpsrld_avx2(auVar94,0x11);
  auVar100 = vpslld_avx2(auVar94,0xf);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpsrld_avx2(auVar94,0x13);
  auVar107 = vpslld_avx2(auVar94,0xd);
  auVar100 = vpor_avx2(auVar107,auVar100);
  auVar110 = vpsrld_avx2(auVar94,10);
  auVar107 = vpsrld_avx2(auVar15,7);
  auVar108 = vpslld_avx2(auVar15,0x19);
  auVar107 = vpor_avx2(auVar108,auVar107);
  auVar108 = vpsrld_avx2(auVar15,0x12);
  auVar151 = vpslld_avx2(auVar15,0xe);
  auVar108 = vpor_avx2(auVar151,auVar108);
  auVar151 = vpsrld_avx2(auVar15,3);
  auVar12 = vpaddd_avx2(auVar12,auVar108 ^ auVar107 ^ auVar151);
  auVar12 = vpaddd_avx2(auVar12,auVar7);
  auVar12 = vpaddd_avx2(auVar12,auVar110 ^ auVar100 ^ auVar44);
  auVar44 = vpsrld_avx2(auVar38,6);
  auVar100 = vpslld_avx2(auVar38,0x1a);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar38,0xb);
  auVar100 = vpslld_avx2(auVar38,0x15);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar38,0x19);
  auVar100 = vpslld_avx2(auVar38,7);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpandn_avx2(auVar38,auVar70);
  auVar44 = vpand_avx2(auVar20,auVar38);
  auVar44 = vpor_avx2(auVar44,auVar100);
  auVar42 = vpaddd_avx2(auVar12,auVar42);
  auVar42 = vpaddd_avx2(auVar44,auVar42);
  auVar42 = vpaddd_avx2(auVar42,auVar132);
  auVar42 = vpaddd_avx2(auVar42,auVar110 ^ auVar108 ^ auVar107);
  auVar44 = vpsrld_avx2(auVar19,2);
  auVar100 = vpslld_avx2(auVar19,0x1e);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar19,0xd);
  auVar100 = vpslld_avx2(auVar19,0x13);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar19,0x16);
  auVar100 = vpslld_avx2(auVar19,10);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpor_avx2(auVar19,auVar18);
  auVar44 = vpand_avx2(auVar44,auVar141);
  auVar100 = vpand_avx2(auVar19,auVar18);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar39 = vpaddd_avx2(auVar39,auVar42);
  auVar42 = vpaddd_avx2(auVar110 ^ auVar108 ^ auVar107,auVar42);
  auVar42 = vpaddd_avx2(auVar44,auVar42);
  auVar44 = vpsrld_avx2(auVar13,0x11);
  auVar100 = vpslld_avx2(auVar13,0xf);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpsrld_avx2(auVar13,0x13);
  auVar107 = vpslld_avx2(auVar13,0xd);
  auVar100 = vpor_avx2(auVar107,auVar100);
  auVar110 = vpsrld_avx2(auVar13,10);
  auVar107 = vpsrld_avx2(auVar142,7);
  auVar108 = vpslld_avx2(auVar142,0x19);
  auVar107 = vpor_avx2(auVar108,auVar107);
  auVar108 = vpsrld_avx2(auVar142,0x12);
  auVar151 = vpslld_avx2(auVar142,0xe);
  auVar108 = vpor_avx2(auVar151,auVar108);
  auVar151 = vpsrld_avx2(auVar142,3);
  auVar15 = vpaddd_avx2(auVar108 ^ auVar107 ^ auVar151,auVar15);
  auVar15 = vpaddd_avx2(auVar15,auVar8);
  auVar15 = vpaddd_avx2(auVar15,auVar100 ^ auVar44 ^ auVar110);
  auVar44 = vpsrld_avx2(auVar39,6);
  auVar100 = vpslld_avx2(auVar39,0x1a);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar39,0xb);
  auVar100 = vpslld_avx2(auVar39,0x15);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar39,0x19);
  auVar100 = vpslld_avx2(auVar39,7);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpandn_avx2(auVar39,auVar20);
  auVar44 = vpand_avx2(auVar38,auVar39);
  auVar44 = vpor_avx2(auVar44,auVar100);
  auVar70 = vpaddd_avx2(auVar15,auVar70);
  auVar70 = vpaddd_avx2(auVar44,auVar70);
  auVar70 = vpaddd_avx2(auVar70,auVar116);
  auVar70 = vpaddd_avx2(auVar108 ^ auVar107 ^ auVar110,auVar70);
  auVar44 = vpsrld_avx2(auVar42,2);
  auVar100 = vpslld_avx2(auVar42,0x1e);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar42,0xd);
  auVar100 = vpslld_avx2(auVar42,0x13);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar42,0x16);
  auVar100 = vpslld_avx2(auVar42,10);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpor_avx2(auVar42,auVar19);
  auVar44 = vpand_avx2(auVar44,auVar18);
  auVar100 = vpand_avx2(auVar42,auVar19);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar141 = vpaddd_avx2(auVar70,auVar141);
  auVar70 = vpaddd_avx2(auVar110 ^ auVar108 ^ auVar107,auVar70);
  auVar70 = vpaddd_avx2(auVar44,auVar70);
  auVar44 = vpsrld_avx2(auVar12,0x11);
  auVar100 = vpslld_avx2(auVar12,0xf);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpsrld_avx2(auVar12,0x13);
  auVar107 = vpslld_avx2(auVar12,0xd);
  auVar100 = vpor_avx2(auVar107,auVar100);
  auVar110 = vpsrld_avx2(auVar12,10);
  auVar107 = vpsrld_avx2(auVar143,7);
  auVar108 = vpslld_avx2(auVar143,0x19);
  auVar107 = vpor_avx2(auVar108,auVar107);
  auVar108 = vpsrld_avx2(auVar143,0x12);
  auVar151 = vpslld_avx2(auVar143,0xe);
  auVar108 = vpor_avx2(auVar151,auVar108);
  auVar151 = vpsrld_avx2(auVar143,3);
  auVar142 = vpaddd_avx2(auVar142,auVar108 ^ auVar107 ^ auVar151);
  auVar142 = vpaddd_avx2(auVar142,auVar34);
  auVar142 = vpaddd_avx2(auVar142,auVar100 ^ auVar44 ^ auVar110);
  auVar44 = vpsrld_avx2(auVar141,6);
  auVar100 = vpslld_avx2(auVar141,0x1a);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar141,0xb);
  auVar100 = vpslld_avx2(auVar141,0x15);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar141,0x19);
  auVar100 = vpslld_avx2(auVar141,7);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpandn_avx2(auVar141,auVar38);
  auVar44 = vpand_avx2(auVar39,auVar141);
  auVar44 = vpor_avx2(auVar44,auVar100);
  auVar20 = vpaddd_avx2(auVar142,auVar20);
  auVar20 = vpaddd_avx2(auVar44,auVar20);
  auVar20 = vpaddd_avx2(auVar20,auVar117);
  auVar20 = vpaddd_avx2(auVar108 ^ auVar107 ^ auVar110,auVar20);
  auVar44 = vpsrld_avx2(auVar70,2);
  auVar100 = vpslld_avx2(auVar70,0x1e);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar70,0xd);
  auVar100 = vpslld_avx2(auVar70,0x13);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar70,0x16);
  auVar100 = vpslld_avx2(auVar70,10);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpor_avx2(auVar70,auVar42);
  auVar44 = vpand_avx2(auVar44,auVar19);
  auVar100 = vpand_avx2(auVar70,auVar42);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar18 = vpaddd_avx2(auVar20,auVar18);
  auVar20 = vpaddd_avx2(auVar110 ^ auVar108 ^ auVar107,auVar20);
  auVar20 = vpaddd_avx2(auVar44,auVar20);
  auVar44 = vpsrld_avx2(auVar15,0x11);
  auVar100 = vpslld_avx2(auVar15,0xf);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpsrld_avx2(auVar15,0x13);
  auVar107 = vpslld_avx2(auVar15,0xd);
  auVar100 = vpor_avx2(auVar107,auVar100);
  auVar110 = vpsrld_avx2(auVar15,10);
  auVar107 = vpsrld_avx2(auVar95,7);
  auVar108 = vpslld_avx2(auVar95,0x19);
  auVar107 = vpor_avx2(auVar108,auVar107);
  auVar108 = vpsrld_avx2(auVar95,0x12);
  auVar151 = vpslld_avx2(auVar95,0xe);
  auVar108 = vpor_avx2(auVar151,auVar108);
  auVar151 = vpsrld_avx2(auVar95,3);
  auVar143 = vpaddd_avx2(auVar108 ^ auVar107 ^ auVar151,auVar143);
  auVar143 = vpaddd_avx2(auVar143,auVar3);
  auVar143 = vpaddd_avx2(auVar143,auVar100 ^ auVar44 ^ auVar110);
  auVar44 = vpsrld_avx2(auVar18,6);
  auVar100 = vpslld_avx2(auVar18,0x1a);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar18,0xb);
  auVar100 = vpslld_avx2(auVar18,0x15);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar18,0x19);
  auVar100 = vpslld_avx2(auVar18,7);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpandn_avx2(auVar18,auVar39);
  auVar44 = vpand_avx2(auVar141,auVar18);
  auVar44 = vpor_avx2(auVar44,auVar100);
  auVar38 = vpaddd_avx2(auVar143,auVar38);
  auVar38 = vpaddd_avx2(auVar44,auVar38);
  auVar38 = vpaddd_avx2(auVar38,auVar118);
  auVar38 = vpaddd_avx2(auVar108 ^ auVar107 ^ auVar110,auVar38);
  auVar44 = vpsrld_avx2(auVar20,2);
  auVar100 = vpslld_avx2(auVar20,0x1e);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar20,0xd);
  auVar100 = vpslld_avx2(auVar20,0x13);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar20,0x16);
  auVar100 = vpslld_avx2(auVar20,10);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpor_avx2(auVar20,auVar70);
  auVar44 = vpand_avx2(auVar44,auVar42);
  auVar100 = vpand_avx2(auVar20,auVar70);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar19 = vpaddd_avx2(auVar38,auVar19);
  auVar38 = vpaddd_avx2(auVar110 ^ auVar108 ^ auVar107,auVar38);
  auVar38 = vpaddd_avx2(auVar44,auVar38);
  auVar44 = vpsrld_avx2(auVar142,0x11);
  auVar100 = vpslld_avx2(auVar142,0xf);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpsrld_avx2(auVar142,0x13);
  auVar107 = vpslld_avx2(auVar142,0xd);
  auVar100 = vpor_avx2(auVar107,auVar100);
  auVar110 = vpsrld_avx2(auVar142,10);
  auVar107 = vpsrld_avx2(auVar72,7);
  auVar108 = vpslld_avx2(auVar72,0x19);
  auVar107 = vpor_avx2(auVar108,auVar107);
  auVar108 = vpsrld_avx2(auVar72,0x12);
  auVar151 = vpslld_avx2(auVar72,0xe);
  auVar108 = vpor_avx2(auVar151,auVar108);
  auVar151 = vpsrld_avx2(auVar72,3);
  auVar95 = vpaddd_avx2(auVar95,auVar108 ^ auVar107 ^ auVar151);
  auVar95 = vpaddd_avx2(auVar95,auVar11);
  auVar95 = vpaddd_avx2(auVar95,auVar100 ^ auVar44 ^ auVar110);
  auVar44 = vpsrld_avx2(auVar19,6);
  auVar100 = vpslld_avx2(auVar19,0x1a);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar19,0xb);
  auVar100 = vpslld_avx2(auVar19,0x15);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar19,0x19);
  auVar100 = vpslld_avx2(auVar19,7);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpandn_avx2(auVar19,auVar141);
  auVar44 = vpand_avx2(auVar18,auVar19);
  auVar44 = vpor_avx2(auVar44,auVar100);
  auVar39 = vpaddd_avx2(auVar95,auVar39);
  auVar39 = vpaddd_avx2(auVar44,auVar39);
  auVar39 = vpaddd_avx2(auVar39,auVar133);
  auVar39 = vpaddd_avx2(auVar108 ^ auVar107 ^ auVar110,auVar39);
  auVar44 = vpsrld_avx2(auVar38,2);
  auVar100 = vpslld_avx2(auVar38,0x1e);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar38,0xd);
  auVar100 = vpslld_avx2(auVar38,0x13);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar38,0x16);
  auVar100 = vpslld_avx2(auVar38,10);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpor_avx2(auVar38,auVar20);
  auVar44 = vpand_avx2(auVar44,auVar70);
  auVar100 = vpand_avx2(auVar38,auVar20);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar42 = vpaddd_avx2(auVar39,auVar42);
  auVar39 = vpaddd_avx2(auVar110 ^ auVar108 ^ auVar107,auVar39);
  auVar39 = vpaddd_avx2(auVar44,auVar39);
  auVar44 = vpsrld_avx2(auVar143,0x11);
  auVar100 = vpslld_avx2(auVar143,0xf);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpsrld_avx2(auVar143,0x13);
  auVar107 = vpslld_avx2(auVar143,0xd);
  auVar100 = vpor_avx2(auVar107,auVar100);
  auVar110 = vpsrld_avx2(auVar143,10);
  auVar107 = vpsrld_avx2(auVar74,7);
  auVar108 = vpslld_avx2(auVar74,0x19);
  auVar107 = vpor_avx2(auVar108,auVar107);
  auVar108 = vpsrld_avx2(auVar74,0x12);
  auVar151 = vpslld_avx2(auVar74,0xe);
  auVar108 = vpor_avx2(auVar151,auVar108);
  auVar151 = vpsrld_avx2(auVar74,3);
  auVar72 = vpaddd_avx2(auVar108 ^ auVar107 ^ auVar151,auVar72);
  auVar72 = vpaddd_avx2(auVar72,auVar94);
  auVar72 = vpaddd_avx2(auVar72,auVar100 ^ auVar44 ^ auVar110);
  auVar44 = vpsrld_avx2(auVar42,6);
  auVar100 = vpslld_avx2(auVar42,0x1a);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar42,0xb);
  auVar100 = vpslld_avx2(auVar42,0x15);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar42,0x19);
  auVar100 = vpslld_avx2(auVar42,7);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpandn_avx2(auVar42,auVar18);
  auVar44 = vpand_avx2(auVar19,auVar42);
  auVar44 = vpor_avx2(auVar44,auVar100);
  auVar141 = vpaddd_avx2(auVar72,auVar141);
  auVar141 = vpaddd_avx2(auVar44,auVar141);
  auVar141 = vpaddd_avx2(auVar141,auVar119);
  auVar141 = vpaddd_avx2(auVar108 ^ auVar107 ^ auVar110,auVar141);
  auVar44 = vpsrld_avx2(auVar39,2);
  auVar100 = vpslld_avx2(auVar39,0x1e);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar39,0xd);
  auVar100 = vpslld_avx2(auVar39,0x13);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar39,0x16);
  auVar100 = vpslld_avx2(auVar39,10);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpor_avx2(auVar39,auVar38);
  auVar44 = vpand_avx2(auVar44,auVar20);
  auVar100 = vpand_avx2(auVar39,auVar38);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar70 = vpaddd_avx2(auVar141,auVar70);
  auVar141 = vpaddd_avx2(auVar110 ^ auVar108 ^ auVar107,auVar141);
  auVar141 = vpaddd_avx2(auVar44,auVar141);
  auVar44 = vpsrld_avx2(auVar95,0x11);
  auVar100 = vpslld_avx2(auVar95,0xf);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpsrld_avx2(auVar95,0x13);
  auVar107 = vpslld_avx2(auVar95,0xd);
  auVar100 = vpor_avx2(auVar107,auVar100);
  auVar110 = vpsrld_avx2(auVar95,10);
  auVar107 = vpsrld_avx2(auVar6,7);
  auVar108 = vpslld_avx2(auVar6,0x19);
  auVar107 = vpor_avx2(auVar108,auVar107);
  auVar108 = vpsrld_avx2(auVar6,0x12);
  auVar151 = vpslld_avx2(auVar6,0xe);
  auVar108 = vpor_avx2(auVar151,auVar108);
  auVar151 = vpsrld_avx2(auVar6,3);
  auVar74 = vpaddd_avx2(auVar74,auVar108 ^ auVar107 ^ auVar151);
  auVar74 = vpaddd_avx2(auVar74,auVar13);
  auVar74 = vpaddd_avx2(auVar74,auVar100 ^ auVar44 ^ auVar110);
  auVar44 = vpsrld_avx2(auVar70,6);
  auVar100 = vpslld_avx2(auVar70,0x1a);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar70,0xb);
  auVar100 = vpslld_avx2(auVar70,0x15);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar70,0x19);
  auVar100 = vpslld_avx2(auVar70,7);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpandn_avx2(auVar70,auVar19);
  auVar44 = vpand_avx2(auVar42,auVar70);
  auVar44 = vpor_avx2(auVar44,auVar100);
  auVar18 = vpaddd_avx2(auVar74,auVar18);
  auVar18 = vpaddd_avx2(auVar44,auVar18);
  auVar18 = vpaddd_avx2(auVar18,auVar120);
  auVar18 = vpaddd_avx2(auVar108 ^ auVar107 ^ auVar110,auVar18);
  auVar44 = vpsrld_avx2(auVar141,2);
  auVar100 = vpslld_avx2(auVar141,0x1e);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar141,0xd);
  auVar100 = vpslld_avx2(auVar141,0x13);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar141,0x16);
  auVar100 = vpslld_avx2(auVar141,10);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpor_avx2(auVar141,auVar39);
  auVar44 = vpand_avx2(auVar44,auVar38);
  auVar100 = vpand_avx2(auVar141,auVar39);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar20 = vpaddd_avx2(auVar18,auVar20);
  auVar18 = vpaddd_avx2(auVar110 ^ auVar108 ^ auVar107,auVar18);
  auVar18 = vpaddd_avx2(auVar44,auVar18);
  auVar44 = vpsrld_avx2(auVar72,0x11);
  auVar100 = vpslld_avx2(auVar72,0xf);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpsrld_avx2(auVar72,0x13);
  auVar107 = vpslld_avx2(auVar72,0xd);
  auVar100 = vpor_avx2(auVar107,auVar100);
  auVar110 = vpsrld_avx2(auVar72,10);
  auVar107 = vpsrld_avx2(auVar33,7);
  auVar108 = vpslld_avx2(auVar33,0x19);
  auVar107 = vpor_avx2(auVar108,auVar107);
  auVar108 = vpsrld_avx2(auVar33,0x12);
  auVar151 = vpslld_avx2(auVar33,0xe);
  auVar108 = vpor_avx2(auVar151,auVar108);
  auVar151 = vpsrld_avx2(auVar33,3);
  auVar6 = vpaddd_avx2(auVar108 ^ auVar107 ^ auVar151,auVar6);
  auVar6 = vpaddd_avx2(auVar6,auVar12);
  auVar6 = vpaddd_avx2(auVar6,auVar100 ^ auVar44 ^ auVar110);
  auVar44 = vpsrld_avx2(auVar20,6);
  auVar100 = vpslld_avx2(auVar20,0x1a);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar20,0xb);
  auVar100 = vpslld_avx2(auVar20,0x15);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar20,0x19);
  auVar100 = vpslld_avx2(auVar20,7);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpandn_avx2(auVar20,auVar42);
  auVar44 = vpand_avx2(auVar70,auVar20);
  auVar44 = vpor_avx2(auVar44,auVar100);
  auVar19 = vpaddd_avx2(auVar6,auVar19);
  auVar19 = vpaddd_avx2(auVar44,auVar19);
  auVar19 = vpaddd_avx2(auVar19,auVar121);
  auVar19 = vpaddd_avx2(auVar108 ^ auVar107 ^ auVar110,auVar19);
  auVar44 = vpsrld_avx2(auVar18,2);
  auVar100 = vpslld_avx2(auVar18,0x1e);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar18,0xd);
  auVar100 = vpslld_avx2(auVar18,0x13);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar18,0x16);
  auVar100 = vpslld_avx2(auVar18,10);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpor_avx2(auVar18,auVar141);
  auVar44 = vpand_avx2(auVar44,auVar39);
  auVar100 = vpand_avx2(auVar18,auVar141);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar38 = vpaddd_avx2(auVar19,auVar38);
  auVar19 = vpaddd_avx2(auVar110 ^ auVar108 ^ auVar107,auVar19);
  auVar19 = vpaddd_avx2(auVar44,auVar19);
  auVar44 = vpsrld_avx2(auVar74,0x11);
  auVar100 = vpslld_avx2(auVar74,0xf);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpsrld_avx2(auVar74,0x13);
  auVar107 = vpslld_avx2(auVar74,0xd);
  auVar100 = vpor_avx2(auVar107,auVar100);
  auVar110 = vpsrld_avx2(auVar74,10);
  auVar107 = vpsrld_avx2(auVar7,7);
  auVar108 = vpslld_avx2(auVar7,0x19);
  auVar107 = vpor_avx2(auVar108,auVar107);
  auVar108 = vpsrld_avx2(auVar7,0x12);
  auVar151 = vpslld_avx2(auVar7,0xe);
  auVar108 = vpor_avx2(auVar151,auVar108);
  auVar151 = vpsrld_avx2(auVar7,3);
  auVar33 = vpaddd_avx2(auVar33,auVar108 ^ auVar107 ^ auVar151);
  auVar33 = vpaddd_avx2(auVar33,auVar15);
  auVar33 = vpaddd_avx2(auVar33,auVar100 ^ auVar44 ^ auVar110);
  auVar44 = vpsrld_avx2(auVar38,6);
  auVar100 = vpslld_avx2(auVar38,0x1a);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar38,0xb);
  auVar100 = vpslld_avx2(auVar38,0x15);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar38,0x19);
  auVar100 = vpslld_avx2(auVar38,7);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpandn_avx2(auVar38,auVar70);
  auVar44 = vpand_avx2(auVar20,auVar38);
  auVar44 = vpor_avx2(auVar44,auVar100);
  auVar42 = vpaddd_avx2(auVar33,auVar42);
  auVar42 = vpaddd_avx2(auVar44,auVar42);
  auVar42 = vpaddd_avx2(auVar42,auVar134);
  auVar42 = vpaddd_avx2(auVar108 ^ auVar107 ^ auVar110,auVar42);
  auVar44 = vpsrld_avx2(auVar19,2);
  auVar100 = vpslld_avx2(auVar19,0x1e);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar19,0xd);
  auVar100 = vpslld_avx2(auVar19,0x13);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar19,0x16);
  auVar100 = vpslld_avx2(auVar19,10);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpor_avx2(auVar19,auVar18);
  auVar44 = vpand_avx2(auVar44,auVar141);
  auVar100 = vpand_avx2(auVar19,auVar18);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar39 = vpaddd_avx2(auVar42,auVar39);
  auVar42 = vpaddd_avx2(auVar110 ^ auVar108 ^ auVar107,auVar42);
  auVar42 = vpaddd_avx2(auVar44,auVar42);
  auVar44 = vpsrld_avx2(auVar6,0x11);
  auVar100 = vpslld_avx2(auVar6,0xf);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpsrld_avx2(auVar6,0x13);
  auVar107 = vpslld_avx2(auVar6,0xd);
  auVar100 = vpor_avx2(auVar107,auVar100);
  auVar110 = vpsrld_avx2(auVar6,10);
  auVar107 = vpsrld_avx2(auVar8,7);
  auVar108 = vpslld_avx2(auVar8,0x19);
  auVar107 = vpor_avx2(auVar108,auVar107);
  auVar108 = vpsrld_avx2(auVar8,0x12);
  auVar151 = vpslld_avx2(auVar8,0xe);
  auVar108 = vpor_avx2(auVar151,auVar108);
  auVar151 = vpsrld_avx2(auVar8,3);
  auVar7 = vpaddd_avx2(auVar108 ^ auVar107 ^ auVar151,auVar7);
  auVar7 = vpaddd_avx2(auVar7,auVar142);
  auVar7 = vpaddd_avx2(auVar7,auVar100 ^ auVar44 ^ auVar110);
  auVar44 = vpsrld_avx2(auVar39,6);
  auVar100 = vpslld_avx2(auVar39,0x1a);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar39,0xb);
  auVar100 = vpslld_avx2(auVar39,0x15);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar39,0x19);
  auVar100 = vpslld_avx2(auVar39,7);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpandn_avx2(auVar39,auVar20);
  auVar44 = vpand_avx2(auVar38,auVar39);
  auVar44 = vpor_avx2(auVar44,auVar100);
  auVar70 = vpaddd_avx2(auVar7,auVar70);
  auVar70 = vpaddd_avx2(auVar44,auVar70);
  auVar70 = vpaddd_avx2(auVar70,auVar122);
  auVar70 = vpaddd_avx2(auVar108 ^ auVar107 ^ auVar110,auVar70);
  auVar44 = vpsrld_avx2(auVar42,2);
  auVar100 = vpslld_avx2(auVar42,0x1e);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar42,0xd);
  auVar100 = vpslld_avx2(auVar42,0x13);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar42,0x16);
  auVar100 = vpslld_avx2(auVar42,10);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpor_avx2(auVar42,auVar19);
  auVar44 = vpand_avx2(auVar44,auVar18);
  auVar100 = vpand_avx2(auVar42,auVar19);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar141 = vpaddd_avx2(auVar70,auVar141);
  auVar70 = vpaddd_avx2(auVar110 ^ auVar108 ^ auVar107,auVar70);
  auVar70 = vpaddd_avx2(auVar44,auVar70);
  auVar44 = vpsrld_avx2(auVar33,0x11);
  auVar100 = vpslld_avx2(auVar33,0xf);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpsrld_avx2(auVar33,0x13);
  auVar107 = vpslld_avx2(auVar33,0xd);
  auVar100 = vpor_avx2(auVar107,auVar100);
  auVar110 = vpsrld_avx2(auVar33,10);
  auVar107 = vpsrld_avx2(auVar34,7);
  auVar108 = vpslld_avx2(auVar34,0x19);
  auVar107 = vpor_avx2(auVar108,auVar107);
  auVar108 = vpsrld_avx2(auVar34,0x12);
  auVar151 = vpslld_avx2(auVar34,0xe);
  auVar108 = vpor_avx2(auVar151,auVar108);
  auVar151 = vpsrld_avx2(auVar34,3);
  auVar8 = vpaddd_avx2(auVar8,auVar108 ^ auVar107 ^ auVar151);
  auVar8 = vpaddd_avx2(auVar8,auVar143);
  auVar8 = vpaddd_avx2(auVar8,auVar100 ^ auVar44 ^ auVar110);
  auVar44 = vpsrld_avx2(auVar141,6);
  auVar100 = vpslld_avx2(auVar141,0x1a);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar141,0xb);
  auVar100 = vpslld_avx2(auVar141,0x15);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar141,0x19);
  auVar100 = vpslld_avx2(auVar141,7);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpandn_avx2(auVar141,auVar38);
  auVar44 = vpand_avx2(auVar39,auVar141);
  auVar44 = vpor_avx2(auVar44,auVar100);
  auVar20 = vpaddd_avx2(auVar8,auVar20);
  auVar20 = vpaddd_avx2(auVar44,auVar20);
  auVar20 = vpaddd_avx2(auVar20,auVar123);
  auVar20 = vpaddd_avx2(auVar108 ^ auVar107 ^ auVar110,auVar20);
  auVar44 = vpsrld_avx2(auVar70,2);
  auVar100 = vpslld_avx2(auVar70,0x1e);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar70,0xd);
  auVar100 = vpslld_avx2(auVar70,0x13);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar70,0x16);
  auVar100 = vpslld_avx2(auVar70,10);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpor_avx2(auVar70,auVar42);
  auVar44 = vpand_avx2(auVar44,auVar19);
  auVar100 = vpand_avx2(auVar70,auVar42);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar18 = vpaddd_avx2(auVar20,auVar18);
  auVar20 = vpaddd_avx2(auVar110 ^ auVar108 ^ auVar107,auVar20);
  auVar20 = vpaddd_avx2(auVar44,auVar20);
  auVar44 = vpsrld_avx2(auVar7,0x11);
  auVar100 = vpslld_avx2(auVar7,0xf);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpsrld_avx2(auVar7,0x13);
  auVar107 = vpslld_avx2(auVar7,0xd);
  auVar100 = vpor_avx2(auVar107,auVar100);
  auVar110 = vpsrld_avx2(auVar7,10);
  auVar107 = vpsrld_avx2(auVar3,7);
  auVar108 = vpslld_avx2(auVar3,0x19);
  auVar107 = vpor_avx2(auVar108,auVar107);
  auVar108 = vpsrld_avx2(auVar3,0x12);
  auVar151 = vpslld_avx2(auVar3,0xe);
  auVar108 = vpor_avx2(auVar151,auVar108);
  auVar151 = vpsrld_avx2(auVar3,3);
  auVar34 = vpaddd_avx2(auVar108 ^ auVar107 ^ auVar151,auVar34);
  auVar34 = vpaddd_avx2(auVar34,auVar95);
  auVar34 = vpaddd_avx2(auVar34,auVar100 ^ auVar44 ^ auVar110);
  auVar44 = vpsrld_avx2(auVar18,6);
  auVar100 = vpslld_avx2(auVar18,0x1a);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar18,0xb);
  auVar100 = vpslld_avx2(auVar18,0x15);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar18,0x19);
  auVar100 = vpslld_avx2(auVar18,7);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpandn_avx2(auVar18,auVar39);
  auVar44 = vpand_avx2(auVar141,auVar18);
  auVar44 = vpor_avx2(auVar44,auVar100);
  auVar38 = vpaddd_avx2(auVar34,auVar38);
  auVar38 = vpaddd_avx2(auVar44,auVar38);
  auVar38 = vpaddd_avx2(auVar38,auVar102);
  auVar38 = vpaddd_avx2(auVar108 ^ auVar107 ^ auVar110,auVar38);
  auVar44 = vpsrld_avx2(auVar20,2);
  auVar100 = vpslld_avx2(auVar20,0x1e);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar20,0xd);
  auVar100 = vpslld_avx2(auVar20,0x13);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar20,0x16);
  auVar100 = vpslld_avx2(auVar20,10);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpor_avx2(auVar20,auVar70);
  auVar44 = vpand_avx2(auVar44,auVar42);
  auVar100 = vpand_avx2(auVar20,auVar70);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar19 = vpaddd_avx2(auVar38,auVar19);
  auVar38 = vpaddd_avx2(auVar110 ^ auVar108 ^ auVar107,auVar38);
  auVar38 = vpaddd_avx2(auVar44,auVar38);
  auVar44 = vpsrld_avx2(auVar8,0x11);
  auVar100 = vpslld_avx2(auVar8,0xf);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpsrld_avx2(auVar8,0x13);
  auVar107 = vpslld_avx2(auVar8,0xd);
  auVar100 = vpor_avx2(auVar107,auVar100);
  auVar110 = vpsrld_avx2(auVar8,10);
  auVar107 = vpsrld_avx2(auVar11,7);
  auVar108 = vpslld_avx2(auVar11,0x19);
  auVar107 = vpor_avx2(auVar108,auVar107);
  auVar108 = vpsrld_avx2(auVar11,0x12);
  auVar151 = vpslld_avx2(auVar11,0xe);
  auVar108 = vpor_avx2(auVar151,auVar108);
  auVar151 = vpsrld_avx2(auVar11,3);
  auVar3 = vpaddd_avx2(auVar3,auVar108 ^ auVar107 ^ auVar151);
  auVar3 = vpaddd_avx2(auVar3,auVar72);
  auVar3 = vpaddd_avx2(auVar3,auVar100 ^ auVar44 ^ auVar110);
  auVar44 = vpsrld_avx2(auVar19,6);
  auVar100 = vpslld_avx2(auVar19,0x1a);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar19,0xb);
  auVar100 = vpslld_avx2(auVar19,0x15);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar19,0x19);
  auVar100 = vpslld_avx2(auVar19,7);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpandn_avx2(auVar19,auVar141);
  auVar44 = vpand_avx2(auVar18,auVar19);
  auVar44 = vpor_avx2(auVar44,auVar100);
  auVar39 = vpaddd_avx2(auVar3,auVar39);
  auVar39 = vpaddd_avx2(auVar44,auVar39);
  auVar39 = vpaddd_avx2(auVar39,auVar124);
  auVar39 = vpaddd_avx2(auVar108 ^ auVar107 ^ auVar110,auVar39);
  auVar44 = vpsrld_avx2(auVar38,2);
  auVar100 = vpslld_avx2(auVar38,0x1e);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar38,0xd);
  auVar100 = vpslld_avx2(auVar38,0x13);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar38,0x16);
  auVar100 = vpslld_avx2(auVar38,10);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpor_avx2(auVar38,auVar20);
  auVar44 = vpand_avx2(auVar44,auVar70);
  auVar100 = vpand_avx2(auVar38,auVar20);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar42 = vpaddd_avx2(auVar39,auVar42);
  auVar39 = vpaddd_avx2(auVar110 ^ auVar108 ^ auVar107,auVar39);
  auVar39 = vpaddd_avx2(auVar44,auVar39);
  auVar44 = vpsrld_avx2(auVar34,0x11);
  auVar100 = vpslld_avx2(auVar34,0xf);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpsrld_avx2(auVar34,0x13);
  auVar107 = vpslld_avx2(auVar34,0xd);
  auVar100 = vpor_avx2(auVar107,auVar100);
  auVar110 = vpsrld_avx2(auVar34,10);
  auVar107 = vpsrld_avx2(auVar94,7);
  auVar108 = vpslld_avx2(auVar94,0x19);
  auVar107 = vpor_avx2(auVar108,auVar107);
  auVar151 = vpsrld_avx2(auVar94,0x12);
  auVar108 = vpslld_avx2(auVar94,0xe);
  auVar108 = vpor_avx2(auVar108,auVar151);
  auVar151 = vpsrld_avx2(auVar94,3);
  auVar11 = vpaddd_avx2(auVar108 ^ auVar107 ^ auVar151,auVar11);
  auVar11 = vpaddd_avx2(auVar11,auVar74);
  auVar11 = vpaddd_avx2(auVar11,auVar100 ^ auVar44 ^ auVar110);
  auVar44 = vpsrld_avx2(auVar42,6);
  auVar100 = vpslld_avx2(auVar42,0x1a);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar42,0xb);
  auVar100 = vpslld_avx2(auVar42,0x15);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar42,0x19);
  auVar100 = vpslld_avx2(auVar42,7);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpandn_avx2(auVar42,auVar18);
  auVar44 = vpand_avx2(auVar19,auVar42);
  auVar44 = vpor_avx2(auVar44,auVar100);
  auVar141 = vpaddd_avx2(auVar11,auVar141);
  auVar141 = vpaddd_avx2(auVar44,auVar141);
  auVar141 = vpaddd_avx2(auVar141,auVar97);
  auVar141 = vpaddd_avx2(auVar108 ^ auVar107 ^ auVar110,auVar141);
  auVar44 = vpsrld_avx2(auVar39,2);
  auVar100 = vpslld_avx2(auVar39,0x1e);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar39,0xd);
  auVar100 = vpslld_avx2(auVar39,0x13);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar39,0x16);
  auVar100 = vpslld_avx2(auVar39,10);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpor_avx2(auVar39,auVar38);
  auVar44 = vpand_avx2(auVar44,auVar20);
  auVar100 = vpand_avx2(auVar39,auVar38);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar70 = vpaddd_avx2(auVar141,auVar70);
  auVar141 = vpaddd_avx2(auVar110 ^ auVar108 ^ auVar107,auVar141);
  auVar141 = vpaddd_avx2(auVar44,auVar141);
  auVar44 = vpsrld_avx2(auVar3,0x11);
  auVar100 = vpslld_avx2(auVar3,0xf);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpsrld_avx2(auVar3,0x13);
  auVar107 = vpslld_avx2(auVar3,0xd);
  auVar100 = vpor_avx2(auVar107,auVar100);
  auVar110 = vpsrld_avx2(auVar3,10);
  auVar107 = vpsrld_avx2(auVar13,7);
  auVar108 = vpslld_avx2(auVar13,0x19);
  auVar107 = vpor_avx2(auVar108,auVar107);
  auVar108 = vpsrld_avx2(auVar13,0x12);
  auVar151 = vpslld_avx2(auVar13,0xe);
  auVar108 = vpor_avx2(auVar151,auVar108);
  auVar151 = vpsrld_avx2(auVar13,3);
  auVar94 = vpaddd_avx2(auVar94,auVar108 ^ auVar107 ^ auVar151);
  auVar94 = vpaddd_avx2(auVar94,auVar6);
  auVar94 = vpaddd_avx2(auVar94,auVar100 ^ auVar44 ^ auVar110);
  auVar44 = vpsrld_avx2(auVar70,6);
  auVar100 = vpslld_avx2(auVar70,0x1a);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar70,0xb);
  auVar100 = vpslld_avx2(auVar70,0x15);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar70,0x19);
  auVar100 = vpslld_avx2(auVar70,7);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpandn_avx2(auVar70,auVar19);
  auVar44 = vpand_avx2(auVar42,auVar70);
  auVar44 = vpor_avx2(auVar44,auVar100);
  auVar18 = vpaddd_avx2(auVar94,auVar18);
  auVar18 = vpaddd_avx2(auVar44,auVar18);
  auVar18 = vpaddd_avx2(auVar18,auVar98);
  auVar18 = vpaddd_avx2(auVar108 ^ auVar107 ^ auVar110,auVar18);
  auVar44 = vpsrld_avx2(auVar141,2);
  auVar100 = vpslld_avx2(auVar141,0x1e);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar141,0xd);
  auVar100 = vpslld_avx2(auVar141,0x13);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar141,0x16);
  auVar100 = vpslld_avx2(auVar141,10);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpor_avx2(auVar141,auVar39);
  auVar44 = vpand_avx2(auVar44,auVar38);
  auVar100 = vpand_avx2(auVar141,auVar39);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar20 = vpaddd_avx2(auVar18,auVar20);
  auVar18 = vpaddd_avx2(auVar110 ^ auVar108 ^ auVar107,auVar18);
  auVar18 = vpaddd_avx2(auVar44,auVar18);
  auVar44 = vpsrld_avx2(auVar11,0x11);
  auVar100 = vpslld_avx2(auVar11,0xf);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpsrld_avx2(auVar11,0x13);
  auVar107 = vpslld_avx2(auVar11,0xd);
  auVar100 = vpor_avx2(auVar107,auVar100);
  auVar110 = vpsrld_avx2(auVar11,10);
  auVar107 = vpsrld_avx2(auVar12,7);
  auVar108 = vpslld_avx2(auVar12,0x19);
  auVar107 = vpor_avx2(auVar108,auVar107);
  auVar108 = vpsrld_avx2(auVar12,0x12);
  auVar151 = vpslld_avx2(auVar12,0xe);
  auVar108 = vpor_avx2(auVar151,auVar108);
  auVar151 = vpsrld_avx2(auVar12,3);
  auVar13 = vpaddd_avx2(auVar108 ^ auVar107 ^ auVar151,auVar13);
  auVar13 = vpaddd_avx2(auVar13,auVar33);
  auVar13 = vpaddd_avx2(auVar13,auVar100 ^ auVar44 ^ auVar110);
  auVar44 = vpsrld_avx2(auVar20,6);
  auVar100 = vpslld_avx2(auVar20,0x1a);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar20,0xb);
  auVar100 = vpslld_avx2(auVar20,0x15);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar20,0x19);
  auVar100 = vpslld_avx2(auVar20,7);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpandn_avx2(auVar20,auVar42);
  auVar44 = vpand_avx2(auVar70,auVar20);
  auVar44 = vpor_avx2(auVar44,auVar100);
  auVar19 = vpaddd_avx2(auVar13,auVar19);
  auVar19 = vpaddd_avx2(auVar44,auVar19);
  auVar19 = vpaddd_avx2(auVar19,auVar99);
  auVar19 = vpaddd_avx2(auVar108 ^ auVar107 ^ auVar110,auVar19);
  auVar44 = vpsrld_avx2(auVar18,2);
  auVar100 = vpslld_avx2(auVar18,0x1e);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar18,0xd);
  auVar100 = vpslld_avx2(auVar18,0x13);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar18,0x16);
  auVar100 = vpslld_avx2(auVar18,10);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpor_avx2(auVar18,auVar141);
  auVar44 = vpand_avx2(auVar44,auVar39);
  auVar100 = vpand_avx2(auVar18,auVar141);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar38 = vpaddd_avx2(auVar19,auVar38);
  auVar19 = vpaddd_avx2(auVar110 ^ auVar108 ^ auVar107,auVar19);
  auVar19 = vpaddd_avx2(auVar44,auVar19);
  auVar44 = vpsrld_avx2(auVar94,0x11);
  auVar100 = vpslld_avx2(auVar94,0xf);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpsrld_avx2(auVar94,0x13);
  auVar107 = vpslld_avx2(auVar94,0xd);
  auVar100 = vpor_avx2(auVar107,auVar100);
  auVar110 = vpsrld_avx2(auVar94,10);
  auVar107 = vpsrld_avx2(auVar15,7);
  auVar108 = vpslld_avx2(auVar15,0x19);
  auVar107 = vpor_avx2(auVar108,auVar107);
  auVar151 = vpsrld_avx2(auVar15,0x12);
  auVar108 = vpslld_avx2(auVar15,0xe);
  auVar108 = vpor_avx2(auVar108,auVar151);
  auVar151 = vpsrld_avx2(auVar15,3);
  auVar12 = vpaddd_avx2(auVar12,auVar108 ^ auVar107 ^ auVar151);
  auVar12 = vpaddd_avx2(auVar12,auVar7);
  auVar12 = vpaddd_avx2(auVar12,auVar100 ^ auVar44 ^ auVar110);
  auVar44 = vpsrld_avx2(auVar38,6);
  auVar100 = vpslld_avx2(auVar38,0x1a);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar38,0xb);
  auVar100 = vpslld_avx2(auVar38,0x15);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar38,0x19);
  auVar100 = vpslld_avx2(auVar38,7);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpandn_avx2(auVar38,auVar70);
  auVar44 = vpand_avx2(auVar20,auVar38);
  auVar44 = vpor_avx2(auVar44,auVar100);
  auVar42 = vpaddd_avx2(auVar12,auVar42);
  auVar42 = vpaddd_avx2(auVar44,auVar42);
  auVar42 = vpaddd_avx2(auVar42,auVar135);
  auVar42 = vpaddd_avx2(auVar108 ^ auVar107 ^ auVar110,auVar42);
  auVar44 = vpsrld_avx2(auVar19,2);
  auVar100 = vpslld_avx2(auVar19,0x1e);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar19,0xd);
  auVar100 = vpslld_avx2(auVar19,0x13);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar19,0x16);
  auVar100 = vpslld_avx2(auVar19,10);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpor_avx2(auVar19,auVar18);
  auVar44 = vpand_avx2(auVar44,auVar141);
  auVar100 = vpand_avx2(auVar19,auVar18);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar39 = vpaddd_avx2(auVar42,auVar39);
  auVar42 = vpaddd_avx2(auVar110 ^ auVar108 ^ auVar107,auVar42);
  auVar42 = vpaddd_avx2(auVar44,auVar42);
  auVar44 = vpsrld_avx2(auVar13,0x11);
  auVar100 = vpslld_avx2(auVar13,0xf);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpsrld_avx2(auVar13,0x13);
  auVar107 = vpslld_avx2(auVar13,0xd);
  auVar100 = vpor_avx2(auVar107,auVar100);
  auVar110 = vpsrld_avx2(auVar13,10);
  auVar107 = vpsrld_avx2(auVar142,7);
  auVar108 = vpslld_avx2(auVar142,0x19);
  auVar107 = vpor_avx2(auVar108,auVar107);
  auVar151 = vpsrld_avx2(auVar142,0x12);
  auVar108 = vpslld_avx2(auVar142,0xe);
  auVar108 = vpor_avx2(auVar108,auVar151);
  auVar151 = vpsrld_avx2(auVar142,3);
  auVar15 = vpaddd_avx2(auVar108 ^ auVar107 ^ auVar151,auVar15);
  auVar15 = vpaddd_avx2(auVar15,auVar8);
  auVar15 = vpaddd_avx2(auVar15,auVar100 ^ auVar44 ^ auVar110);
  auVar44 = vpsrld_avx2(auVar39,6);
  auVar100 = vpslld_avx2(auVar39,0x1a);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar39,0xb);
  auVar100 = vpslld_avx2(auVar39,0x15);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar39,0x19);
  auVar100 = vpslld_avx2(auVar39,7);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpandn_avx2(auVar39,auVar20);
  auVar44 = vpand_avx2(auVar38,auVar39);
  auVar44 = vpor_avx2(auVar44,auVar100);
  auVar70 = vpaddd_avx2(auVar15,auVar70);
  auVar70 = vpaddd_avx2(auVar44,auVar70);
  auVar70 = vpaddd_avx2(auVar70,auVar125);
  auVar70 = vpaddd_avx2(auVar108 ^ auVar107 ^ auVar110,auVar70);
  auVar44 = vpsrld_avx2(auVar42,2);
  auVar100 = vpslld_avx2(auVar42,0x1e);
  auVar107 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar42,0xd);
  auVar100 = vpslld_avx2(auVar42,0x13);
  auVar108 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpsrld_avx2(auVar42,0x16);
  auVar100 = vpslld_avx2(auVar42,10);
  auVar110 = vpor_avx2(auVar100,auVar44);
  auVar44 = vpor_avx2(auVar42,auVar19);
  auVar44 = vpand_avx2(auVar44,auVar18);
  auVar100 = vpand_avx2(auVar42,auVar19);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar141 = vpaddd_avx2(auVar70,auVar141);
  auVar70 = vpaddd_avx2(auVar110 ^ auVar108 ^ auVar107,auVar70);
  auVar70 = vpaddd_avx2(auVar44,auVar70);
  auVar44 = vpsrld_avx2(auVar12,0x11);
  auVar100 = vpslld_avx2(auVar12,0xf);
  auVar44 = vpor_avx2(auVar100,auVar44);
  auVar100 = vpsrld_avx2(auVar12,0x13);
  auVar107 = vpslld_avx2(auVar12,0xd);
  auVar100 = vpor_avx2(auVar107,auVar100);
  auVar110 = vpsrld_avx2(auVar12,10);
  auVar107 = vpsrld_avx2(auVar143,7);
  auVar108 = vpslld_avx2(auVar143,0x19);
  auVar107 = vpor_avx2(auVar108,auVar107);
  auVar151 = vpsrld_avx2(auVar143,0x12);
  auVar108 = vpslld_avx2(auVar143,0xe);
  auVar108 = vpor_avx2(auVar108,auVar151);
  auVar151 = vpsrld_avx2(auVar143,3);
  auVar142 = vpaddd_avx2(auVar142,auVar108 ^ auVar107 ^ auVar151);
  auVar34 = vpaddd_avx2(auVar142,auVar34);
  auVar34 = vpaddd_avx2(auVar34,auVar100 ^ auVar44 ^ auVar110);
  auVar142 = vpsrld_avx2(auVar141,6);
  auVar44 = vpslld_avx2(auVar141,0x1a);
  auVar100 = vpor_avx2(auVar44,auVar142);
  auVar142 = vpsrld_avx2(auVar141,0xb);
  auVar44 = vpslld_avx2(auVar141,0x15);
  auVar107 = vpor_avx2(auVar44,auVar142);
  auVar142 = vpsrld_avx2(auVar141,0x19);
  auVar44 = vpslld_avx2(auVar141,7);
  auVar108 = vpor_avx2(auVar44,auVar142);
  auVar44 = vpandn_avx2(auVar141,auVar38);
  auVar142 = vpand_avx2(auVar39,auVar141);
  auVar142 = vpor_avx2(auVar142,auVar44);
  auVar20 = vpaddd_avx2(auVar34,auVar20);
  auVar20 = vpaddd_avx2(auVar142,auVar20);
  auVar20 = vpaddd_avx2(auVar20,auVar126);
  auVar20 = vpaddd_avx2(auVar107 ^ auVar100 ^ auVar108,auVar20);
  auVar142 = vpsrld_avx2(auVar70,2);
  auVar44 = vpslld_avx2(auVar70,0x1e);
  auVar100 = vpor_avx2(auVar44,auVar142);
  auVar142 = vpsrld_avx2(auVar70,0xd);
  auVar44 = vpslld_avx2(auVar70,0x13);
  auVar107 = vpor_avx2(auVar44,auVar142);
  auVar142 = vpsrld_avx2(auVar70,0x16);
  auVar44 = vpslld_avx2(auVar70,10);
  auVar108 = vpor_avx2(auVar44,auVar142);
  auVar142 = vpor_avx2(auVar70,auVar42);
  auVar142 = vpand_avx2(auVar142,auVar19);
  auVar44 = vpand_avx2(auVar70,auVar42);
  auVar142 = vpor_avx2(auVar44,auVar142);
  auVar18 = vpaddd_avx2(auVar20,auVar18);
  auVar20 = vpaddd_avx2(auVar108 ^ auVar107 ^ auVar100,auVar20);
  auVar20 = vpaddd_avx2(auVar142,auVar20);
  auVar142 = vpsrld_avx2(auVar15,0x11);
  auVar44 = vpslld_avx2(auVar15,0xf);
  auVar44 = vpor_avx2(auVar44,auVar142);
  auVar142 = vpsrld_avx2(auVar15,0x13);
  auVar100 = vpslld_avx2(auVar15,0xd);
  auVar100 = vpor_avx2(auVar100,auVar142);
  auVar108 = vpsrld_avx2(auVar15,10);
  auVar142 = vpsrld_avx2(auVar95,7);
  auVar107 = vpslld_avx2(auVar95,0x19);
  auVar142 = vpor_avx2(auVar107,auVar142);
  auVar107 = vpsrld_avx2(auVar95,0x12);
  auVar110 = vpslld_avx2(auVar95,0xe);
  auVar107 = vpor_avx2(auVar110,auVar107);
  auVar110 = vpsrld_avx2(auVar95,3);
  auVar142 = vpaddd_avx2(auVar107 ^ auVar142 ^ auVar110,auVar143);
  auVar3 = vpaddd_avx2(auVar142,auVar3);
  auVar3 = vpaddd_avx2(auVar3,auVar100 ^ auVar44 ^ auVar108);
  auVar142 = vpsrld_avx2(auVar18,6);
  auVar143 = vpslld_avx2(auVar18,0x1a);
  auVar44 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar18,0xb);
  auVar143 = vpslld_avx2(auVar18,0x15);
  auVar100 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar18,0x19);
  auVar143 = vpslld_avx2(auVar18,7);
  auVar107 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpandn_avx2(auVar18,auVar39);
  auVar142 = vpand_avx2(auVar141,auVar18);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar38 = vpaddd_avx2(auVar3,auVar38);
  auVar38 = vpaddd_avx2(auVar142,auVar38);
  auVar38 = vpaddd_avx2(auVar38,auVar136);
  auVar38 = vpaddd_avx2(auVar100 ^ auVar44 ^ auVar107,auVar38);
  auVar142 = vpsrld_avx2(auVar20,2);
  auVar143 = vpslld_avx2(auVar20,0x1e);
  auVar44 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar20,0xd);
  auVar143 = vpslld_avx2(auVar20,0x13);
  auVar100 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar20,0x16);
  auVar143 = vpslld_avx2(auVar20,10);
  auVar107 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpor_avx2(auVar20,auVar70);
  auVar142 = vpand_avx2(auVar142,auVar42);
  auVar143 = vpand_avx2(auVar20,auVar70);
  auVar142 = vpor_avx2(auVar143,auVar142);
  auVar19 = vpaddd_avx2(auVar38,auVar19);
  auVar38 = vpaddd_avx2(auVar107 ^ auVar100 ^ auVar44,auVar38);
  auVar38 = vpaddd_avx2(auVar142,auVar38);
  auVar142 = vpsrld_avx2(auVar34,0x11);
  auVar143 = vpslld_avx2(auVar34,0xf);
  auVar143 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar34,0x13);
  auVar44 = vpslld_avx2(auVar34,0xd);
  auVar44 = vpor_avx2(auVar44,auVar142);
  auVar107 = vpsrld_avx2(auVar34,10);
  auVar142 = vpsrld_avx2(auVar72,7);
  auVar100 = vpslld_avx2(auVar72,0x19);
  auVar142 = vpor_avx2(auVar100,auVar142);
  auVar108 = vpsrld_avx2(auVar72,0x12);
  auVar100 = vpslld_avx2(auVar72,0xe);
  auVar100 = vpor_avx2(auVar100,auVar108);
  auVar108 = vpsrld_avx2(auVar72,3);
  auVar142 = vpaddd_avx2(auVar95,auVar100 ^ auVar142 ^ auVar108);
  auVar11 = vpaddd_avx2(auVar142,auVar11);
  auVar11 = vpaddd_avx2(auVar11,auVar44 ^ auVar143 ^ auVar107);
  auVar142 = vpsrld_avx2(auVar19,6);
  auVar143 = vpslld_avx2(auVar19,0x1a);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar19,0xb);
  auVar143 = vpslld_avx2(auVar19,0x15);
  auVar44 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar19,0x19);
  auVar143 = vpslld_avx2(auVar19,7);
  auVar100 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpandn_avx2(auVar19,auVar141);
  auVar142 = vpand_avx2(auVar18,auVar19);
  auVar142 = vpor_avx2(auVar142,auVar143);
  auVar39 = vpaddd_avx2(auVar11,auVar39);
  auVar39 = vpaddd_avx2(auVar142,auVar39);
  auVar39 = vpaddd_avx2(auVar39,auVar147);
  auVar39 = vpaddd_avx2(auVar44 ^ auVar95 ^ auVar100,auVar39);
  auVar142 = vpsrld_avx2(auVar38,2);
  auVar143 = vpslld_avx2(auVar38,0x1e);
  auVar95 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar38,0xd);
  auVar143 = vpslld_avx2(auVar38,0x13);
  auVar44 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpsrld_avx2(auVar38,0x16);
  auVar143 = vpslld_avx2(auVar38,10);
  auVar100 = vpor_avx2(auVar143,auVar142);
  auVar142 = vpor_avx2(auVar38,auVar20);
  auVar142 = vpand_avx2(auVar142,auVar70);
  auVar143 = vpand_avx2(auVar38,auVar20);
  auVar142 = vpor_avx2(auVar143,auVar142);
  auVar42 = vpaddd_avx2(auVar39,auVar42);
  auVar39 = vpaddd_avx2(auVar100 ^ auVar44 ^ auVar95,auVar39);
  auVar39 = vpaddd_avx2(auVar142,auVar39);
  auVar142 = vpsrld_avx2(auVar3,0x11);
  auVar143 = vpslld_avx2(auVar3,0xf);
  auVar142 = vpor_avx2(auVar143,auVar142);
  auVar143 = vpsrld_avx2(auVar3,0x13);
  auVar95 = vpslld_avx2(auVar3,0xd);
  auVar143 = vpor_avx2(auVar95,auVar143);
  auVar44 = vpsrld_avx2(auVar3,10);
  auVar3 = vpsrld_avx2(auVar74,7);
  auVar95 = vpslld_avx2(auVar74,0x19);
  auVar3 = vpor_avx2(auVar95,auVar3);
  auVar95 = vpsrld_avx2(auVar74,0x12);
  auVar100 = vpslld_avx2(auVar74,0xe);
  auVar95 = vpor_avx2(auVar100,auVar95);
  auVar100 = vpsrld_avx2(auVar74,3);
  auVar3 = vpaddd_avx2(auVar95 ^ auVar3 ^ auVar100,auVar72);
  auVar94 = vpaddd_avx2(auVar3,auVar94);
  auVar94 = vpaddd_avx2(auVar94,auVar143 ^ auVar142 ^ auVar44);
  auVar3 = vpsrld_avx2(auVar42,6);
  auVar142 = vpslld_avx2(auVar42,0x1a);
  auVar143 = vpor_avx2(auVar142,auVar3);
  auVar3 = vpsrld_avx2(auVar42,0xb);
  auVar142 = vpslld_avx2(auVar42,0x15);
  auVar95 = vpor_avx2(auVar142,auVar3);
  auVar3 = vpsrld_avx2(auVar42,0x19);
  auVar142 = vpslld_avx2(auVar42,7);
  auVar72 = vpor_avx2(auVar142,auVar3);
  auVar142 = vpandn_avx2(auVar42,auVar18);
  auVar3 = vpand_avx2(auVar19,auVar42);
  auVar142 = vpor_avx2(auVar3,auVar142);
  auVar3 = vpaddd_avx2(auVar94,auVar141);
  auVar3 = vpaddd_avx2(auVar142,auVar3);
  auVar3 = vpaddd_avx2(auVar3,auVar137);
  auVar3 = vpaddd_avx2(auVar95 ^ auVar143 ^ auVar72,auVar3);
  auVar141 = vpsrld_avx2(auVar39,2);
  auVar142 = vpslld_avx2(auVar39,0x1e);
  auVar143 = vpor_avx2(auVar142,auVar141);
  auVar141 = vpsrld_avx2(auVar39,0xd);
  auVar142 = vpslld_avx2(auVar39,0x13);
  auVar95 = vpor_avx2(auVar142,auVar141);
  auVar141 = vpsrld_avx2(auVar39,0x16);
  auVar142 = vpslld_avx2(auVar39,10);
  auVar72 = vpor_avx2(auVar142,auVar141);
  auVar141 = vpor_avx2(auVar39,auVar38);
  auVar141 = vpand_avx2(auVar141,auVar20);
  auVar142 = vpand_avx2(auVar39,auVar38);
  auVar141 = vpor_avx2(auVar141,auVar142);
  auVar70 = vpaddd_avx2(auVar70,auVar3);
  auVar3 = vpaddd_avx2(auVar95 ^ auVar143 ^ auVar72,auVar3);
  auVar3 = vpaddd_avx2(auVar141,auVar3);
  auVar141 = vpsrld_avx2(auVar11,0x11);
  auVar142 = vpslld_avx2(auVar11,0xf);
  auVar141 = vpor_avx2(auVar142,auVar141);
  auVar142 = vpsrld_avx2(auVar11,0x13);
  auVar143 = vpslld_avx2(auVar11,0xd);
  auVar142 = vpor_avx2(auVar143,auVar142);
  auVar95 = vpsrld_avx2(auVar11,10);
  auVar11 = vpsrld_avx2(auVar6,7);
  auVar143 = vpslld_avx2(auVar6,0x19);
  auVar11 = vpor_avx2(auVar143,auVar11);
  auVar143 = vpsrld_avx2(auVar6,0x12);
  auVar72 = vpslld_avx2(auVar6,0xe);
  auVar143 = vpor_avx2(auVar72,auVar143);
  auVar72 = vpsrld_avx2(auVar6,3);
  auVar11 = vpaddd_avx2(auVar74,auVar143 ^ auVar11 ^ auVar72);
  auVar11 = vpaddd_avx2(auVar11,auVar13);
  auVar11 = vpaddd_avx2(auVar11,auVar95 ^ auVar142 ^ auVar141);
  auVar13 = vpsrld_avx2(auVar70,6);
  auVar141 = vpslld_avx2(auVar70,0x1a);
  auVar142 = vpor_avx2(auVar141,auVar13);
  auVar13 = vpsrld_avx2(auVar70,0xb);
  auVar141 = vpslld_avx2(auVar70,0x15);
  auVar143 = vpor_avx2(auVar141,auVar13);
  auVar13 = vpsrld_avx2(auVar70,0x19);
  auVar141 = vpslld_avx2(auVar70,7);
  auVar95 = vpor_avx2(auVar141,auVar13);
  auVar141 = vpandn_avx2(auVar70,auVar19);
  auVar13 = vpand_avx2(auVar42,auVar70);
  auVar141 = vpor_avx2(auVar13,auVar141);
  auVar13 = vpaddd_avx2(auVar11,auVar18);
  auVar13 = vpaddd_avx2(auVar141,auVar13);
  auVar13 = vpaddd_avx2(auVar13,auVar138);
  auVar13 = vpaddd_avx2(auVar143 ^ auVar142 ^ auVar95,auVar13);
  auVar18 = vpsrld_avx2(auVar3,2);
  auVar141 = vpslld_avx2(auVar3,0x1e);
  auVar142 = vpor_avx2(auVar141,auVar18);
  auVar18 = vpsrld_avx2(auVar3,0xd);
  auVar141 = vpslld_avx2(auVar3,0x13);
  auVar143 = vpor_avx2(auVar141,auVar18);
  auVar18 = vpsrld_avx2(auVar3,0x16);
  auVar141 = vpslld_avx2(auVar3,10);
  auVar95 = vpor_avx2(auVar141,auVar18);
  auVar18 = vpor_avx2(auVar3,auVar39);
  auVar18 = vpand_avx2(auVar18,auVar38);
  auVar141 = vpand_avx2(auVar3,auVar39);
  auVar141 = vpor_avx2(auVar18,auVar141);
  auVar18 = vpaddd_avx2(auVar20,auVar13);
  auVar13 = vpaddd_avx2(auVar143 ^ auVar142 ^ auVar95,auVar13);
  auVar13 = vpaddd_avx2(auVar141,auVar13);
  auVar20 = vpsrld_avx2(auVar94,0x11);
  auVar141 = vpslld_avx2(auVar94,0xf);
  auVar20 = vpor_avx2(auVar141,auVar20);
  auVar141 = vpsrld_avx2(auVar94,0x13);
  auVar142 = vpslld_avx2(auVar94,0xd);
  auVar141 = vpor_avx2(auVar142,auVar141);
  auVar143 = vpsrld_avx2(auVar94,10);
  auVar94 = vpsrld_avx2(auVar33,7);
  auVar142 = vpslld_avx2(auVar33,0x19);
  auVar94 = vpor_avx2(auVar142,auVar94);
  auVar142 = vpsrld_avx2(auVar33,0x12);
  auVar95 = vpslld_avx2(auVar33,0xe);
  auVar142 = vpor_avx2(auVar95,auVar142);
  auVar95 = vpsrld_avx2(auVar33,3);
  auVar94 = vpaddd_avx2(auVar6,auVar95 ^ auVar142 ^ auVar94);
  auVar94 = vpaddd_avx2(auVar94,auVar12);
  auVar94 = vpaddd_avx2(auVar94,auVar141 ^ auVar20 ^ auVar143);
  auVar12 = vpsrld_avx2(auVar18,6);
  auVar20 = vpslld_avx2(auVar18,0x1a);
  auVar141 = vpor_avx2(auVar20,auVar12);
  auVar12 = vpsrld_avx2(auVar18,0xb);
  auVar20 = vpslld_avx2(auVar18,0x15);
  auVar142 = vpor_avx2(auVar20,auVar12);
  auVar12 = vpsrld_avx2(auVar18,0x19);
  auVar20 = vpslld_avx2(auVar18,7);
  auVar143 = vpor_avx2(auVar20,auVar12);
  auVar20 = vpandn_avx2(auVar18,auVar42);
  auVar12 = vpand_avx2(auVar18,auVar70);
  auVar20 = vpor_avx2(auVar12,auVar20);
  auVar12 = vpaddd_avx2(auVar94,auVar19);
  auVar12 = vpaddd_avx2(auVar20,auVar12);
  auVar12 = vpaddd_avx2(auVar12,auVar103);
  auVar12 = vpaddd_avx2(auVar12,auVar143 ^ auVar142 ^ auVar141);
  auVar19 = vpsrld_avx2(auVar13,2);
  auVar20 = vpslld_avx2(auVar13,0x1e);
  auVar141 = vpor_avx2(auVar20,auVar19);
  auVar19 = vpsrld_avx2(auVar13,0xd);
  auVar20 = vpslld_avx2(auVar13,0x13);
  auVar142 = vpor_avx2(auVar20,auVar19);
  auVar19 = vpsrld_avx2(auVar13,0x16);
  auVar20 = vpslld_avx2(auVar13,10);
  auVar143 = vpor_avx2(auVar20,auVar19);
  auVar19 = vpor_avx2(auVar13,auVar3);
  auVar19 = vpand_avx2(auVar19,auVar39);
  auVar20 = vpand_avx2(auVar13,auVar3);
  auVar20 = vpor_avx2(auVar19,auVar20);
  auVar19 = vpaddd_avx2(auVar38,auVar12);
  auVar12 = vpaddd_avx2(auVar143 ^ auVar142 ^ auVar141,auVar12);
  v = (__m256i)vpaddd_avx2(auVar20,auVar12);
  auVar12 = vpsrld_avx2(auVar11,0x11);
  auVar20 = vpslld_avx2(auVar11,0xf);
  auVar20 = vpor_avx2(auVar20,auVar12);
  auVar12 = vpsrld_avx2(auVar11,0x13);
  auVar38 = vpslld_avx2(auVar11,0xd);
  auVar38 = vpor_avx2(auVar38,auVar12);
  auVar74 = vpsrld_avx2(auVar11,10);
  auVar11 = vpsrld_avx2(auVar7,7);
  auVar12 = vpslld_avx2(auVar7,0x19);
  auVar141 = vpor_avx2(auVar12,auVar11);
  auVar11 = vpsrld_avx2(auVar7,0x12);
  auVar12 = vpslld_avx2(auVar7,0xe);
  auVar142 = vpor_avx2(auVar12,auVar11);
  auVar6 = vpsrld_avx2(auVar7,3);
  auVar11 = vpsrld_avx2(auVar19,6);
  auVar12 = vpslld_avx2(auVar19,0x1a);
  auVar143 = vpor_avx2(auVar12,auVar11);
  auVar11 = vpsrld_avx2(auVar19,0xb);
  auVar12 = vpslld_avx2(auVar19,0x15);
  auVar95 = vpor_avx2(auVar12,auVar11);
  auVar11 = vpsrld_avx2(auVar19,0x19);
  auVar12 = vpslld_avx2(auVar19,7);
  auVar72 = vpor_avx2(auVar12,auVar11);
  auVar12 = vpandn_avx2(auVar19,auVar70);
  auVar11 = vpand_avx2(auVar18,auVar19);
  auVar12 = vpor_avx2(auVar11,auVar12);
  auVar11 = vpaddd_avx2(auVar33,auVar142 ^ auVar141 ^ auVar6);
  auVar11 = vpaddd_avx2(auVar11,auVar15);
  auVar11 = vpaddd_avx2(auVar11,auVar38 ^ auVar20 ^ auVar74);
  auVar11 = vpaddd_avx2(auVar11,auVar42);
  auVar11 = vpaddd_avx2(auVar11,auVar12);
  auVar11 = vpaddd_avx2(auVar11,auVar45);
  auVar11 = vpaddd_avx2(auVar11,auVar95 ^ auVar143 ^ auVar72);
  auVar12 = vpsrld_avx2((undefined1  [32])v,2);
  auVar15 = vpslld_avx2((undefined1  [32])v,0x1e);
  auVar20 = vpor_avx2(auVar15,auVar12);
  auVar12 = vpsrld_avx2((undefined1  [32])v,0xd);
  auVar15 = vpslld_avx2((undefined1  [32])v,0x13);
  auVar38 = vpor_avx2(auVar15,auVar12);
  auVar12 = vpsrld_avx2((undefined1  [32])v,0x16);
  auVar15 = vpslld_avx2((undefined1  [32])v,10);
  auVar42 = vpor_avx2(auVar15,auVar12);
  auVar12 = vpor_avx2((undefined1  [32])v,auVar13);
  auVar12 = vpand_avx2(auVar3,auVar12);
  auVar15 = vpand_avx2((undefined1  [32])v,auVar13);
  auVar15 = vpor_avx2(auVar12,auVar15);
  auVar12 = vpaddd_avx2(auVar39,auVar11);
  auVar11 = vpaddd_avx2(auVar38 ^ auVar20 ^ auVar42,auVar11);
  auVar11 = vpaddd_avx2(auVar11,auVar15);
  auVar15 = vpsrld_avx2(auVar94,0x11);
  auVar20 = vpslld_avx2(auVar94,0xf);
  auVar15 = vpor_avx2(auVar20,auVar15);
  auVar20 = vpsrld_avx2(auVar94,0x13);
  auVar38 = vpslld_avx2(auVar94,0xd);
  auVar20 = vpor_avx2(auVar38,auVar20);
  auVar143 = vpsrld_avx2(auVar94,10);
  auVar94 = vpsrld_avx2(auVar8,7);
  auVar38 = vpslld_avx2(auVar8,0x19);
  auVar38 = vpor_avx2(auVar38,auVar94);
  auVar94 = vpsrld_avx2(auVar8,0x12);
  auVar39 = vpslld_avx2(auVar8,0xe);
  auVar39 = vpor_avx2(auVar39,auVar94);
  auVar95 = vpsrld_avx2(auVar8,3);
  auVar94 = vpsrld_avx2(auVar12,6);
  auVar8 = vpslld_avx2(auVar12,0x1a);
  auVar42 = vpor_avx2(auVar8,auVar94);
  auVar94 = vpsrld_avx2(auVar12,0xb);
  auVar8 = vpslld_avx2(auVar12,0x15);
  auVar141 = vpor_avx2(auVar8,auVar94);
  auVar94 = vpsrld_avx2(auVar12,0x19);
  auVar8 = vpslld_avx2(auVar12,7);
  auVar142 = vpor_avx2(auVar8,auVar94);
  auVar8 = vpandn_avx2(auVar12,auVar18);
  auVar94 = vpand_avx2(auVar19,auVar12);
  auVar8 = vpor_avx2(auVar94,auVar8);
  auVar94 = vpaddd_avx2(auVar7,auVar39 ^ auVar38 ^ auVar95);
  auVar94 = vpaddd_avx2(auVar94,auVar34);
  auVar94 = vpaddd_avx2(auVar94,auVar20 ^ auVar15 ^ auVar143);
  auVar94 = vpaddd_avx2(auVar94,auVar70);
  auVar94 = vpaddd_avx2(auVar94,auVar8);
  auVar94 = vpaddd_avx2(auVar94,auVar31);
  auVar94 = vpaddd_avx2(auVar94,auVar141 ^ auVar42 ^ auVar142);
  auVar8 = vpsrld_avx2(auVar11,2);
  auVar34 = vpslld_avx2(auVar11,0x1e);
  auVar15 = vpor_avx2(auVar34,auVar8);
  auVar8 = vpsrld_avx2(auVar11,0xd);
  auVar34 = vpslld_avx2(auVar11,0x13);
  auVar20 = vpor_avx2(auVar34,auVar8);
  auVar8 = vpsrld_avx2(auVar11,0x16);
  auVar34 = vpslld_avx2(auVar11,10);
  auVar38 = vpor_avx2(auVar34,auVar8);
  auVar8 = vpand_avx2((undefined1  [32])v,auVar11);
  auVar34 = vpor_avx2((undefined1  [32])v,auVar11);
  auVar34 = vpand_avx2(auVar13,auVar34);
  auVar8 = vpor_avx2(auVar34,auVar8);
  auVar34._8_4_ = 0x6a09e667;
  auVar34._0_8_ = 0x6a09e6676a09e667;
  auVar34._12_4_ = 0x6a09e667;
  auVar34._16_4_ = 0x6a09e667;
  auVar34._20_4_ = 0x6a09e667;
  auVar34._24_4_ = 0x6a09e667;
  auVar34._28_4_ = 0x6a09e667;
  auVar8 = vpaddd_avx2(auVar8,auVar34);
  auVar34 = vpaddd_avx2(auVar94,auVar20 ^ auVar15 ^ auVar38);
  vpaddd_avx2(auVar34,auVar8);
  anon_unknown_0::Write8((uchar *)this,0,v);
  auVar8._8_4_ = 0xbb67ae85;
  auVar8._0_8_ = 0xbb67ae85bb67ae85;
  auVar8._12_4_ = 0xbb67ae85;
  auVar8._16_4_ = 0xbb67ae85;
  auVar8._20_4_ = 0xbb67ae85;
  auVar8._24_4_ = 0xbb67ae85;
  auVar8._28_4_ = 0xbb67ae85;
  vpaddd_avx2(auVar11,auVar8);
  anon_unknown_0::Write8((uchar *)this,4,v);
  auVar11._8_4_ = 0x3c6ef372;
  auVar11._0_8_ = 0x3c6ef3723c6ef372;
  auVar11._12_4_ = 0x3c6ef372;
  auVar11._16_4_ = 0x3c6ef372;
  auVar11._20_4_ = 0x3c6ef372;
  auVar11._24_4_ = 0x3c6ef372;
  auVar11._28_4_ = 0x3c6ef372;
  vpaddd_avx2((undefined1  [32])v,auVar11);
  anon_unknown_0::Write8((uchar *)this,8,v);
  vpaddd_avx2(auVar13,auVar9);
  anon_unknown_0::Write8((uchar *)this,0xc,v);
  auVar8 = vpaddd_avx2(auVar3,auVar16);
  vpaddd_avx2(auVar8,auVar94);
  anon_unknown_0::Write8((uchar *)this,0x10,v);
  vpaddd_avx2(auVar12,auVar14);
  anon_unknown_0::Write8((uchar *)this,0x14,v);
  vpaddd_avx2(auVar19,auVar40);
  anon_unknown_0::Write8((uchar *)this,0x18,v);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    vpaddd_avx2(auVar18,auVar10);
    anon_unknown_0::Write8((uchar *)this,0x1c,(__m256i)in_stack_00000008);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Transform_8way(unsigned char* out, const unsigned char* in)
{
    // Transform 1
    __m256i a = K(0x6a09e667ul);
    __m256i b = K(0xbb67ae85ul);
    __m256i c = K(0x3c6ef372ul);
    __m256i d = K(0xa54ff53aul);
    __m256i e = K(0x510e527ful);
    __m256i f = K(0x9b05688cul);
    __m256i g = K(0x1f83d9abul);
    __m256i h = K(0x5be0cd19ul);

    __m256i w0, w1, w2, w3, w4, w5, w6, w7, w8, w9, w10, w11, w12, w13, w14, w15;

    Round(a, b, c, d, e, f, g, h, Add(K(0x428a2f98ul), w0 = Read8(in, 0)));
    Round(h, a, b, c, d, e, f, g, Add(K(0x71374491ul), w1 = Read8(in, 4)));
    Round(g, h, a, b, c, d, e, f, Add(K(0xb5c0fbcful), w2 = Read8(in, 8)));
    Round(f, g, h, a, b, c, d, e, Add(K(0xe9b5dba5ul), w3 = Read8(in, 12)));
    Round(e, f, g, h, a, b, c, d, Add(K(0x3956c25bul), w4 = Read8(in, 16)));
    Round(d, e, f, g, h, a, b, c, Add(K(0x59f111f1ul), w5 = Read8(in, 20)));
    Round(c, d, e, f, g, h, a, b, Add(K(0x923f82a4ul), w6 = Read8(in, 24)));
    Round(b, c, d, e, f, g, h, a, Add(K(0xab1c5ed5ul), w7 = Read8(in, 28)));
    Round(a, b, c, d, e, f, g, h, Add(K(0xd807aa98ul), w8 = Read8(in, 32)));
    Round(h, a, b, c, d, e, f, g, Add(K(0x12835b01ul), w9 = Read8(in, 36)));
    Round(g, h, a, b, c, d, e, f, Add(K(0x243185beul), w10 = Read8(in, 40)));
    Round(f, g, h, a, b, c, d, e, Add(K(0x550c7dc3ul), w11 = Read8(in, 44)));
    Round(e, f, g, h, a, b, c, d, Add(K(0x72be5d74ul), w12 = Read8(in, 48)));
    Round(d, e, f, g, h, a, b, c, Add(K(0x80deb1feul), w13 = Read8(in, 52)));
    Round(c, d, e, f, g, h, a, b, Add(K(0x9bdc06a7ul), w14 = Read8(in, 56)));
    Round(b, c, d, e, f, g, h, a, Add(K(0xc19bf174ul), w15 = Read8(in, 60)));
    Round(a, b, c, d, e, f, g, h, Add(K(0xe49b69c1ul), Inc(w0, sigma1(w14), w9, sigma0(w1))));
    Round(h, a, b, c, d, e, f, g, Add(K(0xefbe4786ul), Inc(w1, sigma1(w15), w10, sigma0(w2))));
    Round(g, h, a, b, c, d, e, f, Add(K(0x0fc19dc6ul), Inc(w2, sigma1(w0), w11, sigma0(w3))));
    Round(f, g, h, a, b, c, d, e, Add(K(0x240ca1ccul), Inc(w3, sigma1(w1), w12, sigma0(w4))));
    Round(e, f, g, h, a, b, c, d, Add(K(0x2de92c6ful), Inc(w4, sigma1(w2), w13, sigma0(w5))));
    Round(d, e, f, g, h, a, b, c, Add(K(0x4a7484aaul), Inc(w5, sigma1(w3), w14, sigma0(w6))));
    Round(c, d, e, f, g, h, a, b, Add(K(0x5cb0a9dcul), Inc(w6, sigma1(w4), w15, sigma0(w7))));
    Round(b, c, d, e, f, g, h, a, Add(K(0x76f988daul), Inc(w7, sigma1(w5), w0, sigma0(w8))));
    Round(a, b, c, d, e, f, g, h, Add(K(0x983e5152ul), Inc(w8, sigma1(w6), w1, sigma0(w9))));
    Round(h, a, b, c, d, e, f, g, Add(K(0xa831c66dul), Inc(w9, sigma1(w7), w2, sigma0(w10))));
    Round(g, h, a, b, c, d, e, f, Add(K(0xb00327c8ul), Inc(w10, sigma1(w8), w3, sigma0(w11))));
    Round(f, g, h, a, b, c, d, e, Add(K(0xbf597fc7ul), Inc(w11, sigma1(w9), w4, sigma0(w12))));
    Round(e, f, g, h, a, b, c, d, Add(K(0xc6e00bf3ul), Inc(w12, sigma1(w10), w5, sigma0(w13))));
    Round(d, e, f, g, h, a, b, c, Add(K(0xd5a79147ul), Inc(w13, sigma1(w11), w6, sigma0(w14))));
    Round(c, d, e, f, g, h, a, b, Add(K(0x06ca6351ul), Inc(w14, sigma1(w12), w7, sigma0(w15))));
    Round(b, c, d, e, f, g, h, a, Add(K(0x14292967ul), Inc(w15, sigma1(w13), w8, sigma0(w0))));
    Round(a, b, c, d, e, f, g, h, Add(K(0x27b70a85ul), Inc(w0, sigma1(w14), w9, sigma0(w1))));
    Round(h, a, b, c, d, e, f, g, Add(K(0x2e1b2138ul), Inc(w1, sigma1(w15), w10, sigma0(w2))));
    Round(g, h, a, b, c, d, e, f, Add(K(0x4d2c6dfcul), Inc(w2, sigma1(w0), w11, sigma0(w3))));
    Round(f, g, h, a, b, c, d, e, Add(K(0x53380d13ul), Inc(w3, sigma1(w1), w12, sigma0(w4))));
    Round(e, f, g, h, a, b, c, d, Add(K(0x650a7354ul), Inc(w4, sigma1(w2), w13, sigma0(w5))));
    Round(d, e, f, g, h, a, b, c, Add(K(0x766a0abbul), Inc(w5, sigma1(w3), w14, sigma0(w6))));
    Round(c, d, e, f, g, h, a, b, Add(K(0x81c2c92eul), Inc(w6, sigma1(w4), w15, sigma0(w7))));
    Round(b, c, d, e, f, g, h, a, Add(K(0x92722c85ul), Inc(w7, sigma1(w5), w0, sigma0(w8))));
    Round(a, b, c, d, e, f, g, h, Add(K(0xa2bfe8a1ul), Inc(w8, sigma1(w6), w1, sigma0(w9))));
    Round(h, a, b, c, d, e, f, g, Add(K(0xa81a664bul), Inc(w9, sigma1(w7), w2, sigma0(w10))));
    Round(g, h, a, b, c, d, e, f, Add(K(0xc24b8b70ul), Inc(w10, sigma1(w8), w3, sigma0(w11))));
    Round(f, g, h, a, b, c, d, e, Add(K(0xc76c51a3ul), Inc(w11, sigma1(w9), w4, sigma0(w12))));
    Round(e, f, g, h, a, b, c, d, Add(K(0xd192e819ul), Inc(w12, sigma1(w10), w5, sigma0(w13))));
    Round(d, e, f, g, h, a, b, c, Add(K(0xd6990624ul), Inc(w13, sigma1(w11), w6, sigma0(w14))));
    Round(c, d, e, f, g, h, a, b, Add(K(0xf40e3585ul), Inc(w14, sigma1(w12), w7, sigma0(w15))));
    Round(b, c, d, e, f, g, h, a, Add(K(0x106aa070ul), Inc(w15, sigma1(w13), w8, sigma0(w0))));
    Round(a, b, c, d, e, f, g, h, Add(K(0x19a4c116ul), Inc(w0, sigma1(w14), w9, sigma0(w1))));
    Round(h, a, b, c, d, e, f, g, Add(K(0x1e376c08ul), Inc(w1, sigma1(w15), w10, sigma0(w2))));
    Round(g, h, a, b, c, d, e, f, Add(K(0x2748774cul), Inc(w2, sigma1(w0), w11, sigma0(w3))));
    Round(f, g, h, a, b, c, d, e, Add(K(0x34b0bcb5ul), Inc(w3, sigma1(w1), w12, sigma0(w4))));
    Round(e, f, g, h, a, b, c, d, Add(K(0x391c0cb3ul), Inc(w4, sigma1(w2), w13, sigma0(w5))));
    Round(d, e, f, g, h, a, b, c, Add(K(0x4ed8aa4aul), Inc(w5, sigma1(w3), w14, sigma0(w6))));
    Round(c, d, e, f, g, h, a, b, Add(K(0x5b9cca4ful), Inc(w6, sigma1(w4), w15, sigma0(w7))));
    Round(b, c, d, e, f, g, h, a, Add(K(0x682e6ff3ul), Inc(w7, sigma1(w5), w0, sigma0(w8))));
    Round(a, b, c, d, e, f, g, h, Add(K(0x748f82eeul), Inc(w8, sigma1(w6), w1, sigma0(w9))));
    Round(h, a, b, c, d, e, f, g, Add(K(0x78a5636ful), Inc(w9, sigma1(w7), w2, sigma0(w10))));
    Round(g, h, a, b, c, d, e, f, Add(K(0x84c87814ul), Inc(w10, sigma1(w8), w3, sigma0(w11))));
    Round(f, g, h, a, b, c, d, e, Add(K(0x8cc70208ul), Inc(w11, sigma1(w9), w4, sigma0(w12))));
    Round(e, f, g, h, a, b, c, d, Add(K(0x90befffaul), Inc(w12, sigma1(w10), w5, sigma0(w13))));
    Round(d, e, f, g, h, a, b, c, Add(K(0xa4506cebul), Inc(w13, sigma1(w11), w6, sigma0(w14))));
    Round(c, d, e, f, g, h, a, b, Add(K(0xbef9a3f7ul), Inc(w14, sigma1(w12), w7, sigma0(w15))));
    Round(b, c, d, e, f, g, h, a, Add(K(0xc67178f2ul), Inc(w15, sigma1(w13), w8, sigma0(w0))));

    a = Add(a, K(0x6a09e667ul));
    b = Add(b, K(0xbb67ae85ul));
    c = Add(c, K(0x3c6ef372ul));
    d = Add(d, K(0xa54ff53aul));
    e = Add(e, K(0x510e527ful));
    f = Add(f, K(0x9b05688cul));
    g = Add(g, K(0x1f83d9abul));
    h = Add(h, K(0x5be0cd19ul));

    __m256i t0 = a, t1 = b, t2 = c, t3 = d, t4 = e, t5 = f, t6 = g, t7 = h;

    // Transform 2
    Round(a, b, c, d, e, f, g, h, K(0xc28a2f98ul));
    Round(h, a, b, c, d, e, f, g, K(0x71374491ul));
    Round(g, h, a, b, c, d, e, f, K(0xb5c0fbcful));
    Round(f, g, h, a, b, c, d, e, K(0xe9b5dba5ul));
    Round(e, f, g, h, a, b, c, d, K(0x3956c25bul));
    Round(d, e, f, g, h, a, b, c, K(0x59f111f1ul));
    Round(c, d, e, f, g, h, a, b, K(0x923f82a4ul));
    Round(b, c, d, e, f, g, h, a, K(0xab1c5ed5ul));
    Round(a, b, c, d, e, f, g, h, K(0xd807aa98ul));
    Round(h, a, b, c, d, e, f, g, K(0x12835b01ul));
    Round(g, h, a, b, c, d, e, f, K(0x243185beul));
    Round(f, g, h, a, b, c, d, e, K(0x550c7dc3ul));
    Round(e, f, g, h, a, b, c, d, K(0x72be5d74ul));
    Round(d, e, f, g, h, a, b, c, K(0x80deb1feul));
    Round(c, d, e, f, g, h, a, b, K(0x9bdc06a7ul));
    Round(b, c, d, e, f, g, h, a, K(0xc19bf374ul));
    Round(a, b, c, d, e, f, g, h, K(0x649b69c1ul));
    Round(h, a, b, c, d, e, f, g, K(0xf0fe4786ul));
    Round(g, h, a, b, c, d, e, f, K(0x0fe1edc6ul));
    Round(f, g, h, a, b, c, d, e, K(0x240cf254ul));
    Round(e, f, g, h, a, b, c, d, K(0x4fe9346ful));
    Round(d, e, f, g, h, a, b, c, K(0x6cc984beul));
    Round(c, d, e, f, g, h, a, b, K(0x61b9411eul));
    Round(b, c, d, e, f, g, h, a, K(0x16f988faul));
    Round(a, b, c, d, e, f, g, h, K(0xf2c65152ul));
    Round(h, a, b, c, d, e, f, g, K(0xa88e5a6dul));
    Round(g, h, a, b, c, d, e, f, K(0xb019fc65ul));
    Round(f, g, h, a, b, c, d, e, K(0xb9d99ec7ul));
    Round(e, f, g, h, a, b, c, d, K(0x9a1231c3ul));
    Round(d, e, f, g, h, a, b, c, K(0xe70eeaa0ul));
    Round(c, d, e, f, g, h, a, b, K(0xfdb1232bul));
    Round(b, c, d, e, f, g, h, a, K(0xc7353eb0ul));
    Round(a, b, c, d, e, f, g, h, K(0x3069bad5ul));
    Round(h, a, b, c, d, e, f, g, K(0xcb976d5ful));
    Round(g, h, a, b, c, d, e, f, K(0x5a0f118ful));
    Round(f, g, h, a, b, c, d, e, K(0xdc1eeefdul));
    Round(e, f, g, h, a, b, c, d, K(0x0a35b689ul));
    Round(d, e, f, g, h, a, b, c, K(0xde0b7a04ul));
    Round(c, d, e, f, g, h, a, b, K(0x58f4ca9dul));
    Round(b, c, d, e, f, g, h, a, K(0xe15d5b16ul));
    Round(a, b, c, d, e, f, g, h, K(0x007f3e86ul));
    Round(h, a, b, c, d, e, f, g, K(0x37088980ul));
    Round(g, h, a, b, c, d, e, f, K(0xa507ea32ul));
    Round(f, g, h, a, b, c, d, e, K(0x6fab9537ul));
    Round(e, f, g, h, a, b, c, d, K(0x17406110ul));
    Round(d, e, f, g, h, a, b, c, K(0x0d8cd6f1ul));
    Round(c, d, e, f, g, h, a, b, K(0xcdaa3b6dul));
    Round(b, c, d, e, f, g, h, a, K(0xc0bbbe37ul));
    Round(a, b, c, d, e, f, g, h, K(0x83613bdaul));
    Round(h, a, b, c, d, e, f, g, K(0xdb48a363ul));
    Round(g, h, a, b, c, d, e, f, K(0x0b02e931ul));
    Round(f, g, h, a, b, c, d, e, K(0x6fd15ca7ul));
    Round(e, f, g, h, a, b, c, d, K(0x521afacaul));
    Round(d, e, f, g, h, a, b, c, K(0x31338431ul));
    Round(c, d, e, f, g, h, a, b, K(0x6ed41a95ul));
    Round(b, c, d, e, f, g, h, a, K(0x6d437890ul));
    Round(a, b, c, d, e, f, g, h, K(0xc39c91f2ul));
    Round(h, a, b, c, d, e, f, g, K(0x9eccabbdul));
    Round(g, h, a, b, c, d, e, f, K(0xb5c9a0e6ul));
    Round(f, g, h, a, b, c, d, e, K(0x532fb63cul));
    Round(e, f, g, h, a, b, c, d, K(0xd2c741c6ul));
    Round(d, e, f, g, h, a, b, c, K(0x07237ea3ul));
    Round(c, d, e, f, g, h, a, b, K(0xa4954b68ul));
    Round(b, c, d, e, f, g, h, a, K(0x4c191d76ul));

    w0 = Add(t0, a);
    w1 = Add(t1, b);
    w2 = Add(t2, c);
    w3 = Add(t3, d);
    w4 = Add(t4, e);
    w5 = Add(t5, f);
    w6 = Add(t6, g);
    w7 = Add(t7, h);

    // Transform 3
    a = K(0x6a09e667ul);
    b = K(0xbb67ae85ul);
    c = K(0x3c6ef372ul);
    d = K(0xa54ff53aul);
    e = K(0x510e527ful);
    f = K(0x9b05688cul);
    g = K(0x1f83d9abul);
    h = K(0x5be0cd19ul);

    Round(a, b, c, d, e, f, g, h, Add(K(0x428a2f98ul), w0));
    Round(h, a, b, c, d, e, f, g, Add(K(0x71374491ul), w1));
    Round(g, h, a, b, c, d, e, f, Add(K(0xb5c0fbcful), w2));
    Round(f, g, h, a, b, c, d, e, Add(K(0xe9b5dba5ul), w3));
    Round(e, f, g, h, a, b, c, d, Add(K(0x3956c25bul), w4));
    Round(d, e, f, g, h, a, b, c, Add(K(0x59f111f1ul), w5));
    Round(c, d, e, f, g, h, a, b, Add(K(0x923f82a4ul), w6));
    Round(b, c, d, e, f, g, h, a, Add(K(0xab1c5ed5ul), w7));
    Round(a, b, c, d, e, f, g, h, K(0x5807aa98ul));
    Round(h, a, b, c, d, e, f, g, K(0x12835b01ul));
    Round(g, h, a, b, c, d, e, f, K(0x243185beul));
    Round(f, g, h, a, b, c, d, e, K(0x550c7dc3ul));
    Round(e, f, g, h, a, b, c, d, K(0x72be5d74ul));
    Round(d, e, f, g, h, a, b, c, K(0x80deb1feul));
    Round(c, d, e, f, g, h, a, b, K(0x9bdc06a7ul));
    Round(b, c, d, e, f, g, h, a, K(0xc19bf274ul));
    Round(a, b, c, d, e, f, g, h, Add(K(0xe49b69c1ul), Inc(w0, sigma0(w1))));
    Round(h, a, b, c, d, e, f, g, Add(K(0xefbe4786ul), Inc(w1, K(0xa00000ul), sigma0(w2))));
    Round(g, h, a, b, c, d, e, f, Add(K(0x0fc19dc6ul), Inc(w2, sigma1(w0), sigma0(w3))));
    Round(f, g, h, a, b, c, d, e, Add(K(0x240ca1ccul), Inc(w3, sigma1(w1), sigma0(w4))));
    Round(e, f, g, h, a, b, c, d, Add(K(0x2de92c6ful), Inc(w4, sigma1(w2), sigma0(w5))));
    Round(d, e, f, g, h, a, b, c, Add(K(0x4a7484aaul), Inc(w5, sigma1(w3), sigma0(w6))));
    Round(c, d, e, f, g, h, a, b, Add(K(0x5cb0a9dcul), Inc(w6, sigma1(w4), K(0x100ul), sigma0(w7))));
    Round(b, c, d, e, f, g, h, a, Add(K(0x76f988daul), Inc(w7, sigma1(w5), w0, K(0x11002000ul))));
    Round(a, b, c, d, e, f, g, h, Add(K(0x983e5152ul), w8 = Add(K(0x80000000ul), sigma1(w6), w1)));
    Round(h, a, b, c, d, e, f, g, Add(K(0xa831c66dul), w9 = Add(sigma1(w7), w2)));
    Round(g, h, a, b, c, d, e, f, Add(K(0xb00327c8ul), w10 = Add(sigma1(w8), w3)));
    Round(f, g, h, a, b, c, d, e, Add(K(0xbf597fc7ul), w11 = Add(sigma1(w9), w4)));
    Round(e, f, g, h, a, b, c, d, Add(K(0xc6e00bf3ul), w12 = Add(sigma1(w10), w5)));
    Round(d, e, f, g, h, a, b, c, Add(K(0xd5a79147ul), w13 = Add(sigma1(w11), w6)));
    Round(c, d, e, f, g, h, a, b, Add(K(0x06ca6351ul), w14 = Add(sigma1(w12), w7, K(0x400022ul))));
    Round(b, c, d, e, f, g, h, a, Add(K(0x14292967ul), w15 = Add(K(0x100ul), sigma1(w13), w8, sigma0(w0))));
    Round(a, b, c, d, e, f, g, h, Add(K(0x27b70a85ul), Inc(w0, sigma1(w14), w9, sigma0(w1))));
    Round(h, a, b, c, d, e, f, g, Add(K(0x2e1b2138ul), Inc(w1, sigma1(w15), w10, sigma0(w2))));
    Round(g, h, a, b, c, d, e, f, Add(K(0x4d2c6dfcul), Inc(w2, sigma1(w0), w11, sigma0(w3))));
    Round(f, g, h, a, b, c, d, e, Add(K(0x53380d13ul), Inc(w3, sigma1(w1), w12, sigma0(w4))));
    Round(e, f, g, h, a, b, c, d, Add(K(0x650a7354ul), Inc(w4, sigma1(w2), w13, sigma0(w5))));
    Round(d, e, f, g, h, a, b, c, Add(K(0x766a0abbul), Inc(w5, sigma1(w3), w14, sigma0(w6))));
    Round(c, d, e, f, g, h, a, b, Add(K(0x81c2c92eul), Inc(w6, sigma1(w4), w15, sigma0(w7))));
    Round(b, c, d, e, f, g, h, a, Add(K(0x92722c85ul), Inc(w7, sigma1(w5), w0, sigma0(w8))));
    Round(a, b, c, d, e, f, g, h, Add(K(0xa2bfe8a1ul), Inc(w8, sigma1(w6), w1, sigma0(w9))));
    Round(h, a, b, c, d, e, f, g, Add(K(0xa81a664bul), Inc(w9, sigma1(w7), w2, sigma0(w10))));
    Round(g, h, a, b, c, d, e, f, Add(K(0xc24b8b70ul), Inc(w10, sigma1(w8), w3, sigma0(w11))));
    Round(f, g, h, a, b, c, d, e, Add(K(0xc76c51a3ul), Inc(w11, sigma1(w9), w4, sigma0(w12))));
    Round(e, f, g, h, a, b, c, d, Add(K(0xd192e819ul), Inc(w12, sigma1(w10), w5, sigma0(w13))));
    Round(d, e, f, g, h, a, b, c, Add(K(0xd6990624ul), Inc(w13, sigma1(w11), w6, sigma0(w14))));
    Round(c, d, e, f, g, h, a, b, Add(K(0xf40e3585ul), Inc(w14, sigma1(w12), w7, sigma0(w15))));
    Round(b, c, d, e, f, g, h, a, Add(K(0x106aa070ul), Inc(w15, sigma1(w13), w8, sigma0(w0))));
    Round(a, b, c, d, e, f, g, h, Add(K(0x19a4c116ul), Inc(w0, sigma1(w14), w9, sigma0(w1))));
    Round(h, a, b, c, d, e, f, g, Add(K(0x1e376c08ul), Inc(w1, sigma1(w15), w10, sigma0(w2))));
    Round(g, h, a, b, c, d, e, f, Add(K(0x2748774cul), Inc(w2, sigma1(w0), w11, sigma0(w3))));
    Round(f, g, h, a, b, c, d, e, Add(K(0x34b0bcb5ul), Inc(w3, sigma1(w1), w12, sigma0(w4))));
    Round(e, f, g, h, a, b, c, d, Add(K(0x391c0cb3ul), Inc(w4, sigma1(w2), w13, sigma0(w5))));
    Round(d, e, f, g, h, a, b, c, Add(K(0x4ed8aa4aul), Inc(w5, sigma1(w3), w14, sigma0(w6))));
    Round(c, d, e, f, g, h, a, b, Add(K(0x5b9cca4ful), Inc(w6, sigma1(w4), w15, sigma0(w7))));
    Round(b, c, d, e, f, g, h, a, Add(K(0x682e6ff3ul), Inc(w7, sigma1(w5), w0, sigma0(w8))));
    Round(a, b, c, d, e, f, g, h, Add(K(0x748f82eeul), Inc(w8, sigma1(w6), w1, sigma0(w9))));
    Round(h, a, b, c, d, e, f, g, Add(K(0x78a5636ful), Inc(w9, sigma1(w7), w2, sigma0(w10))));
    Round(g, h, a, b, c, d, e, f, Add(K(0x84c87814ul), Inc(w10, sigma1(w8), w3, sigma0(w11))));
    Round(f, g, h, a, b, c, d, e, Add(K(0x8cc70208ul), Inc(w11, sigma1(w9), w4, sigma0(w12))));
    Round(e, f, g, h, a, b, c, d, Add(K(0x90befffaul), Inc(w12, sigma1(w10), w5, sigma0(w13))));
    Round(d, e, f, g, h, a, b, c, Add(K(0xa4506cebul), Inc(w13, sigma1(w11), w6, sigma0(w14))));
    Round(c, d, e, f, g, h, a, b, Add(K(0xbef9a3f7ul), w14, sigma1(w12), w7, sigma0(w15)));
    Round(b, c, d, e, f, g, h, a, Add(K(0xc67178f2ul), w15, sigma1(w13), w8, sigma0(w0)));

    // Output
    Write8(out, 0, Add(a, K(0x6a09e667ul)));
    Write8(out, 4, Add(b, K(0xbb67ae85ul)));
    Write8(out, 8, Add(c, K(0x3c6ef372ul)));
    Write8(out, 12, Add(d, K(0xa54ff53aul)));
    Write8(out, 16, Add(e, K(0x510e527ful)));
    Write8(out, 20, Add(f, K(0x9b05688cul)));
    Write8(out, 24, Add(g, K(0x1f83d9abul)));
    Write8(out, 28, Add(h, K(0x5be0cd19ul)));
}